

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverLines.cpp
# Opt level: O3

void setupAction<float>(vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                        *L1,vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                            *L2,Matrix<float,_64,_64,_0,_64,_64> *Action)

{
  pointer pMVar1;
  pointer pMVar2;
  void *pvVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  float *pfVar12;
  float *pfVar13;
  Index col;
  int primI;
  int iVar14;
  ulong uVar15;
  int row;
  int row_00;
  long lVar16;
  int iVar17;
  int iVar18;
  int secI;
  int iVar19;
  ulong uVar20;
  Matrix<float,_15,_84,_0,_15,_84> M1;
  Matrix<float,_93,_157,_0,_93,_157> M2;
  Matrix<float,_60,_15,_0,_60,_15> B;
  vector<float,_std::allocator<float>_> m [6] [5] [3];
  Matrix<float,_15,_15,_0,_15,_15> BtB;
  Matrix<float,_93,_64,_0,_93,_64> M3;
  Matrix<float,_60,_84,_0,_60,_84> M1p;
  Matrix<float,_15,_60,_0,_15,_60> Bt;
  PartialPivLU<Eigen::Matrix<float,_93,_93,_0,_93,_93>_> lu;
  Matrix<float,_15,_84,_0,_15,_84> MStack_25718;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  *pvStack_24368;
  float fStack_24360;
  float fStack_2435c;
  float fStack_24358;
  float fStack_24354;
  float fStack_24350;
  float fStack_2434c;
  float fStack_24348;
  float fStack_24344;
  float fStack_24340;
  float fStack_2433c;
  float fStack_24338;
  float fStack_24334;
  float fStack_24330;
  float fStack_2432c;
  float fStack_24328;
  float fStack_24324;
  float fStack_24320;
  float fStack_2431c;
  float fStack_24318;
  float fStack_24314;
  float fStack_24310;
  float fStack_2430c;
  float fStack_24308;
  float fStack_24304;
  float fStack_24300;
  float fStack_242fc;
  float fStack_242f8;
  float fStack_242f4;
  float fStack_242f0;
  float fStack_242ec;
  float fStack_242e8;
  float fStack_242e4;
  float fStack_242e0;
  float fStack_242dc;
  float fStack_242d8;
  float fStack_242d4;
  float fStack_242d0;
  float fStack_242cc;
  float fStack_242c8;
  float fStack_242c4;
  float fStack_242c0;
  float fStack_242bc;
  float fStack_242b8;
  float fStack_242b4;
  float fStack_242b0;
  float fStack_242ac;
  float fStack_242a8;
  float fStack_242a4;
  float fStack_242a0;
  float fStack_2429c;
  float fStack_24298;
  float fStack_24294;
  float fStack_24290;
  float fStack_2428c;
  float *pfStack_24288;
  Block<Eigen::Matrix<float,_93,_157,_0,_93,_157>,_93,_64,_false> BStack_24280;
  Product<Eigen::Inverse<Eigen::Matrix<float,_15,_15,_0,_15,_15>_>,_Eigen::Matrix<float,_15,_60,_0,_15,_60>,_0>
  PStack_24250;
  Matrix<float,_60,_84,_0,_60,_84> *pMStack_24240;
  float fStack_24214;
  float fStack_241e4;
  float fStack_2409c;
  float fStack_2406c;
  float fStack_23f24;
  float fStack_23ef4;
  float fStack_23dac;
  float fStack_23d7c;
  float fStack_23c34;
  float fStack_23c04;
  float fStack_23abc;
  float fStack_23a8c;
  float fStack_23990;
  float fStack_23944;
  float fStack_23914;
  float fStack_23818;
  float fStack_237cc;
  float fStack_2379c;
  float fStack_236a0;
  float fStack_23654;
  float fStack_23624;
  float fStack_23528;
  float fStack_234dc;
  float fStack_233a8;
  float fStack_23364;
  float fStack_23338;
  float fStack_2323c;
  float fStack_23230;
  float fStack_231ec;
  float fStack_231c8;
  float fStack_231c4;
  float fStack_230c4;
  float fStack_230b8;
  float fStack_23054;
  float fStack_23050;
  float fStack_22f40;
  float fStack_22ee0;
  float fStack_22edc;
  float fStack_22dc8;
  float fStack_22adc;
  float fStack_22a84;
  float fStack_22a80;
  float fStack_22964;
  float fStack_22910;
  float fStack_2290c;
  float fStack_22824;
  float fStack_22818;
  float fStack_22814;
  float fStack_22810;
  float fStack_2280c;
  float fStack_22808;
  float fStack_22804;
  float fStack_22800;
  float fStack_227fc;
  float fStack_227f8;
  float fStack_227f4;
  float fStack_227f0;
  float fStack_227ec;
  float fStack_227e8;
  float fStack_227e4;
  float fStack_227e0;
  float fStack_227dc;
  float fStack_227d8;
  float fStack_227d4;
  float fStack_227d0;
  float fStack_227cc;
  float fStack_227c8;
  float fStack_227c4;
  float fStack_227c0;
  float fStack_227bc;
  float fStack_227b8;
  float fStack_227b4;
  float fStack_227b0;
  float fStack_227ac;
  float fStack_227a8;
  float fStack_227a4;
  float fStack_227a0;
  float fStack_2279c;
  float fStack_22798;
  float fStack_226b0;
  float fStack_226ac;
  float fStack_226a8;
  float fStack_226a4;
  float fStack_226a0;
  float fStack_2269c;
  float fStack_22698;
  float fStack_22694;
  float fStack_22690;
  float fStack_2268c;
  float fStack_22688;
  float fStack_22684;
  float fStack_22680;
  float fStack_2267c;
  float fStack_22678;
  float fStack_22674;
  float fStack_22670;
  float fStack_2266c;
  float fStack_22668;
  float fStack_22664;
  float fStack_22660;
  float fStack_2265c;
  float fStack_22658;
  float fStack_22654;
  float fStack_22650;
  float fStack_2264c;
  float fStack_22648;
  float fStack_22644;
  float fStack_22640;
  float fStack_2263c;
  float fStack_22638;
  float fStack_22634;
  float fStack_22630;
  float fStack_2262c;
  float fStack_22628;
  float fStack_22624;
  float fStack_2253c;
  float fStack_22538;
  float fStack_22534;
  float fStack_22530;
  float fStack_2252c;
  float fStack_22528;
  float fStack_22524;
  float fStack_22520;
  float fStack_2251c;
  float fStack_22518;
  float fStack_22514;
  float fStack_22510;
  float fStack_2250c;
  float fStack_22508;
  float fStack_22504;
  float fStack_22500;
  float fStack_224fc;
  float fStack_224f8;
  float fStack_224f4;
  float fStack_224f0;
  float fStack_224ec;
  float fStack_224e8;
  float fStack_224e4;
  float fStack_224e0;
  float fStack_224dc;
  float fStack_224d8;
  float fStack_223c8;
  float fStack_223c4;
  float fStack_223c0;
  float fStack_223bc;
  float fStack_223b8;
  float fStack_223b4;
  float fStack_223b0;
  float fStack_22238;
  float fStack_22234;
  float fStack_22230;
  float fStack_2222c;
  float fStack_22228;
  float fStack_22224;
  float fStack_22220;
  float fStack_221ec;
  float fStack_221e8;
  float fStack_221e4;
  float fStack_221e0;
  float fStack_221dc;
  float fStack_221d8;
  float fStack_221d4;
  float fStack_221d0;
  float fStack_221cc;
  float fStack_221c8;
  float fStack_220e4;
  float fStack_220e0;
  float fStack_220c4;
  float fStack_220c0;
  float fStack_220bc;
  float fStack_220b8;
  float fStack_220b4;
  float fStack_220b0;
  float fStack_220ac;
  float fStack_220a8;
  float fStack_220a4;
  float fStack_220a0;
  float fStack_2209c;
  float fStack_22098;
  float fStack_22094;
  float fStack_22090;
  float fStack_2208c;
  float fStack_22088;
  float fStack_22084;
  float fStack_22080;
  float fStack_2207c;
  float fStack_22078;
  float fStack_22074;
  float fStack_22070;
  float fStack_2206c;
  float fStack_22068;
  float fStack_22064;
  float fStack_22060;
  float fStack_2205c;
  float fStack_22058;
  float fStack_22054;
  float fStack_21f70;
  float fStack_21f6c;
  float fStack_21f68;
  float fStack_21f64;
  float fStack_21f60;
  float fStack_21f5c;
  float fStack_21f58;
  float fStack_21f54;
  float fStack_21f50;
  float fStack_21f4c;
  float fStack_21f48;
  float fStack_21f44;
  float fStack_21f40;
  float fStack_21f3c;
  float fStack_21f38;
  float fStack_21f34;
  float fStack_21f30;
  float fStack_21f2c;
  float fStack_21f28;
  float fStack_21f24;
  float fStack_21f20;
  float fStack_21f1c;
  float fStack_21f18;
  float fStack_21f14;
  float fStack_21f10;
  float fStack_21f0c;
  float fStack_21f08;
  float fStack_21f04;
  float fStack_21f00;
  float fStack_21efc;
  float fStack_21ef8;
  float fStack_21ef4;
  float fStack_21ef0;
  float fStack_21eec;
  float fStack_21ee8;
  float fStack_21ee4;
  float fStack_21ee0;
  float fStack_21dfc;
  float fStack_21df8;
  float fStack_21df4;
  float fStack_21df0;
  float fStack_21dec;
  float fStack_21de8;
  float fStack_21de4;
  float fStack_21de0;
  float fStack_21ddc;
  float fStack_21dd8;
  float fStack_21dd4;
  float fStack_21dd0;
  float fStack_21dcc;
  float fStack_21dc8;
  float fStack_21dc4;
  float fStack_21dc0;
  float fStack_21dbc;
  float fStack_21db8;
  float fStack_21db4;
  float fStack_21db0;
  float fStack_21dac;
  float fStack_21da8;
  float fStack_21da4;
  float fStack_21da0;
  float fStack_21d9c;
  float fStack_21d98;
  float fStack_21d94;
  float fStack_21c88;
  float fStack_21c84;
  float fStack_21c80;
  float fStack_21c7c;
  float fStack_21c78;
  float fStack_21c74;
  float fStack_21c70;
  float fStack_21c6c;
  float fStack_21b14;
  float fStack_21af4;
  float fStack_21af0;
  float fStack_21aec;
  float fStack_21ae8;
  float fStack_21ae4;
  float fStack_21ae0;
  float fStack_21adc;
  float fStack_21aa8;
  float fStack_21aa4;
  float fStack_21aa0;
  float fStack_21a9c;
  float fStack_21a98;
  float fStack_21a94;
  float fStack_21a90;
  float fStack_21a8c;
  float fStack_21a88;
  float fStack_21a84;
  float fStack_219a0;
  float fStack_2199c;
  float fStack_21980;
  float fStack_2197c;
  float fStack_21978;
  float fStack_21974;
  float fStack_21970;
  float fStack_2196c;
  float fStack_21968;
  float fStack_21964;
  float fStack_21960;
  float fStack_2195c;
  float fStack_21958;
  float fStack_21954;
  float fStack_21950;
  float fStack_2194c;
  float fStack_21948;
  float fStack_21944;
  float fStack_21940;
  float fStack_2193c;
  float fStack_21938;
  float fStack_21934;
  float fStack_21930;
  float fStack_2192c;
  float fStack_21928;
  float fStack_21924;
  float fStack_21920;
  float fStack_2191c;
  float fStack_21918;
  float fStack_21914;
  float fStack_21910;
  float fStack_2182c;
  float fStack_21828;
  float fStack_21824;
  float fStack_21820;
  float fStack_2181c;
  float fStack_21818;
  float fStack_21814;
  float fStack_21810;
  float fStack_2180c;
  float fStack_21808;
  float fStack_21804;
  float fStack_21800;
  float fStack_217fc;
  float fStack_217f8;
  float fStack_217f4;
  float fStack_217f0;
  float fStack_217ec;
  float fStack_217e8;
  float fStack_217e4;
  float fStack_217e0;
  float fStack_217dc;
  float fStack_217d8;
  float fStack_217d4;
  float fStack_217d0;
  float fStack_217cc;
  float fStack_217c8;
  float fStack_217c4;
  float fStack_216b8;
  float fStack_216b4;
  float fStack_216b0;
  float fStack_216ac;
  float fStack_216a8;
  float fStack_216a4;
  float fStack_216a0;
  float fStack_2169c;
  float fStack_21544;
  float fStack_21524;
  float fStack_21520;
  float fStack_2151c;
  float fStack_21518;
  float fStack_21514;
  float fStack_21510;
  float fStack_2150c;
  float fStack_214d8;
  float fStack_214d4;
  float fStack_214d0;
  float fStack_214cc;
  float fStack_214c8;
  float fStack_214c4;
  float fStack_214c0;
  float fStack_214bc;
  float fStack_214b8;
  float fStack_214b4;
  float fStack_213d0;
  float fStack_213cc;
  float fStack_213b0;
  float fStack_213ac;
  float fStack_213a8;
  float fStack_213a4;
  float fStack_213a0;
  float fStack_2139c;
  float fStack_21398;
  float fStack_21394;
  float fStack_21390;
  float fStack_2138c;
  float fStack_21388;
  float fStack_21384;
  float fStack_21380;
  float fStack_2137c;
  float fStack_21378;
  float fStack_21374;
  float fStack_21370;
  float fStack_2136c;
  float fStack_21368;
  float fStack_2125c;
  float fStack_21258;
  float fStack_21254;
  float fStack_21250;
  float fStack_2124c;
  float fStack_21248;
  float fStack_21244;
  float fStack_21240;
  float fStack_210e8;
  float fStack_210c8;
  float fStack_210c4;
  float fStack_210c0;
  float fStack_210bc;
  float fStack_210b8;
  float fStack_210b4;
  float fStack_210b0;
  float fStack_20f74;
  float fStack_20f70;
  float fStack_20e00;
  float fStack_20c20;
  float fStack_20c1c;
  float fStack_20c18;
  float fStack_20c14;
  float fStack_20c10;
  float fStack_20c0c;
  float fStack_20c08;
  float fStack_20c04;
  float fStack_20c00;
  float fStack_20bfc;
  float fStack_20b90;
  float fStack_20adc;
  float fStack_20ad8;
  float fStack_20ad4;
  float fStack_20ad0;
  float fStack_20acc;
  float fStack_20ac8;
  float fStack_20ac4;
  float fStack_20ac0;
  float fStack_20abc;
  float fStack_20ab8;
  float fStack_20ab4;
  float fStack_20ab0;
  float fStack_20aac;
  float fStack_20aa8;
  float fStack_20aa4;
  float fStack_20aa0;
  float fStack_20a9c;
  float fStack_20a98;
  float fStack_20a94;
  float fStack_20a90;
  float fStack_20a8c;
  float fStack_20a88;
  float fStack_20a18;
  float fStack_2099c;
  float fStack_20998;
  float fStack_20994;
  float fStack_20990;
  float fStack_2098c;
  float fStack_20988;
  float fStack_20968;
  float fStack_20964;
  float fStack_20960;
  float fStack_2095c;
  float fStack_20958;
  float fStack_20954;
  float fStack_20950;
  float fStack_2094c;
  float fStack_20948;
  float fStack_20944;
  float fStack_20940;
  float fStack_2093c;
  float fStack_20938;
  float fStack_20934;
  float fStack_20930;
  float fStack_2092c;
  float fStack_20928;
  float fStack_20924;
  float fStack_20920;
  float fStack_2091c;
  float fStack_20918;
  float fStack_20914;
  float fStack_208e0;
  float fStack_208a0;
  float fStack_20828;
  float fStack_20824;
  float fStack_20820;
  float fStack_2081c;
  float fStack_20818;
  float fStack_20814;
  float fStack_207f4;
  float fStack_207f0;
  float fStack_207ec;
  float fStack_207e8;
  float fStack_207e4;
  float fStack_207e0;
  float fStack_207dc;
  float fStack_207d8;
  float fStack_207d4;
  float fStack_207d0;
  float fStack_207cc;
  float fStack_207c8;
  float fStack_207c4;
  float fStack_207c0;
  float fStack_207bc;
  float fStack_207b8;
  float fStack_207b4;
  float fStack_207b0;
  float fStack_207ac;
  float fStack_207a8;
  float fStack_207a4;
  float fStack_207a0;
  float fStack_20768;
  float fStack_20728;
  float fStack_206b4;
  float fStack_206b0;
  float fStack_206ac;
  float fStack_206a8;
  float fStack_206a4;
  float fStack_206a0;
  float fStack_20680;
  float fStack_2067c;
  float fStack_20678;
  float fStack_20674;
  float fStack_20670;
  float fStack_2066c;
  float fStack_20668;
  float fStack_20664;
  float fStack_20660;
  float fStack_2065c;
  float fStack_20658;
  float fStack_20654;
  float fStack_20650;
  float fStack_2064c;
  float fStack_20648;
  float fStack_20644;
  float fStack_20640;
  float fStack_2063c;
  float fStack_20638;
  float fStack_20634;
  float fStack_20630;
  float fStack_2062c;
  float fStack_205f0;
  float fStack_205b0;
  float fStack_20540;
  float fStack_2053c;
  float fStack_20538;
  float fStack_20534;
  float fStack_20530;
  float fStack_2052c;
  float fStack_2050c;
  float fStack_20508;
  float fStack_20504;
  float fStack_20500;
  float fStack_204fc;
  float fStack_204f8;
  float fStack_204f4;
  float fStack_204f0;
  float fStack_204ec;
  float fStack_204e8;
  float fStack_204e4;
  float fStack_204e0;
  float fStack_204dc;
  float fStack_204d8;
  float fStack_204d4;
  float fStack_204d0;
  float fStack_204cc;
  float fStack_204c8;
  float fStack_204c4;
  float fStack_204c0;
  float fStack_204bc;
  float fStack_204b8;
  float fStack_20478;
  float fStack_20438;
  float fStack_203cc;
  float fStack_203c8;
  float fStack_203c4;
  float fStack_203c0;
  float fStack_203bc;
  float fStack_203b8;
  float fStack_20398;
  float fStack_20394;
  float fStack_20390;
  float fStack_2038c;
  float fStack_20388;
  float fStack_20384;
  float fStack_20380;
  float fStack_2037c;
  float fStack_20378;
  float fStack_20374;
  float fStack_20370;
  float fStack_2036c;
  float fStack_20300;
  float fStack_202c0;
  float fStack_20258;
  float fStack_20254;
  float fStack_20250;
  float fStack_2024c;
  float fStack_20248;
  float fStack_20244;
  float fStack_20188;
  float fStack_200cc;
  float fStack_200c8;
  float fStack_200c4;
  float fStack_200c0;
  float fStack_200bc;
  float fStack_200b8;
  float fStack_200b4;
  float fStack_20080;
  float fStack_2007c;
  float fStack_20078;
  float fStack_20074;
  float fStack_20070;
  float fStack_2006c;
  float fStack_20068;
  float fStack_20064;
  float fStack_20060;
  float fStack_2005c;
  float fStack_1ffd4;
  float fStack_1ff74;
  float fStack_1ff58;
  float fStack_1ff54;
  float fStack_1ff50;
  float fStack_1ff4c;
  float fStack_1ff48;
  float fStack_1ff44;
  float fStack_1ff40;
  float fStack_1ff3c;
  float fStack_1ff38;
  float fStack_1ff34;
  float fStack_1ff30;
  float fStack_1ff2c;
  float fStack_1ff28;
  float fStack_1ff24;
  float fStack_1ff20;
  float fStack_1ff1c;
  float fStack_1ff18;
  float fStack_1ff14;
  float fStack_1ff10;
  float fStack_1ff0c;
  float fStack_1ff08;
  float fStack_1ff04;
  float fStack_1ff00;
  float fStack_1fefc;
  float fStack_1fef8;
  float fStack_1fef4;
  float fStack_1fef0;
  float fStack_1feec;
  float fStack_1fee8;
  float fStack_1fe9c;
  float fStack_1fe5c;
  float fStack_1fe00;
  float fStack_1fdfc;
  float fStack_1fdf8;
  float fStack_1fdf4;
  float fStack_1fdf0;
  float fStack_1fdec;
  float fStack_1fde8;
  float fStack_1fde4;
  float fStack_1fde0;
  float fStack_1fddc;
  float fStack_1fdd8;
  float fStack_1fdd4;
  float fStack_1fdd0;
  float fStack_1fdcc;
  float fStack_1fdc8;
  float fStack_1fdc4;
  float fStack_1fdc0;
  float fStack_1fdbc;
  float fStack_1fdb8;
  float fStack_1fdb4;
  float fStack_1fdb0;
  float fStack_1fdac;
  float fStack_1fda8;
  float fStack_1fda4;
  float fStack_1fda0;
  float fStack_1fd9c;
  float fStack_1fd98;
  float fStack_1fd94;
  float fStack_1fd90;
  float fStack_1fd8c;
  float fStack_1fd88;
  float fStack_1fd84;
  float fStack_1fd80;
  float fStack_1fd7c;
  float fStack_1fd78;
  float fStack_1fd74;
  float fStack_1fd24;
  float fStack_1fce4;
  float fStack_1fc8c;
  float fStack_1fc88;
  float fStack_1fc84;
  float fStack_1fc80;
  float fStack_1fc7c;
  float fStack_1fc78;
  float fStack_1fc74;
  float fStack_1fc70;
  float fStack_1fc6c;
  float fStack_1fc68;
  float fStack_1fc64;
  float fStack_1fc60;
  float fStack_1fc5c;
  float fStack_1fc58;
  float fStack_1fc54;
  float fStack_1fc50;
  float fStack_1fc4c;
  float fStack_1fc48;
  float fStack_1fc44;
  float fStack_1fc40;
  float fStack_1fc3c;
  float fStack_1fc38;
  float fStack_1fc34;
  float fStack_1fc30;
  float fStack_1fc2c;
  float fStack_1fc28;
  float fStack_1fc24;
  float fStack_1fc20;
  float fStack_1fc1c;
  float fStack_1fc18;
  float fStack_1fc14;
  float fStack_1fc10;
  float fStack_1fc0c;
  float fStack_1fc08;
  float fStack_1fc04;
  float fStack_1fc00;
  float fStack_1fbfc;
  float fStack_1fbac;
  float fStack_1fb6c;
  float fStack_1fb18;
  float fStack_1fb14;
  float fStack_1fb10;
  float fStack_1fb0c;
  float fStack_1fb08;
  float fStack_1fb04;
  float fStack_1fb00;
  float fStack_1fafc;
  float fStack_1faf8;
  float fStack_1faf4;
  float fStack_1faf0;
  float fStack_1faec;
  float fStack_1fae8;
  float fStack_1fae4;
  float fStack_1fae0;
  float fStack_1fadc;
  float fStack_1fad8;
  float fStack_1fad4;
  float fStack_1fad0;
  float fStack_1facc;
  float fStack_1fac8;
  float fStack_1fac4;
  float fStack_1fac0;
  float fStack_1fabc;
  float fStack_1fab8;
  float fStack_1fab4;
  float fStack_1fab0;
  float fStack_1faac;
  float fStack_1faa8;
  float fStack_1faa4;
  float fStack_1faa0;
  float fStack_1fa9c;
  float fStack_1fa98;
  float fStack_1fa94;
  float fStack_1fa90;
  float fStack_1fa8c;
  float fStack_1fa84;
  float fStack_1fa34;
  float fStack_1f9f4;
  float fStack_1f9a4;
  float fStack_1f9a0;
  float fStack_1f99c;
  float fStack_1f998;
  float fStack_1f994;
  float fStack_1f990;
  float fStack_1f98c;
  float fStack_1f988;
  float fStack_1f984;
  float fStack_1f980;
  float fStack_1f97c;
  float fStack_1f978;
  float fStack_1f974;
  float fStack_1f970;
  float fStack_1f96c;
  float fStack_1f968;
  float fStack_1f964;
  float fStack_1f960;
  float fStack_1f95c;
  float fStack_1f958;
  float fStack_1f954;
  float fStack_1f950;
  float fStack_1f94c;
  float fStack_1f948;
  float fStack_1f944;
  float fStack_1f940;
  float fStack_1f90c;
  float fStack_1f8bc;
  float fStack_1f87c;
  float fStack_1f830;
  float fStack_1f82c;
  float fStack_1f828;
  float fStack_1f824;
  float fStack_1f820;
  float fStack_1f81c;
  float fStack_1f818;
  float fStack_1f794;
  float fStack_1f744;
  float fStack_1f6c0;
  float fStack_1f6a0;
  float fStack_1f69c;
  float fStack_1f698;
  float fStack_1f694;
  float fStack_1f690;
  float fStack_1f68c;
  float fStack_1f688;
  float fStack_1f654;
  float fStack_1f650;
  float fStack_1f64c;
  float fStack_1f648;
  float fStack_1f644;
  float fStack_1f640;
  float fStack_1f63c;
  float fStack_1f638;
  float fStack_1f634;
  float fStack_1f630;
  float fStack_1f61c;
  float fStack_1f590;
  float fStack_1f54c;
  float fStack_1f548;
  float fStack_1f52c;
  float fStack_1f528;
  float fStack_1f524;
  float fStack_1f520;
  float fStack_1f51c;
  float fStack_1f518;
  float fStack_1f514;
  float fStack_1f510;
  float fStack_1f50c;
  float fStack_1f508;
  float fStack_1f504;
  float fStack_1f500;
  float fStack_1f4fc;
  float fStack_1f4f8;
  float fStack_1f4f4;
  float fStack_1f4f0;
  float fStack_1f4ec;
  float fStack_1f4e8;
  float fStack_1f4e4;
  float fStack_1f4e0;
  float fStack_1f4dc;
  float fStack_1f4d8;
  float fStack_1f4d4;
  float fStack_1f4d0;
  float fStack_1f4cc;
  float fStack_1f4c8;
  float fStack_1f4c4;
  float fStack_1f4c0;
  float fStack_1f4bc;
  float fStack_1f4a4;
  float fStack_1f458;
  float fStack_1f418;
  float fStack_1f3d8;
  float fStack_1f3d4;
  float fStack_1f3d0;
  float fStack_1f3cc;
  float fStack_1f3c8;
  float fStack_1f3c4;
  float fStack_1f3c0;
  float fStack_1f3bc;
  float fStack_1f3b8;
  float fStack_1f3b4;
  float fStack_1f3b0;
  float fStack_1f3ac;
  float fStack_1f3a8;
  float fStack_1f3a4;
  float fStack_1f3a0;
  float fStack_1f39c;
  float fStack_1f398;
  float fStack_1f394;
  float fStack_1f390;
  float fStack_1f38c;
  float fStack_1f388;
  float fStack_1f384;
  float fStack_1f380;
  float fStack_1f37c;
  float fStack_1f378;
  float fStack_1f374;
  float fStack_1f370;
  float fStack_1f36c;
  float fStack_1f368;
  float fStack_1f364;
  float fStack_1f360;
  float fStack_1f35c;
  float fStack_1f358;
  float fStack_1f354;
  float fStack_1f350;
  float fStack_1f34c;
  float fStack_1f348;
  float fStack_1f32c;
  float fStack_1f2e0;
  float fStack_1f2dc;
  float fStack_1f2d8;
  float fStack_1f2d4;
  float fStack_1f2d0;
  float fStack_1f2cc;
  float fStack_1f2c8;
  float fStack_1f2c4;
  float fStack_1f2c0;
  float fStack_1f2bc;
  float fStack_1f2b8;
  float fStack_1f2b4;
  float fStack_1f2b0;
  float fStack_1f2ac;
  float fStack_1f2a8;
  float fStack_1f2a4;
  float fStack_1f264;
  float fStack_1f260;
  float fStack_1f25c;
  float fStack_1f258;
  float fStack_1f254;
  float fStack_1f250;
  float fStack_1f24c;
  float fStack_1f248;
  float fStack_1f244;
  float fStack_1f240;
  float fStack_1f23c;
  float fStack_1f238;
  float fStack_1f234;
  float fStack_1f230;
  float fStack_1f22c;
  float fStack_1f228;
  float fStack_1f224;
  float fStack_1f220;
  float fStack_1f21c;
  float fStack_1f218;
  float fStack_1f214;
  float fStack_1f210;
  float fStack_1f20c;
  float fStack_1f208;
  float fStack_1f204;
  float fStack_1f200;
  float fStack_1f1fc;
  float fStack_1f1f8;
  float fStack_1f1f4;
  float fStack_1f1f0;
  float fStack_1f1ec;
  float fStack_1f1e8;
  float fStack_1f1e4;
  float fStack_1f1e0;
  float fStack_1f1dc;
  float fStack_1f1d8;
  float fStack_1f1d4;
  float fStack_1f1b4;
  float fStack_1f1a0;
  float fStack_1f19c;
  float fStack_1f198;
  float fStack_1f194;
  float fStack_1f190;
  float fStack_1f18c;
  float fStack_1f188;
  float fStack_1f184;
  float fStack_1f180;
  float fStack_1f17c;
  float fStack_1f178;
  float fStack_1f174;
  float fStack_1f170;
  float fStack_1f16c;
  float fStack_1f168;
  float fStack_1f164;
  float fStack_1f160;
  float fStack_1f15c;
  float fStack_1f158;
  float fStack_1f154;
  float fStack_1f150;
  float fStack_1f14c;
  float fStack_1f148;
  float fStack_1f144;
  float fStack_1f140;
  float fStack_1f13c;
  float fStack_1f138;
  float fStack_1f134;
  float fStack_1f130;
  float fStack_1f0f0;
  float fStack_1f0ec;
  float fStack_1f0e8;
  float fStack_1f0e4;
  float fStack_1f0e0;
  float fStack_1f0dc;
  float fStack_1f0d8;
  float fStack_1f0d4;
  float fStack_1f0d0;
  float fStack_1f0cc;
  float fStack_1f0c8;
  float fStack_1f0c4;
  float fStack_1f0c0;
  float fStack_1f0bc;
  float fStack_1f0b8;
  float fStack_1f0b4;
  float fStack_1f0b0;
  float fStack_1f0ac;
  float fStack_1f0a8;
  float fStack_1f0a4;
  float fStack_1f0a0;
  float fStack_1f09c;
  float fStack_1f098;
  float fStack_1f094;
  float fStack_1f090;
  float fStack_1f08c;
  float fStack_1f088;
  float fStack_1f03c;
  float fStack_1f02c;
  float fStack_1f028;
  float fStack_1f024;
  float fStack_1f020;
  float fStack_1f01c;
  float fStack_1f018;
  float fStack_1f014;
  float fStack_1f010;
  float fStack_1f00c;
  float fStack_1f008;
  float fStack_1f004;
  float fStack_1f000;
  float fStack_1effc;
  float fStack_1eff8;
  float fStack_1eff4;
  float fStack_1eff0;
  float fStack_1efec;
  float fStack_1efe8;
  float fStack_1efe4;
  float fStack_1efe0;
  float fStack_1efdc;
  float fStack_1efd8;
  float fStack_1efd4;
  float fStack_1efd0;
  float fStack_1efcc;
  float fStack_1efc8;
  float fStack_1efc4;
  float fStack_1efc0;
  float fStack_1efbc;
  float fStack_1ef7c;
  float fStack_1ef78;
  float fStack_1ef74;
  float fStack_1ef70;
  float fStack_1ef6c;
  float fStack_1ef68;
  float fStack_1ef64;
  float fStack_1ef60;
  float fStack_1eec4;
  float fStack_1eeb8;
  float fStack_1eeb4;
  float fStack_1eeb0;
  float fStack_1eeac;
  float fStack_1eea8;
  float fStack_1eea4;
  float fStack_1eea0;
  float fStack_1ee9c;
  float fStack_1ee98;
  float fStack_1ee94;
  float fStack_1ee90;
  float fStack_1ee8c;
  float fStack_1ee88;
  float fStack_1ee84;
  float fStack_1ee08;
  float fStack_1ede8;
  float fStack_1ede4;
  float fStack_1ede0;
  float fStack_1eddc;
  float fStack_1edd8;
  float fStack_1edd4;
  float fStack_1edd0;
  float fStack_1ed9c;
  float fStack_1ed98;
  float fStack_1ed94;
  float fStack_1ed90;
  float fStack_1ed8c;
  float fStack_1ed88;
  float fStack_1ed84;
  float fStack_1ed80;
  float fStack_1ed7c;
  float fStack_1ed78;
  float fStack_1ed4c;
  float fStack_1ed0c;
  float fStack_1ed08;
  float fStack_1ed04;
  float fStack_1ed00;
  float fStack_1ecfc;
  float fStack_1ecf8;
  float fStack_1ecf4;
  float fStack_1ecf0;
  float fStack_1ecec;
  float fStack_1ece8;
  float fStack_1ece4;
  float fStack_1ece0;
  float fStack_1ecdc;
  float fStack_1ecd8;
  float fStack_1ecd4;
  float fStack_1ec94;
  float fStack_1ec90;
  float fStack_1ec74;
  float fStack_1ec70;
  float fStack_1ec6c;
  float fStack_1ec68;
  float fStack_1ec64;
  float fStack_1ec60;
  float fStack_1ec5c;
  float fStack_1ec58;
  float fStack_1ec54;
  float fStack_1ec50;
  float fStack_1ec4c;
  float fStack_1ec48;
  float fStack_1ec44;
  float fStack_1ec40;
  float fStack_1ec3c;
  float fStack_1ec38;
  float fStack_1ec34;
  float fStack_1ec30;
  float fStack_1ec2c;
  float fStack_1ec28;
  float fStack_1ec24;
  float fStack_1ec20;
  float fStack_1ec1c;
  float fStack_1ec18;
  float fStack_1ec14;
  float fStack_1ec10;
  float fStack_1ec0c;
  float fStack_1ec08;
  float fStack_1ec04;
  float fStack_1ebd4;
  float fStack_1ebd0;
  float fStack_1ebcc;
  float fStack_1ebc8;
  float fStack_1ebc4;
  float fStack_1ebc0;
  float fStack_1ebbc;
  float fStack_1ebb8;
  float fStack_1ebb4;
  float fStack_1ebb0;
  float fStack_1ebac;
  float fStack_1eba8;
  float fStack_1eba4;
  float fStack_1eba0;
  float fStack_1eb9c;
  float fStack_1eb98;
  float fStack_1eb94;
  float fStack_1eb90;
  float fStack_1eb8c;
  float fStack_1eb88;
  float fStack_1eb84;
  float fStack_1eb80;
  float fStack_1eb7c;
  float fStack_1eb78;
  float fStack_1eb74;
  float fStack_1eb70;
  float fStack_1eb6c;
  float fStack_1eb68;
  float fStack_1eb64;
  float fStack_1eb60;
  float fStack_1eb20;
  float fStack_1eb1c;
  float fStack_1eb18;
  float fStack_1eb14;
  float fStack_1eb10;
  float fStack_1eb0c;
  float fStack_1eb08;
  float fStack_1eb04;
  float fStack_1eb00;
  float fStack_1eafc;
  float fStack_1eaf8;
  float fStack_1eaf4;
  float fStack_1eaf0;
  float fStack_1eaec;
  float fStack_1eae8;
  float fStack_1eae4;
  float fStack_1eae0;
  float fStack_1eadc;
  float fStack_1ead8;
  float fStack_1ead4;
  float fStack_1ead0;
  float fStack_1eacc;
  float fStack_1eac8;
  float fStack_1eac4;
  float fStack_1eac0;
  float fStack_1eabc;
  float fStack_1eab8;
  float fStack_1eab4;
  float fStack_1eab0;
  float fStack_1eaac;
  float fStack_1eaa8;
  float fStack_1eaa4;
  float fStack_1eaa0;
  float fStack_1ea9c;
  float fStack_1ea98;
  float fStack_1ea94;
  float fStack_1ea90;
  float fStack_1ea8c;
  float fStack_1ea88;
  float fStack_1ea84;
  float fStack_1ea80;
  float fStack_1ea7c;
  float fStack_1ea78;
  float fStack_1ea74;
  float fStack_1ea70;
  float fStack_1ea6c;
  float fStack_1ea68;
  float fStack_1ea64;
  float fStack_1ea60;
  float fStack_1ea5c;
  float fStack_1ea58;
  float fStack_1ea54;
  float fStack_1ea50;
  float fStack_1ea4c;
  float fStack_1ea48;
  float fStack_1ea44;
  float fStack_1ea40;
  float fStack_1ea3c;
  float fStack_1ea38;
  float fStack_1ea34;
  float fStack_1ea30;
  float fStack_1ea2c;
  float fStack_1ea28;
  float fStack_1ea24;
  float fStack_1ea20;
  float fStack_1ea1c;
  float fStack_1ea18;
  float fStack_1ea14;
  float fStack_1ea10;
  float fStack_1ea0c;
  float fStack_1ea08;
  float fStack_1ea04;
  float fStack_1ea00;
  float fStack_1e9fc;
  float fStack_1e9f8;
  float fStack_1e9f4;
  float fStack_1e9f0;
  float fStack_1e9ec;
  float fStack_1e9ac;
  float fStack_1e9a8;
  float fStack_1e9a4;
  float fStack_1e9a0;
  float fStack_1e99c;
  float fStack_1e998;
  float fStack_1e994;
  float fStack_1e990;
  float fStack_1e98c;
  float fStack_1e988;
  float fStack_1e984;
  float fStack_1e980;
  float fStack_1e97c;
  float fStack_1e978;
  float fStack_1e974;
  float fStack_1e970;
  float fStack_1e96c;
  float fStack_1e968;
  float fStack_1e964;
  float fStack_1e960;
  float fStack_1e95c;
  float fStack_1e958;
  float fStack_1e954;
  float fStack_1e950;
  float fStack_1e94c;
  float fStack_1e948;
  float fStack_1e944;
  float fStack_1e918;
  float fStack_1e914;
  float fStack_1e910;
  float fStack_1e90c;
  float fStack_1e908;
  float fStack_1e904;
  float fStack_1e900;
  float fStack_1e8fc;
  float fStack_1e8f8;
  float fStack_1e8f4;
  float fStack_1e8f0;
  float fStack_1e8ec;
  float fStack_1e8e8;
  float fStack_1e8e4;
  float fStack_1e8e0;
  float fStack_1e8dc;
  float fStack_1e8d8;
  float fStack_1e8d4;
  float fStack_1e8d0;
  float fStack_1e8cc;
  float fStack_1e8c8;
  float fStack_1e8c4;
  float fStack_1e8c0;
  float fStack_1e8bc;
  float fStack_1e8b8;
  float fStack_1e8b4;
  float fStack_1e8b0;
  float fStack_1e8ac;
  float fStack_1e8a8;
  float fStack_1e8a4;
  float fStack_1e8a0;
  float fStack_1e89c;
  float fStack_1e898;
  float fStack_1e894;
  float fStack_1e890;
  float fStack_1e88c;
  float fStack_1e888;
  float fStack_1e884;
  float fStack_1e880;
  float fStack_1e87c;
  float fStack_1e878;
  float fStack_1e838;
  float fStack_1e834;
  float fStack_1e830;
  float fStack_1e82c;
  float fStack_1e828;
  float fStack_1e824;
  float fStack_1e820;
  float fStack_1e81c;
  float fStack_1e7a4;
  float fStack_1e7a0;
  float fStack_1e79c;
  float fStack_1e798;
  float fStack_1e794;
  float fStack_1e790;
  float fStack_1e78c;
  float fStack_1e788;
  float fStack_1e784;
  float fStack_1e780;
  float fStack_1e77c;
  float fStack_1e778;
  float fStack_1e774;
  float fStack_1e770;
  float fStack_1e76c;
  float fStack_1e768;
  float fStack_1e764;
  float fStack_1e760;
  float fStack_1e75c;
  float fStack_1e758;
  float fStack_1e754;
  float fStack_1e750;
  float fStack_1e74c;
  float fStack_1e748;
  float fStack_1e744;
  float fStack_1e740;
  float fStack_1e6c4;
  float fStack_1e6a4;
  float fStack_1e6a0;
  float fStack_1e69c;
  float fStack_1e698;
  float fStack_1e694;
  float fStack_1e690;
  float fStack_1e68c;
  float fStack_1e658;
  float fStack_1e654;
  float fStack_1e650;
  float fStack_1e64c;
  float fStack_1e648;
  float fStack_1e644;
  float fStack_1e640;
  float fStack_1e63c;
  float fStack_1e638;
  float fStack_1e634;
  float fStack_1e630;
  float fStack_1e62c;
  float fStack_1e628;
  float fStack_1e624;
  float fStack_1e620;
  float fStack_1e61c;
  float fStack_1e618;
  float fStack_1e614;
  float fStack_1e610;
  float fStack_1e60c;
  float fStack_1e608;
  float fStack_1e604;
  float fStack_1e5c8;
  float fStack_1e5c4;
  float fStack_1e5c0;
  float fStack_1e5bc;
  float fStack_1e5b8;
  float fStack_1e5b4;
  float fStack_1e5b0;
  float fStack_1e5ac;
  float fStack_1e5a8;
  float fStack_1e5a4;
  float fStack_1e5a0;
  float fStack_1e59c;
  float fStack_1e598;
  float fStack_1e594;
  float fStack_1e590;
  float fStack_1e550;
  float fStack_1e54c;
  float fStack_1e530;
  float fStack_1e52c;
  float fStack_1e528;
  float fStack_1e524;
  float fStack_1e520;
  float fStack_1e51c;
  float fStack_1e518;
  float fStack_1e514;
  float fStack_1e510;
  float fStack_1e50c;
  float fStack_1e508;
  float fStack_1e504;
  float fStack_1e500;
  float fStack_1e4fc;
  float fStack_1e4f8;
  float fStack_1e4f4;
  float fStack_1e4f0;
  float fStack_1e4ec;
  float fStack_1e4e8;
  float fStack_1e4e4;
  float fStack_1e4e0;
  float fStack_1e4dc;
  float fStack_1e4d8;
  float fStack_1e4d4;
  float fStack_1e4d0;
  float fStack_1e4cc;
  float fStack_1e4c8;
  float fStack_1e4c4;
  float fStack_1e4c0;
  float fStack_1e4bc;
  float fStack_1e4b8;
  float fStack_1e4b4;
  float fStack_1e4b0;
  float fStack_1e4ac;
  float fStack_1e4a8;
  float fStack_1e4a4;
  float fStack_1e4a0;
  float fStack_1e49c;
  float fStack_1e498;
  float fStack_1e494;
  float fStack_1e490;
  float fStack_1e48c;
  float fStack_1e488;
  float fStack_1e484;
  float fStack_1e480;
  float fStack_1e47c;
  float fStack_1e478;
  float fStack_1e474;
  float fStack_1e470;
  float fStack_1e46c;
  float fStack_1e468;
  float fStack_1e464;
  float fStack_1e460;
  float fStack_1e45c;
  float fStack_1e458;
  float fStack_1e454;
  float fStack_1e450;
  float fStack_1e44c;
  float fStack_1e448;
  float fStack_1e444;
  float fStack_1e440;
  float fStack_1e43c;
  float fStack_1e438;
  float fStack_1e434;
  float fStack_1e430;
  float fStack_1e42c;
  float fStack_1e428;
  float fStack_1e424;
  float fStack_1e420;
  float fStack_1e41c;
  float fStack_1e3dc;
  float fStack_1e3d8;
  float fStack_1e3d4;
  float fStack_1e3d0;
  float fStack_1e3cc;
  float fStack_1e3c8;
  float fStack_1e3c4;
  float fStack_1e3c0;
  float fStack_1e3bc;
  float fStack_1e3b8;
  float fStack_1e3b4;
  float fStack_1e3b0;
  float fStack_1e3ac;
  float fStack_1e3a8;
  float fStack_1e3a4;
  float fStack_1e3a0;
  float fStack_1e39c;
  float fStack_1e398;
  float fStack_1e394;
  float fStack_1e390;
  float fStack_1e38c;
  float fStack_1e388;
  float fStack_1e384;
  float fStack_1e380;
  float fStack_1e37c;
  float fStack_1e378;
  float fStack_1e374;
  float fStack_1e348;
  float fStack_1e344;
  float fStack_1e340;
  float fStack_1e33c;
  float fStack_1e338;
  float fStack_1e334;
  float fStack_1e330;
  float fStack_1e32c;
  float fStack_1e328;
  float fStack_1e324;
  float fStack_1e320;
  float fStack_1e31c;
  float fStack_1e318;
  float fStack_1e314;
  float fStack_1e310;
  float fStack_1e30c;
  float fStack_1e308;
  float fStack_1e304;
  float fStack_1e300;
  float fStack_1e2fc;
  float fStack_1e2f8;
  float fStack_1e2f4;
  float fStack_1e2f0;
  float fStack_1e2ec;
  float fStack_1e2e8;
  float fStack_1e2e4;
  float fStack_1e2e0;
  float fStack_1e2dc;
  float fStack_1e2d8;
  float fStack_1e2d4;
  float fStack_1e2d0;
  float fStack_1e2cc;
  float fStack_1e2c8;
  float fStack_1e2c4;
  float fStack_1e2c0;
  float fStack_1e2bc;
  float fStack_1e2b8;
  float fStack_1e2b4;
  float fStack_1e2b0;
  float fStack_1e2ac;
  float fStack_1e2a8;
  float fStack_1e268;
  float fStack_1e264;
  float fStack_1e260;
  float fStack_1e25c;
  float fStack_1e258;
  float fStack_1e254;
  float fStack_1e250;
  float fStack_1e24c;
  float fStack_1e1d4;
  float fStack_1e1d0;
  float fStack_1e1cc;
  float fStack_1e1c8;
  float fStack_1e1c4;
  float fStack_1e1c0;
  float fStack_1e1bc;
  float fStack_1e1b8;
  float fStack_1e1b4;
  float fStack_1e1b0;
  float fStack_1e1ac;
  float fStack_1e1a8;
  float fStack_1e1a4;
  float fStack_1e1a0;
  float fStack_1e19c;
  float fStack_1e198;
  float fStack_1e194;
  float fStack_1e190;
  float fStack_1e18c;
  float fStack_1e188;
  float fStack_1e184;
  float fStack_1e180;
  float fStack_1e17c;
  float fStack_1e178;
  float fStack_1e174;
  float fStack_1e170;
  float fStack_1e0f4;
  float fStack_1e0d4;
  float fStack_1e0d0;
  float fStack_1e0cc;
  float fStack_1e0c8;
  float fStack_1e0c4;
  float fStack_1e0c0;
  float fStack_1e0bc;
  float fStack_1e088;
  float fStack_1e084;
  float fStack_1e080;
  float fStack_1e07c;
  float fStack_1e078;
  float fStack_1e074;
  float fStack_1e070;
  float fStack_1e06c;
  float fStack_1e068;
  float fStack_1e064;
  float fStack_1e060;
  float fStack_1e05c;
  float fStack_1e058;
  float fStack_1e054;
  float fStack_1e050;
  float fStack_1e04c;
  float fStack_1e048;
  float fStack_1e044;
  float fStack_1e040;
  float fStack_1e03c;
  float fStack_1e038;
  float fStack_1e034;
  float fStack_1dff8;
  float fStack_1dff4;
  float fStack_1dff0;
  float fStack_1dfec;
  float fStack_1dfe8;
  float fStack_1dfe4;
  float fStack_1dfe0;
  float fStack_1dfdc;
  float fStack_1dfd8;
  float fStack_1dfd4;
  float fStack_1dfd0;
  float fStack_1dfcc;
  float fStack_1dfc8;
  float fStack_1dfc4;
  float fStack_1dfc0;
  float fStack_1df80;
  float fStack_1df7c;
  float fStack_1df60;
  float fStack_1df5c;
  float fStack_1df58;
  float fStack_1df54;
  float fStack_1df50;
  float fStack_1df4c;
  float fStack_1df48;
  float fStack_1df44;
  float fStack_1df40;
  float fStack_1df3c;
  float fStack_1df38;
  float fStack_1df34;
  float fStack_1df30;
  float fStack_1df2c;
  float fStack_1df28;
  float fStack_1df24;
  float fStack_1df20;
  float fStack_1df1c;
  float fStack_1df18;
  float fStack_1deec;
  float fStack_1dee8;
  float fStack_1dee4;
  float fStack_1dee0;
  float fStack_1dedc;
  float fStack_1ded8;
  float fStack_1ded4;
  float fStack_1ded0;
  float fStack_1decc;
  float fStack_1dec8;
  float fStack_1dec4;
  float fStack_1dec0;
  float fStack_1debc;
  float fStack_1deb8;
  float fStack_1deb4;
  float fStack_1deb0;
  float fStack_1deac;
  float fStack_1dea8;
  float fStack_1dea4;
  float fStack_1dea0;
  float fStack_1de9c;
  float fStack_1de98;
  float fStack_1de94;
  float fStack_1de90;
  float fStack_1de8c;
  float fStack_1de88;
  float fStack_1de84;
  float fStack_1de80;
  float fStack_1de7c;
  float fStack_1de78;
  float fStack_1de74;
  float fStack_1de70;
  float fStack_1de6c;
  float fStack_1de68;
  float fStack_1de64;
  float fStack_1de60;
  float fStack_1de5c;
  float fStack_1de58;
  float fStack_1de54;
  float fStack_1de50;
  float fStack_1de4c;
  float fStack_1de0c;
  float fStack_1de08;
  float fStack_1de04;
  float fStack_1de00;
  float fStack_1ddfc;
  float fStack_1ddf8;
  float fStack_1ddf4;
  float fStack_1ddf0;
  float fStack_1dd78;
  float fStack_1dd74;
  float fStack_1dd70;
  float fStack_1dd6c;
  float fStack_1dd68;
  float fStack_1dd64;
  float fStack_1dd60;
  float fStack_1dd5c;
  float fStack_1dd58;
  float fStack_1dd54;
  float fStack_1dd50;
  float fStack_1dd4c;
  float fStack_1dd48;
  float fStack_1dd44;
  float fStack_1dd40;
  float fStack_1dd3c;
  float fStack_1dd38;
  float fStack_1dd34;
  float fStack_1dd30;
  float fStack_1dd2c;
  float fStack_1dd28;
  float fStack_1dd24;
  float fStack_1dd20;
  float fStack_1dd1c;
  float fStack_1dd18;
  float fStack_1dd14;
  float fStack_1dc98;
  float fStack_1dc78;
  float fStack_1dc74;
  float fStack_1dc70;
  float fStack_1dc6c;
  float fStack_1dc68;
  float fStack_1dc64;
  float fStack_1dc60;
  float fStack_1dc04;
  float fStack_1dc00;
  float fStack_1dbfc;
  float fStack_1dbf8;
  float fStack_1dbf4;
  float fStack_1dbf0;
  float fStack_1dbec;
  float fStack_1dbe8;
  float fStack_1dbe4;
  float fStack_1dbe0;
  float fStack_1dbdc;
  float fStack_1dbd8;
  float fStack_1db9c;
  float fStack_1db98;
  float fStack_1db94;
  float fStack_1db90;
  float fStack_1db8c;
  float fStack_1db88;
  float fStack_1db84;
  float fStack_1db80;
  float fStack_1db7c;
  float fStack_1db78;
  float fStack_1db74;
  float fStack_1db70;
  float fStack_1db6c;
  float fStack_1db68;
  float fStack_1db64;
  float fStack_1db24;
  float fStack_1db20;
  float fStack_1da90;
  float fStack_1da8c;
  float fStack_1da88;
  float fStack_1da84;
  float fStack_1da80;
  float fStack_1da7c;
  float fStack_1da78;
  float fStack_1da74;
  float fStack_1da70;
  float fStack_1da6c;
  float fStack_1da68;
  float fStack_1da64;
  float fStack_1da60;
  float fStack_1da5c;
  float fStack_1da58;
  float fStack_1da54;
  float fStack_1da50;
  float fStack_1da4c;
  float fStack_1da48;
  float fStack_1da44;
  float fStack_1da40;
  float fStack_1da3c;
  float fStack_1da38;
  float fStack_1da34;
  float fStack_1da30;
  float fStack_1da2c;
  float fStack_1d944;
  float fStack_1d940;
  float fStack_1d93c;
  float fStack_1d938;
  float fStack_1d934;
  float fStack_1d930;
  float fStack_1d92c;
  float fStack_1d928;
  float fStack_1d924;
  float fStack_1d920;
  float fStack_1d8b4;
  float fStack_1d8b0;
  float fStack_1d8ac;
  float fStack_1d8a8;
  float fStack_1d8a4;
  float fStack_1d8a0;
  float fStack_1d89c;
  float fStack_1d898;
  float fStack_1d894;
  float fStack_1d890;
  float fStack_1d88c;
  float fStack_1d888;
  float fStack_1d884;
  float fStack_1d880;
  float fStack_1d87c;
  float fStack_1d878;
  float fStack_1d800;
  float fStack_1d7fc;
  float fStack_1d7f8;
  float fStack_1d7f4;
  float fStack_1d7f0;
  float fStack_1d7ec;
  float fStack_1d7e8;
  float fStack_1d7e4;
  float fStack_1d7e0;
  float fStack_1d7dc;
  float fStack_1d7d8;
  float fStack_1d7d4;
  float fStack_1d7d0;
  float fStack_1d7cc;
  float fStack_1d7c8;
  float fStack_1d7c4;
  float fStack_1d7c0;
  float fStack_1d7bc;
  float fStack_1d7b8;
  float fStack_1d7b4;
  float fStack_1d7b0;
  float fStack_1d7ac;
  float fStack_1d778;
  float fStack_1d774;
  float fStack_1d770;
  float fStack_1d76c;
  float fStack_1d768;
  float fStack_1d764;
  float fStack_1d760;
  float fStack_1d75c;
  float fStack_1d758;
  float fStack_1d754;
  float fStack_1d750;
  float fStack_1d74c;
  float fStack_1d748;
  float fStack_1d744;
  float fStack_1d740;
  float fStack_1d73c;
  float fStack_1d738;
  float fStack_1d734;
  float fStack_1d730;
  float fStack_1d72c;
  float fStack_1d728;
  float fStack_1d724;
  float fStack_1d720;
  float fStack_1d71c;
  float fStack_1d718;
  float fStack_1d714;
  float fStack_1d710;
  float fStack_1d70c;
  float fStack_1d708;
  float fStack_1d700;
  float fStack_1d6c0;
  float fStack_1d6bc;
  float fStack_1d6b8;
  float fStack_1d6b4;
  float fStack_1d6b0;
  float fStack_1d6ac;
  float fStack_1d68c;
  float fStack_1d688;
  float fStack_1d684;
  float fStack_1d680;
  float fStack_1d67c;
  float fStack_1d678;
  float fStack_1d674;
  float fStack_1d670;
  float fStack_1d66c;
  float fStack_1d668;
  float fStack_1d664;
  float fStack_1d660;
  float fStack_1d65c;
  float fStack_1d658;
  float fStack_1d654;
  float fStack_1d650;
  float fStack_1d64c;
  float fStack_1d648;
  float fStack_1d644;
  float fStack_1d640;
  float fStack_1d63c;
  float fStack_1d638;
  float fStack_1d604;
  float fStack_1d600;
  float fStack_1d5fc;
  float fStack_1d5f8;
  float fStack_1d5f4;
  float fStack_1d5f0;
  float fStack_1d5ec;
  float fStack_1d5e8;
  float fStack_1d5e4;
  float fStack_1d5e0;
  float fStack_1d5dc;
  float fStack_1d5d8;
  float fStack_1d5d4;
  float fStack_1d5d0;
  float fStack_1d5cc;
  float fStack_1d5c8;
  float fStack_1d5c4;
  float fStack_1d5c0;
  float fStack_1d5bc;
  float fStack_1d5b8;
  float fStack_1d5b4;
  float fStack_1d5b0;
  float fStack_1d5ac;
  float fStack_1d5a8;
  float fStack_1d5a4;
  float fStack_1d5a0;
  float fStack_1d59c;
  float fStack_1d598;
  float fStack_1d594;
  float fStack_1d588;
  float fStack_1d54c;
  float fStack_1d548;
  float fStack_1d544;
  float fStack_1d540;
  float fStack_1d53c;
  float fStack_1d538;
  float fStack_1d518;
  float fStack_1d514;
  float fStack_1d510;
  float fStack_1d50c;
  float fStack_1d508;
  float fStack_1d504;
  float fStack_1d500;
  float fStack_1d4fc;
  float fStack_1d4f8;
  float fStack_1d4f4;
  float fStack_1d4f0;
  float fStack_1d4ec;
  float fStack_1d4e8;
  float fStack_1d4e4;
  float fStack_1d4e0;
  float fStack_1d4dc;
  float fStack_1d4d8;
  float fStack_1d4d4;
  float fStack_1d4d0;
  float fStack_1d4cc;
  float fStack_1d4c8;
  float fStack_1d4c4;
  float fStack_1d490;
  float fStack_1d48c;
  float fStack_1d488;
  float fStack_1d484;
  float fStack_1d480;
  float fStack_1d47c;
  float fStack_1d478;
  float fStack_1d474;
  float fStack_1d470;
  float fStack_1d46c;
  float fStack_1d468;
  float fStack_1d464;
  float fStack_1d460;
  float fStack_1d45c;
  float fStack_1d458;
  float fStack_1d454;
  float fStack_1d450;
  float fStack_1d44c;
  float fStack_1d448;
  float fStack_1d444;
  float fStack_1d440;
  float fStack_1d43c;
  float fStack_1d438;
  float fStack_1d434;
  float fStack_1d430;
  float fStack_1d42c;
  float fStack_1d428;
  float fStack_1d424;
  float fStack_1d420;
  float fStack_1d410;
  float fStack_1d3d8;
  float fStack_1d3d4;
  float fStack_1d3d0;
  float fStack_1d3cc;
  float fStack_1d3c8;
  float fStack_1d3c4;
  float fStack_1d3a4;
  float fStack_1d3a0;
  float fStack_1d39c;
  float fStack_1d398;
  float fStack_1d394;
  float fStack_1d390;
  float fStack_1d38c;
  float fStack_1d388;
  float fStack_1d384;
  float fStack_1d380;
  float fStack_1d37c;
  float fStack_1d378;
  float fStack_1d374;
  float fStack_1d370;
  float fStack_1d36c;
  float fStack_1d368;
  float fStack_1d364;
  float fStack_1d360;
  float fStack_1d35c;
  float fStack_1d358;
  float fStack_1d354;
  float fStack_1d350;
  float fStack_1d31c;
  float fStack_1d318;
  float fStack_1d314;
  float fStack_1d310;
  float fStack_1d30c;
  float fStack_1d308;
  float fStack_1d304;
  float fStack_1d300;
  float fStack_1d2fc;
  float fStack_1d2f8;
  float fStack_1d2f4;
  float fStack_1d2f0;
  float fStack_1d2ec;
  float fStack_1d2e8;
  float fStack_1d2e4;
  float fStack_1d2e0;
  float fStack_1d2dc;
  float fStack_1d2d8;
  float fStack_1d2d4;
  float fStack_1d2d0;
  float fStack_1d2cc;
  float fStack_1d2c8;
  float fStack_1d2c4;
  float fStack_1d2c0;
  float fStack_1d2bc;
  float fStack_1d2b8;
  float fStack_1d2b4;
  float fStack_1d2b0;
  float fStack_1d2ac;
  float fStack_1d298;
  float fStack_1d264;
  float fStack_1d260;
  float fStack_1d25c;
  float fStack_1d258;
  float fStack_1d254;
  float fStack_1d250;
  float fStack_1d230;
  float fStack_1d22c;
  float fStack_1d228;
  float fStack_1d224;
  float fStack_1d220;
  float fStack_1d21c;
  float fStack_1d218;
  float fStack_1d214;
  float fStack_1d210;
  float fStack_1d20c;
  float fStack_1d208;
  float fStack_1d204;
  float fStack_1d1a8;
  float fStack_1d1a4;
  float fStack_1d1a0;
  float fStack_1d19c;
  float fStack_1d198;
  float fStack_1d194;
  float fStack_1d190;
  float fStack_1d18c;
  float fStack_1d188;
  float fStack_1d184;
  float fStack_1d180;
  float fStack_1d17c;
  float fStack_1d178;
  float fStack_1d174;
  float fStack_1d170;
  float fStack_1d16c;
  float fStack_1d168;
  float fStack_1d164;
  float fStack_1d160;
  float fStack_1d15c;
  float fStack_1d158;
  float fStack_1d154;
  float fStack_1d150;
  float fStack_1d14c;
  float fStack_1d148;
  float fStack_1d144;
  float fStack_1d140;
  float fStack_1d13c;
  float fStack_1d138;
  float fStack_1d120;
  float fStack_1d0f0;
  float fStack_1d0ec;
  float fStack_1d0e8;
  float fStack_1d0e4;
  float fStack_1d0e0;
  float fStack_1d0dc;
  float fStack_1d034;
  float fStack_1d030;
  float fStack_1d02c;
  float fStack_1d028;
  float fStack_1d024;
  float fStack_1d020;
  float fStack_1d01c;
  float fStack_1d018;
  float fStack_1d014;
  float fStack_1d010;
  float fStack_1d00c;
  float fStack_1d008;
  float fStack_1d004;
  float fStack_1d000;
  float fStack_1cfa8;
  float fStack_1cf64;
  float fStack_1cf60;
  float fStack_1cf5c;
  float fStack_1cf58;
  float fStack_1cf54;
  float fStack_1cf50;
  float fStack_1cf4c;
  float fStack_1cf18;
  float fStack_1cf14;
  float fStack_1cf10;
  float fStack_1cf0c;
  float fStack_1cf08;
  float fStack_1cf04;
  float fStack_1cf00;
  float fStack_1cefc;
  float fStack_1cef8;
  float fStack_1cef4;
  float fStack_1cef0;
  float fStack_1ceec;
  float fStack_1cee8;
  float fStack_1cee4;
  float fStack_1cee0;
  float fStack_1cedc;
  float fStack_1ced8;
  float fStack_1ced4;
  float fStack_1ced0;
  float fStack_1cecc;
  float fStack_1cec8;
  float fStack_1cec4;
  float fStack_1ce88;
  float fStack_1ce84;
  float fStack_1ce80;
  float fStack_1ce7c;
  float fStack_1ce78;
  float fStack_1ce74;
  float fStack_1ce70;
  float fStack_1ce6c;
  float fStack_1ce68;
  float fStack_1ce64;
  float fStack_1ce60;
  float fStack_1ce5c;
  float fStack_1ce58;
  float fStack_1ce54;
  float fStack_1ce50;
  float fStack_1ce30;
  float fStack_1ce0c;
  float fStack_1cdf0;
  float fStack_1cdec;
  float fStack_1cde8;
  float fStack_1cde4;
  float fStack_1cde0;
  float fStack_1cddc;
  float fStack_1cdd8;
  float fStack_1cdd4;
  float fStack_1cdd0;
  float fStack_1cdcc;
  float fStack_1cdc8;
  float fStack_1cdc4;
  float fStack_1cdc0;
  float fStack_1cdbc;
  float fStack_1cdb8;
  float fStack_1cdb4;
  float fStack_1cdb0;
  float fStack_1cdac;
  float fStack_1cda8;
  float fStack_1cda4;
  float fStack_1cda0;
  float fStack_1cd9c;
  float fStack_1cd98;
  float fStack_1cd94;
  float fStack_1cd90;
  float fStack_1cd8c;
  float fStack_1cd88;
  float fStack_1cd84;
  float fStack_1cd80;
  float fStack_1cd7c;
  float fStack_1cd78;
  float fStack_1cd74;
  float fStack_1cd70;
  float fStack_1cd6c;
  float fStack_1cd68;
  float fStack_1cd64;
  float fStack_1cd60;
  float fStack_1cd5c;
  float fStack_1cd58;
  float fStack_1cd54;
  float fStack_1cd50;
  float fStack_1cd4c;
  float fStack_1cd48;
  float fStack_1cd44;
  float fStack_1cd40;
  float fStack_1cd3c;
  float fStack_1cd38;
  float fStack_1cd34;
  float fStack_1cd30;
  float fStack_1cd2c;
  float fStack_1cd28;
  float fStack_1cd24;
  float fStack_1cd20;
  float fStack_1cd1c;
  float fStack_1cd18;
  float fStack_1cd14;
  float fStack_1cd10;
  float fStack_1cd0c;
  float fStack_1cd08;
  float fStack_1cd04;
  float fStack_1cd00;
  float fStack_1ccfc;
  float fStack_1ccf8;
  float fStack_1ccf4;
  float fStack_1ccf0;
  float fStack_1ccec;
  float fStack_1cce8;
  float fStack_1cce4;
  float fStack_1cce0;
  float fStack_1ccdc;
  float fStack_1ccb8;
  float fStack_1cc98;
  float fStack_1cc94;
  float fStack_1cc90;
  float fStack_1cc8c;
  float fStack_1cc88;
  float fStack_1cc84;
  float fStack_1cc80;
  float fStack_1cc7c;
  float fStack_1cc78;
  float fStack_1cc74;
  float fStack_1cc70;
  float fStack_1cc6c;
  float fStack_1cc68;
  float fStack_1cc64;
  float fStack_1cc60;
  float fStack_1cc5c;
  float fStack_1cc58;
  float fStack_1cc54;
  float fStack_1cc50;
  float fStack_1cc4c;
  float fStack_1cc48;
  float fStack_1cc44;
  float fStack_1cc40;
  float fStack_1cc3c;
  float fStack_1cc38;
  float fStack_1cc34;
  float fStack_1cc30;
  float fStack_1cc2c;
  float fStack_1cc28;
  float fStack_1cc24;
  float fStack_1cc20;
  float fStack_1cc1c;
  float fStack_1cc18;
  float fStack_1cc14;
  float fStack_1cc10;
  float fStack_1cc0c;
  float fStack_1cc08;
  float fStack_1cc04;
  float fStack_1cc00;
  float fStack_1cbfc;
  float fStack_1cbf8;
  float fStack_1cbf4;
  float fStack_1cbf0;
  float fStack_1cbec;
  float fStack_1cbe8;
  float fStack_1cbe4;
  float fStack_1cbe0;
  float fStack_1cbdc;
  float fStack_1cbd8;
  float fStack_1cbd4;
  float fStack_1cbd0;
  float fStack_1cbcc;
  float fStack_1cbc8;
  float fStack_1cbc4;
  float fStack_1cbc0;
  float fStack_1cbbc;
  float fStack_1cbb8;
  float fStack_1cbb4;
  float fStack_1cbb0;
  float fStack_1cbac;
  float fStack_1cba8;
  float fStack_1cba4;
  float fStack_1cba0;
  float fStack_1cb9c;
  float fStack_1cb98;
  float fStack_1cb94;
  float fStack_1cb90;
  float fStack_1cb8c;
  float fStack_1cb88;
  float fStack_1cb84;
  float fStack_1cb80;
  float fStack_1cb7c;
  float fStack_1cb78;
  float fStack_1cb74;
  float fStack_1cb70;
  float fStack_1cb6c;
  float fStack_1cb68;
  float fStack_1cb40;
  float fStack_1cb24;
  float fStack_1cb20;
  float fStack_1cb1c;
  float fStack_1cb18;
  float fStack_1cb14;
  float fStack_1cb10;
  float fStack_1cb0c;
  float fStack_1cb08;
  float fStack_1cb04;
  float fStack_1cb00;
  float fStack_1cafc;
  float fStack_1caf8;
  float fStack_1caf4;
  float fStack_1caf0;
  float fStack_1caec;
  float fStack_1cae8;
  float fStack_1cae4;
  float fStack_1cae0;
  float fStack_1cadc;
  float fStack_1cad8;
  float fStack_1cad4;
  float fStack_1cad0;
  float fStack_1cacc;
  float fStack_1cac8;
  float fStack_1cac4;
  float fStack_1cac0;
  float fStack_1cabc;
  float fStack_1cab8;
  float fStack_1cab4;
  float fStack_1cab0;
  float fStack_1caac;
  float fStack_1caa8;
  float fStack_1caa4;
  float fStack_1caa0;
  float fStack_1ca9c;
  float fStack_1ca98;
  float fStack_1ca94;
  float fStack_1ca90;
  float fStack_1ca8c;
  float fStack_1ca88;
  float fStack_1ca84;
  float fStack_1ca80;
  float fStack_1ca7c;
  float fStack_1ca78;
  float fStack_1ca74;
  float fStack_1ca70;
  float fStack_1ca6c;
  float fStack_1ca68;
  float fStack_1ca64;
  float fStack_1ca60;
  float fStack_1ca5c;
  float fStack_1ca58;
  float fStack_1ca54;
  float fStack_1ca50;
  float fStack_1ca4c;
  float fStack_1ca48;
  float fStack_1ca44;
  float fStack_1ca40;
  float fStack_1ca3c;
  float fStack_1ca38;
  float fStack_1ca34;
  float fStack_1ca30;
  float fStack_1ca2c;
  float fStack_1ca28;
  float fStack_1ca24;
  float fStack_1ca20;
  float fStack_1ca1c;
  float fStack_1ca18;
  float fStack_1ca14;
  float fStack_1ca10;
  float fStack_1ca0c;
  float fStack_1ca08;
  float fStack_1ca04;
  float fStack_1ca00;
  float fStack_1c9fc;
  float fStack_1c9f8;
  float fStack_1c9f4;
  float fStack_1c9c8;
  float fStack_1c9b0;
  float fStack_1c9ac;
  float fStack_1c9a8;
  float fStack_1c9a4;
  float fStack_1c9a0;
  float fStack_1c99c;
  float fStack_1c998;
  float fStack_1c994;
  float fStack_1c990;
  float fStack_1c98c;
  float fStack_1c988;
  float fStack_1c984;
  float fStack_1c980;
  float fStack_1c97c;
  float fStack_1c978;
  float fStack_1c974;
  float fStack_1c970;
  float fStack_1c96c;
  float fStack_1c968;
  float fStack_1c964;
  float fStack_1c960;
  float fStack_1c95c;
  float fStack_1c958;
  float fStack_1c954;
  float fStack_1c950;
  float fStack_1c94c;
  float fStack_1c920;
  float fStack_1c91c;
  float fStack_1c918;
  float fStack_1c914;
  float fStack_1c910;
  float fStack_1c90c;
  float fStack_1c908;
  float fStack_1c904;
  float fStack_1c900;
  float fStack_1c8fc;
  float fStack_1c8f8;
  float fStack_1c8f4;
  float fStack_1c8f0;
  float fStack_1c8ec;
  float fStack_1c8e8;
  float fStack_1c8e4;
  float fStack_1c8e0;
  float fStack_1c8dc;
  float fStack_1c8d8;
  float fStack_1c8d4;
  float fStack_1c8d0;
  float fStack_1c8cc;
  float fStack_1c8c8;
  float fStack_1c8c4;
  float fStack_1c8c0;
  float fStack_1c8bc;
  float fStack_1c8b8;
  float fStack_1c8b4;
  float fStack_1c8b0;
  float fStack_1c8ac;
  float fStack_1c8a8;
  float fStack_1c8a4;
  float fStack_1c8a0;
  float fStack_1c89c;
  float fStack_1c898;
  float fStack_1c894;
  float fStack_1c890;
  float fStack_1c88c;
  float fStack_1c888;
  float fStack_1c884;
  float fStack_1c880;
  float fStack_1c850;
  float fStack_1c83c;
  float fStack_1c838;
  float fStack_1c834;
  float fStack_1c830;
  float fStack_1c82c;
  float fStack_1c828;
  float fStack_1c824;
  float fStack_1c7ac;
  float fStack_1c7a8;
  float fStack_1c7a4;
  float fStack_1c7a0;
  float fStack_1c79c;
  float fStack_1c798;
  float fStack_1c794;
  float fStack_1c790;
  float fStack_1c78c;
  float fStack_1c788;
  float fStack_1c784;
  float fStack_1c780;
  float fStack_1c77c;
  float fStack_1c778;
  float fStack_1c774;
  float fStack_1c770;
  float fStack_1c76c;
  float fStack_1c768;
  float fStack_1c764;
  float fStack_1c760;
  float fStack_1c75c;
  float fStack_1c758;
  float fStack_1c754;
  float fStack_1c750;
  float fStack_1c74c;
  float fStack_1c748;
  float fStack_1c6d8;
  float fStack_1c6cc;
  float fStack_1c6ac;
  float fStack_1c6a8;
  float fStack_1c6a4;
  float fStack_1c6a0;
  float fStack_1c69c;
  float fStack_1c698;
  float fStack_1c694;
  float fStack_1c660;
  float fStack_1c65c;
  float fStack_1c658;
  float fStack_1c654;
  float fStack_1c650;
  float fStack_1c64c;
  float fStack_1c648;
  float fStack_1c644;
  float fStack_1c640;
  float fStack_1c63c;
  float fStack_1c638;
  float fStack_1c634;
  float fStack_1c630;
  float fStack_1c62c;
  float fStack_1c628;
  float fStack_1c624;
  float fStack_1c620;
  float fStack_1c61c;
  float fStack_1c618;
  float fStack_1c614;
  float fStack_1c610;
  float fStack_1c60c;
  float fStack_1c5d0;
  float fStack_1c5cc;
  float fStack_1c5c8;
  float fStack_1c5c4;
  float fStack_1c5c0;
  float fStack_1c5bc;
  float fStack_1c5b8;
  float fStack_1c5b4;
  float fStack_1c5b0;
  float fStack_1c5ac;
  float fStack_1c5a8;
  float fStack_1c5a4;
  float fStack_1c5a0;
  float fStack_1c59c;
  float fStack_1c598;
  float fStack_1c560;
  float fStack_1c558;
  float fStack_1c554;
  float fStack_1c538;
  float fStack_1c534;
  float fStack_1c530;
  float fStack_1c52c;
  float fStack_1c528;
  float fStack_1c524;
  float fStack_1c520;
  float fStack_1c51c;
  float fStack_1c518;
  float fStack_1c514;
  float fStack_1c510;
  float fStack_1c50c;
  float fStack_1c508;
  float fStack_1c504;
  float fStack_1c500;
  float fStack_1c4fc;
  float fStack_1c4f8;
  float fStack_1c4f4;
  float fStack_1c4f0;
  float fStack_1c4ec;
  float fStack_1c4e8;
  float fStack_1c4e4;
  float fStack_1c4e0;
  float fStack_1c4dc;
  float fStack_1c4d8;
  float fStack_1c4d4;
  float fStack_1c4d0;
  float fStack_1c4cc;
  float fStack_1c4c8;
  float fStack_1c4c4;
  float fStack_1c4c0;
  float fStack_1c4bc;
  float fStack_1c4b8;
  float fStack_1c4b4;
  float fStack_1c4b0;
  float fStack_1c4ac;
  float fStack_1c4a8;
  float fStack_1c4a4;
  float fStack_1c4a0;
  float fStack_1c49c;
  float fStack_1c498;
  float fStack_1c494;
  float fStack_1c490;
  float fStack_1c48c;
  float fStack_1c488;
  float fStack_1c484;
  float fStack_1c480;
  float fStack_1c47c;
  float fStack_1c478;
  float fStack_1c474;
  float fStack_1c470;
  float fStack_1c46c;
  float fStack_1c468;
  float fStack_1c464;
  float fStack_1c460;
  float fStack_1c45c;
  float fStack_1c458;
  float fStack_1c454;
  float fStack_1c450;
  float fStack_1c44c;
  float fStack_1c448;
  float fStack_1c444;
  float fStack_1c440;
  float fStack_1c43c;
  float fStack_1c438;
  float fStack_1c434;
  float fStack_1c430;
  float fStack_1c42c;
  float fStack_1c428;
  float fStack_1c424;
  float fStack_1c3e8;
  float fStack_1c3e4;
  float fStack_1c3e0;
  float fStack_1c3dc;
  float fStack_1c3d8;
  float fStack_1c3d4;
  float fStack_1c3d0;
  float fStack_1c3cc;
  float fStack_1c3c8;
  float fStack_1c3c4;
  float fStack_1c3c0;
  float fStack_1c3bc;
  float fStack_1c3b8;
  float fStack_1c3b4;
  float fStack_1c3b0;
  float fStack_1c3ac;
  float fStack_1c3a8;
  float fStack_1c3a4;
  float fStack_1c3a0;
  float fStack_1c39c;
  float fStack_1c398;
  float fStack_1c394;
  float fStack_1c390;
  float fStack_1c38c;
  float fStack_1c388;
  float fStack_1c384;
  float fStack_1c380;
  float fStack_1c37c;
  float fStack_1c378;
  float fStack_1c374;
  float fStack_1c370;
  float fStack_1c36c;
  float fStack_1c368;
  float fStack_1c364;
  float fStack_1c360;
  float fStack_1c35c;
  float fStack_1c358;
  float fStack_1c354;
  float fStack_1c350;
  float fStack_1c34c;
  float fStack_1c348;
  float fStack_1c344;
  float fStack_1c340;
  float fStack_1c33c;
  float fStack_1c338;
  float fStack_1c334;
  float fStack_1c330;
  float fStack_1c32c;
  float fStack_1c328;
  float fStack_1c324;
  float fStack_1c320;
  float fStack_1c31c;
  float fStack_1c318;
  float fStack_1c314;
  float fStack_1c310;
  float fStack_1c30c;
  float fStack_1c308;
  float fStack_1c304;
  float fStack_1c300;
  float fStack_1c2fc;
  float fStack_1c2f8;
  float fStack_1c2f4;
  float fStack_1c2f0;
  float fStack_1c2ec;
  float fStack_1c2e8;
  float fStack_1c2e4;
  float fStack_1c2e0;
  float fStack_1c2dc;
  float fStack_1c2d8;
  float fStack_1c2d4;
  float fStack_1c2d0;
  float fStack_1c2cc;
  float fStack_1c2c8;
  float fStack_1c2c4;
  float fStack_1c2c0;
  float fStack_1c2bc;
  float fStack_1c2b8;
  float fStack_1c2b4;
  float fStack_1c2b0;
  float fStack_1c2ac;
  float fStack_1c2a8;
  float fStack_1c2a4;
  float fStack_1c2a0;
  float fStack_1c29c;
  float fStack_1c298;
  float fStack_1c294;
  float fStack_1c290;
  float fStack_1c28c;
  float fStack_1c288;
  float fStack_1c284;
  float fStack_1c280;
  float fStack_1c27c;
  float fStack_1c278;
  float fStack_1c274;
  float fStack_1c270;
  float fStack_1c26c;
  float fStack_1c268;
  float fStack_1c264;
  float fStack_1c260;
  float fStack_1c25c;
  float fStack_1c258;
  float fStack_1c254;
  float fStack_1c250;
  float fStack_1c24c;
  float fStack_1c248;
  float fStack_1c244;
  float fStack_1c240;
  float fStack_1c23c;
  float fStack_1c238;
  float fStack_1c234;
  float fStack_1c230;
  float fStack_1c22c;
  float fStack_1c228;
  float fStack_1c224;
  float fStack_1c220;
  float fStack_1c21c;
  float fStack_1c218;
  float fStack_1c214;
  float fStack_1c210;
  float fStack_1c20c;
  float fStack_1c208;
  float fStack_1c1dc;
  float fStack_1c1d8;
  float fStack_1c1d4;
  float fStack_1c1d0;
  float fStack_1c1cc;
  float fStack_1c1c8;
  float fStack_1c1c4;
  float fStack_1c1c0;
  float fStack_1c1bc;
  float fStack_1c1b8;
  float fStack_1c1b4;
  float fStack_1c1b0;
  float fStack_1c1ac;
  float fStack_1c1a8;
  float fStack_1c1a4;
  float fStack_1c1a0;
  float fStack_1c19c;
  float fStack_1c198;
  float fStack_1c194;
  float fStack_1c190;
  float fStack_1c18c;
  float fStack_1c188;
  float fStack_1c184;
  float fStack_1c180;
  float fStack_1c17c;
  float fStack_1c178;
  float fStack_1c174;
  float fStack_1c170;
  float fStack_1c16c;
  float fStack_1c168;
  float fStack_1c164;
  float fStack_1c160;
  float fStack_1c15c;
  float fStack_1c158;
  float fStack_1c154;
  float fStack_1c150;
  float fStack_1c14c;
  float fStack_1c148;
  float fStack_1c144;
  float fStack_1c140;
  float fStack_1c13c;
  float fStack_1c138;
  float fStack_1c134;
  float fStack_1c130;
  float fStack_1c12c;
  float fStack_1c128;
  float fStack_1c124;
  float fStack_1c120;
  float fStack_1c11c;
  float fStack_1c118;
  float fStack_1c114;
  float fStack_1c110;
  float fStack_1c10c;
  float fStack_1c108;
  float fStack_1c104;
  float fStack_1c100;
  float fStack_1c0fc;
  float fStack_1c0f8;
  float fStack_1c0f4;
  float fStack_1c0f0;
  float fStack_1c0ec;
  float fStack_1c0e8;
  float fStack_1c0e4;
  float fStack_1c0e0;
  float fStack_1c068;
  float fStack_1c064;
  float fStack_1c060;
  float fStack_1c05c;
  float fStack_1c058;
  float fStack_1c054;
  float fStack_1c050;
  float fStack_1c04c;
  float fStack_1c048;
  float fStack_1c044;
  float fStack_1c040;
  float fStack_1c03c;
  float fStack_1c038;
  float fStack_1c034;
  float fStack_1c030;
  float fStack_1c02c;
  float fStack_1c028;
  float fStack_1c024;
  float fStack_1c020;
  float fStack_1c01c;
  float fStack_1c018;
  float fStack_1c014;
  float fStack_1c010;
  float fStack_1c00c;
  float fStack_1c008;
  float fStack_1c004;
  float fStack_1bfc4;
  float fStack_1bfc0;
  float fStack_1bfbc;
  float fStack_1bfb8;
  float fStack_1bfb4;
  float fStack_1bfb0;
  float fStack_1bfac;
  float fStack_1bfa8;
  float fStack_1bfa4;
  float fStack_1bfa0;
  float fStack_1bf9c;
  float fStack_1bf98;
  float fStack_1bf94;
  float fStack_1bf90;
  float fStack_1bf8c;
  float fStack_1bf88;
  float fStack_1bf68;
  float fStack_1bf64;
  float fStack_1bf60;
  float fStack_1bf5c;
  float fStack_1bf58;
  float fStack_1bf54;
  float fStack_1bf50;
  float fStack_1bf1c;
  float fStack_1bf18;
  float fStack_1bf14;
  float fStack_1bf10;
  float fStack_1bf0c;
  float fStack_1bf08;
  float fStack_1bf04;
  float fStack_1bf00;
  float fStack_1befc;
  float fStack_1bef8;
  float fStack_1bef4;
  float fStack_1bef0;
  float fStack_1beec;
  float fStack_1bee8;
  float fStack_1bee4;
  float fStack_1bee0;
  float fStack_1bedc;
  float fStack_1bed8;
  float fStack_1bed4;
  float fStack_1bed0;
  float fStack_1becc;
  float fStack_1bec8;
  float fStack_1be8c;
  float fStack_1be88;
  float fStack_1be84;
  float fStack_1be80;
  float fStack_1be7c;
  float fStack_1be78;
  float fStack_1be74;
  float fStack_1be70;
  float fStack_1be6c;
  float fStack_1be68;
  float fStack_1be64;
  float fStack_1be60;
  float fStack_1be5c;
  float fStack_1be58;
  float fStack_1be54;
  float fStack_1be50;
  float fStack_1be4c;
  float fStack_1be48;
  float fStack_1be44;
  float fStack_1be40;
  float fStack_1be3c;
  float fStack_1be38;
  float fStack_1be34;
  float fStack_1be30;
  float fStack_1be2c;
  float fStack_1be28;
  float fStack_1be24;
  float fStack_1be20;
  float fStack_1be1c;
  float fStack_1be18;
  float fStack_1be14;
  float fStack_1be10;
  float fStack_1bdf4;
  float fStack_1bdf0;
  float fStack_1bdec;
  float fStack_1bde8;
  float fStack_1bde4;
  float fStack_1bde0;
  float fStack_1bddc;
  float fStack_1bdd8;
  float fStack_1bdd4;
  float fStack_1bdd0;
  float fStack_1bdcc;
  float fStack_1bdc8;
  float fStack_1bdc4;
  float fStack_1bdc0;
  float fStack_1bdbc;
  float fStack_1bdb8;
  float fStack_1bdb4;
  float fStack_1bdb0;
  float fStack_1bdac;
  float fStack_1bda8;
  float fStack_1bda4;
  float fStack_1bda0;
  float fStack_1bd9c;
  float fStack_1bd98;
  float fStack_1bd94;
  float fStack_1bd90;
  float fStack_1bd8c;
  float fStack_1bd88;
  float fStack_1bd84;
  float fStack_1bd80;
  float fStack_1bd7c;
  float fStack_1bd78;
  float fStack_1bd74;
  float fStack_1bd70;
  float fStack_1bd6c;
  float fStack_1bd68;
  float fStack_1bd64;
  float fStack_1bd60;
  float fStack_1bd5c;
  float fStack_1bd58;
  float fStack_1bd54;
  float fStack_1bd50;
  float fStack_1bd4c;
  float fStack_1bd48;
  float fStack_1bd44;
  float fStack_1bd40;
  float fStack_1bd3c;
  float fStack_1bd38;
  float fStack_1bd34;
  float fStack_1bd30;
  float fStack_1bd2c;
  float fStack_1bd28;
  float fStack_1bd24;
  float fStack_1bd20;
  float fStack_1bd1c;
  float fStack_1bd18;
  float fStack_1bd14;
  float fStack_1bd10;
  float fStack_1bd0c;
  float fStack_1bd08;
  float fStack_1bd04;
  float fStack_1bd00;
  float fStack_1bcfc;
  float fStack_1bcf8;
  float fStack_1bcf4;
  float fStack_1bcf0;
  float fStack_1bcec;
  float fStack_1bce8;
  float fStack_1bce4;
  float fStack_1bce0;
  float fStack_1bcdc;
  float fStack_1bcd8;
  float fStack_1bcd4;
  float fStack_1bcd0;
  float fStack_1bccc;
  float fStack_1bcc8;
  float fStack_1bcc4;
  float fStack_1bcc0;
  float fStack_1bcbc;
  float fStack_1bcb8;
  float fStack_1bcb4;
  float fStack_1bcb0;
  float fStack_1bcac;
  float fStack_1bca8;
  float fStack_1bca4;
  float fStack_1bca0;
  float fStack_1bc9c;
  float fStack_1bc98;
  float fStack_1bc94;
  float fStack_1bc90;
  float fStack_1bc8c;
  float fStack_1bc88;
  float fStack_1bc84;
  float fStack_1bc80;
  float fStack_1bc7c;
  float fStack_1bc78;
  float fStack_1bc74;
  float fStack_1bc70;
  float fStack_1bc6c;
  float fStack_1bc68;
  float fStack_1bc64;
  float fStack_1bc60;
  float fStack_1bc5c;
  float fStack_1bc58;
  float fStack_1bc54;
  float fStack_1bc50;
  float fStack_1bc4c;
  float fStack_1bc48;
  float fStack_1bc44;
  float fStack_1bc40;
  float fStack_1bc3c;
  float fStack_1bc38;
  float fStack_1bc0c;
  float fStack_1bc08;
  float fStack_1bc04;
  float fStack_1bc00;
  float fStack_1bbfc;
  float fStack_1bbf8;
  float fStack_1bbf4;
  float fStack_1bbf0;
  float fStack_1bbec;
  float fStack_1bbe8;
  float fStack_1bbe4;
  float fStack_1bbe0;
  float fStack_1bbdc;
  float fStack_1bbd8;
  float fStack_1bbd4;
  float fStack_1bbd0;
  float fStack_1bbcc;
  float fStack_1bbc8;
  float fStack_1bbc4;
  float fStack_1bbc0;
  float fStack_1bbbc;
  float fStack_1bbb8;
  float fStack_1bbb4;
  float fStack_1bbb0;
  float fStack_1bbac;
  float fStack_1bba8;
  float fStack_1bba4;
  float fStack_1bba0;
  float fStack_1bb9c;
  float fStack_1bb98;
  float fStack_1bb94;
  float fStack_1bb90;
  float fStack_1bb8c;
  float fStack_1bb88;
  float fStack_1bb84;
  float fStack_1bb80;
  float fStack_1bb7c;
  float fStack_1bb78;
  float fStack_1bb74;
  float fStack_1bb70;
  float fStack_1bb6c;
  float fStack_1bb68;
  float fStack_1bb64;
  float fStack_1bb60;
  float fStack_1bb5c;
  float fStack_1bb58;
  float fStack_1bb54;
  float fStack_1bb50;
  float fStack_1bb4c;
  float fStack_1bb48;
  float fStack_1bb44;
  float fStack_1bb40;
  float fStack_1bb3c;
  float fStack_1bb38;
  float fStack_1bb34;
  float fStack_1bb30;
  float afStack_1bb2c [37];
  float fStack_1ba98;
  float fStack_1ba94;
  float fStack_1ba90;
  float fStack_1ba8c;
  float fStack_1ba88;
  float fStack_1ba84;
  float fStack_1ba80;
  float fStack_1ba7c;
  float fStack_1ba78;
  float fStack_1ba74;
  float fStack_1ba70;
  float fStack_1ba6c;
  float fStack_1b9b8;
  float fStack_1b9b4;
  float fStack_1b9b0;
  float fStack_1b9ac;
  float fStack_1b9a8;
  float fStack_1b9a4;
  float fStack_1b9a0;
  float fStack_1b99c;
  float fStack_1b924;
  float fStack_1b920;
  float fStack_1b91c;
  float fStack_1b918;
  float fStack_1b914;
  float fStack_1b910;
  float fStack_1b90c;
  float fStack_1b908;
  float fStack_1b904;
  float fStack_1b900;
  float fStack_1b8fc;
  float fStack_1b8f8;
  float fStack_1b8f4;
  float fStack_1b8f0;
  float fStack_1b8ec;
  float fStack_1b8e8;
  float fStack_1b8e4;
  float fStack_1b8e0;
  float fStack_1b8dc;
  float fStack_1b8d8;
  float fStack_1b8d4;
  float fStack_1b8d0;
  float fStack_1b8cc;
  float fStack_1b8c8;
  float fStack_1b8c4;
  float fStack_1b8c0;
  float fStack_1b880;
  float fStack_1b87c;
  float fStack_1b878;
  float fStack_1b874;
  float fStack_1b870;
  float fStack_1b86c;
  float fStack_1b868;
  float fStack_1b864;
  float fStack_1b860;
  float fStack_1b85c;
  float fStack_1b858;
  float fStack_1b854;
  float fStack_1b850;
  float fStack_1b84c;
  float fStack_1b848;
  float fStack_1b844;
  float fStack_1b824;
  float fStack_1b820;
  float fStack_1b81c;
  float fStack_1b818;
  float fStack_1b814;
  float fStack_1b810;
  float fStack_1b80c;
  float fStack_1b7d8;
  float fStack_1b7d4;
  float fStack_1b7d0;
  float fStack_1b7cc;
  float fStack_1b7c8;
  float fStack_1b7c4;
  float fStack_1b7c0;
  float fStack_1b7bc;
  float fStack_1b7b8;
  float fStack_1b7b4;
  float fStack_1b7b0;
  float fStack_1b7ac;
  float fStack_1b7a8;
  float fStack_1b7a4;
  float fStack_1b7a0;
  float fStack_1b79c;
  float fStack_1b798;
  float fStack_1b794;
  float fStack_1b790;
  float fStack_1b78c;
  float fStack_1b788;
  float fStack_1b784;
  float fStack_1b748;
  float fStack_1b744;
  float fStack_1b740;
  float fStack_1b73c;
  float fStack_1b738;
  float fStack_1b734;
  float fStack_1b730;
  float fStack_1b72c;
  float fStack_1b728;
  float fStack_1b724;
  float fStack_1b720;
  float fStack_1b71c;
  float fStack_1b718;
  float fStack_1b714;
  float fStack_1b710;
  float fStack_1b70c;
  float fStack_1b708;
  float fStack_1b704;
  float fStack_1b700;
  float fStack_1b6fc;
  float fStack_1b6f8;
  float fStack_1b6f4;
  float fStack_1b6f0;
  float fStack_1b6ec;
  float fStack_1b6e8;
  float fStack_1b6e4;
  float fStack_1b6e0;
  float fStack_1b6dc;
  float fStack_1b6d8;
  float fStack_1b6d4;
  float fStack_1b6d0;
  float fStack_1b6cc;
  float fStack_1b6b0;
  float fStack_1b6ac;
  float fStack_1b6a8;
  float fStack_1b6a4;
  float fStack_1b6a0;
  float fStack_1b69c;
  float fStack_1b698;
  float fStack_1b694;
  float fStack_1b690;
  float fStack_1b68c;
  float fStack_1b688;
  float fStack_1b684;
  float fStack_1b680;
  float fStack_1b67c;
  float fStack_1b678;
  float fStack_1b674;
  float fStack_1b670;
  float fStack_1b66c;
  float fStack_1b668;
  float fStack_1b63c;
  float fStack_1b638;
  float fStack_1b634;
  float fStack_1b630;
  float fStack_1b62c;
  float fStack_1b628;
  float fStack_1b624;
  float fStack_1b620;
  float fStack_1b61c;
  float fStack_1b618;
  float fStack_1b614;
  float fStack_1b610;
  float fStack_1b60c;
  float fStack_1b608;
  float fStack_1b604;
  float fStack_1b600;
  float fStack_1b5fc;
  float fStack_1b5f8;
  float fStack_1b5f4;
  float fStack_1b5f0;
  float fStack_1b5ec;
  float fStack_1b5e8;
  float fStack_1b5e4;
  float fStack_1b5e0;
  float fStack_1b5dc;
  float fStack_1b5d8;
  float fStack_1b5d4;
  float fStack_1b5d0;
  float fStack_1b5cc;
  float fStack_1b5c8;
  float fStack_1b5c4;
  float fStack_1b5c0;
  float fStack_1b5bc;
  float fStack_1b5b8;
  float fStack_1b5b4;
  float fStack_1b5b0;
  float fStack_1b5ac;
  float fStack_1b5a8;
  float fStack_1b5a4;
  float fStack_1b5a0;
  float fStack_1b59c;
  float fStack_1b598;
  float fStack_1b594;
  float fStack_1b590;
  float fStack_1b58c;
  float fStack_1b588;
  float fStack_1b584;
  float fStack_1b580;
  float fStack_1b57c;
  float fStack_1b578;
  float fStack_1b574;
  float fStack_1b570;
  float fStack_1b56c;
  float fStack_1b568;
  float fStack_1b564;
  float fStack_1b560;
  float fStack_1b55c;
  float fStack_1b558;
  float fStack_1b554;
  float fStack_1b550;
  float fStack_1b54c;
  float fStack_1b548;
  float fStack_1b544;
  float fStack_1b540;
  float fStack_1b4c8;
  float fStack_1b4c4;
  float fStack_1b4c0;
  float fStack_1b4bc;
  float fStack_1b4b8;
  float fStack_1b4b4;
  float fStack_1b4b0;
  float fStack_1b4ac;
  float fStack_1b4a8;
  float fStack_1b4a4;
  float fStack_1b4a0;
  float fStack_1b49c;
  float fStack_1b498;
  float fStack_1b494;
  float fStack_1b490;
  float fStack_1b48c;
  float fStack_1b488;
  float fStack_1b484;
  float fStack_1b480;
  float fStack_1b47c;
  float fStack_1b478;
  float fStack_1b474;
  float fStack_1b470;
  float fStack_1b46c;
  float fStack_1b468;
  float fStack_1b464;
  float fStack_1b424;
  float fStack_1b420;
  float fStack_1b41c;
  float fStack_1b418;
  float fStack_1b414;
  float fStack_1b410;
  float fStack_1b40c;
  float fStack_1b408;
  float fStack_1b404;
  float fStack_1b400;
  float fStack_1b3fc;
  float fStack_1b3f8;
  float fStack_1b3f4;
  float fStack_1b3f0;
  float fStack_1b3ec;
  float fStack_1b3e8;
  float fStack_1b3c8;
  float fStack_1b3c4;
  float fStack_1b3c0;
  float fStack_1b3bc;
  float fStack_1b3b8;
  float fStack_1b3b4;
  float fStack_1b3b0;
  float fStack_1b354;
  float fStack_1b350;
  float fStack_1b34c;
  float fStack_1b348;
  float fStack_1b344;
  float fStack_1b340;
  float fStack_1b33c;
  float fStack_1b338;
  float fStack_1b334;
  float fStack_1b330;
  float fStack_1b32c;
  float fStack_1b328;
  float fStack_1b2ec;
  float fStack_1b2e8;
  float fStack_1b2e4;
  float fStack_1b2e0;
  float fStack_1b2dc;
  float fStack_1b2d8;
  float fStack_1b2d4;
  float fStack_1b2d0;
  float fStack_1b2cc;
  float fStack_1b2c8;
  float fStack_1b2c4;
  float fStack_1b2c0;
  float fStack_1b2bc;
  float fStack_1b2b8;
  float fStack_1b2b4;
  float fStack_1b2b0;
  float fStack_1b2ac;
  float fStack_1b2a8;
  float fStack_1b2a4;
  float fStack_1b2a0;
  float fStack_1b29c;
  float fStack_1b298;
  float fStack_1b294;
  float fStack_1b290;
  float fStack_1b28c;
  float fStack_1b288;
  float fStack_1b284;
  float fStack_1b280;
  float fStack_1b27c;
  float fStack_1b278;
  float fStack_1b274;
  float fStack_1b270;
  float fStack_1b1e0;
  float fStack_1b1dc;
  float fStack_1b1d8;
  float fStack_1b1d4;
  float fStack_1b1d0;
  float fStack_1b1cc;
  float fStack_1b1c8;
  float fStack_1b1c4;
  float fStack_1b1c0;
  float fStack_1b1bc;
  float fStack_1b1b8;
  float fStack_1b1b4;
  float fStack_1b1b0;
  float fStack_1b1ac;
  float fStack_1b1a8;
  float fStack_1b1a4;
  float fStack_1b1a0;
  float fStack_1b19c;
  float fStack_1b198;
  float fStack_1b194;
  float fStack_1b190;
  float fStack_1b18c;
  float fStack_1b188;
  float fStack_1b184;
  float fStack_1b180;
  float fStack_1b17c;
  float fStack_1b13c;
  float fStack_1b138;
  float fStack_1b134;
  float fStack_1b130;
  float fStack_1b12c;
  float fStack_1b128;
  float fStack_1b124;
  float fStack_1b120;
  float fStack_1b11c;
  float fStack_1b118;
  float fStack_1b114;
  float fStack_1b110;
  float fStack_1b10c;
  float fStack_1b108;
  float fStack_1b104;
  float fStack_1b100;
  float fStack_1b06c;
  float fStack_1b068;
  float fStack_1b064;
  float fStack_1b060;
  float fStack_1b05c;
  float fStack_1b058;
  float fStack_1b054;
  float fStack_1b050;
  float fStack_1b04c;
  float fStack_1b048;
  float fStack_1b044;
  float fStack_1b040;
  float fStack_1afc8;
  float fStack_1afc4;
  float fStack_1afc0;
  float fStack_1afbc;
  float fStack_1afb8;
  float fStack_1afb4;
  float fStack_1afb0;
  float fStack_1afac;
  float fStack_1afa8;
  float fStack_1afa4;
  float fStack_1afa0;
  float fStack_1af9c;
  float fStack_1af98;
  float fStack_1af94;
  float fStack_1af90;
  float fStack_1af20;
  float fStack_1af1c;
  float fStack_1af18;
  float fStack_1af14;
  float fStack_1af10;
  float fStack_1af0c;
  float fStack_1af08;
  float fStack_1af04;
  float fStack_1af00;
  float fStack_1aefc;
  float fStack_1ae90;
  float fStack_1ae8c;
  float fStack_1ae88;
  float fStack_1ae84;
  float fStack_1ae80;
  float fStack_1ae7c;
  float fStack_1ae78;
  float fStack_1ae74;
  float fStack_1ae70;
  float fStack_1ae6c;
  float fStack_1ae68;
  float fStack_1ae64;
  float fStack_1ae60;
  float fStack_1ae5c;
  float fStack_1ae58;
  float fStack_1ae54;
  float fStack_1ae50;
  float fStack_1ae4c;
  float fStack_1ae48;
  float fStack_1ae44;
  float fStack_1ae40;
  float fStack_1ae3c;
  float fStack_1ae38;
  float fStack_1ae34;
  float fStack_1ae30;
  float fStack_1ae2c;
  float fStack_1ae28;
  float fStack_1ae24;
  float fStack_1ae20;
  float fStack_1ae1c;
  float fStack_1addc;
  float fStack_1add8;
  float fStack_1add4;
  float fStack_1add0;
  float fStack_1adcc;
  float fStack_1adc8;
  float fStack_1adc4;
  float fStack_1adc0;
  float fStack_1adbc;
  float fStack_1adb8;
  float fStack_1adb4;
  float fStack_1adb0;
  float fStack_1adac;
  float fStack_1ada8;
  float fStack_1ada4;
  float fStack_1ada0;
  float fStack_1ad9c;
  float fStack_1ad98;
  float fStack_1ad94;
  float fStack_1ad90;
  float fStack_1ad8c;
  float fStack_1ad88;
  float fStack_1ad54;
  float fStack_1ad50;
  float fStack_1ad4c;
  float fStack_1ad48;
  float fStack_1ad44;
  float fStack_1ad40;
  float fStack_1ad3c;
  float fStack_1ad38;
  float fStack_1ad34;
  float fStack_1ad30;
  float fStack_1ad2c;
  float fStack_1ad28;
  float fStack_1ad24;
  float fStack_1ad20;
  float fStack_1ad1c;
  float fStack_1ad18;
  float fStack_1ad14;
  float fStack_1ad10;
  float fStack_1ad0c;
  float fStack_1ad08;
  float fStack_1ad04;
  float fStack_1ad00;
  float fStack_1acfc;
  float fStack_1acf8;
  float fStack_1acf4;
  float fStack_1acf0;
  float fStack_1acec;
  float fStack_1ace8;
  float fStack_1ace4;
  float fStack_1ace0;
  float fStack_1acdc;
  float fStack_1acd8;
  float fStack_1acd4;
  float fStack_1acd0;
  float fStack_1accc;
  float fStack_1acc8;
  float fStack_1acc4;
  float fStack_1acc0;
  float fStack_1acbc;
  float fStack_1acb8;
  float fStack_1acb4;
  float fStack_1acb0;
  float fStack_1acac;
  float fStack_1aca8;
  float fStack_1ac9c;
  float fStack_1ac98;
  float fStack_1ac94;
  float fStack_1ac90;
  float fStack_1ac8c;
  float fStack_1ac88;
  float fStack_1ac68;
  float fStack_1ac64;
  float fStack_1ac60;
  float fStack_1ac5c;
  float fStack_1ac58;
  float fStack_1ac54;
  float fStack_1ac50;
  float fStack_1ac4c;
  float fStack_1ac48;
  float fStack_1ac44;
  float fStack_1ac40;
  float fStack_1ac3c;
  float fStack_1ac38;
  float fStack_1ac34;
  float fStack_1ac30;
  float fStack_1ac2c;
  float fStack_1ac28;
  float fStack_1ac24;
  float fStack_1ac20;
  float fStack_1ac1c;
  float fStack_1ac18;
  float fStack_1ac14;
  float fStack_1abe0;
  float fStack_1abdc;
  float fStack_1abd8;
  float fStack_1abd4;
  float fStack_1abd0;
  float fStack_1abcc;
  float fStack_1abc8;
  float fStack_1abc4;
  float fStack_1abc0;
  float fStack_1abbc;
  float fStack_1abb8;
  float fStack_1abb4;
  float fStack_1abb0;
  float fStack_1abac;
  float fStack_1aba8;
  float fStack_1aba4;
  float fStack_1aba0;
  float fStack_1ab9c;
  float fStack_1ab98;
  float fStack_1ab94;
  float fStack_1ab90;
  float fStack_1ab8c;
  float fStack_1ab88;
  float fStack_1ab84;
  float fStack_1ab80;
  float fStack_1ab7c;
  float fStack_1ab78;
  float fStack_1ab74;
  float fStack_1ab70;
  float fStack_1ab6c;
  float fStack_1ab68;
  float fStack_1ab64;
  float fStack_1ab60;
  float fStack_1ab5c;
  float fStack_1ab58;
  float fStack_1ab54;
  float fStack_1ab50;
  float fStack_1ab4c;
  float fStack_1ab48;
  float fStack_1ab44;
  float fStack_1ab40;
  float fStack_1ab3c;
  float fStack_1ab38;
  float fStack_1ab34;
  float fStack_1ab28;
  float fStack_1ab24;
  float fStack_1ab20;
  float fStack_1ab1c;
  float fStack_1ab18;
  float fStack_1ab14;
  float fStack_1aaf4;
  float fStack_1aaf0;
  float fStack_1aaec;
  float fStack_1aae8;
  float fStack_1aae4;
  float fStack_1aae0;
  float fStack_1aadc;
  float fStack_1aad8;
  float fStack_1aad4;
  float fStack_1aad0;
  float fStack_1aacc;
  float fStack_1aac8;
  float fStack_1aac4;
  float fStack_1aac0;
  float fStack_1aabc;
  float fStack_1aab8;
  float fStack_1aab4;
  float fStack_1aab0;
  float fStack_1aaac;
  float fStack_1aaa8;
  float fStack_1aaa4;
  float fStack_1aaa0;
  float fStack_1aa6c;
  float fStack_1aa68;
  float fStack_1aa64;
  float fStack_1aa60;
  float fStack_1aa5c;
  float fStack_1aa58;
  float fStack_1aa54;
  float fStack_1aa50;
  float fStack_1aa4c;
  float fStack_1aa48;
  float fStack_1aa44;
  float fStack_1aa40;
  float fStack_1aa3c;
  float fStack_1aa38;
  float fStack_1aa34;
  float fStack_1aa30;
  float fStack_1aa2c;
  float fStack_1aa28;
  float fStack_1aa24;
  float fStack_1aa20;
  float fStack_1aa1c;
  float fStack_1aa18;
  float fStack_1aa14;
  float fStack_1aa10;
  float fStack_1aa0c;
  float fStack_1aa08;
  float fStack_1aa04;
  float fStack_1aa00;
  float fStack_1a9fc;
  float fStack_1a9f8;
  float fStack_1a9f4;
  float fStack_1a9f0;
  float fStack_1a9ec;
  float fStack_1a9e8;
  float fStack_1a9e4;
  float fStack_1a9e0;
  float fStack_1a9dc;
  float fStack_1a9d8;
  float fStack_1a9d4;
  float fStack_1a9d0;
  float fStack_1a9cc;
  float fStack_1a9c8;
  float fStack_1a9c4;
  float fStack_1a9c0;
  float fStack_1a9b4;
  float fStack_1a9b0;
  float fStack_1a9ac;
  float fStack_1a9a8;
  float fStack_1a9a4;
  float fStack_1a9a0;
  float fStack_1a980;
  float fStack_1a97c;
  float fStack_1a978;
  float fStack_1a974;
  float fStack_1a970;
  float fStack_1a96c;
  float fStack_1a968;
  float fStack_1a964;
  float fStack_1a960;
  float fStack_1a95c;
  float fStack_1a958;
  float fStack_1a954;
  float fStack_1a8f8;
  float fStack_1a8f4;
  float fStack_1a8f0;
  float fStack_1a8ec;
  float fStack_1a8e8;
  float fStack_1a8e4;
  float fStack_1a8e0;
  float fStack_1a8dc;
  float fStack_1a8d8;
  float fStack_1a8d4;
  float fStack_1a8d0;
  float fStack_1a8cc;
  float fStack_1a8c8;
  float fStack_1a8c4;
  float fStack_1a8c0;
  float fStack_1a8bc;
  float fStack_1a8b8;
  float fStack_1a8b4;
  float fStack_1a8b0;
  float fStack_1a8ac;
  float fStack_1a8a8;
  float fStack_1a8a4;
  float fStack_1a8a0;
  float fStack_1a89c;
  float fStack_1a898;
  float fStack_1a894;
  float fStack_1a890;
  float fStack_1a88c;
  float fStack_1a888;
  float fStack_1a884;
  float fStack_1a880;
  float fStack_1a87c;
  float fStack_1a878;
  float fStack_1a874;
  float fStack_1a870;
  float fStack_1a86c;
  float fStack_1a868;
  float fStack_1a864;
  float fStack_1a860;
  float fStack_1a85c;
  float fStack_1a858;
  float fStack_1a854;
  float fStack_1a850;
  float fStack_1a84c;
  float fStack_1a840;
  float fStack_1a83c;
  float fStack_1a838;
  float fStack_1a834;
  float fStack_1a830;
  float fStack_1a82c;
  float fStack_1a784;
  float fStack_1a780;
  float fStack_1a77c;
  float fStack_1a778;
  float fStack_1a774;
  float fStack_1a770;
  float fStack_1a76c;
  float fStack_1a768;
  float fStack_1a764;
  float fStack_1a760;
  float fStack_1a75c;
  float fStack_1a758;
  float fStack_1a754;
  float fStack_1a750;
  float fStack_1a710;
  float fStack_1a70c;
  float fStack_1a708;
  float fStack_1a704;
  float fStack_1a700;
  float fStack_1a6fc;
  float fStack_1a6f8;
  float fStack_1a6f4;
  float fStack_1a6f0;
  float fStack_1a6ec;
  float fStack_1a6e8;
  float fStack_1a6e4;
  float fStack_1a6e0;
  float fStack_1a6dc;
  float fStack_1a6d8;
  float fStack_1a6b4;
  float fStack_1a6b0;
  float fStack_1a6ac;
  float fStack_1a6a8;
  float fStack_1a6a4;
  float fStack_1a6a0;
  float fStack_1a69c;
  float fStack_1a668;
  float fStack_1a664;
  float fStack_1a660;
  float fStack_1a65c;
  float fStack_1a658;
  float fStack_1a654;
  float fStack_1a650;
  float fStack_1a64c;
  float fStack_1a648;
  float fStack_1a644;
  float fStack_1a640;
  float fStack_1a63c;
  float fStack_1a638;
  float fStack_1a634;
  float fStack_1a630;
  float fStack_1a62c;
  float fStack_1a628;
  float fStack_1a624;
  float fStack_1a620;
  float fStack_1a61c;
  float fStack_1a618;
  float fStack_1a614;
  float fStack_1a5d8;
  float fStack_1a5d4;
  float fStack_1a5d0;
  float fStack_1a5cc;
  float fStack_1a5c8;
  float fStack_1a5c4;
  float fStack_1a5c0;
  float fStack_1a5bc;
  float fStack_1a5b8;
  float fStack_1a5b4;
  float fStack_1a5b0;
  float fStack_1a5ac;
  float fStack_1a5a8;
  float fStack_1a5a4;
  float fStack_1a5a0;
  float fStack_1a59c;
  float fStack_1a598;
  float fStack_1a594;
  float fStack_1a590;
  float fStack_1a58c;
  float fStack_1a588;
  float fStack_1a584;
  float fStack_1a580;
  float fStack_1a57c;
  float fStack_1a578;
  float fStack_1a574;
  float fStack_1a570;
  float fStack_1a56c;
  float fStack_1a568;
  float fStack_1a564;
  float fStack_1a55c;
  float fStack_1a540;
  float fStack_1a53c;
  float fStack_1a538;
  float fStack_1a534;
  float fStack_1a530;
  float fStack_1a52c;
  float fStack_1a528;
  float fStack_1a524;
  float fStack_1a520;
  float fStack_1a51c;
  float fStack_1a518;
  float fStack_1a514;
  float fStack_1a510;
  float fStack_1a50c;
  float fStack_1a508;
  float fStack_1a504;
  float fStack_1a500;
  float fStack_1a4fc;
  float fStack_1a4f8;
  float fStack_1a4f4;
  float fStack_1a4f0;
  float fStack_1a4ec;
  float fStack_1a4e8;
  float fStack_1a4e4;
  float fStack_1a4e0;
  float fStack_1a4dc;
  float fStack_1a4d8;
  float fStack_1a4d4;
  float fStack_1a4d0;
  float fStack_1a4cc;
  float fStack_1a4c8;
  float fStack_1a4c4;
  float fStack_1a4c0;
  float fStack_1a4bc;
  float fStack_1a4b8;
  float fStack_1a4b4;
  float fStack_1a4b0;
  float fStack_1a4ac;
  float fStack_1a4a8;
  float fStack_1a4a4;
  float fStack_1a4a0;
  float fStack_1a49c;
  float fStack_1a498;
  float fStack_1a494;
  float fStack_1a490;
  float fStack_1a48c;
  float fStack_1a488;
  float fStack_1a484;
  float fStack_1a480;
  float fStack_1a47c;
  float fStack_1a478;
  float fStack_1a474;
  float fStack_1a470;
  float fStack_1a46c;
  float fStack_1a468;
  float fStack_1a464;
  float fStack_1a460;
  float fStack_1a45c;
  float fStack_1a458;
  float fStack_1a454;
  float fStack_1a450;
  float fStack_1a44c;
  float fStack_1a448;
  float fStack_1a444;
  float fStack_1a440;
  float fStack_1a43c;
  float fStack_1a438;
  float fStack_1a434;
  float fStack_1a430;
  float fStack_1a42c;
  float fStack_1a428;
  float fStack_1a424;
  float fStack_1a420;
  float fStack_1a41c;
  float fStack_1a418;
  float fStack_1a414;
  float fStack_1a410;
  float fStack_1a40c;
  float fStack_1a408;
  float fStack_1a404;
  float fStack_1a400;
  float fStack_1a3fc;
  float fStack_1a3f8;
  float fStack_1a3f4;
  float fStack_1a3f0;
  float fStack_1a3e8;
  float fStack_1a3e4;
  float fStack_1a3e0;
  float fStack_1a3dc;
  float fStack_1a3d8;
  float fStack_1a3d4;
  float fStack_1a3d0;
  float fStack_1a3cc;
  float fStack_1a3c8;
  float fStack_1a3c4;
  float fStack_1a3c0;
  float fStack_1a3bc;
  float fStack_1a3b8;
  float fStack_1a3b4;
  float fStack_1a3b0;
  float fStack_1a3ac;
  float fStack_1a3a8;
  float fStack_1a3a4;
  float fStack_1a3a0;
  float fStack_1a39c;
  float fStack_1a398;
  float fStack_1a394;
  float fStack_1a390;
  float fStack_1a38c;
  float fStack_1a388;
  float fStack_1a384;
  float fStack_1a380;
  float fStack_1a37c;
  float fStack_1a378;
  float fStack_1a374;
  float fStack_1a370;
  float fStack_1a36c;
  float fStack_1a368;
  float fStack_1a364;
  float fStack_1a360;
  float fStack_1a35c;
  float fStack_1a358;
  float fStack_1a354;
  float fStack_1a350;
  float fStack_1a34c;
  float fStack_1a348;
  float fStack_1a344;
  float fStack_1a340;
  float fStack_1a33c;
  float fStack_1a338;
  float fStack_1a334;
  float fStack_1a330;
  float fStack_1a32c;
  float fStack_1a328;
  float fStack_1a324;
  float fStack_1a320;
  float fStack_1a31c;
  float fStack_1a318;
  float fStack_1a314;
  float fStack_1a310;
  float fStack_1a30c;
  float fStack_1a308;
  float fStack_1a304;
  float fStack_1a300;
  float fStack_1a2fc;
  float fStack_1a2f8;
  float fStack_1a2f4;
  float fStack_1a2f0;
  float fStack_1a2ec;
  float fStack_1a2e8;
  float fStack_1a2e4;
  float fStack_1a2e0;
  float fStack_1a2dc;
  float fStack_1a2d8;
  float fStack_1a2d4;
  float fStack_1a2d0;
  float fStack_1a2cc;
  float fStack_1a2c8;
  float fStack_1a2c4;
  float fStack_1a2c0;
  float fStack_1a2bc;
  float fStack_1a2b8;
  float fStack_1a2b4;
  float fStack_1a2b0;
  float fStack_1a2ac;
  float fStack_1a2a8;
  float fStack_1a2a4;
  float fStack_1a2a0;
  float fStack_1a29c;
  float fStack_1a298;
  float fStack_1a294;
  float fStack_1a290;
  float fStack_1a28c;
  float fStack_1a288;
  float fStack_1a284;
  float fStack_1a280;
  float fStack_1a27c;
  float fStack_1a274;
  float fStack_1a270;
  float fStack_1a26c;
  float fStack_1a268;
  float fStack_1a264;
  float fStack_1a260;
  float fStack_1a25c;
  float fStack_1a258;
  float fStack_1a254;
  float fStack_1a250;
  float fStack_1a24c;
  float fStack_1a248;
  float fStack_1a244;
  float fStack_1a240;
  float fStack_1a23c;
  float fStack_1a238;
  float fStack_1a234;
  float fStack_1a230;
  float fStack_1a22c;
  float fStack_1a228;
  float fStack_1a224;
  float fStack_1a220;
  float fStack_1a21c;
  float fStack_1a218;
  float fStack_1a214;
  float fStack_1a210;
  float fStack_1a1e4;
  float fStack_1a1e0;
  float fStack_1a1dc;
  float fStack_1a1d8;
  float fStack_1a1d4;
  float fStack_1a1d0;
  float fStack_1a1cc;
  float fStack_1a1c8;
  float fStack_1a1c4;
  float fStack_1a1c0;
  float fStack_1a1bc;
  float fStack_1a1b8;
  float fStack_1a1b4;
  float fStack_1a1b0;
  float fStack_1a1ac;
  float fStack_1a1a8;
  float fStack_1a1a4;
  float fStack_1a1a0;
  float fStack_1a19c;
  float fStack_1a198;
  float fStack_1a194;
  float fStack_1a190;
  float fStack_1a18c;
  float fStack_1a188;
  float fStack_1a184;
  float fStack_1a180;
  float fStack_1a17c;
  float fStack_1a178;
  float fStack_1a174;
  float fStack_1a170;
  float fStack_1a16c;
  float fStack_1a168;
  float fStack_1a164;
  float fStack_1a160;
  float fStack_1a15c;
  float fStack_1a158;
  float fStack_1a154;
  float fStack_1a150;
  float fStack_1a14c;
  float fStack_1a148;
  float fStack_1a144;
  float fStack_1a140;
  float fStack_1a13c;
  float fStack_1a138;
  float fStack_1a134;
  float fStack_1a130;
  float fStack_1a12c;
  float fStack_1a128;
  float fStack_1a124;
  float fStack_1a120;
  float fStack_1a11c;
  float fStack_1a118;
  float fStack_1a114;
  float fStack_1a110;
  float fStack_1a10c;
  float fStack_1a108;
  float fStack_1a100;
  float fStack_1a0fc;
  float fStack_1a0f8;
  float fStack_1a0f4;
  float fStack_1a0f0;
  float fStack_1a0ec;
  float fStack_1a0e8;
  float fStack_1a070;
  float fStack_1a06c;
  float fStack_1a068;
  float fStack_1a064;
  float fStack_1a060;
  float fStack_1a05c;
  float fStack_1a058;
  float fStack_1a054;
  float fStack_1a050;
  float fStack_1a04c;
  float fStack_1a048;
  float fStack_1a044;
  float fStack_1a040;
  float fStack_1a03c;
  float fStack_1a038;
  float fStack_1a034;
  float fStack_1a030;
  float fStack_1a02c;
  float fStack_1a028;
  float fStack_1a024;
  float fStack_1a020;
  float fStack_1a01c;
  float fStack_1a018;
  float fStack_1a014;
  float fStack_1a010;
  float fStack_1a00c;
  float fStack_19fcc;
  float fStack_19fc8;
  float fStack_19fc4;
  float fStack_19fc0;
  float fStack_19fbc;
  float fStack_19fb8;
  float fStack_19fb4;
  float fStack_19fb0;
  float fStack_19fac;
  float fStack_19fa8;
  float fStack_19fa4;
  float fStack_19fa0;
  float fStack_19f9c;
  float fStack_19f98;
  float fStack_19f94;
  float fStack_19f90;
  float fStack_19f70;
  float fStack_19f6c;
  float fStack_19f68;
  float fStack_19f64;
  float fStack_19f60;
  float fStack_19f5c;
  float fStack_19f58;
  float fStack_19f24;
  float fStack_19f20;
  float fStack_19f1c;
  float fStack_19f18;
  float fStack_19f14;
  float fStack_19f10;
  float fStack_19f0c;
  float fStack_19f08;
  float fStack_19f04;
  float fStack_19f00;
  float fStack_19efc;
  float fStack_19ef8;
  float fStack_19ef4;
  float fStack_19ef0;
  float fStack_19eec;
  float fStack_19ee8;
  float fStack_19ee4;
  float fStack_19ee0;
  float fStack_19edc;
  float fStack_19ed8;
  float fStack_19ed4;
  float fStack_19ed0;
  float fStack_19e94;
  float fStack_19e90;
  float fStack_19e8c;
  float fStack_19e88;
  float fStack_19e84;
  float fStack_19e80;
  float fStack_19e7c;
  float fStack_19e78;
  float fStack_19e74;
  float fStack_19e70;
  float fStack_19e6c;
  float fStack_19e68;
  float fStack_19e64;
  float fStack_19e60;
  float fStack_19e5c;
  float fStack_19e58;
  float fStack_19e54;
  float fStack_19e50;
  float fStack_19e4c;
  float fStack_19e48;
  float fStack_19e44;
  float fStack_19e40;
  float fStack_19e3c;
  float fStack_19e38;
  float fStack_19e34;
  float fStack_19e30;
  float fStack_19e2c;
  float fStack_19e28;
  float fStack_19e24;
  float fStack_19e20;
  float fStack_19e1c;
  float fStack_19e18;
  float fStack_19dfc;
  float fStack_19df8;
  float fStack_19df4;
  float fStack_19df0;
  float fStack_19dec;
  float fStack_19de8;
  float fStack_19de4;
  float fStack_19de0;
  float fStack_19ddc;
  float fStack_19dd8;
  float fStack_19dd4;
  float fStack_19dd0;
  float fStack_19dcc;
  float fStack_19dc8;
  float fStack_19dc4;
  float fStack_19dc0;
  float fStack_19dbc;
  float fStack_19db8;
  float fStack_19db4;
  float fStack_19db0;
  float fStack_19dac;
  float fStack_19da8;
  float fStack_19da4;
  float fStack_19da0;
  float fStack_19d9c;
  float fStack_19d98;
  float fStack_19d94;
  float fStack_19d90;
  float fStack_19d8c;
  float fStack_19d88;
  float fStack_19d84;
  float fStack_19d80;
  float fStack_19d7c;
  float fStack_19d78;
  float fStack_19d74;
  float fStack_19d70;
  float fStack_19d6c;
  float fStack_19d68;
  float fStack_19d64;
  float fStack_19d60;
  float fStack_19d5c;
  float fStack_19d58;
  float fStack_19d54;
  float fStack_19d50;
  float fStack_19d4c;
  float fStack_19d48;
  float fStack_19d44;
  float fStack_19d40;
  float fStack_19d3c;
  float fStack_19d38;
  float fStack_19d34;
  float fStack_19d30;
  float fStack_19d2c;
  float fStack_19d28;
  float fStack_19d24;
  float fStack_19d20;
  float fStack_19d1c;
  float fStack_19d18;
  float fStack_19d14;
  float fStack_19d10;
  float fStack_19d0c;
  float fStack_19d08;
  float fStack_19d04;
  float fStack_19d00;
  float fStack_19cfc;
  float fStack_19cf8;
  float fStack_19cf4;
  float fStack_19cf0;
  float fStack_19cec;
  float fStack_19ce8;
  float fStack_19ce4;
  float fStack_19ce0;
  float fStack_19cdc;
  float fStack_19cd8;
  float fStack_19cd4;
  float fStack_19cd0;
  float fStack_19ccc;
  float fStack_19cc8;
  float fStack_19cc4;
  float fStack_19cc0;
  float fStack_19cbc;
  float fStack_19cb8;
  float fStack_19cb4;
  float fStack_19cb0;
  float fStack_19cac;
  float fStack_19ca8;
  float fStack_19ca4;
  float fStack_19ca0;
  float fStack_19c9c;
  float fStack_19c98;
  float fStack_19c94;
  float fStack_19c90;
  float fStack_19c8c;
  float fStack_19c88;
  float fStack_19c84;
  float fStack_19c80;
  float fStack_19c7c;
  float fStack_19c78;
  float fStack_19c74;
  float fStack_19c70;
  float fStack_19c6c;
  float fStack_19c68;
  float fStack_19c64;
  float fStack_19c60;
  float fStack_19c5c;
  float fStack_19c58;
  float fStack_19c54;
  float fStack_19c50;
  float fStack_19c4c;
  float fStack_19c48;
  float fStack_19c44;
  float fStack_19c40;
  float fStack_19c14;
  float fStack_19c10;
  float fStack_19c0c;
  float fStack_19c08;
  float fStack_19c04;
  float fStack_19c00;
  float fStack_19bfc;
  float fStack_19bf8;
  float fStack_19bf4;
  float fStack_19bf0;
  float fStack_19bec;
  float fStack_19be8;
  float fStack_19be4;
  float fStack_19be0;
  float fStack_19bdc;
  float fStack_19bd8;
  float fStack_19bd4;
  float fStack_19bd0;
  float fStack_19bcc;
  float fStack_19bc8;
  float fStack_19bc4;
  float fStack_19bc0;
  float fStack_19bbc;
  float fStack_19bb8;
  float fStack_19bb4;
  float fStack_19bb0;
  float fStack_19bac;
  float fStack_19ba8;
  float fStack_19ba4;
  float fStack_19ba0;
  float fStack_19b9c;
  float fStack_19b98;
  float fStack_19b94;
  float fStack_19b90;
  float fStack_19b8c;
  float fStack_19b88;
  float fStack_19b84;
  float fStack_19b80;
  float fStack_19b7c;
  float fStack_19b78;
  float fStack_19b74;
  float fStack_19b70;
  float fStack_19b6c;
  float fStack_19b68;
  float fStack_19b64;
  float fStack_19b60;
  float fStack_19b5c;
  float fStack_19b58;
  float fStack_19b54;
  float fStack_19b50;
  float fStack_19b4c;
  float fStack_19b48;
  float fStack_19b44;
  float fStack_19b40;
  float fStack_19b3c;
  float fStack_19b38;
  float fStack_19b34;
  float fStack_19b30;
  float fStack_19b2c;
  float fStack_19b28;
  float fStack_19b24;
  float fStack_19b20;
  float fStack_19b1c;
  float fStack_19b18;
  float fStack_19aa0;
  float fStack_19a9c;
  float fStack_19a98;
  float fStack_19a94;
  float fStack_19a90;
  float fStack_19a8c;
  float fStack_19a88;
  float fStack_19a84;
  float fStack_19a80;
  float fStack_19a7c;
  float fStack_19a78;
  float fStack_19a74;
  float fStack_19a70;
  float fStack_19a6c;
  float fStack_19a68;
  float fStack_19a64;
  float fStack_19a60;
  float fStack_19a5c;
  float fStack_19a58;
  float fStack_19a54;
  float fStack_19a50;
  float fStack_19a4c;
  float fStack_19a48;
  float fStack_19a44;
  float fStack_19a40;
  float fStack_19a3c;
  float fStack_199fc;
  float fStack_199f8;
  float fStack_199f4;
  float fStack_199f0;
  float fStack_199ec;
  float fStack_199e8;
  float fStack_199e4;
  float fStack_199e0;
  float fStack_199dc;
  float fStack_199d8;
  float fStack_199d4;
  float fStack_199d0;
  float fStack_199cc;
  float fStack_199c8;
  float fStack_199c4;
  float fStack_199c0;
  float fStack_199a0;
  float fStack_1999c;
  float fStack_19998;
  float fStack_19994;
  float fStack_19990;
  float fStack_1998c;
  float fStack_19988;
  float fStack_19954;
  float fStack_19950;
  float fStack_1994c;
  float fStack_19948;
  float fStack_19944;
  float fStack_19940;
  float fStack_1993c;
  float fStack_19938;
  float fStack_19934;
  float fStack_19930;
  float fStack_1992c;
  float fStack_19928;
  float fStack_19924;
  float fStack_19920;
  float fStack_1991c;
  float fStack_19918;
  float fStack_19914;
  float fStack_19910;
  float fStack_1990c;
  float fStack_19908;
  float fStack_19904;
  float fStack_19900;
  float fStack_198c4;
  float fStack_198c0;
  float fStack_198bc;
  float fStack_198b8;
  float fStack_198b4;
  float fStack_198b0;
  float fStack_198ac;
  float fStack_198a8;
  float fStack_198a4;
  float fStack_198a0;
  float fStack_1989c;
  float fStack_19898;
  float fStack_19894;
  float fStack_19890;
  float fStack_1988c;
  float fStack_19888;
  float fStack_19884;
  float fStack_19880;
  float fStack_1987c;
  float fStack_19878;
  float fStack_19874;
  float fStack_19870;
  float fStack_1986c;
  float fStack_19868;
  float fStack_19864;
  float fStack_19860;
  float fStack_1985c;
  float fStack_19858;
  float fStack_19854;
  float fStack_19850;
  float fStack_1984c;
  float fStack_19848;
  float fStack_1982c;
  float fStack_19828;
  float fStack_19824;
  float fStack_19820;
  float fStack_1981c;
  float fStack_19818;
  float fStack_19814;
  float fStack_19810;
  float fStack_1980c;
  float fStack_19808;
  float fStack_19804;
  float fStack_19800;
  float fStack_197fc;
  float fStack_197f8;
  float fStack_197f4;
  float fStack_197f0;
  float fStack_197ec;
  float fStack_197e8;
  float fStack_197e4;
  float fStack_197b8;
  float fStack_197b4;
  float fStack_197b0;
  float fStack_197ac;
  float fStack_197a8;
  float fStack_197a4;
  float fStack_197a0;
  float fStack_1979c;
  float fStack_19798;
  float fStack_19794;
  float fStack_19790;
  float fStack_1978c;
  float fStack_19788;
  float fStack_19784;
  float fStack_19780;
  float fStack_1977c;
  float fStack_19778;
  float fStack_19774;
  float fStack_19770;
  float fStack_1976c;
  float fStack_19768;
  float fStack_19764;
  float fStack_19760;
  float fStack_1975c;
  float fStack_19758;
  float fStack_19754;
  float fStack_19750;
  float fStack_1974c;
  float fStack_19748;
  float fStack_19744;
  float fStack_19740;
  float fStack_1973c;
  float fStack_19738;
  float fStack_19734;
  float fStack_19730;
  float fStack_1972c;
  float fStack_19728;
  float fStack_19724;
  float fStack_19720;
  float fStack_1971c;
  float fStack_19718;
  float fStack_19714;
  float fStack_19710;
  float fStack_1970c;
  float fStack_19708;
  float fStack_19704;
  float fStack_19700;
  float fStack_196fc;
  float fStack_196f8;
  float fStack_196f4;
  float fStack_196f0;
  float fStack_196ec;
  float fStack_196e8;
  float fStack_196e4;
  float fStack_196e0;
  float fStack_196dc;
  float fStack_196d8;
  float fStack_196d4;
  float fStack_196d0;
  float fStack_196cc;
  float fStack_196c8;
  float fStack_196c4;
  float fStack_196c0;
  float fStack_196bc;
  float fStack_19644;
  float fStack_19640;
  float fStack_1963c;
  float fStack_19638;
  float fStack_19634;
  float fStack_19630;
  float fStack_1962c;
  float fStack_19628;
  float fStack_19624;
  float fStack_19620;
  float fStack_1961c;
  float fStack_19618;
  float fStack_19614;
  float fStack_19610;
  float fStack_1960c;
  float fStack_19608;
  float fStack_19604;
  float fStack_19600;
  float fStack_195fc;
  float fStack_195f8;
  float fStack_195f4;
  float fStack_195f0;
  float fStack_195ec;
  float fStack_195e8;
  float fStack_195e4;
  float fStack_195e0;
  float fStack_195a0;
  float fStack_1959c;
  float fStack_19598;
  float fStack_19594;
  float fStack_19590;
  float fStack_1958c;
  float fStack_19588;
  float fStack_19584;
  float fStack_19580;
  float fStack_1957c;
  float fStack_19578;
  float fStack_19574;
  float fStack_19570;
  float fStack_1956c;
  float fStack_19568;
  float fStack_19564;
  float fStack_19544;
  float fStack_19540;
  float fStack_1953c;
  float fStack_19538;
  float fStack_19534;
  float fStack_19530;
  float fStack_1952c;
  float fStack_194d0;
  float fStack_194cc;
  float fStack_194c8;
  float fStack_194c4;
  float fStack_194c0;
  float fStack_194bc;
  float fStack_194b8;
  float fStack_194b4;
  float fStack_194b0;
  float fStack_194ac;
  float fStack_194a8;
  float fStack_194a4;
  float fStack_19468;
  float fStack_19464;
  float fStack_19460;
  float fStack_1945c;
  float fStack_19458;
  float fStack_19454;
  float fStack_19450;
  float fStack_1944c;
  float fStack_19448;
  float fStack_19444;
  float fStack_19440;
  float fStack_1943c;
  float fStack_19438;
  float fStack_19434;
  float fStack_19430;
  float fStack_1942c;
  float fStack_19428;
  float fStack_19424;
  float fStack_19420;
  float fStack_1941c;
  float fStack_19418;
  float fStack_19414;
  float fStack_19410;
  float fStack_1940c;
  float fStack_19408;
  float fStack_19404;
  float fStack_19400;
  float fStack_193fc;
  float fStack_193f8;
  float fStack_193f4;
  float fStack_193f0;
  float fStack_193ec;
  float fStack_1935c;
  float fStack_19358;
  float fStack_19354;
  float fStack_19350;
  float fStack_1934c;
  float fStack_19348;
  float fStack_19344;
  float fStack_19340;
  float fStack_1933c;
  float fStack_19338;
  float fStack_19334;
  float fStack_19330;
  float fStack_1932c;
  float fStack_19328;
  float fStack_19324;
  float fStack_19320;
  float fStack_1931c;
  float fStack_19318;
  float fStack_19314;
  float fStack_19310;
  float fStack_1930c;
  float fStack_19308;
  float fStack_19304;
  float fStack_19300;
  float fStack_192fc;
  float fStack_192f8;
  float fStack_192b8;
  float fStack_192b4;
  float fStack_192b0;
  float fStack_192ac;
  float fStack_192a8;
  float fStack_192a4;
  float fStack_192a0;
  float fStack_1929c;
  float fStack_19298;
  float fStack_19294;
  float fStack_19290;
  float fStack_1928c;
  float fStack_19288;
  float fStack_19284;
  float fStack_19280;
  float fStack_1927c;
  float fStack_191e8;
  float fStack_191e4;
  float fStack_191e0;
  float fStack_191dc;
  float fStack_191d8;
  float fStack_191d4;
  float fStack_191d0;
  float fStack_191cc;
  float fStack_191c8;
  float fStack_191c4;
  float fStack_191c0;
  float fStack_191bc;
  float fStack_19144;
  float fStack_19140;
  float fStack_1913c;
  float fStack_19138;
  float fStack_19134;
  float fStack_19130;
  float fStack_1912c;
  float fStack_19128;
  float fStack_19124;
  float fStack_19120;
  float fStack_1911c;
  float fStack_19118;
  float fStack_19114;
  float fStack_19110;
  float fStack_1910c;
  float fStack_1909c;
  float fStack_19098;
  float fStack_19094;
  float fStack_19090;
  float fStack_1908c;
  float fStack_19088;
  float fStack_19084;
  float fStack_19080;
  float fStack_1907c;
  float fStack_19078;
  float fStack_1900c;
  float fStack_19008;
  float fStack_19004;
  float fStack_19000;
  float fStack_18ffc;
  float fStack_18ff8;
  float fStack_18ff4;
  float fStack_18ff0;
  float fStack_18fec;
  float fStack_18fe8;
  float fStack_18fe4;
  float fStack_18fe0;
  float fStack_18fdc;
  float fStack_18fd8;
  float fStack_18fd4;
  float fStack_18fd0;
  float fStack_18fcc;
  float fStack_18fc8;
  float fStack_18fc4;
  float fStack_18fc0;
  float fStack_18fbc;
  float fStack_18fb8;
  float fStack_18fb4;
  float fStack_18fb0;
  float fStack_18fac;
  float fStack_18fa8;
  float fStack_18fa4;
  float fStack_18fa0;
  float fStack_18f9c;
  float fStack_18f98;
  float fStack_18f58;
  float fStack_18f54;
  float fStack_18f50;
  float fStack_18f4c;
  float fStack_18f48;
  float fStack_18f44;
  float fStack_18f40;
  float fStack_18f3c;
  float fStack_18f38;
  float fStack_18f34;
  float fStack_18f30;
  float fStack_18f2c;
  float fStack_18f28;
  float fStack_18f24;
  float fStack_18f20;
  float fStack_18f1c;
  float fStack_18f18;
  float fStack_18f14;
  float fStack_18f10;
  float fStack_18f0c;
  float fStack_18f08;
  float fStack_18f04;
  float fStack_18ed0;
  float fStack_18ecc;
  float fStack_18ec8;
  float fStack_18ec4;
  float fStack_18ec0;
  float fStack_18ebc;
  float fStack_18eb8;
  float fStack_18eb4;
  float fStack_18eb0;
  float fStack_18eac;
  float fStack_18ea8;
  float fStack_18ea4;
  float fStack_18ea0;
  float fStack_18e9c;
  float fStack_18e98;
  float fStack_18e94;
  float fStack_18e90;
  float fStack_18e8c;
  float fStack_18e88;
  float fStack_18e84;
  float fStack_18e80;
  float fStack_18e7c;
  float fStack_18e78;
  float fStack_18e74;
  float fStack_18e70;
  float fStack_18e6c;
  float fStack_18e68;
  float fStack_18e64;
  float fStack_18e60;
  float fStack_18e5c;
  float fStack_18e58;
  float fStack_18e54;
  float fStack_18e50;
  float fStack_18e4c;
  float fStack_18e48;
  float fStack_18e44;
  float fStack_18e40;
  float fStack_18e3c;
  float fStack_18e38;
  float fStack_18e34;
  float fStack_18e30;
  float fStack_18e2c;
  float fStack_18e28;
  float fStack_18e24;
  float fStack_18e18;
  float fStack_18e14;
  float fStack_18e10;
  float fStack_18e0c;
  float fStack_18e08;
  float fStack_18e04;
  float fStack_18de4;
  float fStack_18de0;
  float fStack_18ddc;
  float fStack_18dd8;
  float fStack_18dd4;
  float fStack_18dd0;
  float fStack_18dcc;
  float fStack_18dc8;
  float fStack_18dc4;
  float fStack_18dc0;
  float fStack_18dbc;
  float fStack_18db8;
  float fStack_18db4;
  float fStack_18db0;
  float fStack_18dac;
  float fStack_18da8;
  float fStack_18da4;
  float fStack_18da0;
  float fStack_18d9c;
  float fStack_18d98;
  float fStack_18d94;
  float fStack_18d90;
  float fStack_18d5c;
  float fStack_18d58;
  float fStack_18d54;
  float fStack_18d50;
  float fStack_18d4c;
  float fStack_18d48;
  float fStack_18d44;
  float fStack_18d40;
  float fStack_18d3c;
  float fStack_18d38;
  float fStack_18d34;
  float fStack_18d30;
  float fStack_18d2c;
  float fStack_18d28;
  float fStack_18d24;
  float fStack_18d20;
  float fStack_18d1c;
  float fStack_18d18;
  float fStack_18d14;
  float fStack_18d10;
  float fStack_18d0c;
  float fStack_18d08;
  float fStack_18d04;
  float fStack_18d00;
  float fStack_18cfc;
  float fStack_18cf8;
  float fStack_18cf4;
  float fStack_18cf0;
  float fStack_18cec;
  float fStack_18ce8;
  float fStack_18ce4;
  float fStack_18ce0;
  float fStack_18cdc;
  float fStack_18cd8;
  float fStack_18cd4;
  float fStack_18cd0;
  float fStack_18ccc;
  float fStack_18cc8;
  float fStack_18cc4;
  float fStack_18cc0;
  float fStack_18cbc;
  float fStack_18cb8;
  float fStack_18cb4;
  float fStack_18cb0;
  float fStack_18ca4;
  float fStack_18ca0;
  float fStack_18c9c;
  float fStack_18c98;
  float fStack_18c94;
  float fStack_18c90;
  float fStack_18c70;
  float fStack_18c6c;
  float fStack_18c68;
  float fStack_18c64;
  float fStack_18c60;
  float fStack_18c5c;
  float fStack_18c58;
  float fStack_18c54;
  float fStack_18c50;
  float fStack_18c4c;
  float fStack_18c48;
  float fStack_18c44;
  float fStack_18be8;
  float fStack_18be4;
  float fStack_18be0;
  float fStack_18bdc;
  float fStack_18bd8;
  float fStack_18bd4;
  float fStack_18bd0;
  float fStack_18bcc;
  float fStack_18bc8;
  float fStack_18bc4;
  float fStack_18bc0;
  float fStack_18bbc;
  float fStack_18bb8;
  float fStack_18bb4;
  float fStack_18bb0;
  float fStack_18bac;
  float fStack_18ba8;
  float fStack_18ba4;
  float fStack_18ba0;
  float fStack_18b9c;
  float fStack_18b98;
  float fStack_18b94;
  float fStack_18b90;
  float fStack_18b8c;
  float fStack_18b88;
  float fStack_18b84;
  float fStack_18b80;
  float fStack_18b7c;
  float fStack_18b78;
  float fStack_18b74;
  float fStack_18b70;
  float fStack_18b6c;
  float fStack_18b68;
  float fStack_18b64;
  float fStack_18b60;
  float fStack_18b5c;
  float fStack_18b58;
  float fStack_18b54;
  float fStack_18b50;
  float fStack_18b4c;
  float fStack_18b48;
  float fStack_18b44;
  float fStack_18b40;
  float fStack_18b3c;
  float fStack_18b30;
  float fStack_18b2c;
  float fStack_18b28;
  float fStack_18b24;
  float fStack_18b20;
  float fStack_18b1c;
  float fStack_18a74;
  float fStack_18a70;
  float fStack_18a6c;
  float fStack_18a68;
  float fStack_18a64;
  float fStack_18a60;
  float fStack_18a5c;
  float fStack_18a58;
  float fStack_18a54;
  float fStack_18a50;
  float fStack_18a4c;
  float fStack_18a48;
  float fStack_18a44;
  float fStack_18a40;
  float fStack_18a00;
  float fStack_189fc;
  float fStack_189f8;
  float fStack_189f4;
  float fStack_189f0;
  float fStack_189ec;
  float fStack_189e8;
  float fStack_189e4;
  float fStack_189e0;
  float fStack_189dc;
  float fStack_189d8;
  float fStack_189d4;
  float fStack_189d0;
  float fStack_189cc;
  float fStack_189c8;
  float fStack_189a4;
  float fStack_189a0;
  float fStack_1899c;
  float fStack_18998;
  float fStack_18994;
  float fStack_18990;
  float fStack_1898c;
  float fStack_18958;
  float fStack_18954;
  float fStack_18950;
  float fStack_1894c;
  float fStack_18948;
  float fStack_18944;
  float fStack_18940;
  float fStack_1893c;
  float fStack_18938;
  float fStack_18934;
  float fStack_18930;
  float fStack_1892c;
  float fStack_18928;
  float fStack_18924;
  float fStack_18920;
  float fStack_1891c;
  float fStack_18918;
  float fStack_18914;
  float fStack_18910;
  float fStack_1890c;
  float fStack_18908;
  float fStack_18904;
  float fStack_188c8;
  float fStack_188c4;
  float fStack_188c0;
  float fStack_188bc;
  float fStack_188b8;
  float fStack_188b4;
  float fStack_188b0;
  float fStack_188ac;
  float fStack_188a8;
  float fStack_188a4;
  float fStack_188a0;
  float fStack_1889c;
  float fStack_18898;
  float fStack_18894;
  float fStack_18890;
  float fStack_1888c;
  float fStack_18888;
  float fStack_18884;
  float fStack_18880;
  float fStack_1887c;
  float fStack_18878;
  float fStack_18874;
  float fStack_18870;
  float fStack_1886c;
  float fStack_18868;
  float fStack_18864;
  float fStack_18860;
  float fStack_1885c;
  float fStack_18858;
  float fStack_18854;
  float fStack_1884c;
  float fStack_18830;
  float fStack_1882c;
  float fStack_18828;
  float fStack_18824;
  float fStack_18820;
  float fStack_1881c;
  float fStack_18818;
  float fStack_18814;
  float fStack_18810;
  float fStack_1880c;
  float fStack_18808;
  float fStack_18804;
  float fStack_18800;
  float fStack_187fc;
  float fStack_187f8;
  float fStack_187f4;
  float fStack_187f0;
  float fStack_187ec;
  float fStack_187e8;
  float fStack_187e4;
  float fStack_187e0;
  float fStack_187dc;
  float fStack_187d8;
  float fStack_187d4;
  float fStack_187d0;
  float fStack_187cc;
  float fStack_187c8;
  float fStack_187c4;
  float fStack_187c0;
  float fStack_187bc;
  float fStack_187b8;
  float fStack_187b4;
  float fStack_187b0;
  float fStack_187ac;
  float fStack_187a8;
  float fStack_187a4;
  float fStack_187a0;
  float fStack_1879c;
  float fStack_18798;
  float fStack_18794;
  float fStack_18790;
  float fStack_1878c;
  float fStack_18788;
  float fStack_18784;
  float fStack_18780;
  float fStack_1877c;
  float fStack_18778;
  float fStack_18774;
  float fStack_18770;
  float fStack_1876c;
  float fStack_18768;
  float fStack_18764;
  float fStack_18760;
  float fStack_1875c;
  float fStack_18758;
  float fStack_18754;
  float fStack_18750;
  float fStack_1874c;
  float fStack_18748;
  float fStack_18744;
  float fStack_18740;
  float fStack_1873c;
  float fStack_18738;
  float fStack_18734;
  float fStack_18730;
  float fStack_1872c;
  float fStack_18728;
  float fStack_18724;
  float fStack_18720;
  float fStack_1871c;
  float fStack_18718;
  float fStack_18714;
  float fStack_18710;
  float fStack_1870c;
  float fStack_18708;
  float fStack_18704;
  float fStack_18700;
  float fStack_186fc;
  float fStack_186f8;
  float fStack_186f4;
  float fStack_186f0;
  float fStack_186ec;
  float fStack_186e8;
  float fStack_186e4;
  float fStack_186e0;
  float fStack_186d8;
  float fStack_186d4;
  float fStack_186d0;
  float fStack_186cc;
  float fStack_186c8;
  float fStack_186c4;
  float fStack_186c0;
  float fStack_186bc;
  float fStack_186b8;
  float fStack_186b4;
  float fStack_186b0;
  float fStack_186ac;
  float fStack_186a8;
  float fStack_186a4;
  float fStack_186a0;
  float fStack_1869c;
  float fStack_18698;
  float fStack_18694;
  float fStack_18690;
  float fStack_1868c;
  float fStack_18688;
  float fStack_18684;
  float fStack_18680;
  float fStack_1867c;
  float fStack_18678;
  float fStack_18674;
  float fStack_18648;
  float fStack_18644;
  float fStack_18640;
  float fStack_1863c;
  float fStack_18638;
  float fStack_18634;
  float fStack_18630;
  float fStack_1862c;
  float fStack_18628;
  float fStack_18624;
  float fStack_18620;
  float fStack_1861c;
  float fStack_18618;
  float fStack_18614;
  float fStack_18610;
  float fStack_1860c;
  float fStack_18608;
  float fStack_18604;
  float fStack_18600;
  float fStack_185fc;
  float fStack_185f8;
  float fStack_185f4;
  float fStack_185f0;
  float fStack_185ec;
  float fStack_185e8;
  float fStack_185e4;
  float fStack_185e0;
  float fStack_185dc;
  float fStack_185d8;
  float fStack_185d4;
  float fStack_185d0;
  float fStack_185cc;
  float fStack_185c8;
  float fStack_185c4;
  float fStack_185c0;
  float fStack_185bc;
  float fStack_185b8;
  float fStack_185b4;
  float fStack_185b0;
  float fStack_185ac;
  float fStack_185a8;
  float fStack_185a4;
  float fStack_185a0;
  float fStack_1859c;
  float fStack_18598;
  float fStack_18594;
  float fStack_18590;
  float fStack_1858c;
  float fStack_18588;
  float fStack_18584;
  float fStack_18580;
  float fStack_1857c;
  float fStack_18578;
  float fStack_18574;
  float fStack_18570;
  float fStack_1856c;
  float fStack_18564;
  float fStack_18560;
  float fStack_1855c;
  float fStack_18558;
  float fStack_18554;
  float fStack_18550;
  float fStack_1854c;
  float fStack_184d4;
  float fStack_184d0;
  float fStack_184cc;
  float fStack_184c8;
  float fStack_184c4;
  float fStack_184c0;
  float fStack_184bc;
  float fStack_184b8;
  float fStack_184b4;
  float fStack_184b0;
  float fStack_184ac;
  float fStack_184a8;
  float fStack_184a4;
  float fStack_184a0;
  float fStack_1849c;
  float fStack_18498;
  float fStack_18494;
  float fStack_18490;
  float fStack_1848c;
  float fStack_18488;
  float fStack_18484;
  float fStack_18480;
  float fStack_1847c;
  float fStack_18478;
  float fStack_18474;
  float fStack_18470;
  float fStack_18430;
  float fStack_1842c;
  float fStack_18428;
  float fStack_18424;
  float fStack_18420;
  float fStack_1841c;
  float fStack_18418;
  float fStack_18414;
  float fStack_18410;
  float fStack_1840c;
  float fStack_18408;
  float fStack_18404;
  float fStack_18400;
  float fStack_183fc;
  float fStack_183f8;
  float fStack_183f4;
  float fStack_183d4;
  float fStack_183d0;
  float fStack_183cc;
  float fStack_183c8;
  float fStack_183c4;
  float fStack_183c0;
  float fStack_183bc;
  float fStack_18388;
  float fStack_18384;
  float fStack_18380;
  float fStack_1837c;
  float fStack_18378;
  float fStack_18374;
  float fStack_18370;
  float fStack_1836c;
  float fStack_18368;
  float fStack_18364;
  float fStack_18360;
  float fStack_1835c;
  float fStack_18358;
  float fStack_18354;
  float fStack_18350;
  float fStack_1834c;
  float fStack_18348;
  float fStack_18344;
  float fStack_18340;
  float fStack_1833c;
  float fStack_18338;
  float fStack_18334;
  float fStack_182f8;
  float fStack_182f4;
  float fStack_182f0;
  float fStack_182ec;
  float fStack_182e8;
  float fStack_182e4;
  float fStack_182e0;
  float fStack_182dc;
  float fStack_182d8;
  float fStack_182d4;
  float fStack_182d0;
  float fStack_182cc;
  float fStack_182c8;
  float fStack_182c4;
  float fStack_182c0;
  float fStack_182bc;
  float fStack_182b8;
  float fStack_182b4;
  float fStack_182b0;
  float fStack_182ac;
  float fStack_182a8;
  float fStack_182a4;
  float fStack_182a0;
  float fStack_1829c;
  float fStack_18298;
  float fStack_18294;
  float fStack_18290;
  float fStack_1828c;
  float fStack_18288;
  float fStack_18284;
  float fStack_18280;
  float fStack_1827c;
  float fStack_18260;
  float fStack_1825c;
  float fStack_18258;
  float fStack_18254;
  float fStack_18250;
  float fStack_1824c;
  float fStack_18248;
  float fStack_18244;
  float fStack_18240;
  float fStack_1823c;
  float fStack_18238;
  float fStack_18234;
  float fStack_18230;
  float fStack_1822c;
  float fStack_18228;
  float fStack_18224;
  float fStack_18220;
  float fStack_1821c;
  float fStack_18218;
  float fStack_181ec;
  float fStack_181e8;
  float fStack_181e4;
  float fStack_181e0;
  float fStack_181dc;
  float fStack_181d8;
  float fStack_181d4;
  float fStack_181d0;
  float fStack_181cc;
  float fStack_181c8;
  float fStack_181c4;
  float fStack_181c0;
  float fStack_181bc;
  float fStack_181b8;
  float fStack_181b4;
  float fStack_181b0;
  float fStack_181ac;
  float fStack_181a8;
  float fStack_181a4;
  float fStack_181a0;
  float fStack_1819c;
  float fStack_18198;
  float fStack_18194;
  float fStack_18190;
  float fStack_1818c;
  float fStack_18188;
  float fStack_18184;
  float fStack_18180;
  float fStack_1817c;
  float fStack_18178;
  float fStack_18174;
  float fStack_18170;
  float fStack_1816c;
  float fStack_18168;
  float fStack_18164;
  float fStack_18160;
  float fStack_1815c;
  float fStack_18158;
  float fStack_18154;
  float fStack_18150;
  float fStack_1814c;
  float fStack_18148;
  float fStack_18144;
  float fStack_18140;
  float fStack_1813c;
  float fStack_18138;
  float fStack_18134;
  float fStack_18130;
  float fStack_1812c;
  float fStack_18128;
  float fStack_18124;
  float fStack_18120;
  float fStack_1811c;
  float fStack_18118;
  float fStack_18114;
  float fStack_18110;
  float fStack_1810c;
  float fStack_18108;
  float fStack_18104;
  float fStack_18100;
  float fStack_180fc;
  float fStack_180f8;
  float fStack_180f4;
  float fStack_180f0;
  float fStack_18078;
  float fStack_18074;
  float fStack_18070;
  float fStack_1806c;
  float fStack_18068;
  float fStack_18064;
  float fStack_18060;
  float fStack_1805c;
  float fStack_18058;
  float fStack_18054;
  float fStack_18050;
  float fStack_1804c;
  float fStack_18048;
  float fStack_18044;
  float fStack_18040;
  float fStack_1803c;
  float fStack_18038;
  float fStack_18034;
  float fStack_18030;
  float fStack_1802c;
  float fStack_18028;
  float fStack_18024;
  float fStack_18020;
  float fStack_1801c;
  float fStack_18018;
  float fStack_18014;
  float fStack_17fd4;
  float fStack_17fd0;
  float fStack_17fcc;
  float fStack_17fc8;
  float fStack_17fc4;
  float fStack_17fc0;
  float fStack_17fbc;
  float fStack_17fb8;
  float fStack_17fb4;
  float fStack_17fb0;
  float fStack_17fac;
  float fStack_17fa8;
  float fStack_17fa4;
  float fStack_17fa0;
  float fStack_17f9c;
  float fStack_17f98;
  float fStack_17f78;
  float fStack_17f74;
  float fStack_17f70;
  float fStack_17f6c;
  float fStack_17f68;
  float fStack_17f64;
  float fStack_17f60;
  float fStack_17f04;
  float fStack_17f00;
  float fStack_17efc;
  float fStack_17ef8;
  float fStack_17ef4;
  float fStack_17ef0;
  float fStack_17eec;
  float fStack_17ee8;
  float fStack_17ee4;
  float fStack_17ee0;
  float fStack_17edc;
  float fStack_17ed8;
  float fStack_17e9c;
  float fStack_17e98;
  float fStack_17e94;
  float fStack_17e90;
  float fStack_17e8c;
  float fStack_17e88;
  float fStack_17e84;
  float fStack_17e80;
  float fStack_17e7c;
  float fStack_17e78;
  float fStack_17e74;
  float fStack_17e70;
  float fStack_17e6c;
  float fStack_17e68;
  float fStack_17e64;
  float fStack_17e60;
  float fStack_17e5c;
  float fStack_17e58;
  float fStack_17e54;
  float fStack_17e50;
  float fStack_17e4c;
  float fStack_17e48;
  float fStack_17e44;
  float fStack_17e40;
  float fStack_17e3c;
  float fStack_17e38;
  float fStack_17e34;
  float fStack_17e30;
  float fStack_17e2c;
  float fStack_17e28;
  float fStack_17e24;
  float fStack_17e20;
  float fStack_17d90;
  float fStack_17d8c;
  float fStack_17d88;
  float fStack_17d84;
  float fStack_17d80;
  float fStack_17d7c;
  float fStack_17d78;
  float fStack_17d74;
  float fStack_17d70;
  float fStack_17d6c;
  float fStack_17d68;
  float fStack_17d64;
  float fStack_17d60;
  float fStack_17d5c;
  float fStack_17d58;
  float fStack_17d54;
  float fStack_17d50;
  float fStack_17d4c;
  float fStack_17d48;
  float fStack_17d44;
  float fStack_17d40;
  float fStack_17d3c;
  float fStack_17d38;
  float fStack_17d34;
  float fStack_17d30;
  float fStack_17d2c;
  float fStack_17cec;
  float fStack_17ce8;
  float fStack_17ce4;
  float fStack_17ce0;
  float fStack_17cdc;
  float fStack_17cd8;
  float fStack_17cd4;
  float fStack_17cd0;
  float fStack_17ccc;
  float fStack_17cc8;
  float fStack_17cc4;
  float fStack_17cc0;
  float fStack_17cbc;
  float fStack_17cb8;
  float fStack_17cb4;
  float fStack_17cb0;
  float fStack_17c1c;
  float fStack_17c18;
  float fStack_17c14;
  float fStack_17c10;
  float fStack_17c0c;
  float fStack_17c08;
  float fStack_17c04;
  float fStack_17c00;
  float fStack_17bfc;
  float fStack_17bf8;
  float fStack_17bf4;
  float fStack_17bf0;
  float fStack_17b78;
  float fStack_17b74;
  float fStack_17b70;
  float fStack_17b6c;
  float fStack_17b68;
  float fStack_17b64;
  float fStack_17b60;
  float fStack_17b5c;
  float fStack_17b58;
  float fStack_17b54;
  float fStack_17b50;
  float fStack_17b4c;
  float fStack_17b48;
  float fStack_17b44;
  float fStack_17b40;
  float fStack_17ad0;
  float fStack_17acc;
  float fStack_17ac8;
  float fStack_17ac4;
  float fStack_17ac0;
  float fStack_17abc;
  float fStack_17ab8;
  float fStack_17ab4;
  float fStack_17ab0;
  float fStack_17aac;
  float fStack_17a40;
  float fStack_17a3c;
  float fStack_17a38;
  float fStack_17a34;
  float fStack_17a30;
  float fStack_17a2c;
  float fStack_17a28;
  float fStack_17a24;
  float fStack_17a20;
  float fStack_17a1c;
  float fStack_17a18;
  float fStack_17a14;
  float fStack_17a10;
  float fStack_17a0c;
  float fStack_17a08;
  float fStack_17a04;
  float fStack_17a00;
  float fStack_179fc;
  float fStack_179f8;
  float fStack_179f4;
  float fStack_179f0;
  float fStack_179ec;
  float fStack_179e8;
  float fStack_179e4;
  float fStack_179e0;
  float fStack_179dc;
  float fStack_179d8;
  float fStack_179d4;
  float fStack_179d0;
  float fStack_179cc;
  float fStack_1798c;
  float fStack_17988;
  float fStack_17984;
  float fStack_17980;
  float fStack_1797c;
  float fStack_17978;
  float fStack_17974;
  float fStack_17970;
  float fStack_1796c;
  float fStack_17968;
  float fStack_17964;
  float fStack_17960;
  float fStack_1795c;
  float fStack_17958;
  float fStack_17954;
  float fStack_17950;
  float fStack_1794c;
  float fStack_17948;
  float fStack_17944;
  float fStack_17940;
  float fStack_1793c;
  float fStack_17938;
  float fStack_17904;
  float fStack_17900;
  float fStack_178fc;
  float fStack_178f8;
  float fStack_178f4;
  float fStack_178f0;
  float fStack_178ec;
  float fStack_178e8;
  float fStack_178e4;
  float fStack_178e0;
  float fStack_178dc;
  float fStack_178d8;
  float fStack_178d4;
  float fStack_178d0;
  float fStack_178cc;
  float fStack_178c8;
  float fStack_178c4;
  float fStack_178c0;
  float fStack_178bc;
  float fStack_178b8;
  float fStack_178b4;
  float fStack_178b0;
  float fStack_178ac;
  float fStack_178a8;
  float fStack_178a4;
  float fStack_178a0;
  float fStack_1789c;
  float fStack_17898;
  float fStack_17894;
  float fStack_17890;
  float fStack_1788c;
  float fStack_17888;
  float fStack_17884;
  float fStack_17880;
  float fStack_1787c;
  float fStack_17878;
  float fStack_17874;
  float fStack_17870;
  float fStack_1786c;
  float fStack_17868;
  float fStack_17864;
  float fStack_17860;
  float fStack_1785c;
  float fStack_17858;
  float fStack_1784c;
  float fStack_17848;
  float fStack_17844;
  float fStack_17840;
  float fStack_1783c;
  float fStack_17838;
  float fStack_17818;
  float fStack_17814;
  float fStack_17810;
  float fStack_1780c;
  float fStack_17808;
  float fStack_17804;
  float fStack_17800;
  float fStack_177fc;
  float fStack_177f8;
  float fStack_177f4;
  float fStack_177f0;
  float fStack_177ec;
  float fStack_17790;
  float fStack_1778c;
  float fStack_17788;
  float fStack_17784;
  float fStack_17780;
  float fStack_1777c;
  float fStack_17778;
  float fStack_17774;
  float fStack_17770;
  float fStack_1776c;
  float fStack_17768;
  float fStack_17764;
  float fStack_17760;
  float fStack_1775c;
  float fStack_17758;
  float fStack_17754;
  float fStack_17750;
  float fStack_1774c;
  float fStack_17748;
  float fStack_17744;
  float fStack_17740;
  float fStack_1773c;
  float fStack_17738;
  float fStack_17734;
  float fStack_17730;
  float fStack_1772c;
  float fStack_17728;
  float fStack_17724;
  float fStack_17720;
  float fStack_1771c;
  float fStack_17718;
  float fStack_17714;
  float fStack_17710;
  float fStack_1770c;
  float fStack_17708;
  float fStack_17704;
  float fStack_17700;
  float fStack_176fc;
  float fStack_176f8;
  float fStack_176f4;
  float fStack_176f0;
  float fStack_176ec;
  float fStack_176e8;
  float fStack_176e4;
  float fStack_176d8;
  float fStack_176d4;
  float fStack_176d0;
  float fStack_176cc;
  float fStack_176c8;
  float fStack_176c4;
  float fStack_1761c;
  float fStack_17618;
  float fStack_17614;
  float fStack_17610;
  float fStack_1760c;
  float fStack_17608;
  float fStack_17604;
  float fStack_17600;
  float fStack_175fc;
  float fStack_175f8;
  float fStack_175f4;
  float fStack_175f0;
  float fStack_175ec;
  float fStack_175e8;
  float fStack_175a8;
  float fStack_175a4;
  float fStack_175a0;
  float fStack_1759c;
  float fStack_17598;
  float fStack_17594;
  float fStack_17590;
  float fStack_1758c;
  float fStack_17588;
  float fStack_17584;
  float fStack_17580;
  float fStack_1757c;
  float fStack_17578;
  float fStack_17574;
  float fStack_17570;
  float fStack_1754c;
  float fStack_17548;
  float fStack_17544;
  float fStack_17540;
  float fStack_1753c;
  float fStack_17538;
  float fStack_17534;
  float fStack_17500;
  float fStack_174fc;
  float fStack_174f8;
  float fStack_174f4;
  float fStack_174f0;
  float fStack_174ec;
  float fStack_174e8;
  float fStack_174e4;
  float fStack_174e0;
  float fStack_174dc;
  float fStack_174d8;
  float fStack_174d4;
  float fStack_174d0;
  float fStack_174cc;
  float fStack_174c8;
  float fStack_174c4;
  float fStack_174c0;
  float fStack_174bc;
  float fStack_174b8;
  float fStack_174b4;
  float fStack_174b0;
  float fStack_174ac;
  float fStack_17470;
  float fStack_1746c;
  float fStack_17468;
  float fStack_17464;
  float fStack_17460;
  float fStack_1745c;
  float fStack_17458;
  float fStack_17454;
  float fStack_17450;
  float fStack_1744c;
  float fStack_17448;
  float fStack_17444;
  float fStack_17440;
  float fStack_1743c;
  float fStack_17438;
  float fStack_17434;
  float fStack_17430;
  float fStack_1742c;
  float fStack_17428;
  float fStack_17424;
  float fStack_17420;
  float fStack_1741c;
  float fStack_17418;
  float fStack_17414;
  float fStack_17410;
  float fStack_1740c;
  float fStack_17408;
  float fStack_17404;
  float fStack_17400;
  float fStack_173fc;
  float fStack_173f4;
  float fStack_173d8;
  float fStack_173d4;
  float fStack_173d0;
  float fStack_173cc;
  float fStack_173c8;
  float fStack_173c4;
  float fStack_173c0;
  float fStack_173bc;
  float fStack_173b8;
  float fStack_173b4;
  float fStack_173b0;
  float fStack_173ac;
  float fStack_173a8;
  float fStack_173a4;
  float fStack_173a0;
  float fStack_1739c;
  float fStack_17398;
  float fStack_17394;
  float fStack_17390;
  float fStack_17364;
  float fStack_17360;
  float fStack_1735c;
  float fStack_17358;
  float fStack_17354;
  float fStack_17350;
  float fStack_1734c;
  float fStack_17348;
  float fStack_17344;
  float fStack_17340;
  float fStack_1733c;
  float fStack_17338;
  float fStack_17334;
  float fStack_17330;
  float fStack_1732c;
  float fStack_17328;
  float fStack_17324;
  float fStack_17320;
  float fStack_1731c;
  float fStack_17318;
  float fStack_17314;
  float fStack_17310;
  float fStack_1730c;
  float fStack_17308;
  float fStack_17304;
  float fStack_17300;
  float fStack_172fc;
  float fStack_172f8;
  float fStack_172f4;
  float fStack_172f0;
  float fStack_172ec;
  float fStack_172e8;
  float fStack_172e4;
  float fStack_172e0;
  float fStack_172dc;
  float fStack_172d8;
  float fStack_172d4;
  float fStack_172d0;
  float fStack_172cc;
  float fStack_172c8;
  float fStack_172c4;
  float fStack_172c0;
  float fStack_172bc;
  float fStack_172b8;
  float fStack_172b4;
  float fStack_172b0;
  float fStack_172ac;
  float fStack_172a8;
  float fStack_172a4;
  float fStack_172a0;
  float fStack_1729c;
  float fStack_17298;
  float fStack_17294;
  float fStack_17290;
  float fStack_1728c;
  float fStack_17288;
  float fStack_17280;
  float fStack_1727c;
  float fStack_17278;
  float fStack_17274;
  float fStack_17270;
  float fStack_1726c;
  float fStack_17268;
  float fStack_171f0;
  float fStack_171ec;
  float fStack_171e8;
  float fStack_171e4;
  float fStack_171e0;
  float fStack_171dc;
  float fStack_171d8;
  float fStack_171d4;
  float fStack_171d0;
  float fStack_171cc;
  float fStack_171c8;
  float fStack_171c4;
  float fStack_171c0;
  float fStack_171bc;
  float fStack_171b8;
  float fStack_171b4;
  float fStack_171b0;
  float fStack_171ac;
  float fStack_171a8;
  float fStack_171a4;
  float fStack_171a0;
  float fStack_1719c;
  float fStack_17198;
  float fStack_17194;
  float fStack_17190;
  float fStack_1718c;
  float fStack_1714c;
  float fStack_17148;
  float fStack_17144;
  float fStack_17140;
  float fStack_1713c;
  float fStack_17138;
  float fStack_17134;
  float fStack_17130;
  float fStack_1712c;
  float fStack_17128;
  float fStack_17124;
  float fStack_17120;
  float fStack_1711c;
  float fStack_17118;
  float fStack_17114;
  float fStack_17110;
  float fStack_170f0;
  float fStack_170ec;
  float fStack_170e8;
  float fStack_170e4;
  float fStack_170e0;
  float fStack_170dc;
  float fStack_170d8;
  float fStack_1707c;
  float fStack_17078;
  float fStack_17074;
  float fStack_17070;
  float fStack_1706c;
  float fStack_17068;
  float fStack_17064;
  float fStack_17060;
  float fStack_1705c;
  float fStack_17058;
  float fStack_17054;
  float fStack_17050;
  float fStack_17014;
  float fStack_17010;
  float fStack_1700c;
  float fStack_17008;
  float fStack_17004;
  float fStack_17000;
  float fStack_16ffc;
  float fStack_16ff8;
  float fStack_16ff4;
  float fStack_16ff0;
  float fStack_16fec;
  float fStack_16fe8;
  float fStack_16fe4;
  float fStack_16fe0;
  float fStack_16fdc;
  float fStack_16fd8;
  float fStack_16fd4;
  float fStack_16fd0;
  float fStack_16fcc;
  float fStack_16fc8;
  float fStack_16fc4;
  float fStack_16fc0;
  float fStack_16fbc;
  float fStack_16fb8;
  float fStack_16fb4;
  float fStack_16fb0;
  float fStack_16fac;
  float fStack_16fa8;
  float fStack_16fa4;
  float fStack_16fa0;
  float fStack_16f9c;
  float fStack_16f98;
  float fStack_16f08;
  float fStack_16f04;
  float fStack_16f00;
  float fStack_16efc;
  float fStack_16ef8;
  float fStack_16ef4;
  float fStack_16ef0;
  float fStack_16eec;
  float fStack_16ee8;
  float fStack_16ee4;
  float fStack_16ee0;
  float fStack_16edc;
  float fStack_16ed8;
  float fStack_16ed4;
  float fStack_16ed0;
  float fStack_16ecc;
  float fStack_16ec8;
  float fStack_16ec4;
  float fStack_16ec0;
  float fStack_16ebc;
  float fStack_16eb8;
  float fStack_16eb4;
  float fStack_16eb0;
  float fStack_16eac;
  float fStack_16ea8;
  float fStack_16ea4;
  float fStack_16e64;
  float fStack_16e60;
  float fStack_16e5c;
  float fStack_16e58;
  float fStack_16e54;
  float fStack_16e50;
  float fStack_16e4c;
  float fStack_16e48;
  float fStack_16e44;
  float fStack_16e40;
  float fStack_16e3c;
  float fStack_16e38;
  float fStack_16e34;
  float fStack_16e30;
  float fStack_16e2c;
  float fStack_16e28;
  float fStack_16d94;
  float fStack_16d90;
  float fStack_16d8c;
  float fStack_16d88;
  float fStack_16d84;
  float fStack_16d80;
  float fStack_16d7c;
  float fStack_16d78;
  float fStack_16d74;
  float fStack_16d70;
  float fStack_16d6c;
  float fStack_16d68;
  float fStack_16cf0;
  float fStack_16cec;
  float fStack_16ce8;
  float fStack_16ce4;
  float fStack_16ce0;
  float fStack_16cdc;
  float fStack_16cd8;
  float fStack_16cd4;
  float fStack_16cd0;
  float fStack_16ccc;
  float fStack_16cc8;
  float fStack_16cc4;
  float fStack_16cc0;
  float fStack_16cbc;
  float fStack_16cb8;
  float fStack_16c48;
  float fStack_16c44;
  float fStack_16c40;
  float fStack_16c3c;
  float fStack_16c38;
  float fStack_16c34;
  float fStack_16c30;
  float fStack_16c2c;
  float fStack_16c28;
  float fStack_16c24;
  float fStack_16bb8;
  float fStack_16bb4;
  float fStack_16bb0;
  float fStack_16bac;
  float fStack_16ba8;
  float fStack_16ba4;
  float fStack_16ba0;
  float fStack_16b9c;
  float fStack_16b98;
  float fStack_16b94;
  float fStack_16b90;
  float fStack_16b8c;
  float fStack_16b88;
  float fStack_16b84;
  float fStack_16b80;
  float fStack_16b7c;
  float fStack_16b78;
  float fStack_16b74;
  float fStack_16b70;
  float fStack_16b6c;
  float fStack_16b68;
  float fStack_16b64;
  float fStack_16b60;
  float fStack_16b5c;
  float fStack_16b58;
  float fStack_16b54;
  float fStack_16b50;
  float fStack_16b4c;
  float fStack_16b48;
  float fStack_16b44;
  float fStack_16b04;
  float fStack_16b00;
  float fStack_16afc;
  float fStack_16af8;
  float fStack_16af4;
  float fStack_16af0;
  float fStack_16aec;
  float fStack_16ae8;
  float fStack_16ae4;
  float fStack_16ae0;
  float fStack_16adc;
  float fStack_16ad8;
  float fStack_16a7c;
  float fStack_16a78;
  float fStack_16a74;
  float fStack_16a70;
  float fStack_16a6c;
  float fStack_16a68;
  float fStack_16a64;
  float fStack_16a60;
  float fStack_16a5c;
  float fStack_16a58;
  float fStack_16a54;
  float fStack_16a50;
  float fStack_16a4c;
  float fStack_16a48;
  float fStack_16a44;
  float fStack_16a40;
  float fStack_16a3c;
  float fStack_16a38;
  float fStack_16a34;
  float fStack_16a30;
  float fStack_16a2c;
  float fStack_16a28;
  float fStack_16a24;
  float fStack_16a20;
  float fStack_16a1c;
  float fStack_16a18;
  float fStack_16a14;
  float fStack_16a10;
  float fStack_16a0c;
  float fStack_16a08;
  float fStack_16a04;
  float fStack_16a00;
  float fStack_169fc;
  float fStack_169f8;
  float fStack_169f4;
  float fStack_169f0;
  float fStack_169ec;
  float fStack_169e8;
  float fStack_169e4;
  float fStack_169e0;
  float fStack_169dc;
  float fStack_169d8;
  float fStack_169d4;
  float fStack_169d0;
  float fStack_169c4;
  float fStack_169c0;
  float fStack_169bc;
  float fStack_169b8;
  float fStack_169b4;
  float fStack_169b0;
  float fStack_16908;
  float fStack_16904;
  float fStack_16900;
  float fStack_168fc;
  float fStack_168f8;
  float fStack_168f4;
  float fStack_168f0;
  float fStack_168ec;
  float fStack_168e8;
  float fStack_168e4;
  float fStack_168e0;
  float fStack_168dc;
  float fStack_168d8;
  float fStack_168d4;
  float fStack_16894;
  float fStack_16890;
  float fStack_1688c;
  float fStack_16888;
  float fStack_16884;
  float fStack_16880;
  float fStack_1687c;
  float fStack_16878;
  float fStack_16874;
  float fStack_16870;
  float fStack_1686c;
  float fStack_16868;
  float fStack_16864;
  float fStack_16860;
  float fStack_1685c;
  float fStack_16838;
  float fStack_16834;
  float fStack_16830;
  float fStack_1682c;
  float fStack_16828;
  float fStack_16824;
  float fStack_16820;
  float fStack_167c4;
  float fStack_167c0;
  float fStack_167bc;
  float fStack_167b8;
  float fStack_167b4;
  float fStack_167b0;
  float fStack_167ac;
  float fStack_167a8;
  float fStack_167a4;
  float fStack_167a0;
  float fStack_1679c;
  float fStack_16798;
  float fStack_1675c;
  float fStack_16758;
  float fStack_16754;
  float fStack_16750;
  float fStack_1674c;
  float fStack_16748;
  float fStack_16744;
  float fStack_16740;
  float fStack_1673c;
  float fStack_16738;
  float fStack_16734;
  float fStack_16730;
  float fStack_1672c;
  float fStack_16728;
  float fStack_16724;
  float fStack_16720;
  float fStack_1671c;
  float fStack_16718;
  float fStack_16714;
  float fStack_16710;
  float fStack_1670c;
  float fStack_16708;
  float fStack_16704;
  float fStack_16700;
  float fStack_166fc;
  float fStack_166f8;
  float fStack_166f4;
  float fStack_166f0;
  float fStack_166ec;
  float fStack_166e8;
  float fStack_166e0;
  float fStack_16650;
  float fStack_1664c;
  float fStack_16648;
  float fStack_16644;
  float fStack_16640;
  float fStack_1663c;
  float fStack_16638;
  float fStack_16634;
  float fStack_16630;
  float fStack_1662c;
  float fStack_16628;
  float fStack_16624;
  float fStack_16620;
  float fStack_1661c;
  float fStack_16618;
  float fStack_16614;
  float fStack_16610;
  float fStack_1660c;
  float fStack_16608;
  float fStack_16604;
  float fStack_16600;
  float fStack_165fc;
  float fStack_165f8;
  float fStack_165f4;
  float fStack_165f0;
  float fStack_165ec;
  float fStack_165ac;
  float fStack_165a8;
  float fStack_165a4;
  float fStack_165a0;
  float fStack_1659c;
  float fStack_16598;
  float fStack_16594;
  float fStack_16590;
  float fStack_1658c;
  float fStack_16588;
  float fStack_16584;
  float fStack_16580;
  float fStack_1657c;
  float fStack_16578;
  float fStack_16574;
  float fStack_16570;
  float fStack_164dc;
  float fStack_164d8;
  float fStack_164d4;
  float fStack_164d0;
  float fStack_164cc;
  float fStack_164c8;
  float fStack_164c4;
  float fStack_164c0;
  float fStack_164bc;
  float fStack_164b8;
  float fStack_164b4;
  float fStack_164b0;
  float fStack_16438;
  float fStack_16434;
  float fStack_16430;
  float fStack_1642c;
  float fStack_16428;
  float fStack_16424;
  float fStack_16420;
  float fStack_1641c;
  float fStack_16418;
  float fStack_16414;
  float fStack_16410;
  float fStack_1640c;
  float fStack_16408;
  float fStack_16404;
  float fStack_16400;
  float fStack_16300;
  float fStack_162fc;
  float fStack_162f8;
  float fStack_162f4;
  float fStack_162f0;
  float fStack_162ec;
  float fStack_162e8;
  float fStack_162e4;
  float fStack_162e0;
  float fStack_162dc;
  float fStack_162d8;
  float fStack_162d4;
  float fStack_162d0;
  float fStack_162cc;
  float fStack_162c8;
  float fStack_162c4;
  float fStack_162c0;
  float fStack_162bc;
  float fStack_162b8;
  float fStack_162b4;
  float fStack_162b0;
  float fStack_162ac;
  float fStack_162a8;
  float fStack_162a4;
  float fStack_162a0;
  float fStack_1629c;
  float fStack_16298;
  float fStack_16294;
  float fStack_16290;
  float fStack_1628c;
  float fStack_161c4;
  float fStack_161c0;
  float fStack_161bc;
  float fStack_161b8;
  float fStack_161b4;
  float fStack_161b0;
  float fStack_161ac;
  float fStack_161a8;
  float fStack_161a4;
  float fStack_161a0;
  float fStack_1619c;
  float fStack_16198;
  float fStack_16194;
  float fStack_16190;
  float fStack_16150;
  float fStack_1614c;
  float fStack_16148;
  float fStack_16144;
  float fStack_16140;
  float fStack_1613c;
  float fStack_16138;
  float fStack_16134;
  float fStack_16130;
  float fStack_1612c;
  float fStack_16128;
  float fStack_16124;
  float fStack_16120;
  float fStack_1611c;
  float fStack_16118;
  float fStack_16080;
  float fStack_1607c;
  float fStack_16078;
  float fStack_16074;
  float fStack_16070;
  float fStack_1606c;
  float fStack_16068;
  float fStack_16064;
  float fStack_16060;
  float fStack_1605c;
  float fStack_16058;
  float fStack_16054;
  float fStack_15fdc;
  float fStack_15fd8;
  float fStack_15fd4;
  float fStack_15fd0;
  float fStack_15fcc;
  float fStack_15fc8;
  float fStack_15fc4;
  float fStack_15fc0;
  float fStack_15fbc;
  float fStack_15fb8;
  float fStack_15fb4;
  float fStack_15fb0;
  float fStack_15fac;
  float fStack_15fa8;
  float fStack_15fa4;
  undefined8 auStack_15f08 [20];
  float fStack_15e68;
  float fStack_15e64;
  float fStack_15e60;
  float fStack_15e5c;
  float fStack_15e58;
  float fStack_15e54;
  float fStack_15e50;
  float fStack_15e4c;
  float fStack_15e48;
  float fStack_15e44;
  float fStack_15e40;
  float fStack_15e3c;
  float fStack_15e38;
  float fStack_15e34;
  float afStack_15e30 [2];
  Matrix<float,_60,_15,_0,_60,_15> MStack_15e28;
  vector<float,_std::allocator<float>_> avStack_15018 [90];
  Matrix<float,_15,_15,_0,_15,_15> MStack_1479c;
  undefined1 auStack_14418 [24];
  float afStack_14400 [5890];
  undefined8 auStack_e7f8 [28];
  Matrix<float,_60,_84,_0,_60,_84> local_e718;
  Matrix<float,_15,_60,_0,_15,_60> local_9858;
  Scalar local_8a44 [8835];
  undefined4 local_38;
  undefined1 local_34;
  char local_33;
  
  uVar15 = 0;
  pvStack_24368 = L2;
  pfStack_24288 = (float *)Action;
  memset(avStack_15018,0,0x870);
  do {
    lVar16 = 0;
    uVar20 = 0;
    do {
      if (uVar15 != uVar20) {
        pMVar1 = (L1->
                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pMVar2 = (pvStack_24368->
                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar11 = (long)(int)((int)uVar20 - (uint)(uVar15 < uVar20));
        fillRow1<float>(pMVar1 + uVar15,pMVar2 + uVar15,
                        (Matrix<float,_6,_1,_0,_6,_1> *)
                        ((long)&(pMVar1->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                ).m_storage.m_data + lVar16),
                        (Matrix<float,_6,_1,_0,_6,_1> *)
                        ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                ).m_storage.m_data + lVar16),
                        avStack_15018 + uVar15 * 0xf + lVar11 * 3,
                        avStack_15018 + uVar15 * 0xf + lVar11 * 3 + 1,
                        avStack_15018 + uVar15 * 0xf + lVar11 * 3 + 2);
      }
      uVar20 = uVar20 + 1;
      lVar16 = lVar16 + 0x18;
    } while (uVar20 != 6);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 6);
  row_00 = 0;
  memset(&local_e718,0,0x4ec0);
  iVar18 = 1;
  iVar14 = 2;
  iVar17 = 0;
  iVar19 = 0;
  do {
    fillRow2<float>(&local_e718,row_00,
                    (vector<float,_std::allocator<float>_> (*) [3])
                    (avStack_15018 + (long)iVar19 * 0xf + (long)iVar17 * 3),
                    (vector<float,_std::allocator<float>_> (*) [3])
                    (avStack_15018 + (long)iVar19 * 0xf + (long)iVar18 * 3),
                    (vector<float,_std::allocator<float>_> (*) [3])
                    (avStack_15018 + (long)iVar19 * 0xf + (long)iVar14 * 3));
    if (iVar14 < 4) {
      iVar14 = iVar14 + 1;
    }
    else if (iVar18 < 3) {
      iVar14 = iVar18 + 2;
      iVar18 = iVar18 + 1;
    }
    else if (iVar17 < 2) {
      iVar18 = iVar17 + 2;
      iVar14 = iVar17 + 3;
      iVar17 = iVar17 + 1;
    }
    else {
      iVar19 = iVar19 + 1;
      iVar14 = 2;
      iVar17 = 0;
      iVar18 = 1;
    }
    row_00 = row_00 + 1;
  } while (row_00 != 0x3c);
  lVar16 = 0xe0;
  do {
    uVar4 = *(undefined8 *)((long)auStack_e7f8 + lVar16 + 8);
    uVar5 = *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0x10);
    uVar6 = *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0x18);
    uVar7 = *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0x20);
    uVar8 = *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0x28);
    uVar9 = *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0x30);
    uVar10 = *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0x38);
    *(undefined8 *)((long)auStack_15f08 + lVar16) = *(undefined8 *)((long)auStack_e7f8 + lVar16);
    *(undefined8 *)((long)auStack_15f08 + lVar16 + 8) = uVar4;
    *(undefined8 *)((long)auStack_15f08 + lVar16 + 0x10) = uVar5;
    *(undefined8 *)((long)auStack_15f08 + lVar16 + 0x18) = uVar6;
    *(undefined8 *)((long)auStack_15f08 + lVar16 + 0x20) = uVar7;
    *(undefined8 *)((long)auStack_15f08 + lVar16 + 0x28) = uVar8;
    *(undefined8 *)((long)auStack_15f08 + lVar16 + 0x30) = uVar9;
    *(undefined8 *)((long)auStack_15f08 + lVar16 + 0x38) = uVar10;
    uVar4 = *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0x48);
    *(undefined8 *)((long)auStack_15f08 + lVar16 + 0x40) =
         *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0x40);
    *(undefined8 *)((long)auStack_15f08 + lVar16 + 0x48) = uVar4;
    uVar4 = *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0x58);
    *(undefined8 *)((long)auStack_15f08 + lVar16 + 0x50) =
         *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0x50);
    *(undefined8 *)((long)auStack_15f08 + lVar16 + 0x58) = uVar4;
    uVar4 = *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0x68);
    *(undefined8 *)((long)auStack_15f08 + lVar16 + 0x60) =
         *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0x60);
    *(undefined8 *)((long)auStack_15f08 + lVar16 + 0x68) = uVar4;
    uVar4 = *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0x78);
    *(undefined8 *)((long)auStack_15f08 + lVar16 + 0x70) =
         *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0x70);
    *(undefined8 *)((long)auStack_15f08 + lVar16 + 0x78) = uVar4;
    uVar4 = *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0x88);
    *(undefined8 *)((long)auStack_15f08 + lVar16 + 0x80) =
         *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0x80);
    *(undefined8 *)((long)auStack_15f08 + lVar16 + 0x88) = uVar4;
    uVar4 = *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0x98);
    *(undefined8 *)((long)auStack_15f08 + lVar16 + 0x90) =
         *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0x90);
    *(undefined8 *)((long)auStack_15f08 + lVar16 + 0x98) = uVar4;
    uVar4 = *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0xa8);
    uVar5 = *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0xb0);
    uVar6 = *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0xb8);
    uVar7 = *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0xc0);
    uVar8 = *(undefined8 *)((long)auStack_e7f8 + lVar16 + 200);
    uVar9 = *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0xd0);
    uVar10 = *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0xd8);
    *(undefined8 *)((long)&fStack_15e68 + lVar16) =
         *(undefined8 *)((long)auStack_e7f8 + lVar16 + 0xa0);
    *(undefined8 *)((long)&fStack_15e60 + lVar16) = uVar4;
    *(undefined8 *)((long)&fStack_15e58 + lVar16) = uVar5;
    *(undefined8 *)((long)&fStack_15e50 + lVar16) = uVar6;
    *(undefined8 *)((long)&fStack_15e48 + lVar16) = uVar7;
    *(undefined8 *)((long)&fStack_15e40 + lVar16) = uVar8;
    *(undefined8 *)((long)&fStack_15e38 + lVar16) = uVar9;
    *(undefined8 *)((long)afStack_15e30 + lVar16) = uVar10;
    uVar4 = *(undefined8 *)
             ((long)local_e718.super_PlainObjectBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>_>.
                    m_storage.m_data.array + lVar16 + 8);
    *(undefined8 *)
     ((long)MStack_15e28.super_PlainObjectBase<Eigen::Matrix<float,_60,_15,_0,_60,_15>_>.m_storage.
            m_data.array + lVar16) =
         *(undefined8 *)
          ((long)local_e718.super_PlainObjectBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>_>.
                 m_storage.m_data.array + lVar16);
    *(undefined8 *)
     ((long)MStack_15e28.super_PlainObjectBase<Eigen::Matrix<float,_60,_15,_0,_60,_15>_>.m_storage.
            m_data.array + lVar16 + 8) = uVar4;
    lVar16 = lVar16 + 0xf0;
  } while (lVar16 != 0xef0);
  pfVar12 = local_9858.super_PlainObjectBase<Eigen::Matrix<float,_15,_60,_0,_15,_60>_>.m_storage.
            m_data.array + 0xe;
  lVar16 = 0;
  do {
    ((plain_array<float,_900,_0,_16> *)(pfVar12 + -0xe))->array[0] =
         MStack_15e28.super_PlainObjectBase<Eigen::Matrix<float,_60,_15,_0,_60,_15>_>.m_storage.
         m_data.array[lVar16];
    pfVar12[-0xd] =
         *(float *)((long)&avStack_15018[-0x8c].super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar16 * 4);
    pfVar12[-0xc] =
         *(float *)((long)&avStack_15018[-0x82].super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar16 * 4);
    pfVar12[-0xb] =
         *(float *)((long)&avStack_15018[-0x78].super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar16 * 4);
    pfVar12[-10] = *(float *)((long)&avStack_15018[-0x6e].
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar16 * 4);
    pfVar12[-9] = *(float *)((long)&avStack_15018[-100].
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar16 * 4);
    pfVar12[-8] = *(float *)((long)&avStack_15018[-0x5a].
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar16 * 4);
    pfVar12[-7] = *(float *)((long)&avStack_15018[-0x50].
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar16 * 4);
    pfVar12[-6] = *(float *)((long)&avStack_15018[-0x46].
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar16 * 4);
    pfVar12[-5] = *(float *)((long)&avStack_15018[-0x3c].
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar16 * 4);
    pfVar12[-4] = *(float *)((long)&avStack_15018[-0x32].
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar16 * 4);
    pfVar12[-3] = *(float *)((long)&avStack_15018[-0x28].
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar16 * 4);
    pfVar12[-2] = *(float *)((long)&avStack_15018[-0x1e].
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar16 * 4);
    pfVar12[-1] = *(float *)((long)&avStack_15018[-0x14].
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar16 * 4);
    *pfVar12 = *(float *)((long)&avStack_15018[-10].
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar16 * 4);
    lVar16 = lVar16 + 1;
    pfVar12 = pfVar12 + 0xf;
  } while (lVar16 != 0x3c);
  memset(&MStack_1479c,0,900);
  PStack_24250.m_lhs.m_xpr._0_4_ = 0x3f800000;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<float,15,60,0,15,60>,Eigen::Matrix<float,60,15,0,60,15>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<float,15,15,0,15,15>>
            (&MStack_1479c,&local_9858,&MStack_15e28,(Scalar *)&PStack_24250);
  PStack_24250.m_lhs.m_xpr = &MStack_1479c;
  PStack_24250.m_rhs = &local_9858;
  pMStack_24240 = &local_e718;
  memset(&MStack_25718,0,0x13b0);
  local_8a44[0] = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,15,15,0,15,15>>,Eigen::Matrix<float,15,60,0,15,60>,0>,Eigen::Matrix<float,60,84,0,60,84>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<float,15,84,0,15,84>>
            (&MStack_25718,&PStack_24250,&local_e718,local_8a44);
  memset(&PStack_24250,0,0xe424);
  pvStack_24368 =
       (vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
        *)CONCAT44(pvStack_24368._4_4_,
                   MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                   m_storage.m_data.array[0xe0]);
  fStack_2428c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xef];
  fStack_220e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe0];
  fStack_21f70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xef];
  fStack_24290 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfe];
  fStack_21dfc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfe];
  fStack_24294 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10d];
  fStack_21c88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10d];
  fStack_24298 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11c];
  fStack_21b14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11c];
  fStack_2429c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[299];
  fStack_219a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[299];
  fStack_242a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13a];
  fStack_2182c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13a];
  fStack_242a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x149];
  fStack_216b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x149];
  fStack_242a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x158];
  fStack_21544 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x158];
  fStack_242ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x167];
  fStack_242b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x176];
  fStack_213d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x167];
  fStack_2125c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x176];
  fStack_242b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x185];
  fStack_210e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x185];
  fStack_242b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x194];
  fStack_20f74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x194];
  fStack_242bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a3];
  fStack_20e00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a3];
  fStack_242c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b2];
  fStack_1f6c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b2];
  fStack_242c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c1];
  fStack_1f54c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c1];
  fStack_242c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d0];
  fStack_1f3d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d0];
  fStack_242cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1df];
  fStack_1f264 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1df];
  fStack_242d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ee];
  fStack_1f0f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ee];
  fStack_242d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fd];
  fStack_1ef7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fd];
  fStack_242d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20c];
  fStack_1ee08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20c];
  fStack_242dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21b];
  fStack_1ec94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21b];
  fStack_242e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22a];
  fStack_1eb20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22a];
  fStack_242e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x239];
  fStack_1e9ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x239];
  fStack_242e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x248];
  fStack_1e838 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x248];
  fStack_242ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[599];
  fStack_1e6c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[599];
  fStack_242f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x266];
  fStack_1e550 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x266];
  fStack_242f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x275];
  fStack_1e3dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x275];
  fStack_242f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x284];
  fStack_1e268 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x284];
  fStack_242fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x293];
  fStack_1e0f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x293];
  fStack_24300 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a2];
  fStack_1df80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a2];
  fStack_24304 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b1];
  fStack_1de0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b1];
  fStack_24308 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c0];
  fStack_1dc98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c0];
  fStack_2430c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cf];
  fStack_1db24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cf];
  fStack_24310 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ed];
  fStack_1c6cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ed];
  fStack_24314 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fc];
  fStack_1c558 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fc];
  fStack_24318 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30b];
  fStack_1c3e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30b];
  fStack_2431c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31a];
  fStack_1c270 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31a];
  fStack_24320 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x329];
  fStack_1c0fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x329];
  fStack_24324 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x338];
  fStack_1bf88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x338];
  fStack_24328 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x347];
  fStack_1be14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x347];
  fStack_2432c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x356];
  fStack_1bca0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x356];
  fStack_2434c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2de];
  afStack_1bb2c[0] =
       MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
       .array[0x2de];
  fStack_24330 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x365];
  fStack_1b9b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x365];
  fStack_24334 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x374];
  fStack_1b844 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x374];
  fStack_24338 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[899];
  fStack_1b6d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[899];
  fStack_2433c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x392];
  fStack_1b55c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x392];
  fStack_24340 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a1];
  fStack_1b3e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a1];
  fStack_24344 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b0];
  fStack_1b274 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b0];
  fStack_24348 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bf];
  fStack_1b100 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bf];
  fStack_24350 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ce];
  fStack_19f90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ce];
  fStack_24354 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3dd];
  fStack_19e1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3dd];
  fStack_24358 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ec];
  fStack_19ca8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ec];
  fStack_2435c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fb];
  fStack_19b34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fb];
  fStack_24360 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40a];
  fStack_199c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40a];
  fStack_1984c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x419];
  fStack_196d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x428];
  fStack_19564 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x437];
  fStack_193f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x446];
  fStack_1927c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x455];
  fStack_183f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x464];
  fStack_18280 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x473];
  fStack_1810c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x482];
  fStack_17f98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x491];
  fStack_17e24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a0];
  fStack_17cb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4af];
  fStack_17110 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4be];
  fStack_16f9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cd];
  fStack_16e28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4dc];
  fStack_16570 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4eb];
  fStack_22824 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe0];
  fStack_226b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xef];
  fStack_2253c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfe];
  fStack_223c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10d];
  fStack_220e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11c];
  fStack_21f6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[299];
  fStack_21df8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13a];
  fStack_21c84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x149];
  fStack_2199c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x158];
  fStack_21828 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x167];
  fStack_216b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x176];
  fStack_213cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x185];
  fStack_21258 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x194];
  fStack_20f70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a3];
  fStack_1ff74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b2];
  fStack_1fe00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c1];
  fStack_1fc8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d0];
  fStack_1fb18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1df];
  fStack_1f9a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ee];
  fStack_1f830 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fd];
  fStack_1f548 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20c];
  fStack_1f3d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21b];
  fStack_1f260 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22a];
  fStack_1f0ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x239];
  fStack_1ef78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x248];
  fStack_1ec90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[599];
  fStack_1eb1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x266];
  fStack_1e9a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x275];
  fStack_1e834 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x284];
  fStack_1e54c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x293];
  fStack_1e3d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a2];
  fStack_1e264 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b1];
  fStack_1df7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c0];
  fStack_1de08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cf];
  fStack_1db20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2de];
  fStack_1ce0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ed];
  fStack_1cc98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fc];
  fStack_1cb24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30b];
  fStack_1c9b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31a];
  fStack_1c83c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x329];
  fStack_1c554 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x338];
  fStack_1c3e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x347];
  fStack_1c26c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x356];
  fStack_1c0f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x365];
  fStack_1be10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x374];
  fStack_1bc9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[899];
  fStack_1b9b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x392];
  fStack_1b6cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a1];
  fStack_1b558 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b0];
  fStack_1b270 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bf];
  fStack_1a55c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ce];
  fStack_1a3e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3dd];
  fStack_1a274 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ec];
  fStack_1a100 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fb];
  fStack_19e18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40a];
  fStack_19ca4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x419];
  fStack_19b30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x428];
  fStack_19848 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x437];
  fStack_196d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x446];
  fStack_193ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x455];
  fStack_1884c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x464];
  fStack_186d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x473];
  fStack_18564 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x482];
  fStack_1827c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x491];
  fStack_18108 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a0];
  fStack_17e20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4af];
  fStack_173f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4be];
  fStack_17280 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cd];
  fStack_16f98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4dc];
  fStack_166e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4eb];
  fStack_23990 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x80];
  fStack_226ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x125];
  fStack_22538 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x134];
  fStack_223c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x143];
  fStack_21f68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x152];
  fStack_21df4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x161];
  fStack_21c80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x170];
  fStack_21824 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17f];
  fStack_216b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18e];
  fStack_21254 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19d];
  fStack_2099c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ac];
  fStack_20828 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bb];
  fStack_206b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ca];
  fStack_20540 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d9];
  fStack_203cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e8];
  fStack_20258 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f7];
  fStack_1fdfc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x206];
  fStack_1fc88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x215];
  fStack_1fb14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x224];
  fStack_1f9a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x233];
  fStack_1f82c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x242];
  fStack_1f3d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x251];
  fStack_1f25c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x260];
  fStack_1f0e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26f];
  fStack_1ef74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27e];
  fStack_1eb18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28d];
  fStack_1e9a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29c];
  fStack_1e830 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ab];
  fStack_1e3d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ba];
  fStack_1e260 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c9];
  fStack_1de04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d8];
  fStack_1d6c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e7];
  fStack_1d54c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f6];
  fStack_1d3d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x305];
  fStack_1d264 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x314];
  fStack_1d0f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x323];
  fStack_1cc94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x332];
  fStack_1cb20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x341];
  fStack_1c9ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x350];
  fStack_1c838 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35f];
  fStack_1c3dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36e];
  fStack_1c268 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37d];
  fStack_1c0f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38c];
  fStack_1bc98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39b];
  fStack_1b9b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3aa];
  fStack_1b554 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b9];
  fStack_1ac9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c8];
  fStack_1ab28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d7];
  fStack_1a9b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e6];
  fStack_1a840 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f5];
  fStack_1a3e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x404];
  fStack_1a270 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x413];
  fStack_1a0fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x422];
  fStack_19ca0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x431];
  fStack_19b2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x440];
  fStack_196d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44f];
  fStack_18e18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45e];
  fStack_18ca4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46d];
  fStack_18b30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47c];
  fStack_186d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48b];
  fStack_18560 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49a];
  fStack_18104 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a9];
  fStack_1784c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b8];
  fStack_176d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c7];
  fStack_1727c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d6];
  fStack_169c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e5];
  fStack_23818 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x90];
  fStack_226a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x126];
  fStack_22534 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x135];
  fStack_223c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x144];
  fStack_21f64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x153];
  fStack_21df0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x162];
  fStack_21c7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x171];
  fStack_21820 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x180];
  fStack_216ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[399];
  fStack_21250 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19e];
  fStack_20998 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ad];
  fStack_20824 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bc];
  fStack_206b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cb];
  fStack_2053c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1da];
  fStack_203c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e9];
  fStack_20254 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f8];
  fStack_1fdf8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x207];
  fStack_1fc84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x216];
  fStack_1fb10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x225];
  fStack_1f99c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x234];
  fStack_1f828 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x243];
  fStack_1f3cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x252];
  fStack_1f258 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x261];
  fStack_1f0e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x270];
  fStack_1ef70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27f];
  fStack_1eb14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28e];
  fStack_1e9a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29d];
  fStack_1e82c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ac];
  fStack_1e3d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[699];
  fStack_1e25c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ca];
  fStack_1de00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d9];
  fStack_1d6bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e8];
  fStack_1d548 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f7];
  fStack_1d3d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x306];
  fStack_1d260 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x315];
  fStack_1d0ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x324];
  fStack_1cc90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x333];
  fStack_1cb1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x342];
  fStack_1c9a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x351];
  fStack_1c834 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x360];
  fStack_1c3d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36f];
  fStack_1c264 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37e];
  fStack_1c0f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38d];
  fStack_1bc94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39c];
  fStack_1b9ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ab];
  fStack_1b550 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ba];
  fStack_1ac98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c9];
  fStack_1ab24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d8];
  fStack_1a9b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[999];
  fStack_1a83c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f6];
  fStack_1a3e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x405];
  fStack_1a26c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x414];
  fStack_1a0f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x423];
  fStack_19c9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x432];
  fStack_19b28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x441];
  fStack_196cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x450];
  fStack_18e14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45f];
  fStack_18ca0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46e];
  fStack_18b2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47d];
  fStack_186d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48c];
  fStack_1855c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49b];
  fStack_18100 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4aa];
  fStack_17848 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b9];
  fStack_176d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c8];
  fStack_17278 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d7];
  fStack_169c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e6];
  fStack_236a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xa0];
  fStack_22818 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x118];
  fStack_226a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x127];
  fStack_22530 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x136];
  fStack_223bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x145];
  fStack_21f60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x154];
  fStack_21dec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x163];
  fStack_21c78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x172];
  fStack_2181c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x181];
  fStack_216a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[400];
  fStack_2124c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19f];
  fStack_20994 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ae];
  fStack_20820 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bd];
  fStack_206ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cc];
  fStack_20538 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1db];
  fStack_203c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ea];
  fStack_20250 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f9];
  fStack_1fdf4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x208];
  fStack_1fc80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x217];
  fStack_1fb0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x226];
  fStack_1f998 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x235];
  fStack_1f824 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x244];
  fStack_1f3c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x253];
  fStack_1f254 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x262];
  fStack_1f0e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x271];
  fStack_1ef6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x280];
  fStack_1eb10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28f];
  fStack_1e99c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29e];
  fStack_1e828 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ad];
  fStack_1e3cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[700];
  fStack_1e258 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cb];
  fStack_1ddfc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2da];
  fStack_1d6b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e9];
  fStack_1d544 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f8];
  fStack_1d3d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x307];
  fStack_1d25c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x316];
  fStack_1d0e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x325];
  fStack_1cc8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x334];
  fStack_1cb18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x343];
  fStack_1c9a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x352];
  fStack_1c830 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x361];
  fStack_1c3d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x370];
  fStack_1c260 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37f];
  fStack_1c0ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38e];
  fStack_1bc90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39d];
  fStack_1b9a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ac];
  fStack_1b54c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bb];
  fStack_1ac94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ca];
  fStack_1ab20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d9];
  fStack_1a9ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[1000];
  fStack_1a838 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f7];
  fStack_1a3dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x406];
  fStack_1a268 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x415];
  fStack_1a0f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x424];
  fStack_19c98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x433];
  fStack_19b24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x442];
  fStack_196c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x451];
  fStack_18e10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x460];
  fStack_18c9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46f];
  fStack_18b28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47e];
  fStack_186cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48d];
  fStack_18558 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49c];
  fStack_180fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ab];
  fStack_17844 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ba];
  fStack_176d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c9];
  fStack_17274 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d8];
  fStack_169bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e7];
  fStack_23528 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xb0];
  fStack_22814 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x119];
  fStack_226a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x128];
  fStack_2252c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x137];
  fStack_223b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x146];
  fStack_21f5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x155];
  fStack_21de8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x164];
  fStack_21c74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x173];
  fStack_21818 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x182];
  fStack_216a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x191];
  fStack_21248 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a0];
  fStack_20990 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1af];
  fStack_2081c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1be];
  fStack_206a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cd];
  fStack_20534 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1dc];
  fStack_203c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1eb];
  fStack_2024c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fa];
  fStack_1fdf0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x209];
  fStack_1fc7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x218];
  fStack_1fb08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x227];
  fStack_1f994 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x236];
  fStack_1f820 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x245];
  fStack_1f3c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x254];
  fStack_1f250 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x263];
  fStack_1f0dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x272];
  fStack_1ef68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x281];
  fStack_1eb0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x290];
  fStack_1e998 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29f];
  fStack_1e824 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ae];
  fStack_1e3c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2bd];
  fStack_1e254 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cc];
  fStack_1ddf8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2db];
  fStack_1d6b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ea];
  fStack_1d540 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f9];
  fStack_1d3cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x308];
  fStack_1d258 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x317];
  fStack_1d0e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x326];
  fStack_1cc88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x335];
  fStack_1cb14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x344];
  fStack_1c9a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x353];
  fStack_1c82c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x362];
  fStack_1c3d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x371];
  fStack_1c25c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x380];
  fStack_1c0e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38f];
  fStack_1bc8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39e];
  fStack_1b9a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ad];
  fStack_1b548 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bc];
  fStack_1ac90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3cb];
  fStack_1ab1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3da];
  fStack_1a9a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e9];
  fStack_1a834 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f8];
  fStack_1a3d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x407];
  fStack_1a264 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x416];
  fStack_1a0f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x425];
  fStack_19c94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x434];
  fStack_19b20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x443];
  fStack_196c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x452];
  fStack_18e0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x461];
  fStack_18c98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x470];
  fStack_18b24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47f];
  fStack_186c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48e];
  fStack_18554 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49d];
  fStack_180f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ac];
  fStack_17840 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4bb];
  fStack_176cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ca];
  fStack_17270 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d9];
  fStack_169b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e8];
  fStack_2323c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xd0];
  fStack_22810 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11b];
  fStack_2269c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x12a];
  fStack_22528 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x139];
  fStack_223b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x148];
  fStack_21f58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x157];
  fStack_21de4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x166];
  fStack_21c70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x175];
  fStack_21814 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x184];
  fStack_216a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x193];
  fStack_21244 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a2];
  fStack_2098c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b1];
  fStack_20818 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c0];
  fStack_206a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cf];
  fStack_20530 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1de];
  fStack_203bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ed];
  fStack_20248 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fc];
  fStack_1fdec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20b];
  fStack_1fc78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21a];
  fStack_1fb04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x229];
  fStack_1f990 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x238];
  fStack_1f81c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x247];
  fStack_1f3c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x256];
  fStack_1f24c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x265];
  fStack_1f0d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x274];
  fStack_1ef64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x283];
  fStack_1eb08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x292];
  fStack_1e994 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a1];
  fStack_1e820 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b0];
  fStack_1e3c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2bf];
  fStack_1e250 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ce];
  fStack_1ddf4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2dd];
  fStack_1d6b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ec];
  fStack_1d53c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fb];
  fStack_1d3c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30a];
  fStack_1d254 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x319];
  fStack_1d0e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x328];
  fStack_1cc84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x337];
  fStack_1cb10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x346];
  fStack_1c99c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x355];
  fStack_1c828 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x364];
  fStack_1c3cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x373];
  fStack_1c258 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x382];
  fStack_1c0e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x391];
  fStack_1bc88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a0];
  fStack_1b9a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3af];
  fStack_1b544 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3be];
  fStack_1ac8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3cd];
  fStack_1ab18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3dc];
  fStack_1a9a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3eb];
  fStack_1a830 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fa];
  fStack_1a3d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x409];
  fStack_1a260 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x418];
  fStack_1a0ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x427];
  fStack_19c90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x436];
  fStack_19b1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x445];
  fStack_196c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x454];
  fStack_18e08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x463];
  fStack_18c94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x472];
  fStack_18b20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x481];
  fStack_186c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x490];
  fStack_18550 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49f];
  fStack_180f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ae];
  fStack_1783c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4bd];
  fStack_176c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cc];
  fStack_1726c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4db];
  fStack_169b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ea];
  fStack_230c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe0];
  fStack_2280c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11c];
  fStack_22698 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[299];
  fStack_22524 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13a];
  fStack_223b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x149];
  fStack_21f54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x158];
  fStack_21de0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x167];
  fStack_21c6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x176];
  fStack_21810 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x185];
  fStack_2169c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x194];
  fStack_21240 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a3];
  fStack_20988 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b2];
  fStack_20814 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c1];
  fStack_206a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d0];
  fStack_2052c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1df];
  fStack_203b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ee];
  fStack_20244 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fd];
  fStack_1fde8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20c];
  fStack_1fc74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21b];
  fStack_1fb00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22a];
  fStack_1f98c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x239];
  fStack_1f818 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x248];
  fStack_1f3bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[599];
  fStack_1f248 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x266];
  fStack_1f0d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x275];
  fStack_1ef60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x284];
  fStack_1eb04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x293];
  fStack_1e990 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a2];
  fStack_1e81c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b1];
  fStack_1e3c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c0];
  fStack_1e24c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cf];
  fStack_1ddf0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2de];
  fStack_1d6ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ed];
  fStack_1d538 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fc];
  fStack_1d3c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30b];
  fStack_1d250 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31a];
  fStack_1d0dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x329];
  fStack_1cc80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x338];
  fStack_1cb0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x347];
  fStack_1c998 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x356];
  fStack_1c824 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x365];
  fStack_1c3c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x374];
  fStack_1c254 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[899];
  fStack_1c0e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x392];
  fStack_1bc84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a1];
  fStack_1b99c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b0];
  fStack_1b540 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bf];
  fStack_1ac88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ce];
  fStack_1ab14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3dd];
  fStack_1a9a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ec];
  fStack_1a82c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fb];
  fStack_1a3d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40a];
  fStack_1a25c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x419];
  fStack_1a0e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x428];
  fStack_19c8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x437];
  fStack_19b18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x446];
  fStack_196bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x455];
  fStack_18e04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x464];
  fStack_18c90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x473];
  fStack_18b1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x482];
  fStack_186c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x491];
  fStack_1854c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a0];
  fStack_180f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4af];
  fStack_17838 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4be];
  fStack_176c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cd];
  fStack_17268 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4dc];
  fStack_169b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4eb];
  fStack_233a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x80];
  fStack_22808 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe9];
  fStack_22694 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf8];
  fStack_22520 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x107];
  fStack_22238 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x116];
  fStack_220c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x125];
  fStack_21f50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x134];
  fStack_21ddc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x143];
  fStack_21af4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x152];
  fStack_21980 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x161];
  fStack_2180c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x170];
  fStack_21524 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17f];
  fStack_213b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18e];
  fStack_210c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19d];
  fStack_200cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ac];
  fStack_1ff58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bb];
  fStack_1fde4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ca];
  fStack_1fc70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d9];
  fStack_1fafc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e8];
  fStack_1f988 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f7];
  fStack_1f6a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x206];
  fStack_1f52c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x215];
  fStack_1f3b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x224];
  fStack_1f244 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x233];
  fStack_1f0d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x242];
  fStack_1ede8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x251];
  fStack_1ec74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x260];
  fStack_1eb00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26f];
  fStack_1e98c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27e];
  fStack_1e6a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28d];
  fStack_1e530 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29c];
  fStack_1e3bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ab];
  fStack_1e0d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ba];
  fStack_1df60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c9];
  fStack_1dc78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d8];
  fStack_1cf64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e7];
  fStack_1cdf0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f6];
  fStack_1cc7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x305];
  fStack_1cb08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x314];
  fStack_1c994 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x323];
  fStack_1c6ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x332];
  fStack_1c538 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x341];
  fStack_1c3c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x350];
  fStack_1c250 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35f];
  fStack_1bf68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36e];
  fStack_1bdf4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37d];
  fStack_1bc80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38c];
  fStack_1b824 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39b];
  fStack_1b6b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3aa];
  fStack_1b3c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b9];
  fStack_1a6b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c8];
  fStack_1a540 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d7];
  fStack_1a3cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e6];
  fStack_1a258 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f5];
  fStack_19f70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x404];
  fStack_19dfc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x413];
  fStack_19c88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x422];
  fStack_199a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x431];
  fStack_1982c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x440];
  fStack_19544 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44f];
  fStack_189a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45e];
  fStack_18830 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46d];
  fStack_186bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47c];
  fStack_183d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48b];
  fStack_18260 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49a];
  fStack_17f78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a9];
  fStack_1754c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b8];
  fStack_173d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c7];
  fStack_170f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d6];
  fStack_16838 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e5];
  fStack_23230 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x90];
  fStack_22804 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xea];
  fStack_22690 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf9];
  fStack_2251c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x108];
  fStack_22234 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x117];
  fStack_220c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x126];
  fStack_21f4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x135];
  fStack_21dd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x144];
  fStack_21af0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x153];
  fStack_2197c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x162];
  fStack_21808 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x171];
  fStack_21520 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x180];
  fStack_213ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[399];
  fStack_210c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19e];
  fStack_200c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ad];
  fStack_1ff54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bc];
  fStack_1fde0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cb];
  fStack_1fc6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1da];
  fStack_1faf8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e9];
  fStack_1f984 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f8];
  fStack_1f69c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x207];
  fStack_1f528 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x216];
  fStack_1f3b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x225];
  fStack_1f240 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x234];
  fStack_1f0cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x243];
  fStack_1ede4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x252];
  fStack_1ec70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x261];
  fStack_1eafc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x270];
  fStack_1e988 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27f];
  fStack_1e6a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28e];
  fStack_1e52c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29d];
  fStack_1e3b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ac];
  fStack_1e0d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[699];
  fStack_1df5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ca];
  fStack_1dc74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d9];
  fStack_1cf60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e8];
  fStack_1cdec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f7];
  fStack_1cc78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x306];
  fStack_1cb04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x315];
  fStack_1c990 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x324];
  fStack_1c6a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x333];
  fStack_1c534 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x342];
  fStack_1c3c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x351];
  fStack_1c24c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x360];
  fStack_1bf64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36f];
  fStack_1bdf0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37e];
  fStack_1bc7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38d];
  fStack_1b820 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39c];
  fStack_1b6ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ab];
  fStack_1b3c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ba];
  fStack_1a6b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c9];
  fStack_1a53c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d8];
  fStack_1a3c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[999];
  fStack_1a254 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f6];
  fStack_19f6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x405];
  fStack_19df8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x414];
  fStack_19c84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x423];
  fStack_1999c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x432];
  fStack_19828 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x441];
  fStack_19540 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x450];
  fStack_189a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45f];
  fStack_1882c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46e];
  fStack_186b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47d];
  fStack_183d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48c];
  fStack_1825c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49b];
  fStack_17f74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4aa];
  fStack_17548 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b9];
  fStack_173d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c8];
  fStack_170ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d7];
  fStack_16834 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e6];
  fStack_230b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xa0];
  fStack_22800 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xeb];
  fStack_2268c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfa];
  fStack_22518 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x109];
  fStack_22230 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x118];
  fStack_220bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x127];
  fStack_21f48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x136];
  fStack_21dd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x145];
  fStack_21aec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x154];
  fStack_21978 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x163];
  fStack_21804 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x172];
  fStack_2151c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x181];
  fStack_213a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[400];
  fStack_210c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19f];
  fStack_200c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ae];
  fStack_1ff50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bd];
  fStack_1fddc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cc];
  fStack_1fc68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1db];
  fStack_1faf4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ea];
  fStack_1f980 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f9];
  fStack_1f698 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x208];
  fStack_1f524 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x217];
  fStack_1f3b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x226];
  fStack_1f23c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x235];
  fStack_1f0c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x244];
  fStack_1ede0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x253];
  fStack_1ec6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x262];
  fStack_1eaf8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x271];
  fStack_1e984 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x280];
  fStack_1e69c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28f];
  fStack_1e528 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29e];
  fStack_1e3b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ad];
  fStack_1e0cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[700];
  fStack_1df58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cb];
  fStack_1dc70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2da];
  fStack_1cf5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e9];
  fStack_1cde8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f8];
  fStack_1cc74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x307];
  fStack_1cb00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x316];
  fStack_1c98c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x325];
  fStack_1c6a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x334];
  fStack_1c530 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x343];
  fStack_1c3bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x352];
  fStack_1c248 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x361];
  fStack_1bf60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x370];
  fStack_1bdec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37f];
  fStack_1bc78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38e];
  fStack_1b81c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39d];
  fStack_1b6a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ac];
  fStack_1b3c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bb];
  fStack_1a6ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ca];
  fStack_1a538 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d9];
  fStack_1a3c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[1000];
  fStack_1a250 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f7];
  fStack_19f68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x406];
  fStack_19df4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x415];
  fStack_19c80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x424];
  fStack_19998 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x433];
  fStack_19824 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x442];
  fStack_1953c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x451];
  fStack_1899c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x460];
  fStack_18828 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46f];
  fStack_186b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47e];
  fStack_183cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48d];
  fStack_18258 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49c];
  fStack_17f70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ab];
  fStack_17544 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ba];
  fStack_173d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c9];
  fStack_170e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d8];
  fStack_16830 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e7];
  fStack_22f40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xb0];
  fStack_227fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xec];
  fStack_22688 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfb];
  fStack_22514 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10a];
  fStack_2222c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x119];
  fStack_220b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x128];
  fStack_21f44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x137];
  fStack_21dd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x146];
  fStack_21ae8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x155];
  fStack_21974 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x164];
  fStack_21800 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x173];
  fStack_21518 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x182];
  fStack_213a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x191];
  fStack_210bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a0];
  fStack_200c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1af];
  fStack_1ff4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1be];
  fStack_1fdd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cd];
  fStack_1fc64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1dc];
  fStack_1faf0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1eb];
  fStack_1f97c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fa];
  fStack_1f694 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x209];
  fStack_1f520 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x218];
  fStack_1f3ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x227];
  fStack_1f238 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x236];
  fStack_1f0c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x245];
  fStack_1eddc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x254];
  fStack_1ec68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x263];
  fStack_1eaf4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x272];
  fStack_1e980 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x281];
  fStack_1e698 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x290];
  fStack_1e524 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29f];
  fStack_1e3b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ae];
  fStack_1e0c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2bd];
  fStack_1df54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cc];
  fStack_1dc6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2db];
  fStack_1cf58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ea];
  fStack_1cde4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f9];
  fStack_1cc70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x308];
  fStack_1cafc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x317];
  fStack_1c988 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x326];
  fStack_1c6a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x335];
  fStack_1c52c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x344];
  fStack_1c3b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x353];
  fStack_1c244 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x362];
  fStack_1bf5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x371];
  fStack_1bde8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x380];
  fStack_1bc74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38f];
  fStack_1b818 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39e];
  fStack_1b6a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ad];
  fStack_1b3bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bc];
  fStack_1a6a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3cb];
  fStack_1a534 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3da];
  fStack_1a3c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e9];
  fStack_1a24c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f8];
  fStack_19f64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x407];
  fStack_19df0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x416];
  fStack_19c7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x425];
  fStack_19994 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x434];
  fStack_19820 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x443];
  fStack_19538 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x452];
  fStack_18998 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x461];
  fStack_18824 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x470];
  fStack_186b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47f];
  fStack_183c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48e];
  fStack_18254 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49d];
  fStack_17f6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ac];
  fStack_17540 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4bb];
  fStack_173cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ca];
  fStack_170e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d9];
  fStack_1682c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e8];
  fStack_22dc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xc0];
  fStack_227f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xed];
  fStack_22684 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfc];
  fStack_22510 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10b];
  fStack_22228 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11a];
  fStack_220b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x129];
  fStack_21f40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x138];
  fStack_21dcc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x147];
  fStack_21ae4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x156];
  fStack_21970 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x165];
  fStack_217fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x174];
  fStack_21514 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x183];
  fStack_213a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x192];
  fStack_210b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a1];
  fStack_200bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b0];
  fStack_1ff48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bf];
  fStack_1fdd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ce];
  fStack_1fc60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1dd];
  fStack_1faec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ec];
  fStack_1f978 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fb];
  fStack_1f690 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20a];
  fStack_1f51c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x219];
  fStack_1f3a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x228];
  fStack_1f234 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x237];
  fStack_1f0c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x246];
  fStack_1edd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x255];
  fStack_1ec64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x264];
  fStack_1eaf0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x273];
  fStack_1e97c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x282];
  fStack_1e694 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x291];
  fStack_1e520 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a0];
  fStack_1e3ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2af];
  fStack_1e0c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2be];
  fStack_1df50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cd];
  fStack_1dc68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2dc];
  fStack_1cf54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2eb];
  fStack_1cde0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fa];
  fStack_1cc6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x309];
  fStack_1caf8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x318];
  fStack_1c984 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x327];
  fStack_1c69c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x336];
  fStack_1c528 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x345];
  fStack_1c3b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x354];
  fStack_1c240 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x363];
  fStack_1bf58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x372];
  fStack_1bde4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x381];
  fStack_1bc70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x390];
  fStack_1b814 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39f];
  fStack_1b6a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ae];
  fStack_1b3b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bd];
  fStack_1a6a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3cc];
  fStack_1a530 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3db];
  fStack_1a3bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ea];
  fStack_1a248 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f9];
  fStack_19f60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x408];
  fStack_19dec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x417];
  fStack_19c78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x426];
  fStack_19990 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x435];
  fStack_1981c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x444];
  fStack_19534 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x453];
  fStack_18994 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x462];
  fStack_18820 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x471];
  fStack_186ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x480];
  fStack_183c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48f];
  fStack_18250 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49e];
  fStack_17f68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ad];
  fStack_1753c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4bc];
  fStack_173c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cb];
  fStack_170e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4da];
  fStack_16828 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e9];
  fStack_22adc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xd0];
  fStack_227f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xee];
  fStack_22680 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfd];
  fStack_2250c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10c];
  fStack_22224 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11b];
  fStack_220b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x12a];
  fStack_21f3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x139];
  fStack_21dc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x148];
  fStack_21ae0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x157];
  fStack_2196c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x166];
  fStack_217f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x175];
  fStack_21510 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x184];
  fStack_2139c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x193];
  fStack_210b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a2];
  fStack_200b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b1];
  fStack_1ff44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c0];
  fStack_1fdd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cf];
  fStack_1fc5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1de];
  fStack_1fae8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ed];
  fStack_1f974 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fc];
  fStack_1f68c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20b];
  fStack_1f518 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21a];
  fStack_1f3a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x229];
  fStack_1f230 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x238];
  fStack_1f0bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x247];
  fStack_1edd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x256];
  fStack_1ec60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x265];
  fStack_1eaec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x274];
  fStack_1e978 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x283];
  fStack_1e690 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x292];
  fStack_1e51c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a1];
  fStack_1e3a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b0];
  fStack_1e0c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2bf];
  fStack_1df4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ce];
  fStack_1dc64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2dd];
  fStack_1cf50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ec];
  fStack_1cddc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fb];
  fStack_1cc68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30a];
  fStack_1caf4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x319];
  fStack_1c980 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x328];
  fStack_1c698 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x337];
  fStack_1c524 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x346];
  fStack_1c3b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x355];
  fStack_1c23c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x364];
  fStack_1bf54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x373];
  fStack_1bde0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x382];
  fStack_1bc6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x391];
  fStack_1b810 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a0];
  fStack_1b69c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3af];
  fStack_1b3b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3be];
  fStack_1a6a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3cd];
  fStack_1a52c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3dc];
  fStack_1a3b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3eb];
  fStack_1a244 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fa];
  fStack_19f5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x409];
  fStack_19de8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x418];
  fStack_19c74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x427];
  fStack_1998c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x436];
  fStack_19818 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x445];
  fStack_19530 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x454];
  fStack_18990 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x463];
  fStack_1881c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x472];
  fStack_186a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x481];
  fStack_183c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x490];
  fStack_1824c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49f];
  fStack_17f64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ae];
  fStack_17538 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4bd];
  fStack_173c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cc];
  fStack_170dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4db];
  fStack_16824 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ea];
  fStack_22964 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe0];
  fStack_227f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xef];
  fStack_2267c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfe];
  fStack_22508 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10d];
  fStack_22220 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11c];
  fStack_220ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[299];
  fStack_21f38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13a];
  fStack_21dc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x149];
  fStack_21adc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x158];
  fStack_21968 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x167];
  fStack_217f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x176];
  fStack_2150c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x185];
  fStack_21398 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x194];
  fStack_210b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a3];
  fStack_200b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b2];
  fStack_1ff40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c1];
  fStack_1fdcc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d0];
  fStack_1fc58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1df];
  fStack_1fae4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ee];
  fStack_1f970 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fd];
  fStack_1f688 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20c];
  fStack_1f514 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21b];
  fStack_1f3a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22a];
  fStack_1f22c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x239];
  fStack_1f0b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x248];
  fStack_1edd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[599];
  fStack_1ec5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x266];
  fStack_1eae8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x275];
  fStack_1e974 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x284];
  fStack_1e68c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x293];
  fStack_1e518 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a2];
  fStack_1e3a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b1];
  fStack_1e0bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c0];
  fStack_1df48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cf];
  fStack_1dc60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2de];
  fStack_1cf4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ed];
  fStack_1cdd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fc];
  fStack_1cc64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30b];
  fStack_1caf0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31a];
  fStack_1c97c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x329];
  fStack_1c694 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x338];
  fStack_1c520 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x347];
  fStack_1c3ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x356];
  fStack_1c238 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x365];
  fStack_1bf50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x374];
  fStack_1bddc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[899];
  fStack_1bc68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x392];
  fStack_1b80c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a1];
  fStack_1b698 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b0];
  fStack_1b3b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bf];
  fStack_1a69c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ce];
  fStack_1a528 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3dd];
  fStack_1a3b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ec];
  fStack_1a240 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fb];
  fStack_19f58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40a];
  fStack_19de4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x419];
  fStack_19c70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x428];
  fStack_19988 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x437];
  fStack_19814 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x446];
  fStack_1952c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x455];
  fStack_1898c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x464];
  fStack_18818 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x473];
  fStack_186a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x482];
  fStack_183bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x491];
  fStack_18248 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a0];
  fStack_17f60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4af];
  fStack_17534 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4be];
  fStack_173c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cd];
  fStack_170d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4dc];
  fStack_16820 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4eb];
  fStack_24214 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20];
  fStack_227ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11f];
  fStack_22678 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x12e];
  fStack_22504 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13d];
  fStack_220a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14c];
  fStack_21f34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15b];
  fStack_21dc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16a];
  fStack_21964 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x179];
  fStack_217f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x188];
  fStack_21394 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x197];
  fStack_20adc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a6];
  fStack_20968 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b5];
  fStack_207f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c4];
  fStack_20680 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d3];
  fStack_2050c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e2];
  fStack_20398 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f1];
  fStack_1ff3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x200];
  fStack_1fdc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20f];
  fStack_1fc54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21e];
  fStack_1fae0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22d];
  fStack_1f96c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23c];
  fStack_1f510 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24b];
  fStack_1f39c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25a];
  fStack_1f228 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x269];
  fStack_1f0b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x278];
  fStack_1ec58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x287];
  fStack_1eae4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x296];
  fStack_1e970 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a5];
  fStack_1e514 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b4];
  fStack_1e3a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c3];
  fStack_1df44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d2];
  fStack_1d800 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e1];
  fStack_1d68c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f0];
  fStack_1d518 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ff];
  fStack_1d3a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30e];
  fStack_1d230 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31d];
  fStack_1cdd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32c];
  fStack_1cc60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33b];
  fStack_1caec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34a];
  fStack_1c978 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x359];
  fStack_1c51c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x368];
  fStack_1c3a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x377];
  fStack_1c234 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x386];
  fStack_1bdd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x395];
  fStack_1bc64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a4];
  fStack_1b694 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b3];
  fStack_1addc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c2];
  fStack_1ac68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d1];
  fStack_1aaf4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e0];
  fStack_1a980 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ef];
  fStack_1a524 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fe];
  fStack_1a3b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40d];
  fStack_1a23c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41c];
  fStack_19de0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42b];
  fStack_19c6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43a];
  fStack_19810 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x449];
  fStack_18f58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x458];
  fStack_18de4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x467];
  fStack_18c70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x476];
  fStack_18814 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x485];
  fStack_186a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x494];
  fStack_18244 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a3];
  fStack_1798c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b2];
  fStack_17818 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c1];
  fStack_173bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d0];
  fStack_16b04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4df];
  fStack_2409c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30];
  fStack_227e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x120];
  fStack_22674 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x12f];
  fStack_22500 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13e];
  fStack_220a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14d];
  fStack_21f30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15c];
  fStack_21dbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16b];
  fStack_21960 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17a];
  fStack_217ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x189];
  fStack_21390 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x198];
  fStack_20ad8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a7];
  fStack_20964 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b6];
  fStack_207f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c5];
  fStack_2067c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d4];
  fStack_20508 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e3];
  fStack_20394 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f2];
  fStack_1ff38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x201];
  fStack_1fdc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x210];
  fStack_1fc50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21f];
  fStack_1fadc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22e];
  fStack_1f968 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23d];
  fStack_1f50c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24c];
  fStack_1f398 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25b];
  fStack_1f224 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26a];
  fStack_1f0b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x279];
  fStack_1ec54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x288];
  fStack_1eae0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x297];
  fStack_1e96c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a6];
  fStack_1e510 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b5];
  fStack_1e39c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c4];
  fStack_1df40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d3];
  fStack_1d7fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e2];
  fStack_1d688 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f1];
  fStack_1d514 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x300];
  fStack_1d3a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30f];
  fStack_1d22c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31e];
  fStack_1cdd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32d];
  fStack_1cc5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33c];
  fStack_1cae8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34b];
  fStack_1c974 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35a];
  fStack_1c518 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x369];
  fStack_1c3a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x378];
  fStack_1c230 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x387];
  fStack_1bdd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x396];
  fStack_1bc60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a5];
  fStack_1b690 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b4];
  fStack_1add8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c3];
  fStack_1ac64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d2];
  fStack_1aaf0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e1];
  fStack_1a97c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f0];
  fStack_1a520 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ff];
  fStack_1a3ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40e];
  fStack_1a238 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41d];
  fStack_19ddc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42c];
  fStack_19c68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43b];
  fStack_1980c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44a];
  fStack_18f54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x459];
  fStack_18de0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x468];
  fStack_18c6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x477];
  fStack_18810 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x486];
  fStack_1869c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x495];
  fStack_18240 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a4];
  fStack_17988 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b3];
  fStack_17814 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c2];
  fStack_173b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d1];
  fStack_16b00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e0];
  fStack_23f24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40];
  fStack_227e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x121];
  fStack_22670 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x130];
  fStack_224fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13f];
  fStack_220a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14e];
  fStack_21f2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15d];
  fStack_21db8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16c];
  fStack_2195c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17b];
  fStack_217e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18a];
  fStack_2138c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x199];
  fStack_20ad4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a8];
  fStack_20960 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b7];
  fStack_207ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c6];
  fStack_20678 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d5];
  fStack_20504 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e4];
  fStack_20390 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[499];
  fStack_1ff34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x202];
  fStack_1fdc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x211];
  fStack_1fc4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x220];
  fStack_1fad8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22f];
  fStack_1f964 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23e];
  fStack_1f508 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24d];
  fStack_1f394 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25c];
  fStack_1f220 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26b];
  fStack_1f0ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27a];
  fStack_1ec50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x289];
  fStack_1eadc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x298];
  fStack_1e968 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a7];
  fStack_1e50c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b6];
  fStack_1e398 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c5];
  fStack_1df3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d4];
  fStack_1d7f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e3];
  fStack_1d684 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f2];
  fStack_1d510 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x301];
  fStack_1d39c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x310];
  fStack_1d228 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[799];
  fStack_1cdcc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32e];
  fStack_1cc58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33d];
  fStack_1cae4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34c];
  fStack_1c970 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35b];
  fStack_1c514 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36a];
  fStack_1c3a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x379];
  fStack_1c22c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x388];
  fStack_1bdd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x397];
  fStack_1bc5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a6];
  fStack_1b68c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b5];
  fStack_1add4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c4];
  fStack_1ac60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d3];
  fStack_1aaec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e2];
  fStack_1a978 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f1];
  fStack_1a51c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x400];
  fStack_1a3a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40f];
  fStack_1a234 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41e];
  fStack_19dd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42d];
  fStack_19c64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43c];
  fStack_19808 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[1099];
  fStack_18f50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45a];
  fStack_18ddc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x469];
  fStack_18c68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x478];
  fStack_1880c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x487];
  fStack_18698 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x496];
  fStack_1823c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a5];
  fStack_17984 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b4];
  fStack_17810 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c3];
  fStack_173b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d2];
  fStack_16afc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e1];
  fStack_23dac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x50];
  fStack_227e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x122];
  fStack_2266c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x131];
  fStack_224f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x140];
  fStack_2209c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14f];
  fStack_21f28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15e];
  fStack_21db4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16d];
  fStack_21958 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17c];
  fStack_217e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18b];
  fStack_21388 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19a];
  fStack_20ad0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a9];
  fStack_2095c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b8];
  fStack_207e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c7];
  fStack_20674 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d6];
  fStack_20500 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e5];
  fStack_2038c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[500];
  fStack_1ff30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x203];
  fStack_1fdbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x212];
  fStack_1fc48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x221];
  fStack_1fad4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x230];
  fStack_1f960 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23f];
  fStack_1f504 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24e];
  fStack_1f390 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25d];
  fStack_1f21c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26c];
  fStack_1f0a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27b];
  fStack_1ec4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28a];
  fStack_1ead8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x299];
  fStack_1e964 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a8];
  fStack_1e508 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b7];
  fStack_1e394 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c6];
  fStack_1df38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d5];
  fStack_1d7f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e4];
  fStack_1d680 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f3];
  fStack_1d50c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x302];
  fStack_1d398 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x311];
  fStack_1d224 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[800];
  fStack_1cdc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32f];
  fStack_1cc54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33e];
  fStack_1cae0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34d];
  fStack_1c96c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35c];
  fStack_1c510 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36b];
  fStack_1c39c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37a];
  fStack_1c228 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x389];
  fStack_1bdcc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x398];
  fStack_1bc58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a7];
  fStack_1b688 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b6];
  fStack_1add0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c5];
  fStack_1ac5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d4];
  fStack_1aae8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e3];
  fStack_1a974 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f2];
  fStack_1a518 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x401];
  fStack_1a3a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x410];
  fStack_1a230 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41f];
  fStack_19dd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42e];
  fStack_19c60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43d];
  fStack_19804 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44c];
  fStack_18f4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45b];
  fStack_18dd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46a];
  fStack_18c64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x479];
  fStack_18808 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x488];
  fStack_18694 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x497];
  fStack_18238 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a6];
  fStack_17980 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b5];
  fStack_1780c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c4];
  fStack_173b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d3];
  fStack_16af8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e2];
  fStack_23c34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x70];
  fStack_227dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x124];
  fStack_22668 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x133];
  fStack_224f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x142];
  fStack_22098 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x151];
  fStack_21f24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x160];
  fStack_21db0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16f];
  fStack_21954 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17e];
  fStack_217e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18d];
  fStack_21384 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19c];
  fStack_20acc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ab];
  fStack_20958 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ba];
  fStack_207e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c9];
  fStack_20670 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d8];
  fStack_204fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e7];
  fStack_20388 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f6];
  fStack_1ff2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x205];
  fStack_1fdb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x214];
  fStack_1fc44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x223];
  fStack_1fad0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x232];
  fStack_1f95c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x241];
  fStack_1f500 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x250];
  fStack_1f38c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25f];
  fStack_1f218 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26e];
  fStack_1f0a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27d];
  fStack_1ec48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28c];
  fStack_1ead4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29b];
  fStack_1e960 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2aa];
  fStack_1e504 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b9];
  fStack_1e390 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c8];
  fStack_1df34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d7];
  fStack_1d7f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e6];
  fStack_1d67c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f5];
  fStack_1d508 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x304];
  fStack_1d394 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x313];
  fStack_1d220 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x322];
  fStack_1cdc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x331];
  fStack_1cc50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x340];
  fStack_1cadc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34f];
  fStack_1c968 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35e];
  fStack_1c50c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36d];
  fStack_1c398 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37c];
  fStack_1c224 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38b];
  fStack_1bdc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39a];
  fStack_1bc54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a9];
  fStack_1b684 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b8];
  fStack_1adcc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c7];
  fStack_1ac58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d6];
  fStack_1aae4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e5];
  fStack_1a970 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f4];
  fStack_1a514 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x403];
  fStack_1a3a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x412];
  fStack_1a22c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x421];
  fStack_19dd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x430];
  fStack_19c5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43f];
  fStack_19800 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44e];
  fStack_18f48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45d];
  fStack_18dd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46c];
  fStack_18c60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47b];
  fStack_18804 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48a];
  fStack_18690 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x499];
  fStack_18234 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a8];
  fStack_1797c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b7];
  fStack_17808 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c6];
  fStack_173ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d5];
  fStack_16af4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e4];
  fStack_23abc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x80];
  fStack_227d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x125];
  fStack_22664 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x134];
  fStack_224f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x143];
  fStack_22094 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x152];
  fStack_21f20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x161];
  fStack_21dac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x170];
  fStack_21950 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17f];
  fStack_217dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18e];
  fStack_21380 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19d];
  fStack_20ac8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ac];
  fStack_20954 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bb];
  fStack_207e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ca];
  fStack_2066c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d9];
  fStack_204f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e8];
  fStack_20384 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f7];
  fStack_1ff28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x206];
  fStack_1fdb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x215];
  fStack_1fc40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x224];
  fStack_1facc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x233];
  fStack_1f958 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x242];
  fStack_1f4fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x251];
  fStack_1f388 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x260];
  fStack_1f214 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26f];
  fStack_1f0a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27e];
  fStack_1ec44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28d];
  fStack_1ead0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29c];
  fStack_1e95c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ab];
  fStack_1e500 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ba];
  fStack_1e38c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c9];
  fStack_1df30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d8];
  fStack_1d7ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e7];
  fStack_1d678 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f6];
  fStack_1d504 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x305];
  fStack_1d390 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x314];
  fStack_1d21c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x323];
  fStack_1cdc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x332];
  fStack_1cc4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x341];
  fStack_1cad8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x350];
  fStack_1c964 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35f];
  fStack_1c508 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36e];
  fStack_1c394 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37d];
  fStack_1c220 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38c];
  fStack_1bdc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39b];
  fStack_1bc50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3aa];
  fStack_1b680 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b9];
  fStack_1adc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c8];
  fStack_1ac54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d7];
  fStack_1aae0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e6];
  fStack_1a96c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f5];
  fStack_1a510 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x404];
  fStack_1a39c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x413];
  fStack_1a228 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x422];
  fStack_19dcc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x431];
  fStack_19c58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x440];
  fStack_197fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44f];
  fStack_18f44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45e];
  fStack_18dd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46d];
  fStack_18c5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47c];
  fStack_18800 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48b];
  fStack_1868c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49a];
  fStack_18230 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a9];
  fStack_17978 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b8];
  fStack_17804 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c7];
  fStack_173a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d6];
  fStack_16af0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e5];
  fStack_23944 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x90];
  fStack_227d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x126];
  fStack_22660 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x135];
  fStack_224ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x144];
  fStack_22090 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x153];
  fStack_21f1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x162];
  fStack_21da8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x171];
  fStack_2194c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x180];
  fStack_217d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[399];
  fStack_2137c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19e];
  fStack_20ac4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ad];
  fStack_20950 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bc];
  fStack_207dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cb];
  fStack_20668 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1da];
  fStack_204f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e9];
  fStack_20380 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f8];
  fStack_1ff24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x207];
  fStack_1fdb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x216];
  fStack_1fc3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x225];
  fStack_1fac8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x234];
  fStack_1f954 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x243];
  fStack_1f4f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x252];
  fStack_1f384 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x261];
  fStack_1f210 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x270];
  fStack_1f09c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27f];
  fStack_1ec40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28e];
  fStack_1eacc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29d];
  fStack_1e958 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ac];
  fStack_1e4fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[699];
  fStack_1e388 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ca];
  fStack_1df2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d9];
  fStack_1d7e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e8];
  fStack_1d674 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f7];
  fStack_1d500 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x306];
  fStack_1d38c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x315];
  fStack_1d218 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x324];
  fStack_1cdbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x333];
  fStack_1cc48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x342];
  fStack_1cad4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x351];
  fStack_1c960 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x360];
  fStack_1c504 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36f];
  fStack_1c390 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37e];
  fStack_1c21c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38d];
  fStack_1bdc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39c];
  fStack_1bc4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ab];
  fStack_1b67c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ba];
  fStack_1adc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c9];
  fStack_1ac50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d8];
  fStack_1aadc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[999];
  fStack_1a968 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f6];
  fStack_1a50c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x405];
  fStack_1a398 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x414];
  fStack_1a224 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x423];
  fStack_19dc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x432];
  fStack_19c54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x441];
  fStack_197f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x450];
  fStack_18f40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45f];
  fStack_18dcc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46e];
  fStack_18c58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47d];
  fStack_187fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48c];
  fStack_18688 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49b];
  fStack_1822c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4aa];
  fStack_17974 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b9];
  fStack_17800 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c8];
  fStack_173a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d7];
  fStack_16aec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e6];
  fStack_237cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xa0];
  fStack_227d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x127];
  fStack_2265c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x136];
  fStack_224e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x145];
  fStack_2208c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x154];
  fStack_21f18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x163];
  fStack_21da4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x172];
  fStack_21948 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x181];
  fStack_217d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[400];
  fStack_21378 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19f];
  fStack_20ac0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ae];
  fStack_2094c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bd];
  fStack_207d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cc];
  fStack_20664 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1db];
  fStack_204f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ea];
  fStack_2037c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f9];
  fStack_1ff20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x208];
  fStack_1fdac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x217];
  fStack_1fc38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x226];
  fStack_1fac4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x235];
  fStack_1f950 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x244];
  fStack_1f4f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x253];
  fStack_1f380 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x262];
  fStack_1f20c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x271];
  fStack_1f098 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x280];
  fStack_1ec3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28f];
  fStack_1eac8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29e];
  fStack_1e954 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ad];
  fStack_1e4f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[700];
  fStack_1e384 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cb];
  fStack_1df28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2da];
  fStack_1d7e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e9];
  fStack_1d670 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f8];
  fStack_1d4fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x307];
  fStack_1d388 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x316];
  fStack_1d214 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x325];
  fStack_1cdb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x334];
  fStack_1cc44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x343];
  fStack_1cad0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x352];
  fStack_1c95c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x361];
  fStack_1c500 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x370];
  fStack_1c38c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37f];
  fStack_1c218 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38e];
  fStack_1bdbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39d];
  fStack_1bc48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ac];
  fStack_1b678 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bb];
  fStack_1adc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ca];
  fStack_1ac4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d9];
  fStack_1aad8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[1000];
  fStack_1a964 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f7];
  fStack_1a508 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x406];
  fStack_1a394 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x415];
  fStack_1a220 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x424];
  fStack_19dc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x433];
  fStack_19c50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x442];
  fStack_197f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x451];
  fStack_18f3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x460];
  fStack_18dc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46f];
  fStack_18c54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47e];
  fStack_187f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48d];
  fStack_18684 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49c];
  fStack_18228 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ab];
  fStack_17970 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ba];
  fStack_177fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c9];
  fStack_173a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d8];
  fStack_16ae8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e7];
  fStack_23654 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xb0];
  fStack_227cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x128];
  fStack_22658 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x137];
  fStack_224e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x146];
  fStack_22088 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x155];
  fStack_21f14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x164];
  fStack_21da0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x173];
  fStack_21944 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x182];
  fStack_217d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x191];
  fStack_21374 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a0];
  fStack_20abc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1af];
  fStack_20948 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1be];
  fStack_207d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cd];
  fStack_20660 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1dc];
  fStack_204ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1eb];
  fStack_20378 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fa];
  fStack_1ff1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x209];
  fStack_1fda8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x218];
  fStack_1fc34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x227];
  fStack_1fac0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x236];
  fStack_1f94c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x245];
  fStack_1f4f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x254];
  fStack_1f37c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x263];
  fStack_1f208 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x272];
  fStack_1f094 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x281];
  fStack_1ec38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x290];
  fStack_1eac4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29f];
  fStack_1e950 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ae];
  fStack_1e4f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2bd];
  fStack_1e380 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cc];
  fStack_1df24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2db];
  fStack_1d7e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ea];
  fStack_1d66c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f9];
  fStack_1d4f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x308];
  fStack_1d384 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x317];
  fStack_1d210 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x326];
  fStack_1cdb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x335];
  fStack_1cc40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x344];
  fStack_1cacc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x353];
  fStack_1c958 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x362];
  fStack_1c4fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x371];
  fStack_1c388 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x380];
  fStack_1c214 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38f];
  fStack_1bdb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39e];
  fStack_1bc44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ad];
  fStack_1b674 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bc];
  fStack_1adbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3cb];
  fStack_1ac48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3da];
  fStack_1aad4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e9];
  fStack_1a960 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f8];
  fStack_1a504 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x407];
  fStack_1a390 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x416];
  fStack_1a21c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x425];
  fStack_19dc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x434];
  fStack_19c4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x443];
  fStack_197f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x452];
  fStack_18f38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x461];
  fStack_18dc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x470];
  fStack_18c50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47f];
  fStack_187f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48e];
  fStack_18680 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49d];
  fStack_18224 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ac];
  fStack_1796c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4bb];
  fStack_177f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ca];
  fStack_1739c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d9];
  fStack_16ae4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e8];
  fStack_234dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xc0];
  fStack_227c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x129];
  fStack_22654 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x138];
  fStack_224e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x147];
  fStack_22084 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x156];
  fStack_21f10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x165];
  fStack_21d9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x174];
  fStack_21940 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x183];
  fStack_217cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x192];
  fStack_21370 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a1];
  fStack_20ab8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b0];
  fStack_20944 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bf];
  fStack_207d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ce];
  fStack_2065c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1dd];
  fStack_204e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ec];
  fStack_20374 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fb];
  fStack_1ff18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20a];
  fStack_1fda4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x219];
  fStack_1fc30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x228];
  fStack_1fabc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x237];
  fStack_1f948 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x246];
  fStack_1f4ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x255];
  fStack_1f378 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x264];
  fStack_1f204 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x273];
  fStack_1f090 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x282];
  fStack_1ec34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x291];
  fStack_1eac0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a0];
  fStack_1e94c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2af];
  fStack_1e4f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2be];
  fStack_1e37c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cd];
  fStack_1df20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2dc];
  fStack_1d7dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2eb];
  fStack_1d668 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fa];
  fStack_1d4f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x309];
  fStack_1d380 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x318];
  fStack_1d20c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x327];
  fStack_1cdb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x336];
  fStack_1cc3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x345];
  fStack_1cac8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x354];
  fStack_1c954 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x363];
  fStack_1c4f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x372];
  fStack_1c384 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x381];
  fStack_1c210 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x390];
  fStack_1bdb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39f];
  fStack_1bc40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ae];
  fStack_1b670 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bd];
  fStack_1adb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3cc];
  fStack_1ac44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3db];
  fStack_1aad0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ea];
  fStack_1a95c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f9];
  fStack_1a500 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x408];
  fStack_1a38c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x417];
  fStack_1a218 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x426];
  fStack_19dbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x435];
  fStack_19c48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x444];
  fStack_197ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x453];
  fStack_18f34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x462];
  fStack_18dc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x471];
  fStack_18c4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x480];
  fStack_187f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48f];
  fStack_1867c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49e];
  fStack_18220 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ad];
  fStack_17968 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4bc];
  fStack_177f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cb];
  fStack_17398 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4da];
  fStack_16ae0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e9];
  fStack_23364 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xd0];
  fStack_227c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x12a];
  fStack_22650 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x139];
  fStack_224dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x148];
  fStack_22080 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x157];
  fStack_21f0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x166];
  fStack_21d98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x175];
  fStack_2193c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x184];
  fStack_217c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x193];
  fStack_2136c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a2];
  fStack_20ab4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b1];
  fStack_20940 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c0];
  fStack_207cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cf];
  fStack_20658 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1de];
  fStack_204e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ed];
  fStack_20370 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fc];
  fStack_1ff14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20b];
  fStack_1fda0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21a];
  fStack_1fc2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x229];
  fStack_1fab8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x238];
  fStack_1f944 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x247];
  fStack_1f4e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x256];
  fStack_1f374 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x265];
  fStack_1f200 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x274];
  fStack_1f08c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x283];
  fStack_1ec30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x292];
  fStack_1eabc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a1];
  fStack_1e948 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b0];
  fStack_1e4ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2bf];
  fStack_1e378 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ce];
  fStack_1df1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2dd];
  fStack_1d7d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ec];
  fStack_1d664 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fb];
  fStack_1d4f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30a];
  fStack_1d37c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x319];
  fStack_1d208 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x328];
  fStack_1cdac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x337];
  fStack_1cc38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x346];
  fStack_1cac4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x355];
  fStack_1c950 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x364];
  fStack_1c4f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x373];
  fStack_1c380 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x382];
  fStack_1c20c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x391];
  fStack_1bdb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a0];
  fStack_1bc3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3af];
  fStack_1b66c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3be];
  fStack_1adb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3cd];
  fStack_1ac40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3dc];
  fStack_1aacc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3eb];
  fStack_1a958 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fa];
  fStack_1a4fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x409];
  fStack_1a388 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x418];
  fStack_1a214 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x427];
  fStack_19db8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x436];
  fStack_19c44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x445];
  fStack_197e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x454];
  fStack_18f30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x463];
  fStack_18dbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x472];
  fStack_18c48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x481];
  fStack_187ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x490];
  fStack_18678 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49f];
  fStack_1821c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ae];
  fStack_17964 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4bd];
  fStack_177f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cc];
  fStack_17394 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4db];
  fStack_16adc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ea];
  fStack_231ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe0];
  fStack_227c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[299];
  fStack_2264c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13a];
  fStack_224d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x149];
  fStack_2207c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x158];
  fStack_21f08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x167];
  fStack_21d94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x176];
  fStack_21938 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x185];
  fStack_217c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x194];
  fStack_21368 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a3];
  fStack_20ab0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b2];
  fStack_2093c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c1];
  fStack_207c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d0];
  fStack_20654 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1df];
  fStack_204e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ee];
  fStack_2036c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fd];
  fStack_1ff10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20c];
  fStack_1fd9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21b];
  fStack_1fc28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22a];
  fStack_1fab4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x239];
  fStack_1f940 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x248];
  fStack_1f4e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[599];
  fStack_1f370 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x266];
  fStack_1f1fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x275];
  fStack_1f088 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x284];
  fStack_1ec2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x293];
  fStack_1eab8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a2];
  fStack_1e944 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b1];
  fStack_1e4e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c0];
  fStack_1e374 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cf];
  fStack_1df18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2de];
  fStack_1d7d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ed];
  fStack_1d660 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fc];
  fStack_1d4ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30b];
  fStack_1d378 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31a];
  fStack_1d204 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x329];
  fStack_1cda8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x338];
  fStack_1cc34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x347];
  fStack_1cac0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x356];
  fStack_1c94c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x365];
  fStack_1c4f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x374];
  fStack_1c37c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[899];
  fStack_1c208 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x392];
  fStack_1bdac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a1];
  fStack_1bc38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b0];
  fStack_1b668 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bf];
  fStack_1adb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ce];
  fStack_1ac3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3dd];
  fStack_1aac8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ec];
  fStack_1a954 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fb];
  fStack_1a4f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40a];
  fStack_1a384 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x419];
  fStack_1a210 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x428];
  fStack_19db4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x437];
  fStack_19c40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x446];
  fStack_197e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x455];
  fStack_18f2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x464];
  fStack_18db8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x473];
  fStack_18c44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x482];
  fStack_187e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x491];
  fStack_18674 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a0];
  fStack_18218 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4af];
  fStack_17960 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4be];
  fStack_177ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cd];
  fStack_17390 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4dc];
  fStack_16ad8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4eb];
  fStack_241e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30];
  fStack_227bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x12f];
  fStack_22648 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13e];
  fStack_221ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14d];
  fStack_22078 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15c];
  fStack_21f04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16b];
  fStack_21aa8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17a];
  fStack_21934 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x189];
  fStack_214d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x198];
  fStack_20c20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a7];
  fStack_20aac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b6];
  fStack_20938 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c5];
  fStack_207c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d4];
  fStack_20650 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e3];
  fStack_204dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f2];
  fStack_20080 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x201];
  fStack_1ff0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x210];
  fStack_1fd98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21f];
  fStack_1fc24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22e];
  fStack_1fab0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23d];
  fStack_1f654 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24c];
  fStack_1f4e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25b];
  fStack_1f36c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26a];
  fStack_1f1f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x279];
  fStack_1ed9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x288];
  fStack_1ec28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x297];
  fStack_1eab4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a6];
  fStack_1e658 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b5];
  fStack_1e4e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c4];
  fStack_1e088 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d3];
  fStack_1d944 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e2];
  fStack_1d7d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f1];
  fStack_1d65c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x300];
  fStack_1d4e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30f];
  fStack_1d374 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31e];
  fStack_1cf18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32d];
  fStack_1cda4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33c];
  fStack_1cc30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34b];
  fStack_1cabc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35a];
  fStack_1c660 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x369];
  fStack_1c4ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x378];
  fStack_1c378 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x387];
  fStack_1bf1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x396];
  fStack_1bda8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a5];
  fStack_1b7d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b4];
  fStack_1af20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c3];
  fStack_1adac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d2];
  fStack_1ac38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e1];
  fStack_1aac4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f0];
  fStack_1a668 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ff];
  fStack_1a4f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40e];
  fStack_1a380 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41d];
  fStack_19f24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42c];
  fStack_19db0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43b];
  fStack_19954 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44a];
  fStack_1909c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x459];
  fStack_18f28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x468];
  fStack_18db4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x477];
  fStack_18958 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x486];
  fStack_187e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x495];
  fStack_18388 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a4];
  fStack_17ad0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b3];
  fStack_1795c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c2];
  fStack_17500 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d1];
  fStack_16c48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e0];
  fStack_2406c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40];
  fStack_227b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x130];
  fStack_22644 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13f];
  fStack_221e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14e];
  fStack_22074 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15d];
  fStack_21f00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16c];
  fStack_21aa4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17b];
  fStack_21930 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18a];
  fStack_214d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x199];
  fStack_20c1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a8];
  fStack_20aa8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b7];
  fStack_20934 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c6];
  fStack_207c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d5];
  fStack_2064c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e4];
  fStack_204d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[499];
  fStack_2007c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x202];
  fStack_1ff08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x211];
  fStack_1fd94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x220];
  fStack_1fc20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22f];
  fStack_1faac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23e];
  fStack_1f650 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24d];
  fStack_1f4dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25c];
  fStack_1f368 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26b];
  fStack_1f1f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27a];
  fStack_1ed98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x289];
  fStack_1ec24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x298];
  fStack_1eab0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a7];
  fStack_1e654 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b6];
  fStack_1e4e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c5];
  fStack_1e084 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d4];
  fStack_1d940 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e3];
  fStack_1d7cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f2];
  fStack_1d658 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x301];
  fStack_1d4e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x310];
  fStack_1d370 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[799];
  fStack_1cf14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32e];
  fStack_1cda0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33d];
  fStack_1cc2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34c];
  fStack_1cab8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35b];
  fStack_1c65c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36a];
  fStack_1c4e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x379];
  fStack_1c374 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x388];
  fStack_1bf18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x397];
  fStack_1bda4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a6];
  fStack_1b7d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b5];
  fStack_1af1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c4];
  fStack_1ada8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d3];
  fStack_1ac34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e2];
  fStack_1aac0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f1];
  fStack_1a664 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x400];
  fStack_1a4f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40f];
  fStack_1a37c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41e];
  fStack_19f20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42d];
  fStack_19dac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43c];
  fStack_19950 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[1099];
  fStack_19098 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45a];
  fStack_18f24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x469];
  fStack_18db0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x478];
  fStack_18954 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x487];
  fStack_187e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x496];
  fStack_18384 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a5];
  fStack_17acc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b4];
  fStack_17958 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c3];
  fStack_174fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d2];
  fStack_16c44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e1];
  fStack_23ef4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x50];
  fStack_227b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x131];
  fStack_22640 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x140];
  fStack_221e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14f];
  fStack_22070 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15e];
  fStack_21efc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16d];
  fStack_21aa0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17c];
  fStack_2192c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18b];
  fStack_214d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19a];
  fStack_20c18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a9];
  fStack_20aa4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b8];
  fStack_20930 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c7];
  fStack_207bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d6];
  fStack_20648 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e5];
  fStack_204d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[500];
  fStack_20078 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x203];
  fStack_1ff04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x212];
  fStack_1fd90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x221];
  fStack_1fc1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x230];
  fStack_1faa8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23f];
  fStack_1f64c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24e];
  fStack_1f4d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25d];
  fStack_1f364 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26c];
  fStack_1f1f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27b];
  fStack_1ed94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28a];
  fStack_1ec20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x299];
  fStack_1eaac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a8];
  fStack_1e650 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b7];
  fStack_1e4dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c6];
  fStack_1e080 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d5];
  fStack_1d93c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e4];
  fStack_1d7c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f3];
  fStack_1d654 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x302];
  fStack_1d4e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x311];
  fStack_1d36c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[800];
  fStack_1cf10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32f];
  fStack_1cd9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33e];
  fStack_1cc28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34d];
  fStack_1cab4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35c];
  fStack_1c658 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36b];
  fStack_1c4e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37a];
  fStack_1c370 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x389];
  fStack_1bf14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x398];
  fStack_1bda0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a7];
  fStack_1b7d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b6];
  fStack_1af18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c5];
  fStack_1ada4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d4];
  fStack_1ac30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e3];
  fStack_1aabc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f2];
  fStack_1a660 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x401];
  fStack_1a4ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x410];
  fStack_1a378 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41f];
  fStack_19f1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42e];
  fStack_19da8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43d];
  fStack_1994c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44c];
  fStack_19094 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45b];
  fStack_18f20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46a];
  fStack_18dac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x479];
  fStack_18950 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x488];
  fStack_187dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x497];
  fStack_18380 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a6];
  fStack_17ac8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b5];
  fStack_17954 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c4];
  fStack_174f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d3];
  fStack_16c40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e2];
  fStack_23d7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x60];
  fStack_227b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x132];
  fStack_2263c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x141];
  fStack_221e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x150];
  fStack_2206c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15f];
  fStack_21ef8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16e];
  fStack_21a9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17d];
  fStack_21928 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18c];
  fStack_214cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19b];
  fStack_20c14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1aa];
  fStack_20aa0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b9];
  fStack_2092c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c8];
  fStack_207b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d7];
  fStack_20644 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e6];
  fStack_204d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f5];
  fStack_20074 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x204];
  fStack_1ff00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x213];
  fStack_1fd8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x222];
  fStack_1fc18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x231];
  fStack_1faa4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x240];
  fStack_1f648 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24f];
  fStack_1f4d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25e];
  fStack_1f360 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26d];
  fStack_1f1ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27c];
  fStack_1ed90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28b];
  fStack_1ec1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29a];
  fStack_1eaa8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a9];
  fStack_1e64c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b8];
  fStack_1e4d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c7];
  fStack_1e07c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d6];
  fStack_1d938 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e5];
  fStack_1d7c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f4];
  fStack_1d650 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x303];
  fStack_1d4dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x312];
  fStack_1d368 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x321];
  fStack_1cf0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x330];
  fStack_1cd98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33f];
  fStack_1cc24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34e];
  fStack_1cab0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35d];
  fStack_1c654 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36c];
  fStack_1c4e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37b];
  fStack_1c36c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38a];
  fStack_1bf10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x399];
  fStack_1bd9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a8];
  fStack_1b7cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b7];
  fStack_1af14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c6];
  fStack_1ada0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d5];
  fStack_1ac2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e4];
  fStack_1aab8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f3];
  fStack_1a65c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x402];
  fStack_1a4e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x411];
  fStack_1a374 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x420];
  fStack_19f18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42f];
  fStack_19da4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43e];
  fStack_19948 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44d];
  fStack_19090 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45c];
  fStack_18f1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46b];
  fStack_18da8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47a];
  fStack_1894c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x489];
  fStack_187d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x498];
  fStack_1837c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a7];
  fStack_17ac4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b6];
  fStack_17950 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c5];
  fStack_174f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d4];
  fStack_16c3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e3];
  fStack_23c04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x80];
  fStack_227ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x134];
  fStack_22638 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x143];
  fStack_221dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x152];
  fStack_22068 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x161];
  fStack_21ef4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x170];
  fStack_21a98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17f];
  fStack_21924 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18e];
  fStack_214c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19d];
  fStack_20c10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ac];
  fStack_20a9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bb];
  fStack_20928 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ca];
  fStack_207b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d9];
  fStack_20640 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e8];
  fStack_204cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f7];
  fStack_20070 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x206];
  fStack_1fefc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x215];
  fStack_1fd88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x224];
  fStack_1fc14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x233];
  fStack_1faa0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x242];
  fStack_1f644 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x251];
  fStack_1f4d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x260];
  fStack_1f35c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26f];
  fStack_1f1e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27e];
  fStack_1ed8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28d];
  fStack_1ec18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29c];
  fStack_1eaa4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ab];
  fStack_1e648 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ba];
  fStack_1e4d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c9];
  fStack_1e078 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d8];
  fStack_1d934 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e7];
  fStack_1d7c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f6];
  fStack_1d64c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x305];
  fStack_1d4d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x314];
  fStack_1d364 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x323];
  fStack_1cf08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x332];
  fStack_1cd94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x341];
  fStack_1cc20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x350];
  fStack_1caac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35f];
  fStack_1c650 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36e];
  fStack_1c4dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37d];
  fStack_1c368 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38c];
  fStack_1bf0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39b];
  fStack_1bd98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3aa];
  fStack_1b7c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b9];
  fStack_1af10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c8];
  fStack_1ad9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d7];
  fStack_1ac28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e6];
  fStack_1aab4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f5];
  fStack_1a658 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x404];
  fStack_1a4e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x413];
  fStack_1a370 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x422];
  fStack_19f14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x431];
  fStack_19da0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x440];
  fStack_19944 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44f];
  fStack_1908c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45e];
  fStack_18f18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46d];
  fStack_18da4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47c];
  fStack_18948 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48b];
  fStack_187d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49a];
  fStack_18378 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a9];
  fStack_17ac0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b8];
  fStack_1794c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c7];
  fStack_174f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d6];
  fStack_16c38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e5];
  fStack_23a8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x90];
  fStack_227a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x135];
  fStack_22634 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x144];
  fStack_221d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x153];
  fStack_22064 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x162];
  fStack_21ef0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x171];
  fStack_21a94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x180];
  fStack_21920 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[399];
  fStack_214c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19e];
  fStack_20c0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ad];
  fStack_20a98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bc];
  fStack_20924 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cb];
  fStack_207b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1da];
  fStack_2063c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e9];
  fStack_204c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f8];
  fStack_2006c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x207];
  fStack_1fef8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x216];
  fStack_1fd84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x225];
  fStack_1fc10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x234];
  fStack_1fa9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x243];
  fStack_1f640 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x252];
  fStack_1f4cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x261];
  fStack_1f358 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x270];
  fStack_1f1e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27f];
  fStack_1ed88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28e];
  fStack_1ec14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29d];
  fStack_1eaa0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ac];
  fStack_1e644 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[699];
  fStack_1e4d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ca];
  fStack_1e074 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d9];
  fStack_1d930 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e8];
  fStack_1d7bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f7];
  fStack_1d648 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x306];
  fStack_1d4d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x315];
  fStack_1d360 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x324];
  fStack_1cf04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x333];
  fStack_1cd90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x342];
  fStack_1cc1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x351];
  fStack_1caa8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x360];
  fStack_1c64c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36f];
  fStack_1c4d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37e];
  fStack_1c364 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38d];
  fStack_1bf08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39c];
  fStack_1bd94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ab];
  fStack_1b7c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ba];
  fStack_1af0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c9];
  fStack_1ad98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d8];
  fStack_1ac24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[999];
  fStack_1aab0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f6];
  fStack_1a654 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x405];
  fStack_1a4e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x414];
  fStack_1a36c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x423];
  fStack_19f10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x432];
  fStack_19d9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x441];
  fStack_19940 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x450];
  fStack_19088 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45f];
  fStack_18f14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46e];
  fStack_18da0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47d];
  fStack_18944 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48c];
  fStack_187d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49b];
  fStack_18374 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4aa];
  fStack_17abc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b9];
  fStack_17948 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c8];
  fStack_174ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d7];
  fStack_16c34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e6];
  fStack_23914 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xa0];
  fStack_227a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x136];
  fStack_22630 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x145];
  fStack_221d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x154];
  fStack_22060 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x163];
  fStack_21eec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x172];
  fStack_21a90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x181];
  fStack_2191c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[400];
  fStack_214c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19f];
  fStack_20c08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ae];
  fStack_20a94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bd];
  fStack_20920 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cc];
  fStack_207ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1db];
  fStack_20638 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ea];
  fStack_204c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f9];
  fStack_20068 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x208];
  fStack_1fef4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x217];
  fStack_1fd80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x226];
  fStack_1fc0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x235];
  fStack_1fa98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x244];
  fStack_1f63c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x253];
  fStack_1f4c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x262];
  fStack_1f354 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x271];
  fStack_1f1e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x280];
  fStack_1ed84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28f];
  fStack_1ec10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29e];
  fStack_1ea9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ad];
  fStack_1e640 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[700];
  fStack_1e4cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cb];
  fStack_1e070 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2da];
  fStack_1d92c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e9];
  fStack_1d7b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f8];
  fStack_1d644 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x307];
  fStack_1d4d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x316];
  fStack_1d35c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x325];
  fStack_1cf00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x334];
  fStack_1cd8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x343];
  fStack_1cc18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x352];
  fStack_1caa4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x361];
  fStack_1c648 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x370];
  fStack_1c4d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37f];
  fStack_1c360 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38e];
  fStack_1bf04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39d];
  fStack_1bd90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ac];
  fStack_1b7c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bb];
  fStack_1af08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ca];
  fStack_1ad94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d9];
  fStack_1ac20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[1000];
  fStack_1aaac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f7];
  fStack_1a650 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x406];
  fStack_1a4dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x415];
  fStack_1a368 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x424];
  fStack_19f0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x433];
  fStack_19d98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x442];
  fStack_1993c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x451];
  fStack_19084 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x460];
  fStack_18f10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46f];
  fStack_18d9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47e];
  fStack_18940 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48d];
  fStack_187cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49c];
  fStack_18370 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ab];
  fStack_17ab8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ba];
  fStack_17944 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c9];
  fStack_174e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d8];
  fStack_16c30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e7];
  fStack_2379c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xb0];
  fStack_227a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x137];
  fStack_2262c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x146];
  fStack_221d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x155];
  fStack_2205c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x164];
  fStack_21ee8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x173];
  fStack_21a8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x182];
  fStack_21918 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x191];
  fStack_214bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a0];
  fStack_20c04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1af];
  fStack_20a90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1be];
  fStack_2091c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cd];
  fStack_207a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1dc];
  fStack_20634 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1eb];
  fStack_204c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fa];
  fStack_20064 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x209];
  fStack_1fef0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x218];
  fStack_1fd7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x227];
  fStack_1fc08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x236];
  fStack_1fa94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x245];
  fStack_1f638 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x254];
  fStack_1f4c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x263];
  fStack_1f350 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x272];
  fStack_1f1dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x281];
  fStack_1ed80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x290];
  fStack_1ec0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29f];
  fStack_1ea98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ae];
  fStack_1e63c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2bd];
  fStack_1e4c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cc];
  fStack_1e06c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2db];
  fStack_1d928 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ea];
  fStack_1d7b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f9];
  fStack_1d640 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x308];
  fStack_1d4cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x317];
  fStack_1d358 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x326];
  fStack_1cefc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x335];
  fStack_1cd88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x344];
  fStack_1cc14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x353];
  fStack_1caa0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x362];
  fStack_1c644 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x371];
  fStack_1c4d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x380];
  fStack_1c35c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38f];
  fStack_1bf00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39e];
  fStack_1bd8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ad];
  fStack_1b7bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bc];
  fStack_1af04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3cb];
  fStack_1ad90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3da];
  fStack_1ac1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e9];
  fStack_1aaa8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f8];
  fStack_1a64c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x407];
  fStack_1a4d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x416];
  fStack_1a364 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x425];
  fStack_19f08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x434];
  fStack_19d94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x443];
  fStack_19938 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x452];
  fStack_19080 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x461];
  fStack_18f0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x470];
  fStack_18d98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47f];
  fStack_1893c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48e];
  fStack_187c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49d];
  fStack_1836c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ac];
  fStack_17ab4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4bb];
  fStack_17940 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ca];
  fStack_174e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d9];
  fStack_16c2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e8];
  fStack_23624 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xc0];
  fStack_231c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xed];
  fStack_23054 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfc];
  fStack_22ee0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10b];
  fStack_22a84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11a];
  fStack_22910 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x129];
  fStack_2279c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x138];
  fStack_22628 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x147];
  fStack_221cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x156];
  fStack_22058 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x165];
  fStack_21ee4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x174];
  fStack_21a88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x183];
  fStack_21914 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x192];
  fStack_214b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a1];
  fStack_20c00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b0];
  fStack_20a8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bf];
  fStack_20918 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ce];
  fStack_207a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1dd];
  fStack_20630 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ec];
  fStack_204bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fb];
  fStack_20060 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20a];
  fStack_1feec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x219];
  fStack_1fd78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x228];
  fStack_1fc04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x237];
  fStack_1fa90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x246];
  fStack_1f634 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x255];
  fStack_1f4c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x264];
  fStack_1f34c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x273];
  fStack_1f1d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x282];
  fStack_1ed7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x291];
  fStack_1ec08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a0];
  fStack_1ea94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2af];
  fStack_1e638 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2be];
  fStack_1e4c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cd];
  fStack_1e068 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2dc];
  fStack_1d924 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2eb];
  fStack_1d7b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fa];
  fStack_1d63c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x309];
  fStack_1d4c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x318];
  fStack_1d354 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x327];
  fStack_1cef8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x336];
  fStack_1cd84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x345];
  fStack_1cc10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x354];
  fStack_1ca9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x363];
  fStack_1c640 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x372];
  fStack_1c4cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x381];
  fStack_1c358 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x390];
  fStack_1befc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39f];
  fStack_1bd88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ae];
  fStack_1b7b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bd];
  fStack_1af00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3cc];
  fStack_1ad8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3db];
  fStack_1ac18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ea];
  fStack_1aaa4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f9];
  fStack_1a648 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x408];
  fStack_1a4d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x417];
  fStack_1a360 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x426];
  fStack_19f04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x435];
  fStack_19d90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x444];
  fStack_19934 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x453];
  fStack_1907c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x462];
  fStack_18f08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x471];
  fStack_18d94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x480];
  fStack_18938 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48f];
  fStack_187c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49e];
  fStack_18368 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ad];
  fStack_17ab0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4bc];
  fStack_1793c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cb];
  fStack_174e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4da];
  fStack_16c28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e9];
  fStack_23338 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe0];
  fStack_231c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xef];
  fStack_23050 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfe];
  fStack_22edc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10d];
  fStack_22a80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11c];
  fStack_2290c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[299];
  fStack_22798 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13a];
  fStack_22624 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x149];
  fStack_221c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x158];
  fStack_22054 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x167];
  fStack_21ee0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x176];
  fStack_21a84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x185];
  fStack_21910 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x194];
  fStack_214b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a3];
  fStack_20bfc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b2];
  fStack_20a88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c1];
  fStack_20914 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d0];
  fStack_207a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1df];
  fStack_2062c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ee];
  fStack_204b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fd];
  fStack_2005c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20c];
  fStack_1fee8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21b];
  fStack_1fd74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22a];
  fStack_1fc00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x239];
  fStack_1fa8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x248];
  fStack_1f630 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[599];
  fStack_1f4bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x266];
  fStack_1f348 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x275];
  fStack_1f1d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x284];
  fStack_1ed78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x293];
  fStack_1ec04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a2];
  fStack_1ea90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b1];
  fStack_1e634 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c0];
  fStack_1e4c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cf];
  fStack_1e064 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2de];
  fStack_1d920 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ed];
  fStack_1d7ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fc];
  fStack_1d638 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30b];
  fStack_1d4c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31a];
  fStack_1d350 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x329];
  fStack_1cef4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x338];
  fStack_1cd80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x347];
  fStack_1cc0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x356];
  fStack_1ca98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x365];
  fStack_1c63c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x374];
  fStack_1c4c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[899];
  fStack_1c354 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x392];
  fStack_1bef8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a1];
  fStack_1bd84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b0];
  fStack_1b7b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bf];
  fStack_1aefc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ce];
  fStack_1ad88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3dd];
  fStack_1ac14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ec];
  fStack_1aaa0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fb];
  fStack_1a644 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40a];
  fStack_1a4d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x419];
  fStack_1a35c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x428];
  fStack_19f00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x437];
  fStack_19d8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x446];
  fStack_19930 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x455];
  fStack_19078 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x464];
  fStack_18f04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x473];
  fStack_18d90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x482];
  fStack_18934 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x491];
  fStack_187c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a0];
  fStack_18364 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4af];
  fStack_17aac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4be];
  fStack_17938 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cd];
  fStack_174dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4dc];
  fStack_16c24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4eb];
  fStack_1fbfc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30];
  fStack_1ea8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe4];
  fStack_1e918 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf3];
  fStack_1e7a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x102];
  fStack_1e630 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x111];
  fStack_1e4bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x120];
  fStack_1e348 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x12f];
  fStack_1e1d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13e];
  fStack_1e060 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14d];
  fStack_1deec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15c];
  fStack_1dd78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16b];
  fStack_1dc04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17a];
  fStack_1da90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x189];
  fStack_1cef0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a7];
  fStack_1cd7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b6];
  fStack_1cc08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c5];
  fStack_1ca94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d4];
  fStack_1c920 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e3];
  fStack_1c7ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f2];
  fStack_1c638 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x201];
  fStack_1c4c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x210];
  fStack_1c350 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21f];
  fStack_1c1dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22e];
  fStack_1c068 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23d];
  fStack_1bef4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24c];
  fStack_1bd80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25b];
  fStack_1bc0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26a];
  fStack_1ba98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x198];
  fStack_1b924 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x279];
  fStack_1b7b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x288];
  fStack_1b63c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x297];
  fStack_1b4c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a6];
  fStack_1b354 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b5];
  fStack_1b1e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c4];
  fStack_1b06c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d3];
  fStack_1a640 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e2];
  fStack_1a4cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f1];
  fStack_1a358 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x300];
  fStack_1a1e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30f];
  fStack_1a070 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31e];
  fStack_19efc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32d];
  fStack_19d88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33c];
  fStack_19c14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34b];
  fStack_19aa0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35a];
  fStack_1992c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x369];
  fStack_197b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x378];
  fStack_19644 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x387];
  fStack_194d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x396];
  fStack_1935c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a5];
  fStack_191e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b4];
  fStack_18930 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c3];
  fStack_187bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d2];
  fStack_18648 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e1];
  fStack_184d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f0];
  fStack_18360 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ff];
  fStack_181ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40e];
  fStack_18078 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41d];
  fStack_17f04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42c];
  fStack_17d90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43b];
  fStack_17c1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44a];
  fStack_174d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x459];
  fStack_17364 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x468];
  fStack_171f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x477];
  fStack_1707c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x486];
  fStack_16f08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x495];
  fStack_16d94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a4];
  fStack_167c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b3];
  fStack_16650 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c2];
  fStack_164dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d1];
  fStack_16080 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e0];
  fStack_1fa84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40];
  fStack_1ea88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe5];
  fStack_1e914 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf4];
  fStack_1e7a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x103];
  fStack_1e62c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x112];
  fStack_1e4b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x121];
  fStack_1e344 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x130];
  fStack_1e1d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13f];
  fStack_1e05c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14e];
  fStack_1dee8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15d];
  fStack_1dd74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16c];
  fStack_1dc00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17b];
  fStack_1da8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18a];
  fStack_1ceec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a8];
  fStack_1cd78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b7];
  fStack_1cc04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c6];
  fStack_1ca90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d5];
  fStack_1c91c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e4];
  fStack_1c7a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[499];
  fStack_1c634 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x202];
  fStack_1c4c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x211];
  fStack_1c34c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x220];
  fStack_1c1d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22f];
  fStack_1c064 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23e];
  fStack_1bef0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24d];
  fStack_1bd7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25c];
  fStack_1bc08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26b];
  fStack_1ba94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x199];
  fStack_1b920 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27a];
  fStack_1b7ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x289];
  fStack_1b638 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x298];
  fStack_1b4c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a7];
  fStack_1b350 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b6];
  fStack_1b1dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c5];
  fStack_1b068 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d4];
  fStack_1a63c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e3];
  fStack_1a4c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f2];
  fStack_1a354 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x301];
  fStack_1a1e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x310];
  fStack_1a06c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[799];
  fStack_19ef8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32e];
  fStack_19d84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33d];
  fStack_19c10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34c];
  fStack_19a9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35b];
  fStack_19928 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36a];
  fStack_197b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x379];
  fStack_19640 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x388];
  fStack_194cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x397];
  fStack_19358 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a6];
  fStack_191e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b5];
  fStack_1892c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c4];
  fStack_187b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d3];
  fStack_18644 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e2];
  fStack_184d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f1];
  fStack_1835c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x400];
  fStack_181e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40f];
  fStack_18074 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41e];
  fStack_17f00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42d];
  fStack_17d8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43c];
  fStack_17c18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[1099];
  fStack_174d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45a];
  fStack_17360 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x469];
  fStack_171ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x478];
  fStack_17078 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x487];
  fStack_16f04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x496];
  fStack_16d90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a5];
  fStack_167c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b4];
  fStack_1664c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c3];
  fStack_164d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d2];
  fStack_1607c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e1];
  fStack_1f90c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x50];
  fStack_1ea84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe6];
  fStack_1e910 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf5];
  fStack_1e79c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x104];
  fStack_1e628 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x113];
  fStack_1e4b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x122];
  fStack_1e340 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x131];
  fStack_1e1cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x140];
  fStack_1e058 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14f];
  fStack_1dee4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15e];
  fStack_1dd70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16d];
  fStack_1dbfc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17c];
  fStack_1da88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18b];
  fStack_1cee8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a9];
  fStack_1cd74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b8];
  fStack_1cc00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c7];
  fStack_1ca8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d6];
  fStack_1c918 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e5];
  fStack_1c7a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[500];
  fStack_1c630 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x203];
  fStack_1c4bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x212];
  fStack_1c348 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x221];
  fStack_1c1d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x230];
  fStack_1c060 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23f];
  fStack_1beec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24e];
  fStack_1bd78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25d];
  fStack_1bc04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26c];
  fStack_1ba90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19a];
  fStack_1b91c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27b];
  fStack_1b7a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28a];
  fStack_1b634 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x299];
  fStack_1b4c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a8];
  fStack_1b34c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b7];
  fStack_1b1d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c6];
  fStack_1b064 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d5];
  fStack_1a638 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e4];
  fStack_1a4c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f3];
  fStack_1a350 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x302];
  fStack_1a1dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x311];
  fStack_1a068 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[800];
  fStack_19ef4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32f];
  fStack_19d80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33e];
  fStack_19c0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34d];
  fStack_19a98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35c];
  fStack_19924 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36b];
  fStack_197b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37a];
  fStack_1963c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x389];
  fStack_194c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x398];
  fStack_19354 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a7];
  fStack_191e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b6];
  fStack_18928 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c5];
  fStack_187b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d4];
  fStack_18640 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e3];
  fStack_184cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f2];
  fStack_18358 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x401];
  fStack_181e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x410];
  fStack_18070 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41f];
  fStack_17efc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42e];
  fStack_17d88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43d];
  fStack_17c14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44c];
  fStack_174d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45b];
  fStack_1735c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46a];
  fStack_171e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x479];
  fStack_17074 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x488];
  fStack_16f00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x497];
  fStack_16d8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a6];
  fStack_167bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b5];
  fStack_16648 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c4];
  fStack_164d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d3];
  fStack_16078 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e2];
  fStack_1f794 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x60];
  fStack_1ea80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe7];
  fStack_1e90c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf6];
  fStack_1e798 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x105];
  fStack_1e624 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x114];
  fStack_1e4b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x123];
  fStack_1e33c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x132];
  fStack_1e1c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x141];
  fStack_1e054 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x150];
  fStack_1dee0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15f];
  fStack_1dd6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16e];
  fStack_1dbf8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17d];
  fStack_1da84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18c];
  fStack_1cee4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1aa];
  fStack_1cd70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b9];
  fStack_1cbfc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c8];
  fStack_1ca88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d7];
  fStack_1c914 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e6];
  fStack_1c7a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f5];
  fStack_1c62c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x204];
  fStack_1c4b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x213];
  fStack_1c344 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x222];
  fStack_1c1d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x231];
  fStack_1c05c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x240];
  fStack_1bee8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24f];
  fStack_1bd74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25e];
  fStack_1bc00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26d];
  fStack_1ba8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19b];
  fStack_1b918 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27c];
  fStack_1b7a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28b];
  fStack_1b630 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29a];
  fStack_1b4bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a9];
  fStack_1b348 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b8];
  fStack_1b1d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c7];
  fStack_1b060 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d6];
  fStack_1a634 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e5];
  fStack_1a4c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f4];
  fStack_1a34c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x303];
  fStack_1a1d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x312];
  fStack_1a064 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x321];
  fStack_19ef0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x330];
  fStack_19d7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33f];
  fStack_19c08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34e];
  fStack_19a94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35d];
  fStack_19920 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36c];
  fStack_197ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37b];
  fStack_19638 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38a];
  fStack_194c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x399];
  fStack_19350 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a8];
  fStack_191dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b7];
  fStack_18924 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c6];
  fStack_187b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d5];
  fStack_1863c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e4];
  fStack_184c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f3];
  fStack_18354 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x402];
  fStack_181e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x411];
  fStack_1806c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x420];
  fStack_17ef8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42f];
  fStack_17d84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43e];
  fStack_17c10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44d];
  fStack_174cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45c];
  fStack_17358 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46b];
  fStack_171e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47a];
  fStack_17070 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x489];
  fStack_16efc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x498];
  fStack_16d88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a7];
  fStack_167b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b6];
  fStack_16644 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c5];
  fStack_164d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d4];
  fStack_16074 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e3];
  fStack_1f61c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x70];
  fStack_1ea7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe8];
  fStack_1e908 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf7];
  fStack_1e794 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x106];
  fStack_1e620 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x115];
  fStack_1e4ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x124];
  fStack_1e338 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x133];
  fStack_1e1c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x142];
  fStack_1e050 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x151];
  fStack_1dedc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x160];
  fStack_1dd68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16f];
  fStack_1dbf4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17e];
  fStack_1da80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18d];
  fStack_1cee0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ab];
  fStack_1cd6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ba];
  fStack_1cbf8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c9];
  fStack_1ca84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d8];
  fStack_1c910 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e7];
  fStack_1c79c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f6];
  fStack_1c628 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x205];
  fStack_1c4b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x214];
  fStack_1c340 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x223];
  fStack_1c1cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x232];
  fStack_1c058 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x241];
  fStack_1bee4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x250];
  fStack_1bd70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25f];
  fStack_1bbfc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26e];
  fStack_1ba88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19c];
  fStack_1b914 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27d];
  fStack_1b7a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28c];
  fStack_1b62c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29b];
  fStack_1b4b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2aa];
  fStack_1b344 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b9];
  fStack_1b1d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c8];
  fStack_1b05c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d7];
  fStack_1a630 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e6];
  fStack_1a4bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f5];
  fStack_1a348 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x304];
  fStack_1a1d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x313];
  fStack_1a060 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x322];
  fStack_19eec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x331];
  fStack_19d78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x340];
  fStack_19c04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34f];
  fStack_19a90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35e];
  fStack_1991c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36d];
  fStack_197a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37c];
  fStack_19634 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38b];
  fStack_194c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39a];
  fStack_1934c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a9];
  fStack_191d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b8];
  fStack_18920 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c7];
  fStack_187ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d6];
  fStack_18638 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e5];
  fStack_184c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f4];
  fStack_18350 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x403];
  fStack_181dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x412];
  fStack_18068 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x421];
  fStack_17ef4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x430];
  fStack_17d80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43f];
  fStack_17c0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44e];
  fStack_174c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45d];
  fStack_17354 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46c];
  fStack_171e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47b];
  fStack_1706c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48a];
  fStack_16ef8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x499];
  fStack_16d84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a8];
  fStack_167b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b7];
  fStack_16640 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c6];
  fStack_164cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d5];
  fStack_16070 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e4];
  fStack_1f4a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x80];
  fStack_1ea78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe9];
  fStack_1e904 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf8];
  fStack_1e790 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x107];
  fStack_1e61c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x116];
  fStack_1e4a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x125];
  fStack_1e334 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x134];
  fStack_1e1c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x143];
  fStack_1e04c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x152];
  fStack_1ded8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x161];
  fStack_1dd64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x170];
  fStack_1dbf0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17f];
  fStack_1da7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18e];
  fStack_1cedc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ac];
  fStack_1cd68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bb];
  fStack_1cbf4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ca];
  fStack_1ca80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d9];
  fStack_1c90c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e8];
  fStack_1c798 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f7];
  fStack_1c624 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x206];
  fStack_1c4b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x215];
  fStack_1c33c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x224];
  fStack_1c1c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x233];
  fStack_1c054 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x242];
  fStack_1bee0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x251];
  fStack_1bd6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x260];
  fStack_1bbf8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26f];
  fStack_1ba84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19d];
  fStack_1b910 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27e];
  fStack_1b79c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28d];
  fStack_1b628 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29c];
  fStack_1b4b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ab];
  fStack_1b340 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ba];
  fStack_1b1cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c9];
  fStack_1b058 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d8];
  fStack_1a62c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e7];
  fStack_1a4b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f6];
  fStack_1a344 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x305];
  fStack_1a1d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x314];
  fStack_1a05c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x323];
  fStack_19ee8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x332];
  fStack_19d74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x341];
  fStack_19c00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x350];
  fStack_19a8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35f];
  fStack_19918 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36e];
  fStack_197a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37d];
  fStack_19630 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38c];
  fStack_194bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39b];
  fStack_19348 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3aa];
  fStack_191d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b9];
  fStack_1891c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c8];
  fStack_187a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d7];
  fStack_18634 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e6];
  fStack_184c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f5];
  fStack_1834c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x404];
  fStack_181d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x413];
  fStack_18064 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x422];
  fStack_17ef0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x431];
  fStack_17d7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x440];
  fStack_17c08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44f];
  fStack_174c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45e];
  fStack_17350 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46d];
  fStack_171dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47c];
  fStack_17068 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48b];
  fStack_16ef4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49a];
  fStack_16d80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a9];
  fStack_167b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b8];
  fStack_1663c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c7];
  fStack_164c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d6];
  fStack_1606c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e5];
  fStack_1f32c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x90];
  fStack_1ea74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xea];
  fStack_1e900 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf9];
  fStack_1e78c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x108];
  fStack_1e618 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x117];
  fStack_1e4a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x126];
  fStack_1e330 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x135];
  fStack_1e1bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x144];
  fStack_1e048 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x153];
  fStack_1ded4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x162];
  fStack_1dd60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x171];
  fStack_1dbec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x180];
  fStack_1da78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[399];
  fStack_1ced8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ad];
  fStack_1cd64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bc];
  fStack_1cbf0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cb];
  fStack_1ca7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1da];
  fStack_1c908 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e9];
  fStack_1c794 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f8];
  fStack_1c620 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x207];
  fStack_1c4ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x216];
  fStack_1c338 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x225];
  fStack_1c1c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x234];
  fStack_1c050 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x243];
  fStack_1bedc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x252];
  fStack_1bd68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x261];
  fStack_1bbf4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x270];
  fStack_1ba80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19e];
  fStack_1b90c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27f];
  fStack_1b798 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28e];
  fStack_1b624 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29d];
  fStack_1b4b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ac];
  fStack_1b33c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[699];
  fStack_1b1c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ca];
  fStack_1b054 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d9];
  fStack_1a628 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e8];
  fStack_1a4b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f7];
  fStack_1a340 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x306];
  fStack_1a1cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x315];
  fStack_1a058 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x324];
  fStack_19ee4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x333];
  fStack_19d70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x342];
  fStack_19bfc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x351];
  fStack_19a88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x360];
  fStack_19914 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36f];
  fStack_197a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37e];
  fStack_1962c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38d];
  fStack_194b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39c];
  fStack_19344 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ab];
  fStack_191d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ba];
  fStack_18918 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c9];
  fStack_187a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d8];
  fStack_18630 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[999];
  fStack_184bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f6];
  fStack_18348 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x405];
  fStack_181d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x414];
  fStack_18060 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x423];
  fStack_17eec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x432];
  fStack_17d78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x441];
  fStack_17c04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x450];
  fStack_174c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45f];
  fStack_1734c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46e];
  fStack_171d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47d];
  fStack_17064 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48c];
  fStack_16ef0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49b];
  fStack_16d7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4aa];
  fStack_167ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b9];
  fStack_16638 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c8];
  fStack_164c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d7];
  fStack_16068 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e6];
  fStack_1f1b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xa0];
  fStack_1ea70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xeb];
  fStack_1e8fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfa];
  fStack_1e788 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x109];
  fStack_1e614 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x118];
  fStack_1e4a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x127];
  fStack_1e32c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x136];
  fStack_1e1b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x145];
  fStack_1e044 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x154];
  fStack_1ded0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x163];
  fStack_1dd5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x172];
  fStack_1dbe8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x181];
  fStack_1da74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[400];
  fStack_1ced4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ae];
  fStack_1cd60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bd];
  fStack_1cbec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cc];
  fStack_1ca78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1db];
  fStack_1c904 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ea];
  fStack_1c790 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f9];
  fStack_1c61c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x208];
  fStack_1c4a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x217];
  fStack_1c334 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x226];
  fStack_1c1c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x235];
  fStack_1c04c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x244];
  fStack_1bed8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x253];
  fStack_1bd64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x262];
  fStack_1bbf0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x271];
  fStack_1ba7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19f];
  fStack_1b908 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x280];
  fStack_1b794 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28f];
  fStack_1b620 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29e];
  fStack_1b4ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ad];
  fStack_1b338 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[700];
  fStack_1b1c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cb];
  fStack_1b050 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2da];
  fStack_1a624 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e9];
  fStack_1a4b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f8];
  fStack_1a33c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x307];
  fStack_1a1c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x316];
  fStack_1a054 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x325];
  fStack_19ee0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x334];
  fStack_19d6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x343];
  fStack_19bf8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x352];
  fStack_19a84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x361];
  fStack_19910 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x370];
  fStack_1979c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37f];
  fStack_19628 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38e];
  fStack_194b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39d];
  fStack_19340 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ac];
  fStack_191cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bb];
  fStack_18914 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ca];
  fStack_187a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d9];
  fStack_1862c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[1000];
  fStack_184b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f7];
  fStack_18344 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x406];
  fStack_181d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x415];
  fStack_1805c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x424];
  fStack_17ee8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x433];
  fStack_17d74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x442];
  fStack_17c00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x451];
  fStack_174bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x460];
  fStack_17348 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46f];
  fStack_171d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47e];
  fStack_17060 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48d];
  fStack_16eec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49c];
  fStack_16d78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ab];
  fStack_167a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ba];
  fStack_16634 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c9];
  fStack_164c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d8];
  fStack_16064 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e7];
  fStack_1f03c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xb0];
  fStack_1ea6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xec];
  fStack_1e8f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfb];
  fStack_1e784 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10a];
  fStack_1e610 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x119];
  fStack_1e49c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x128];
  fStack_1e328 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x137];
  fStack_1e1b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x146];
  fStack_1e040 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x155];
  fStack_1decc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x164];
  fStack_1dd58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x173];
  fStack_1dbe4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x182];
  fStack_1da70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x191];
  fStack_1ced0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1af];
  fStack_1cd5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1be];
  fStack_1cbe8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cd];
  fStack_1ca74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1dc];
  fStack_1c900 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1eb];
  fStack_1c78c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fa];
  fStack_1c618 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x209];
  fStack_1c4a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x218];
  fStack_1c330 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x227];
  fStack_1c1bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x236];
  fStack_1c048 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x245];
  fStack_1bed4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x254];
  fStack_1bd60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x263];
  fStack_1bbec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x272];
  fStack_1ba78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a0];
  fStack_1b904 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x281];
  fStack_1b790 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x290];
  fStack_1b61c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29f];
  fStack_1b4a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ae];
  fStack_1b334 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2bd];
  fStack_1b1c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cc];
  fStack_1b04c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2db];
  fStack_1a620 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ea];
  fStack_1a4ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f9];
  fStack_1a338 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x308];
  fStack_1a1c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x317];
  fStack_1a050 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x326];
  fStack_19edc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x335];
  fStack_19d68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x344];
  fStack_19bf4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x353];
  fStack_19a80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x362];
  fStack_1990c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x371];
  fStack_19798 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x380];
  fStack_19624 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38f];
  fStack_194b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39e];
  fStack_1933c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ad];
  fStack_191c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bc];
  fStack_18910 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3cb];
  fStack_1879c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3da];
  fStack_18628 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e9];
  fStack_184b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f8];
  fStack_18340 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x407];
  fStack_181cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x416];
  fStack_18058 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x425];
  fStack_17ee4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x434];
  fStack_17d70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x443];
  fStack_17bfc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x452];
  fStack_174b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x461];
  fStack_17344 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x470];
  fStack_171d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47f];
  fStack_1705c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48e];
  fStack_16ee8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49d];
  fStack_16d74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ac];
  fStack_167a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4bb];
  fStack_16630 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ca];
  fStack_164bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d9];
  fStack_16060 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e8];
  fStack_1eec4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xc0];
  fStack_1ea68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xed];
  fStack_1e8f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfc];
  fStack_1e780 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10b];
  fStack_1e60c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11a];
  fStack_1e498 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x129];
  fStack_1e324 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x138];
  fStack_1e1b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x147];
  fStack_1e03c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x156];
  fStack_1dec8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x165];
  fStack_1dd54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x174];
  fStack_1dbe0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x183];
  fStack_1da6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x192];
  fStack_1cecc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b0];
  fStack_1cd58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bf];
  fStack_1cbe4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ce];
  fStack_1ca70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1dd];
  fStack_1c8fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ec];
  fStack_1c788 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fb];
  fStack_1c614 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20a];
  fStack_1c4a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x219];
  fStack_1c32c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x228];
  fStack_1c1b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x237];
  fStack_1c044 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x246];
  fStack_1bed0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x255];
  fStack_1bd5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x264];
  fStack_1bbe8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x273];
  fStack_1ba74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a1];
  fStack_1b900 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x282];
  fStack_1b78c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x291];
  fStack_1b618 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a0];
  fStack_1b4a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2af];
  fStack_1b330 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2be];
  fStack_1b1bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cd];
  fStack_1b048 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2dc];
  fStack_1a61c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2eb];
  fStack_1a4a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fa];
  fStack_1a334 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x309];
  fStack_1a1c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x318];
  fStack_1a04c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x327];
  fStack_19ed8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x336];
  fStack_19d64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x345];
  fStack_19bf0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x354];
  fStack_19a7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x363];
  fStack_19908 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x372];
  fStack_19794 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x381];
  fStack_19620 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x390];
  fStack_194ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39f];
  fStack_19338 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ae];
  fStack_191c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bd];
  fStack_1890c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3cc];
  fStack_18798 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3db];
  fStack_18624 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ea];
  fStack_184b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f9];
  fStack_1833c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x408];
  fStack_181c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x417];
  fStack_18054 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x426];
  fStack_17ee0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x435];
  fStack_17d6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x444];
  fStack_17bf8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x453];
  fStack_174b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x462];
  fStack_17340 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x471];
  fStack_171cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x480];
  fStack_17058 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48f];
  fStack_16ee4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49e];
  fStack_16d70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ad];
  fStack_167a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4bc];
  fStack_1662c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cb];
  fStack_164b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4da];
  fStack_1605c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e9];
  fStack_1ed4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xd0];
  fStack_1ea64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xee];
  fStack_1e8f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfd];
  fStack_1e77c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10c];
  fStack_1e608 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11b];
  fStack_1e494 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x12a];
  fStack_1e320 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x139];
  fStack_1e1ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x148];
  fStack_1e038 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x157];
  fStack_1dec4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x166];
  fStack_1dd50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x175];
  fStack_1dbdc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x184];
  fStack_1da68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x193];
  fStack_1cec8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b1];
  fStack_1cd54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c0];
  fStack_1cbe0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cf];
  fStack_1ca6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1de];
  fStack_1c8f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ed];
  fStack_1c784 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fc];
  fStack_1c610 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20b];
  fStack_1c49c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21a];
  fStack_1c328 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x229];
  fStack_1c1b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x238];
  fStack_1c040 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x247];
  fStack_1becc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x256];
  fStack_1bd58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x265];
  fStack_1bbe4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x274];
  fStack_1ba70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a2];
  fStack_1b8fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x283];
  fStack_1b788 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x292];
  fStack_1b614 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a1];
  fStack_1b4a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b0];
  fStack_1b32c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2bf];
  fStack_1b1b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ce];
  fStack_1b044 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2dd];
  fStack_1a618 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ec];
  fStack_1a4a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fb];
  fStack_1a330 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30a];
  fStack_1a1bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x319];
  fStack_1a048 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x328];
  fStack_19ed4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x337];
  fStack_19d60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x346];
  fStack_19bec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x355];
  fStack_19a78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x364];
  fStack_19904 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x373];
  fStack_19790 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x382];
  fStack_1961c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x391];
  fStack_194a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a0];
  fStack_19334 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3af];
  fStack_191c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3be];
  fStack_18908 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3cd];
  fStack_18794 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3dc];
  fStack_18620 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3eb];
  fStack_184ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fa];
  fStack_18338 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x409];
  fStack_181c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x418];
  fStack_18050 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x427];
  fStack_17edc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x436];
  fStack_17d68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x445];
  fStack_17bf4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x454];
  fStack_174b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x463];
  fStack_1733c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x472];
  fStack_171c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x481];
  fStack_17054 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x490];
  fStack_16ee0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49f];
  fStack_16d6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ae];
  fStack_1679c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4bd];
  fStack_16628 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cc];
  fStack_164b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4db];
  fStack_16058 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ea];
  fStack_1ebd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe0];
  fStack_1ea60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xef];
  fStack_1e8ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfe];
  fStack_1e778 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10d];
  fStack_1e604 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11c];
  fStack_1e490 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[299];
  fStack_1e31c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13a];
  fStack_1e1a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x149];
  fStack_1e034 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x158];
  fStack_1dec0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x167];
  fStack_1dd4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x176];
  fStack_1dbd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x185];
  fStack_1da64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x194];
  fStack_1cec4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b2];
  fStack_1cd50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c1];
  fStack_1cbdc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d0];
  fStack_1ca68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1df];
  fStack_1c8f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ee];
  fStack_1c780 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fd];
  fStack_1c60c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20c];
  fStack_1c498 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21b];
  fStack_1c324 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22a];
  fStack_1c1b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x239];
  fStack_1c03c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x248];
  fStack_1bec8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[599];
  fStack_1bd54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x266];
  fStack_1bbe0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x275];
  fStack_1ba6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a3];
  fStack_1b8f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x284];
  fStack_1b784 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x293];
  fStack_1b610 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a2];
  fStack_1b49c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b1];
  fStack_1b328 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c0];
  fStack_1b1b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cf];
  fStack_1b040 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2de];
  fStack_1a614 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ed];
  fStack_1a4a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fc];
  fStack_1a32c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30b];
  fStack_1a1b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31a];
  fStack_1a044 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x329];
  fStack_19ed0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x338];
  fStack_19d5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x347];
  fStack_19be8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x356];
  fStack_19a74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x365];
  fStack_19900 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x374];
  fStack_1978c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[899];
  fStack_19618 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x392];
  fStack_194a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a1];
  fStack_19330 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b0];
  fStack_191bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bf];
  fStack_18904 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ce];
  fStack_18790 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3dd];
  fStack_1861c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ec];
  fStack_184a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fb];
  fStack_18334 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40a];
  fStack_181c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x419];
  fStack_1804c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x428];
  fStack_17ed8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x437];
  fStack_17d64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x446];
  fStack_17bf0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x455];
  fStack_174ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x464];
  fStack_17338 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x473];
  fStack_171c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x482];
  fStack_17050 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x491];
  fStack_16edc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a0];
  fStack_16d68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4af];
  fStack_16798 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4be];
  fStack_16624 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cd];
  fStack_164b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4dc];
  fStack_16054 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4eb];
  fStack_208e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10];
  fStack_1f1a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe2];
  fStack_1f02c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf1];
  fStack_1eeb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x100];
  fStack_1ebd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10f];
  fStack_1ea5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11e];
  fStack_1e8e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x12d];
  fStack_1e774 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13c];
  fStack_1e48c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14b];
  fStack_1e318 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15a];
  fStack_1e1a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x169];
  fStack_1debc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x178];
  fStack_1dd48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x187];
  fStack_1da60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x196];
  fStack_1d778 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a5];
  fStack_1d604 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b4];
  fStack_1d490 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c3];
  fStack_1d31c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d2];
  fStack_1d1a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e1];
  fStack_1d034 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f0];
  fStack_1cd4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ff];
  fStack_1cbd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20e];
  fStack_1ca64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21d];
  fStack_1c8f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22c];
  fStack_1c77c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23b];
  fStack_1c494 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24a];
  fStack_1c320 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x259];
  fStack_1c1ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x268];
  fStack_1c038 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x277];
  fStack_1bd50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x286];
  fStack_1bbdc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x295];
  fStack_1b8f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a4];
  fStack_1b60c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b3];
  fStack_1b498 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c2];
  fStack_1b1b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d1];
  fStack_1ad54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e0];
  fStack_1abe0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ef];
  fStack_1aa6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fe];
  fStack_1a8f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30d];
  fStack_1a784 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31c];
  fStack_1a49c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32b];
  fStack_1a328 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33a];
  fStack_1a1b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x349];
  fStack_1a040 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x358];
  fStack_19d58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x367];
  fStack_19be4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x376];
  fStack_19a70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x385];
  fStack_19788 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x394];
  fStack_19614 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a3];
  fStack_1932c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b2];
  fStack_18ed0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c1];
  fStack_18d5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d0];
  fStack_18be8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3df];
  fStack_18a74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ee];
  fStack_1878c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fd];
  fStack_18618 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40c];
  fStack_184a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41b];
  fStack_181bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42a];
  fStack_18048 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x439];
  fStack_17d60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x448];
  fStack_17904 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x457];
  fStack_17790 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x466];
  fStack_1761c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x475];
  fStack_17334 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x484];
  fStack_171c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x493];
  fStack_16ed8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a2];
  fStack_16a7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b1];
  fStack_16908 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c0];
  fStack_16620 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cf];
  fStack_161c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4de];
  fStack_20768 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20];
  fStack_1f19c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe3];
  fStack_1f028 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf2];
  fStack_1eeb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x101];
  fStack_1ebcc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x110];
  fStack_1ea58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11f];
  fStack_1e8e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x12e];
  fStack_1e770 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13d];
  fStack_1e488 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14c];
  fStack_1e314 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15b];
  fStack_1e1a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16a];
  fStack_1deb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x179];
  fStack_1dd44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x188];
  fStack_1da5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x197];
  fStack_1d774 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a6];
  fStack_1d600 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b5];
  fStack_1d48c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c4];
  fStack_1d318 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d3];
  fStack_1d1a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e2];
  fStack_1d030 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f1];
  fStack_1cd48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x200];
  fStack_1cbd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20f];
  fStack_1ca60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21e];
  fStack_1c8ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22d];
  fStack_1c778 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23c];
  fStack_1c490 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24b];
  fStack_1c31c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25a];
  fStack_1c1a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x269];
  fStack_1c034 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x278];
  fStack_1bd4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x287];
  fStack_1bbd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x296];
  fStack_1b8f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a5];
  fStack_1b608 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b4];
  fStack_1b494 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c3];
  fStack_1b1ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d2];
  fStack_1ad50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e1];
  fStack_1abdc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f0];
  fStack_1aa68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ff];
  fStack_1a8f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30e];
  fStack_1a780 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31d];
  fStack_1a498 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32c];
  fStack_1a324 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33b];
  fStack_1a1b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34a];
  fStack_1a03c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x359];
  fStack_19d54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x368];
  fStack_19be0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x377];
  fStack_19a6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x386];
  fStack_19784 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x395];
  fStack_19610 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a4];
  fStack_19328 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b3];
  fStack_18ecc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c2];
  fStack_18d58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d1];
  fStack_18be4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e0];
  fStack_18a70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ef];
  fStack_18788 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fe];
  fStack_18614 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40d];
  fStack_184a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41c];
  fStack_181b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42b];
  fStack_18044 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43a];
  fStack_17d5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x449];
  fStack_17900 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x458];
  fStack_1778c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x467];
  fStack_17618 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x476];
  fStack_17330 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x485];
  fStack_171bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x494];
  fStack_16ed4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a3];
  fStack_16a78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b2];
  fStack_16904 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c1];
  fStack_1661c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d0];
  fStack_161c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4df];
  fStack_205f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30];
  fStack_1f198 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe4];
  fStack_1f024 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf3];
  fStack_1eeb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x102];
  fStack_1ebc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x111];
  fStack_1ea54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x120];
  fStack_1e8e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x12f];
  fStack_1e76c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13e];
  fStack_1e484 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14d];
  fStack_1e310 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15c];
  fStack_1e19c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16b];
  fStack_1deb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17a];
  fStack_1dd40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x189];
  fStack_1da58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x198];
  fStack_1d770 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a7];
  fStack_1d5fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b6];
  fStack_1d488 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c5];
  fStack_1d314 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d4];
  fStack_1d1a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e3];
  fStack_1d02c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f2];
  fStack_1cd44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x201];
  fStack_1cbd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x210];
  fStack_1ca5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21f];
  fStack_1c8e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22e];
  fStack_1c774 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23d];
  fStack_1c48c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24c];
  fStack_1c318 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25b];
  fStack_1c1a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26a];
  fStack_1c030 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x279];
  fStack_1bd48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x288];
  fStack_1bbd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x297];
  fStack_1b8ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a6];
  fStack_1b604 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b5];
  fStack_1b490 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c4];
  fStack_1b1a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d3];
  fStack_1ad4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e2];
  fStack_1abd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f1];
  fStack_1aa64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x300];
  fStack_1a8f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30f];
  fStack_1a77c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31e];
  fStack_1a494 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32d];
  fStack_1a320 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33c];
  fStack_1a1ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34b];
  fStack_1a038 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35a];
  fStack_19d50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x369];
  fStack_19bdc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x378];
  fStack_19a68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x387];
  fStack_19780 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x396];
  fStack_1960c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a5];
  fStack_19324 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b4];
  fStack_18ec8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c3];
  fStack_18d54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d2];
  fStack_18be0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e1];
  fStack_18a6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f0];
  fStack_18784 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ff];
  fStack_18610 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40e];
  fStack_1849c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41d];
  fStack_181b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42c];
  fStack_18040 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43b];
  fStack_17d58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44a];
  fStack_178fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x459];
  fStack_17788 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x468];
  fStack_17614 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x477];
  fStack_1732c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x486];
  fStack_171b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x495];
  fStack_16ed0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a4];
  fStack_16a74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b3];
  fStack_16900 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c2];
  fStack_16618 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d1];
  fStack_161bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e0];
  fStack_20478 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40];
  fStack_1f194 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe5];
  fStack_1f020 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf4];
  fStack_1eeac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x103];
  fStack_1ebc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x112];
  fStack_1ea50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x121];
  fStack_1e8dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x130];
  fStack_1e768 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13f];
  fStack_1e480 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14e];
  fStack_1e30c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15d];
  fStack_1e198 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16c];
  fStack_1deb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17b];
  fStack_1dd3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18a];
  fStack_1da54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x199];
  fStack_1d76c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a8];
  fStack_1d5f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b7];
  fStack_1d484 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c6];
  fStack_1d310 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d5];
  fStack_1d19c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e4];
  fStack_1d028 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[499];
  fStack_1cd40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x202];
  fStack_1cbcc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x211];
  fStack_1ca58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x220];
  fStack_1c8e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22f];
  fStack_1c770 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23e];
  fStack_1c488 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24d];
  fStack_1c314 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25c];
  fStack_1c1a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26b];
  fStack_1c02c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27a];
  fStack_1bd44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x289];
  fStack_1bbd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x298];
  fStack_1b8e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a7];
  fStack_1b600 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b6];
  fStack_1b48c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c5];
  fStack_1b1a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d4];
  fStack_1ad48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e3];
  fStack_1abd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f2];
  fStack_1aa60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x301];
  fStack_1a8ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x310];
  fStack_1a778 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[799];
  fStack_1a490 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32e];
  fStack_1a31c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33d];
  fStack_1a1a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34c];
  fStack_1a034 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35b];
  fStack_19d4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36a];
  fStack_19bd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x379];
  fStack_19a64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x388];
  fStack_1977c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x397];
  fStack_19608 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a6];
  fStack_19320 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b5];
  fStack_18ec4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c4];
  fStack_18d50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d3];
  fStack_18bdc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e2];
  fStack_18a68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f1];
  fStack_18780 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x400];
  fStack_1860c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40f];
  fStack_18498 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41e];
  fStack_181b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42d];
  fStack_1803c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43c];
  fStack_17d54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[1099];
  fStack_178f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45a];
  fStack_17784 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x469];
  fStack_17610 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x478];
  fStack_17328 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x487];
  fStack_171b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x496];
  fStack_16ecc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a5];
  fStack_16a70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b4];
  fStack_168fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c3];
  fStack_16614 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d2];
  fStack_161b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e1];
  fStack_20300 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x50];
  fStack_1f190 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe6];
  fStack_1f01c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf5];
  fStack_1eea8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x104];
  fStack_1ebc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x113];
  fStack_1ea4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x122];
  fStack_1e8d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x131];
  fStack_1e764 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x140];
  fStack_1e47c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14f];
  fStack_1e308 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15e];
  fStack_1e194 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16d];
  fStack_1deac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17c];
  fStack_1dd38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18b];
  fStack_1da50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19a];
  fStack_1d768 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a9];
  fStack_1d5f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b8];
  fStack_1d480 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c7];
  fStack_1d30c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d6];
  fStack_1d198 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e5];
  fStack_1d024 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[500];
  fStack_1cd3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x203];
  fStack_1cbc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x212];
  fStack_1ca54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x221];
  fStack_1c8e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x230];
  fStack_1c76c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23f];
  fStack_1c484 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24e];
  fStack_1c310 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25d];
  fStack_1c19c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26c];
  fStack_1c028 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27b];
  fStack_1bd40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28a];
  fStack_1bbcc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x299];
  fStack_1b8e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a8];
  fStack_1b5fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b7];
  fStack_1b488 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c6];
  fStack_1b1a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d5];
  fStack_1ad44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e4];
  fStack_1abd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f3];
  fStack_1aa5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x302];
  fStack_1a8e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x311];
  fStack_1a774 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[800];
  fStack_1a48c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32f];
  fStack_1a318 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33e];
  fStack_1a1a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34d];
  fStack_1a030 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35c];
  fStack_19d48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36b];
  fStack_19bd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37a];
  fStack_19a60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x389];
  fStack_19778 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x398];
  fStack_19604 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a7];
  fStack_1931c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b6];
  fStack_18ec0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c5];
  fStack_18d4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d4];
  fStack_18bd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e3];
  fStack_18a64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f2];
  fStack_1877c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x401];
  fStack_18608 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x410];
  fStack_18494 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41f];
  fStack_181ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42e];
  fStack_18038 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43d];
  fStack_17d50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44c];
  fStack_178f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45b];
  fStack_17780 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46a];
  fStack_1760c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x479];
  fStack_17324 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x488];
  fStack_171b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x497];
  fStack_16ec8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a6];
  fStack_16a6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b5];
  fStack_168f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c4];
  fStack_16610 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d3];
  fStack_161b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e2];
  fStack_20188 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x60];
  fStack_1f18c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe7];
  fStack_1f018 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf6];
  fStack_1eea4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x105];
  fStack_1ebbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x114];
  fStack_1ea48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x123];
  fStack_1e8d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x132];
  fStack_1e760 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x141];
  fStack_1e478 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x150];
  fStack_1e304 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15f];
  fStack_1e190 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16e];
  fStack_1dea8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17d];
  fStack_1dd34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18c];
  fStack_1da4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19b];
  fStack_1d764 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1aa];
  fStack_1d5f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b9];
  fStack_1d47c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c8];
  fStack_1d308 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d7];
  fStack_1d194 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e6];
  fStack_1d020 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f5];
  fStack_1cd38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x204];
  fStack_1cbc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x213];
  fStack_1ca50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x222];
  fStack_1c8dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x231];
  fStack_1c768 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x240];
  fStack_1c480 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24f];
  fStack_1c30c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25e];
  fStack_1c198 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26d];
  fStack_1c024 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27c];
  fStack_1bd3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28b];
  fStack_1bbc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29a];
  fStack_1b8e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a9];
  fStack_1b5f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b8];
  fStack_1b484 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c7];
  fStack_1b19c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d6];
  fStack_1ad40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e5];
  fStack_1abcc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f4];
  fStack_1aa58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x303];
  fStack_1a8e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x312];
  fStack_1a770 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x321];
  fStack_1a488 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x330];
  fStack_1a314 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33f];
  fStack_1a1a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34e];
  fStack_1a02c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35d];
  fStack_19d44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36c];
  fStack_19bd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37b];
  fStack_19a5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38a];
  fStack_19774 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x399];
  fStack_19600 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a8];
  fStack_19318 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b7];
  fStack_18ebc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c6];
  fStack_18d48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d5];
  fStack_18bd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e4];
  fStack_18a60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f3];
  fStack_18778 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x402];
  fStack_18604 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x411];
  fStack_18490 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x420];
  fStack_181a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42f];
  fStack_18034 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43e];
  fStack_17d4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44d];
  fStack_178f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45c];
  fStack_1777c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46b];
  fStack_17608 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47a];
  fStack_17320 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x489];
  fStack_171ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x498];
  fStack_16ec4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a7];
  fStack_16a68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b6];
  fStack_168f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c5];
  fStack_1660c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d4];
  fStack_161b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e3];
  fStack_1fe9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x70];
  fStack_1f188 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe8];
  fStack_1f014 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf7];
  fStack_1eea0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x106];
  fStack_1ebb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x115];
  fStack_1ea44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x124];
  fStack_1e8d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x133];
  fStack_1e75c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x142];
  fStack_1e474 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x151];
  fStack_1e300 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x160];
  fStack_1e18c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16f];
  fStack_1dea4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17e];
  fStack_1dd30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18d];
  fStack_1da48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19c];
  fStack_1d760 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ab];
  fStack_1d5ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ba];
  fStack_1d478 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c9];
  fStack_1d304 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d8];
  fStack_1d190 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e7];
  fStack_1d01c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f6];
  fStack_1cd34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x205];
  fStack_1cbc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x214];
  fStack_1ca4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x223];
  fStack_1c8d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x232];
  fStack_1c764 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x241];
  fStack_1c47c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x250];
  fStack_1c308 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25f];
  fStack_1c194 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26e];
  fStack_1c020 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27d];
  fStack_1bd38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28c];
  fStack_1bbc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29b];
  fStack_1b8dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2aa];
  fStack_1b5f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b9];
  fStack_1b480 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c8];
  fStack_1b198 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d7];
  fStack_1ad3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e6];
  fStack_1abc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f5];
  fStack_1aa54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x304];
  fStack_1a8e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x313];
  fStack_1a76c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x322];
  fStack_1a484 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x331];
  fStack_1a310 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x340];
  fStack_1a19c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34f];
  fStack_1a028 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35e];
  fStack_19d40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36d];
  fStack_19bcc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37c];
  fStack_19a58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38b];
  fStack_19770 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39a];
  fStack_195fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a9];
  fStack_19314 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b8];
  fStack_18eb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c7];
  fStack_18d44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d6];
  fStack_18bd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e5];
  fStack_18a5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f4];
  fStack_18774 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x403];
  fStack_18600 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x412];
  fStack_1848c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x421];
  fStack_181a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x430];
  fStack_18030 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43f];
  fStack_17d48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44e];
  fStack_178ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45d];
  fStack_17778 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46c];
  fStack_17604 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47b];
  fStack_1731c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48a];
  fStack_171a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x499];
  fStack_16ec0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a8];
  fStack_16a64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b7];
  fStack_168f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c6];
  fStack_16608 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d5];
  fStack_161ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e4];
  fStack_1fd24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x80];
  fStack_1f184 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe9];
  fStack_1f010 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf8];
  fStack_1ee9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x107];
  fStack_1ebb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x116];
  fStack_1ea40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x125];
  fStack_1e8cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x134];
  fStack_1e758 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x143];
  fStack_1e470 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x152];
  fStack_1e2fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x161];
  fStack_1e188 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x170];
  fStack_1dea0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17f];
  fStack_1dd2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18e];
  fStack_1da44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19d];
  fStack_1d75c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ac];
  fStack_1d5e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bb];
  fStack_1d474 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ca];
  fStack_1d300 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d9];
  fStack_1d18c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e8];
  fStack_1d018 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f7];
  fStack_1cd30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x206];
  fStack_1cbbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x215];
  fStack_1ca48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x224];
  fStack_1c8d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x233];
  fStack_1c760 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x242];
  fStack_1c478 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x251];
  fStack_1c304 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x260];
  fStack_1c190 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26f];
  fStack_1c01c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27e];
  fStack_1bd34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28d];
  fStack_1bbc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29c];
  fStack_1b8d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ab];
  fStack_1b5f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ba];
  fStack_1b47c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c9];
  fStack_1b194 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d8];
  fStack_1ad38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e7];
  fStack_1abc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f6];
  fStack_1aa50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x305];
  fStack_1a8dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x314];
  fStack_1a768 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x323];
  fStack_1a480 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x332];
  fStack_1a30c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x341];
  fStack_1a198 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x350];
  fStack_1a024 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35f];
  fStack_19d3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36e];
  fStack_19bc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37d];
  fStack_19a54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38c];
  fStack_1976c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39b];
  fStack_195f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3aa];
  fStack_19310 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b9];
  fStack_18eb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c8];
  fStack_18d40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d7];
  fStack_18bcc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e6];
  fStack_18a58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f5];
  fStack_18770 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x404];
  fStack_185fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x413];
  fStack_18488 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x422];
  fStack_181a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x431];
  fStack_1802c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x440];
  fStack_17d44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44f];
  fStack_178e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45e];
  fStack_17774 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46d];
  fStack_17600 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47c];
  fStack_17318 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48b];
  fStack_171a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49a];
  fStack_16ebc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a9];
  fStack_16a60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b8];
  fStack_168ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c7];
  fStack_16604 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d6];
  fStack_161a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e5];
  fStack_1fbac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x90];
  fStack_1f180 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xea];
  fStack_1f00c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf9];
  fStack_1ee98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x108];
  fStack_1ebb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x117];
  fStack_1ea3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x126];
  fStack_1e8c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x135];
  fStack_1e754 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x144];
  fStack_1e46c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x153];
  fStack_1e2f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x162];
  fStack_1e184 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x171];
  fStack_1de9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x180];
  fStack_1dd28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[399];
  fStack_1da40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19e];
  fStack_1d758 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ad];
  fStack_1d5e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bc];
  fStack_1d470 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cb];
  fStack_1d2fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1da];
  fStack_1d188 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e9];
  fStack_1d014 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f8];
  fStack_1cd2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x207];
  fStack_1cbb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x216];
  fStack_1ca44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x225];
  fStack_1c8d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x234];
  fStack_1c75c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x243];
  fStack_1c474 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x252];
  fStack_1c300 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x261];
  fStack_1c18c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x270];
  fStack_1c018 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27f];
  fStack_1bd30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28e];
  fStack_1bbbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29d];
  fStack_1b8d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ac];
  fStack_1b5ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[699];
  fStack_1b478 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ca];
  fStack_1b190 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d9];
  fStack_1ad34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e8];
  fStack_1abc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f7];
  fStack_1aa4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x306];
  fStack_1a8d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x315];
  fStack_1a764 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x324];
  fStack_1a47c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x333];
  fStack_1a308 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x342];
  fStack_1a194 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x351];
  fStack_1a020 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x360];
  fStack_19d38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36f];
  fStack_19bc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37e];
  fStack_19a50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38d];
  fStack_19768 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39c];
  fStack_195f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ab];
  fStack_1930c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ba];
  fStack_18eb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c9];
  fStack_18d3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d8];
  fStack_18bc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[999];
  fStack_18a54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f6];
  fStack_1876c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x405];
  fStack_185f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x414];
  fStack_18484 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x423];
  fStack_1819c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x432];
  fStack_18028 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x441];
  fStack_17d40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x450];
  fStack_178e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45f];
  fStack_17770 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46e];
  fStack_175fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47d];
  fStack_17314 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48c];
  fStack_171a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49b];
  fStack_16eb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4aa];
  fStack_16a5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b9];
  fStack_168e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c8];
  fStack_16600 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d7];
  fStack_161a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e6];
  fStack_1fa34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xa0];
  fStack_1f17c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xeb];
  fStack_1f008 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfa];
  fStack_1ee94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x109];
  fStack_1ebac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x118];
  fStack_1ea38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x127];
  fStack_1e8c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x136];
  fStack_1e750 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x145];
  fStack_1e468 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x154];
  fStack_1e2f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x163];
  fStack_1e180 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x172];
  fStack_1de98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x181];
  fStack_1dd24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[400];
  fStack_1da3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19f];
  fStack_1d754 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ae];
  fStack_1d5e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bd];
  fStack_1d46c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cc];
  fStack_1d2f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1db];
  fStack_1d184 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ea];
  fStack_1d010 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f9];
  fStack_1cd28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x208];
  fStack_1cbb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x217];
  fStack_1ca40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x226];
  fStack_1c8cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x235];
  fStack_1c758 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x244];
  fStack_1c470 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x253];
  fStack_1c2fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x262];
  fStack_1c188 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x271];
  fStack_1c014 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x280];
  fStack_1bd2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28f];
  fStack_1bbb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29e];
  fStack_1b8d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ad];
  fStack_1b5e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[700];
  fStack_1b474 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cb];
  fStack_1b18c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2da];
  fStack_1ad30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e9];
  fStack_1abbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f8];
  fStack_1aa48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x307];
  fStack_1a8d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x316];
  fStack_1a760 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x325];
  fStack_1a478 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x334];
  fStack_1a304 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x343];
  fStack_1a190 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x352];
  fStack_1a01c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x361];
  fStack_19d34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x370];
  fStack_19bc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37f];
  fStack_19a4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38e];
  fStack_19764 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39d];
  fStack_195f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ac];
  fStack_19308 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bb];
  fStack_18eac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ca];
  fStack_18d38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d9];
  fStack_18bc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[1000];
  fStack_18a50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f7];
  fStack_18768 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x406];
  fStack_185f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x415];
  fStack_18480 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x424];
  fStack_18198 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x433];
  fStack_18024 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x442];
  fStack_17d3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x451];
  fStack_178e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x460];
  fStack_1776c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46f];
  fStack_175f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47e];
  fStack_17310 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48d];
  fStack_1719c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49c];
  fStack_16eb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ab];
  fStack_16a58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ba];
  fStack_168e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c9];
  fStack_165fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d8];
  fStack_161a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e7];
  fStack_1f8bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xb0];
  fStack_1f178 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xec];
  fStack_1f004 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfb];
  fStack_1ee90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10a];
  fStack_1eba8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x119];
  fStack_1ea34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x128];
  fStack_1e8c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x137];
  fStack_1e74c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x146];
  fStack_1e464 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x155];
  fStack_1e2f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x164];
  fStack_1e17c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x173];
  fStack_1de94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x182];
  fStack_1dd20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x191];
  fStack_1da38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a0];
  fStack_1d750 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1af];
  fStack_1d5dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1be];
  fStack_1d468 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cd];
  fStack_1d2f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1dc];
  fStack_1d180 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1eb];
  fStack_1d00c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fa];
  fStack_1cd24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x209];
  fStack_1cbb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x218];
  fStack_1ca3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x227];
  fStack_1c8c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x236];
  fStack_1c754 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x245];
  fStack_1c46c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x254];
  fStack_1c2f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x263];
  fStack_1c184 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x272];
  fStack_1c010 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x281];
  fStack_1bd28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x290];
  fStack_1bbb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29f];
  fStack_1b8cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ae];
  fStack_1b5e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2bd];
  fStack_1b470 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cc];
  fStack_1b188 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2db];
  fStack_1ad2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ea];
  fStack_1abb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f9];
  fStack_1aa44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x308];
  fStack_1a8d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x317];
  fStack_1a75c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x326];
  fStack_1a474 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x335];
  fStack_1a300 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x344];
  fStack_1a18c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x353];
  fStack_1a018 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x362];
  fStack_19d30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x371];
  fStack_19bbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x380];
  fStack_19a48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38f];
  fStack_19760 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39e];
  fStack_195ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ad];
  fStack_19304 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bc];
  fStack_18ea8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3cb];
  fStack_18d34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3da];
  fStack_18bc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e9];
  fStack_18a4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f8];
  fStack_18764 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x407];
  fStack_185f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x416];
  fStack_1847c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x425];
  fStack_18194 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x434];
  fStack_18020 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x443];
  fStack_17d38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x452];
  fStack_178dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x461];
  fStack_17768 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x470];
  fStack_175f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47f];
  fStack_1730c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48e];
  fStack_17198 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49d];
  fStack_16eb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ac];
  fStack_16a54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4bb];
  fStack_168e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ca];
  fStack_165f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d9];
  fStack_1619c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e8];
  fStack_1f744 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xc0];
  fStack_1f174 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xed];
  fStack_1f000 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfc];
  fStack_1ee8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10b];
  fStack_1eba4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11a];
  fStack_1ea30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x129];
  fStack_1e8bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x138];
  fStack_1e748 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x147];
  fStack_1e460 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x156];
  fStack_1e2ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x165];
  fStack_1e178 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x174];
  fStack_1de90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x183];
  fStack_1dd1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x192];
  fStack_1da34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a1];
  fStack_1d74c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b0];
  fStack_1d5d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bf];
  fStack_1d464 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ce];
  fStack_1d2f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1dd];
  fStack_1d17c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ec];
  fStack_1d008 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fb];
  fStack_1cd20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20a];
  fStack_1cbac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x219];
  fStack_1ca38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x228];
  fStack_1c8c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x237];
  fStack_1c750 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x246];
  fStack_1c468 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x255];
  fStack_1c2f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x264];
  fStack_1c180 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x273];
  fStack_1c00c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x282];
  fStack_1bd24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x291];
  fStack_1bbb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a0];
  fStack_1b8c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2af];
  fStack_1b5e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2be];
  fStack_1b46c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cd];
  fStack_1b184 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2dc];
  fStack_1ad28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2eb];
  fStack_1abb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fa];
  fStack_1aa40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x309];
  fStack_1a8cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x318];
  fStack_1a758 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x327];
  fStack_1a470 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x336];
  fStack_1a2fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x345];
  fStack_1a188 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x354];
  fStack_1a014 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x363];
  fStack_19d2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x372];
  fStack_19bb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x381];
  fStack_19a44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x390];
  fStack_1975c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39f];
  fStack_195e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ae];
  fStack_19300 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bd];
  fStack_18ea4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3cc];
  fStack_18d30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3db];
  fStack_18bbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ea];
  fStack_18a48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f9];
  fStack_18760 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x408];
  fStack_185ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x417];
  fStack_18478 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x426];
  fStack_18190 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x435];
  fStack_1801c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x444];
  fStack_17d34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x453];
  fStack_178d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x462];
  fStack_17764 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x471];
  fStack_175f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x480];
  fStack_17308 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48f];
  fStack_17194 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49e];
  fStack_16eac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ad];
  fStack_16a50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4bc];
  fStack_168dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cb];
  fStack_165f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4da];
  fStack_16198 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e9];
  fStack_1f458 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xd0];
  fStack_1f170 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xee];
  fStack_1effc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfd];
  fStack_1ee88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10c];
  fStack_1eba0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11b];
  fStack_1ea2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x12a];
  fStack_1e8b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x139];
  fStack_1e744 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x148];
  fStack_1e45c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x157];
  fStack_1e2e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x166];
  fStack_1e174 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x175];
  fStack_1de8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x184];
  fStack_1dd18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x193];
  fStack_1da30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a2];
  fStack_1d748 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b1];
  fStack_1d5d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c0];
  fStack_1d460 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cf];
  fStack_1d2ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1de];
  fStack_1d178 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ed];
  fStack_1d004 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fc];
  fStack_1cd1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20b];
  fStack_1cba8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21a];
  fStack_1ca34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x229];
  fStack_1c8c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x238];
  fStack_1c74c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x247];
  fStack_1c464 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x256];
  fStack_1c2f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x265];
  fStack_1c17c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x274];
  fStack_1c008 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x283];
  fStack_1bd20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x292];
  fStack_1bbac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a1];
  fStack_1b8c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b0];
  fStack_1b5dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2bf];
  fStack_1b468 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ce];
  fStack_1b180 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2dd];
  fStack_1ad24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ec];
  fStack_1abb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fb];
  fStack_1aa3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30a];
  fStack_1a8c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x319];
  fStack_1a754 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x328];
  fStack_1a46c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x337];
  fStack_1a2f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x346];
  fStack_1a184 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x355];
  fStack_1a010 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x364];
  fStack_19d28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x373];
  fStack_19bb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x382];
  fStack_19a40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x391];
  fStack_19758 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a0];
  fStack_195e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3af];
  fStack_192fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3be];
  fStack_18ea0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3cd];
  fStack_18d2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3dc];
  fStack_18bb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3eb];
  fStack_18a44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fa];
  fStack_1875c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x409];
  fStack_185e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x418];
  fStack_18474 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x427];
  fStack_1818c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x436];
  fStack_18018 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x445];
  fStack_17d30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x454];
  fStack_178d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x463];
  fStack_17760 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x472];
  fStack_175ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x481];
  fStack_17304 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x490];
  fStack_17190 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49f];
  fStack_16ea8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ae];
  fStack_16a4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4bd];
  fStack_168d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cc];
  fStack_165f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4db];
  fStack_16194 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ea];
  fStack_1f2e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe0];
  fStack_1f16c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xef];
  fStack_1eff8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfe];
  fStack_1ee84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10d];
  fStack_1eb9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11c];
  fStack_1ea28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[299];
  fStack_1e8b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13a];
  fStack_1e740 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x149];
  fStack_1e458 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x158];
  fStack_1e2e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x167];
  fStack_1e170 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x176];
  fStack_1de88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x185];
  fStack_1dd14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x194];
  fStack_1da2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a3];
  fStack_1d744 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b2];
  fStack_1d5d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c1];
  fStack_1d45c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d0];
  fStack_1d2e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1df];
  fStack_1d174 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ee];
  fStack_1d000 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fd];
  fStack_1cd18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20c];
  fStack_1cba4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21b];
  fStack_1ca30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22a];
  fStack_1c8bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x239];
  fStack_1c748 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x248];
  fStack_1c460 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[599];
  fStack_1c2ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x266];
  fStack_1c178 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x275];
  fStack_1c004 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x284];
  fStack_1bd1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x293];
  fStack_1bba8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a2];
  fStack_1b8c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b1];
  fStack_1b5d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c0];
  fStack_1b464 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cf];
  fStack_1b17c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2de];
  fStack_1ad20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ed];
  fStack_1abac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fc];
  fStack_1aa38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30b];
  fStack_1a8c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31a];
  fStack_1a750 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x329];
  fStack_1a468 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x338];
  fStack_1a2f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x347];
  fStack_1a180 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x356];
  fStack_1a00c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x365];
  fStack_19d24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x374];
  fStack_19bb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[899];
  fStack_19a3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x392];
  fStack_19754 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a1];
  fStack_195e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b0];
  fStack_192f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bf];
  fStack_18e9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ce];
  fStack_18d28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3dd];
  fStack_18bb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ec];
  fStack_18a40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fb];
  fStack_18758 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40a];
  fStack_185e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x419];
  fStack_18470 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x428];
  fStack_18188 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x437];
  fStack_18014 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x446];
  fStack_17d2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x455];
  fStack_178d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x464];
  fStack_1775c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x473];
  fStack_175e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x482];
  fStack_17300 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x491];
  fStack_1718c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a0];
  fStack_16ea4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4af];
  fStack_16a48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4be];
  fStack_168d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cd];
  fStack_165ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4dc];
  fStack_16190 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4eb];
  fStack_20b90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0];
  fStack_1f2dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe1];
  fStack_1f168 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf0];
  fStack_1eff4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xff];
  fStack_1ed0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10e];
  fStack_1eb98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11d];
  fStack_1ea24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[300];
  fStack_1e8b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13b];
  fStack_1e5c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14a];
  fStack_1e454 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x159];
  fStack_1e2e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x168];
  fStack_1dff8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x177];
  fStack_1de84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x186];
  fStack_1db9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x195];
  fStack_1d8b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a4];
  fStack_1d740 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b3];
  fStack_1d5cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c2];
  fStack_1d458 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d1];
  fStack_1d2e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e0];
  fStack_1d170 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ef];
  fStack_1ce88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fe];
  fStack_1cd14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20d];
  fStack_1cba0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21c];
  fStack_1ca2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22b];
  fStack_1c8b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23a];
  fStack_1c5d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x249];
  fStack_1c45c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[600];
  fStack_1c2e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x267];
  fStack_1c174 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x276];
  fStack_1be8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x285];
  fStack_1bd18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x294];
  fStack_1bba4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a3];
  fStack_1b748 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b2];
  fStack_1b5d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c1];
  fStack_1b2ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d0];
  fStack_1ae90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2df];
  fStack_1ad1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ee];
  fStack_1aba8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fd];
  fStack_1aa34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30c];
  fStack_1a8c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31b];
  fStack_1a5d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32a];
  fStack_1a464 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x339];
  fStack_1a2f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x348];
  fStack_1a17c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x357];
  fStack_19e94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x366];
  fStack_19d20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x375];
  fStack_19bac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[900];
  fStack_198c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x393];
  fStack_19750 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a2];
  fStack_19468 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b1];
  fStack_1900c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c0];
  fStack_18e98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3cf];
  fStack_18d24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3de];
  fStack_18bb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ed];
  fStack_188c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fc];
  fStack_18754 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40b];
  fStack_185e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41a];
  fStack_182f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x429];
  fStack_18184 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x438];
  fStack_17e9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x447];
  fStack_17a40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x456];
  fStack_178cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x465];
  fStack_17758 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x474];
  fStack_17470 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x483];
  fStack_172fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x492];
  fStack_17014 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a1];
  fStack_16bb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b0];
  fStack_16a44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4bf];
  fStack_1675c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ce];
  fStack_16300 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4dd];
  fStack_20a18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10];
  fStack_1f2d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe2];
  fStack_1f164 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf1];
  fStack_1eff0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x100];
  fStack_1ed08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10f];
  fStack_1eb94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11e];
  fStack_1ea20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x12d];
  fStack_1e8ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13c];
  fStack_1e5c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14b];
  fStack_1e450 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15a];
  fStack_1e2dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x169];
  fStack_1dff4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x178];
  fStack_1de80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x187];
  fStack_1db98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x196];
  fStack_1d8b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a5];
  fStack_1d73c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b4];
  fStack_1d5c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c3];
  fStack_1d454 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d2];
  fStack_1d2e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e1];
  fStack_1d16c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f0];
  fStack_1ce84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ff];
  fStack_1cd10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20e];
  fStack_1cb9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21d];
  fStack_1ca28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22c];
  fStack_1c8b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23b];
  fStack_1c5cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24a];
  fStack_1c458 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x259];
  fStack_1c2e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x268];
  fStack_1c170 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x277];
  fStack_1be88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x286];
  fStack_1bd14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x295];
  fStack_1bba0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a4];
  fStack_1b744 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b3];
  fStack_1b5d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c2];
  fStack_1b2e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d1];
  fStack_1ae8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e0];
  fStack_1ad18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ef];
  fStack_1aba4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fe];
  fStack_1aa30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30d];
  fStack_1a8bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31c];
  fStack_1a5d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32b];
  fStack_1a460 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33a];
  fStack_1a2ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x349];
  fStack_1a178 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x358];
  fStack_19e90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x367];
  fStack_19d1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x376];
  fStack_19ba8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x385];
  fStack_198c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x394];
  fStack_1974c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a3];
  fStack_19464 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b2];
  fStack_19008 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c1];
  fStack_18e94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d0];
  fStack_18d20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3df];
  fStack_18bac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ee];
  fStack_188c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fd];
  fStack_18750 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40c];
  fStack_185dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41b];
  fStack_182f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42a];
  fStack_18180 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x439];
  fStack_17e98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x448];
  fStack_17a3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x457];
  fStack_178c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x466];
  fStack_17754 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x475];
  fStack_1746c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x484];
  fStack_172f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x493];
  fStack_17010 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a2];
  fStack_16bb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b1];
  fStack_16a40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c0];
  fStack_16758 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cf];
  fStack_162fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4de];
  fStack_208a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20];
  fStack_1f2d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe3];
  fStack_1f160 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf2];
  fStack_1efec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x101];
  fStack_1ed04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x110];
  fStack_1eb90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11f];
  fStack_1ea1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x12e];
  fStack_1e8a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13d];
  fStack_1e5c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14c];
  fStack_1e44c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15b];
  fStack_1e2d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16a];
  fStack_1dff0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x179];
  fStack_1de7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x188];
  fStack_1db94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x197];
  fStack_1d8ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a6];
  fStack_1d738 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b5];
  fStack_1d5c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c4];
  fStack_1d450 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d3];
  fStack_1d2dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e2];
  fStack_1d168 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f1];
  fStack_1ce80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x200];
  fStack_1cd0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20f];
  fStack_1cb98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21e];
  fStack_1ca24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22d];
  fStack_1c8b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23c];
  fStack_1c5c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24b];
  fStack_1c454 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25a];
  fStack_1c2e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x269];
  fStack_1c16c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x278];
  fStack_1be84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x287];
  fStack_1bd10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x296];
  fStack_1bb9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a5];
  fStack_1b740 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b4];
  fStack_1b5cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c3];
  fStack_1b2e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d2];
  fStack_1ae88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e1];
  fStack_1ad14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f0];
  fStack_1aba0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ff];
  fStack_1aa2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30e];
  fStack_1a8b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31d];
  fStack_1a5d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32c];
  fStack_1a45c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33b];
  fStack_1a2e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34a];
  fStack_1a174 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x359];
  fStack_19e8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x368];
  fStack_19d18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x377];
  fStack_19ba4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x386];
  fStack_198bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x395];
  fStack_19748 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a4];
  fStack_19460 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b3];
  fStack_19004 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c2];
  fStack_18e90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d1];
  fStack_18d1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e0];
  fStack_18ba8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ef];
  fStack_188c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fe];
  fStack_1874c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40d];
  fStack_185d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41c];
  fStack_182f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42b];
  fStack_1817c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43a];
  fStack_17e94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x449];
  fStack_17a38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x458];
  fStack_178c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x467];
  fStack_17750 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x476];
  fStack_17468 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x485];
  fStack_172f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x494];
  fStack_1700c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a3];
  fStack_16bb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b2];
  fStack_16a3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c1];
  fStack_16754 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d0];
  fStack_162f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4df];
  fStack_20728 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30];
  fStack_1f2d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe4];
  fStack_1f15c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf3];
  fStack_1efe8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x102];
  fStack_1ed00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x111];
  fStack_1eb8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x120];
  fStack_1ea18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x12f];
  fStack_1e8a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13e];
  fStack_1e5bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14d];
  fStack_1e448 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15c];
  fStack_1e2d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16b];
  fStack_1dfec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17a];
  fStack_1de78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x189];
  fStack_1db90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x198];
  fStack_1d8a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a7];
  fStack_1d734 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b6];
  fStack_1d5c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c5];
  fStack_1d44c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d4];
  fStack_1d2d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e3];
  fStack_1d164 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f2];
  fStack_1ce7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x201];
  fStack_1cd08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x210];
  fStack_1cb94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21f];
  fStack_1ca20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22e];
  fStack_1c8ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23d];
  fStack_1c5c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24c];
  fStack_1c450 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25b];
  fStack_1c2dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26a];
  fStack_1c168 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x279];
  fStack_1be80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x288];
  fStack_1bd0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x297];
  fStack_1bb98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a6];
  fStack_1b73c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b5];
  fStack_1b5c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c4];
  fStack_1b2e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d3];
  fStack_1ae84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e2];
  fStack_1ad10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f1];
  fStack_1ab9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x300];
  fStack_1aa28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30f];
  fStack_1a8b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31e];
  fStack_1a5cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32d];
  fStack_1a458 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33c];
  fStack_1a2e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34b];
  fStack_1a170 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35a];
  fStack_19e88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x369];
  fStack_19d14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x378];
  fStack_19ba0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x387];
  fStack_198b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x396];
  fStack_19744 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a5];
  fStack_1945c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b4];
  fStack_19000 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c3];
  fStack_18e8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d2];
  fStack_18d18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e1];
  fStack_18ba4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f0];
  fStack_188bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ff];
  fStack_18748 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40e];
  fStack_185d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41d];
  fStack_182ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42c];
  fStack_18178 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43b];
  fStack_17e90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44a];
  fStack_17a34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x459];
  fStack_178c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x468];
  fStack_1774c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x477];
  fStack_17464 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x486];
  fStack_172f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x495];
  fStack_17008 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a4];
  fStack_16bac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b3];
  fStack_16a38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c2];
  fStack_16750 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d1];
  fStack_162f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e0];
  fStack_205b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40];
  fStack_1f2cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe5];
  fStack_1f158 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf4];
  fStack_1efe4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x103];
  fStack_1ecfc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x112];
  fStack_1eb88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x121];
  fStack_1ea14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x130];
  fStack_1e8a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13f];
  fStack_1e5b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14e];
  fStack_1e444 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15d];
  fStack_1e2d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16c];
  fStack_1dfe8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17b];
  fStack_1de74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18a];
  fStack_1db8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x199];
  fStack_1d8a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a8];
  fStack_1d730 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b7];
  fStack_1d5bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c6];
  fStack_1d448 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d5];
  fStack_1d2d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e4];
  fStack_1d160 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[499];
  fStack_1ce78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x202];
  fStack_1cd04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x211];
  fStack_1cb90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x220];
  fStack_1ca1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22f];
  fStack_1c8a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23e];
  fStack_1c5c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24d];
  fStack_1c44c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25c];
  fStack_1c2d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26b];
  fStack_1c164 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27a];
  fStack_1be7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x289];
  fStack_1bd08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x298];
  fStack_1bb94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a7];
  fStack_1b738 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b6];
  fStack_1b5c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c5];
  fStack_1b2dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d4];
  fStack_1ae80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e3];
  fStack_1ad0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f2];
  fStack_1ab98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x301];
  fStack_1aa24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x310];
  fStack_1a8b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[799];
  fStack_1a5c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32e];
  fStack_1a454 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33d];
  fStack_1a2e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34c];
  fStack_1a16c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35b];
  fStack_19e84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36a];
  fStack_19d10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x379];
  fStack_19b9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x388];
  fStack_198b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x397];
  fStack_19740 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a6];
  fStack_19458 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b5];
  fStack_18ffc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c4];
  fStack_18e88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d3];
  fStack_18d14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e2];
  fStack_18ba0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f1];
  fStack_188b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x400];
  fStack_18744 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40f];
  fStack_185d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41e];
  fStack_182e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42d];
  fStack_18174 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43c];
  fStack_17e8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[1099];
  fStack_17a30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45a];
  fStack_178bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x469];
  fStack_17748 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x478];
  fStack_17460 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x487];
  fStack_172ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x496];
  fStack_17004 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a5];
  fStack_16ba8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b4];
  fStack_16a34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c3];
  fStack_1674c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d2];
  fStack_162f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e1];
  fStack_20438 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x50];
  fStack_1f2c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe6];
  fStack_1f154 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf5];
  fStack_1efe0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x104];
  fStack_1ecf8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x113];
  fStack_1eb84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x122];
  fStack_1ea10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x131];
  fStack_1e89c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x140];
  fStack_1e5b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14f];
  fStack_1e440 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15e];
  fStack_1e2cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16d];
  fStack_1dfe4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17c];
  fStack_1de70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18b];
  fStack_1db88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19a];
  fStack_1d8a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a9];
  fStack_1d72c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b8];
  fStack_1d5b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c7];
  fStack_1d444 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d6];
  fStack_1d2d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e5];
  fStack_1d15c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[500];
  fStack_1ce74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x203];
  fStack_1cd00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x212];
  fStack_1cb8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x221];
  fStack_1ca18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x230];
  fStack_1c8a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23f];
  fStack_1c5bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24e];
  fStack_1c448 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25d];
  fStack_1c2d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26c];
  fStack_1c160 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27b];
  fStack_1be78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28a];
  fStack_1bd04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x299];
  fStack_1bb90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a8];
  fStack_1b734 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b7];
  fStack_1b5c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c6];
  fStack_1b2d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d5];
  fStack_1ae7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e4];
  fStack_1ad08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f3];
  fStack_1ab94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x302];
  fStack_1aa20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x311];
  fStack_1a8ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[800];
  fStack_1a5c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32f];
  fStack_1a450 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33e];
  fStack_1a2dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34d];
  fStack_1a168 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35c];
  fStack_19e80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36b];
  fStack_19d0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37a];
  fStack_19b98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x389];
  fStack_198b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x398];
  fStack_1973c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a7];
  fStack_19454 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b6];
  fStack_18ff8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c5];
  fStack_18e84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d4];
  fStack_18d10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e3];
  fStack_18b9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f2];
  fStack_188b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x401];
  fStack_18740 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x410];
  fStack_185cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41f];
  fStack_182e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42e];
  fStack_18170 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43d];
  fStack_17e88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44c];
  fStack_17a2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45b];
  fStack_178b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46a];
  fStack_17744 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x479];
  fStack_1745c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x488];
  fStack_172e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x497];
  fStack_17000 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a6];
  fStack_16ba4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b5];
  fStack_16a30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c4];
  fStack_16748 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d3];
  fStack_162ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e2];
  fStack_202c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x60];
  fStack_1f2c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe7];
  fStack_1f150 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf6];
  fStack_1efdc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x105];
  fStack_1ecf4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x114];
  fStack_1eb80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x123];
  fStack_1ea0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x132];
  fStack_1e898 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x141];
  fStack_1e5b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x150];
  fStack_1e43c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15f];
  fStack_1e2c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16e];
  fStack_1dfe0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17d];
  fStack_1de6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18c];
  fStack_1db84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19b];
  fStack_1d89c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1aa];
  fStack_1d728 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b9];
  fStack_1d5b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c8];
  fStack_1d440 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d7];
  fStack_1d2cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e6];
  fStack_1d158 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f5];
  fStack_1ce70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x204];
  fStack_1ccfc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x213];
  fStack_1cb88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x222];
  fStack_1ca14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x231];
  fStack_1c8a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x240];
  fStack_1c5b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24f];
  fStack_1c444 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25e];
  fStack_1c2d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26d];
  fStack_1c15c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27c];
  fStack_1be74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28b];
  fStack_1bd00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29a];
  fStack_1bb8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a9];
  fStack_1b730 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b8];
  fStack_1b5bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c7];
  fStack_1b2d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d6];
  fStack_1ae78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e5];
  fStack_1ad04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f4];
  fStack_1ab90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x303];
  fStack_1aa1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x312];
  fStack_1a8a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x321];
  fStack_1a5c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x330];
  fStack_1a44c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33f];
  fStack_1a2d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34e];
  fStack_1a164 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35d];
  fStack_19e7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36c];
  fStack_19d08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37b];
  fStack_19b94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38a];
  fStack_198ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x399];
  fStack_19738 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a8];
  fStack_19450 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b7];
  fStack_18ff4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c6];
  fStack_18e80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d5];
  fStack_18d0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e4];
  fStack_18b98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f3];
  fStack_188b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x402];
  fStack_1873c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x411];
  fStack_185c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x420];
  fStack_182e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42f];
  fStack_1816c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43e];
  fStack_17e84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44d];
  fStack_17a28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45c];
  fStack_178b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46b];
  fStack_17740 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47a];
  fStack_17458 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x489];
  fStack_172e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x498];
  fStack_16ffc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a7];
  fStack_16ba0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b6];
  fStack_16a2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c5];
  fStack_16744 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d4];
  fStack_162e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e3];
  fStack_1ffd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x70];
  fStack_1f2c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe8];
  fStack_1f14c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf7];
  fStack_1efd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x106];
  fStack_1ecf0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x115];
  fStack_1eb7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x124];
  fStack_1ea08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x133];
  fStack_1e894 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x142];
  fStack_1e5ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x151];
  fStack_1e438 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x160];
  fStack_1e2c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16f];
  fStack_1dfdc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17e];
  fStack_1de68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18d];
  fStack_1db80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19c];
  fStack_1d898 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ab];
  fStack_1d724 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ba];
  fStack_1d5b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c9];
  fStack_1d43c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d8];
  fStack_1d2c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e7];
  fStack_1d154 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f6];
  fStack_1ce6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x205];
  fStack_1ccf8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x214];
  fStack_1cb84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x223];
  fStack_1ca10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x232];
  fStack_1c89c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x241];
  fStack_1c5b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x250];
  fStack_1c440 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25f];
  fStack_1c2cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26e];
  fStack_1c158 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27d];
  fStack_1be70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28c];
  fStack_1bcfc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29b];
  fStack_1bb88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2aa];
  fStack_1b72c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b9];
  fStack_1b5b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c8];
  fStack_1b2d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d7];
  fStack_1ae74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e6];
  fStack_1ad00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f5];
  fStack_1ab8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x304];
  fStack_1aa18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x313];
  fStack_1a8a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x322];
  fStack_1a5bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x331];
  fStack_1a448 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x340];
  fStack_1a2d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34f];
  fStack_1a160 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35e];
  fStack_19e78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36d];
  fStack_19d04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37c];
  fStack_19b90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38b];
  fStack_198a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39a];
  fStack_19734 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a9];
  fStack_1944c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b8];
  fStack_18ff0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c7];
  fStack_18e7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d6];
  fStack_18d08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e5];
  fStack_18b94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f4];
  fStack_188ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x403];
  fStack_18738 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x412];
  fStack_185c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x421];
  fStack_182dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x430];
  fStack_18168 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43f];
  fStack_17e80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44e];
  fStack_17a24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45d];
  fStack_178b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46c];
  fStack_1773c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47b];
  fStack_17454 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48a];
  fStack_172e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x499];
  fStack_16ff8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a8];
  fStack_16b9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b7];
  fStack_16a28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c6];
  fStack_16740 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d5];
  fStack_162e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e4];
  fStack_1fe5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x80];
  fStack_1f2bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe9];
  fStack_1f148 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf8];
  fStack_1efd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x107];
  fStack_1ecec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x116];
  fStack_1eb78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x125];
  fStack_1ea04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x134];
  fStack_1e890 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x143];
  fStack_1e5a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x152];
  fStack_1e434 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x161];
  fStack_1e2c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x170];
  fStack_1dfd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17f];
  fStack_1de64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18e];
  fStack_1db7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19d];
  fStack_1d894 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ac];
  fStack_1d720 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bb];
  fStack_1d5ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ca];
  fStack_1d438 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d9];
  fStack_1d2c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e8];
  fStack_1d150 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f7];
  fStack_1ce68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x206];
  fStack_1ccf4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x215];
  fStack_1cb80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x224];
  fStack_1ca0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x233];
  fStack_1c898 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x242];
  fStack_1c5b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x251];
  fStack_1c43c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x260];
  fStack_1c2c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26f];
  fStack_1c154 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27e];
  fStack_1be6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28d];
  fStack_1bcf8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29c];
  fStack_1bb84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ab];
  fStack_1b728 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ba];
  fStack_1b5b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c9];
  fStack_1b2cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d8];
  fStack_1ae70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e7];
  fStack_1acfc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f6];
  fStack_1ab88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x305];
  fStack_1aa14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x314];
  fStack_1a8a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x323];
  fStack_1a5b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x332];
  fStack_1a444 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x341];
  fStack_1a2d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x350];
  fStack_1a15c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35f];
  fStack_19e74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36e];
  fStack_19d00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37d];
  fStack_19b8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38c];
  fStack_198a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39b];
  fStack_19730 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3aa];
  fStack_19448 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b9];
  fStack_18fec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c8];
  fStack_18e78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d7];
  fStack_18d04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e6];
  fStack_18b90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f5];
  fStack_188a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x404];
  fStack_18734 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x413];
  fStack_185c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x422];
  fStack_182d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x431];
  fStack_18164 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x440];
  fStack_17e7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44f];
  fStack_17a20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45e];
  fStack_178ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46d];
  fStack_17738 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47c];
  fStack_17450 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48b];
  fStack_172dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49a];
  fStack_16ff4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a9];
  fStack_16b98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b8];
  fStack_16a24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c7];
  fStack_1673c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d6];
  fStack_162e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e5];
  fStack_1fce4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x90];
  fStack_1f2b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xea];
  fStack_1f144 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf9];
  fStack_1efd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x108];
  fStack_1ece8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x117];
  fStack_1eb74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x126];
  fStack_1ea00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x135];
  fStack_1e88c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x144];
  fStack_1e5a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x153];
  fStack_1e430 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x162];
  fStack_1e2bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x171];
  fStack_1dfd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x180];
  fStack_1de60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[399];
  fStack_1db78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19e];
  fStack_1d890 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ad];
  fStack_1d71c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bc];
  fStack_1d5a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cb];
  fStack_1d434 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1da];
  fStack_1d2c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e9];
  fStack_1d14c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f8];
  fStack_1ce64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x207];
  fStack_1ccf0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x216];
  fStack_1cb7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x225];
  fStack_1ca08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x234];
  fStack_1c894 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x243];
  fStack_1c5ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x252];
  fStack_1c438 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x261];
  fStack_1c2c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x270];
  fStack_1c150 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27f];
  fStack_1be68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28e];
  fStack_1bcf4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29d];
  fStack_1bb80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ac];
  fStack_1b724 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[699];
  fStack_1b5b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ca];
  fStack_1b2c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d9];
  fStack_1ae6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e8];
  fStack_1acf8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f7];
  fStack_1ab84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x306];
  fStack_1aa10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x315];
  fStack_1a89c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x324];
  fStack_1a5b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x333];
  fStack_1a440 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x342];
  fStack_1a2cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x351];
  fStack_1a158 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x360];
  fStack_19e70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36f];
  fStack_19cfc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37e];
  fStack_19b88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38d];
  fStack_198a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39c];
  fStack_1972c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ab];
  fStack_19444 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ba];
  fStack_18fe8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c9];
  fStack_18e74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d8];
  fStack_18d00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[999];
  fStack_18b8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f6];
  fStack_188a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x405];
  fStack_18730 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x414];
  fStack_185bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x423];
  fStack_182d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x432];
  fStack_18160 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x441];
  fStack_17e78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x450];
  fStack_17a1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45f];
  fStack_178a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46e];
  fStack_17734 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47d];
  fStack_1744c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48c];
  fStack_172d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49b];
  fStack_16ff0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4aa];
  fStack_16b94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b9];
  fStack_16a20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c8];
  fStack_16738 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d7];
  fStack_162dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e6];
  fStack_1fb6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xa0];
  fStack_1f2b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xeb];
  fStack_1f140 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfa];
  fStack_1efcc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x109];
  fStack_1ece4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x118];
  fStack_1eb70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x127];
  fStack_1e9fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x136];
  fStack_1e888 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x145];
  fStack_1e5a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x154];
  fStack_1e42c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x163];
  fStack_1e2b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x172];
  fStack_1dfd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x181];
  fStack_1de5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[400];
  fStack_1db74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19f];
  fStack_1d88c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ae];
  fStack_1d718 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bd];
  fStack_1d5a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cc];
  fStack_1d430 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1db];
  fStack_1d2bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ea];
  fStack_1d148 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f9];
  fStack_1ce60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x208];
  fStack_1ccec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x217];
  fStack_1cb78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x226];
  fStack_1ca04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x235];
  fStack_1c890 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x244];
  fStack_1c5a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x253];
  fStack_1c434 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x262];
  fStack_1c2c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x271];
  fStack_1c14c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x280];
  fStack_1be64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28f];
  fStack_1bcf0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29e];
  fStack_1bb7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ad];
  fStack_1b720 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[700];
  fStack_1b5ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cb];
  fStack_1b2c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2da];
  fStack_1ae68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e9];
  fStack_1acf4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f8];
  fStack_1ab80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x307];
  fStack_1aa0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x316];
  fStack_1a898 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x325];
  fStack_1a5b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x334];
  fStack_1a43c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x343];
  fStack_1a2c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x352];
  fStack_1a154 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x361];
  fStack_19e6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x370];
  fStack_19cf8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37f];
  fStack_19b84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38e];
  fStack_1989c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39d];
  fStack_19728 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ac];
  fStack_19440 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bb];
  fStack_18fe4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ca];
  fStack_18e70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d9];
  fStack_18cfc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[1000];
  fStack_18b88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f7];
  fStack_188a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x406];
  fStack_1872c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x415];
  fStack_185b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x424];
  fStack_182d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x433];
  fStack_1815c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x442];
  fStack_17e74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x451];
  fStack_17a18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x460];
  fStack_178a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46f];
  fStack_17730 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47e];
  fStack_17448 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48d];
  fStack_172d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49c];
  fStack_16fec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ab];
  fStack_16b90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ba];
  fStack_16a1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c9];
  fStack_16734 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d8];
  fStack_162d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e7];
  fStack_1f9f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xb0];
  fStack_1f2b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xec];
  fStack_1f13c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfb];
  fStack_1efc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10a];
  fStack_1ece0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x119];
  fStack_1eb6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x128];
  fStack_1e9f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x137];
  fStack_1e884 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x146];
  fStack_1e59c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x155];
  fStack_1e428 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x164];
  fStack_1e2b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x173];
  fStack_1dfcc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x182];
  fStack_1de58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x191];
  fStack_1db70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a0];
  fStack_1d888 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1af];
  fStack_1d714 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1be];
  fStack_1d5a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cd];
  fStack_1d42c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1dc];
  fStack_1d2b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1eb];
  fStack_1d144 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fa];
  fStack_1ce5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x209];
  fStack_1cce8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x218];
  fStack_1cb74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x227];
  fStack_1ca00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x236];
  fStack_1c88c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x245];
  fStack_1c5a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x254];
  fStack_1c430 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x263];
  fStack_1c2bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x272];
  fStack_1c148 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x281];
  fStack_1be60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x290];
  fStack_1bcec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29f];
  fStack_1bb78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ae];
  fStack_1b71c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2bd];
  fStack_1b5a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cc];
  fStack_1b2c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2db];
  fStack_1ae64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ea];
  fStack_1acf0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f9];
  fStack_1ab7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x308];
  fStack_1aa08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x317];
  fStack_1a894 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x326];
  fStack_1a5ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x335];
  fStack_1a438 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x344];
  fStack_1a2c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x353];
  fStack_1a150 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x362];
  fStack_19e68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x371];
  fStack_19cf4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x380];
  fStack_19b80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38f];
  fStack_19898 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39e];
  fStack_19724 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ad];
  fStack_1943c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bc];
  fStack_18fe0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3cb];
  fStack_18e6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3da];
  fStack_18cf8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e9];
  fStack_18b84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f8];
  fStack_1889c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x407];
  fStack_18728 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x416];
  fStack_185b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x425];
  fStack_182cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x434];
  fStack_18158 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x443];
  fStack_17e70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x452];
  fStack_17a14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x461];
  fStack_178a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x470];
  fStack_1772c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47f];
  fStack_17444 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48e];
  fStack_172d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49d];
  fStack_16fe8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ac];
  fStack_16b8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4bb];
  fStack_16a18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ca];
  fStack_16730 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d9];
  fStack_162d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e8];
  fStack_1f87c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xc0];
  fStack_1f2ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xed];
  fStack_1f138 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfc];
  fStack_1efc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10b];
  fStack_1ecdc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11a];
  fStack_1eb68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x129];
  fStack_1e9f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x138];
  fStack_1e880 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x147];
  fStack_1e598 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x156];
  fStack_1e424 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x165];
  fStack_1e2b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x174];
  fStack_1dfc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x183];
  fStack_1de54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x192];
  fStack_1db6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a1];
  fStack_1d884 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b0];
  fStack_1d710 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bf];
  fStack_1d59c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ce];
  fStack_1d428 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1dd];
  fStack_1d2b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ec];
  fStack_1d140 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fb];
  fStack_1ce58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20a];
  fStack_1cce4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x219];
  fStack_1cb70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x228];
  fStack_1c9fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x237];
  fStack_1c888 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x246];
  fStack_1c5a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x255];
  fStack_1c42c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x264];
  fStack_1c2b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x273];
  fStack_1c144 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x282];
  fStack_1be5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x291];
  fStack_1bce8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a0];
  fStack_1bb74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2af];
  fStack_1b718 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2be];
  fStack_1b5a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cd];
  fStack_1b2bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2dc];
  fStack_1ae60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2eb];
  fStack_1acec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fa];
  fStack_1ab78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x309];
  fStack_1aa04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x318];
  fStack_1a890 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x327];
  fStack_1a5a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x336];
  fStack_1a434 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x345];
  fStack_1a2c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x354];
  fStack_1a14c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x363];
  fStack_19e64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x372];
  fStack_19cf0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x381];
  fStack_19b7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x390];
  fStack_19894 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39f];
  fStack_19720 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ae];
  fStack_19438 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bd];
  fStack_18fdc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3cc];
  fStack_18e68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3db];
  fStack_18cf4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ea];
  fStack_18b80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f9];
  fStack_18898 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x408];
  fStack_18724 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x417];
  fStack_185b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x426];
  fStack_182c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x435];
  fStack_18154 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x444];
  fStack_17e6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x453];
  fStack_17a10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x462];
  fStack_1789c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x471];
  fStack_17728 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x480];
  fStack_17440 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48f];
  fStack_172cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49e];
  fStack_16fe4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ad];
  fStack_16b88 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4bc];
  fStack_16a14 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cb];
  fStack_1672c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4da];
  fStack_162d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e9];
  fStack_1f590 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xd0];
  fStack_1f2a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xee];
  fStack_1f134 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfd];
  fStack_1efc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10c];
  fStack_1ecd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11b];
  fStack_1eb64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x12a];
  fStack_1e9f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x139];
  fStack_1e87c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x148];
  fStack_1e594 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x157];
  fStack_1e420 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x166];
  fStack_1e2ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x175];
  fStack_1dfc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x184];
  fStack_1de50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x193];
  fStack_1db68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a2];
  fStack_1d880 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b1];
  fStack_1d70c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c0];
  fStack_1d598 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cf];
  fStack_1d424 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1de];
  fStack_1d2b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ed];
  fStack_1d13c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fc];
  fStack_1ce54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20b];
  fStack_1cce0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21a];
  fStack_1cb6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x229];
  fStack_1c9f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x238];
  fStack_1c884 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x247];
  fStack_1c59c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x256];
  fStack_1c428 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x265];
  fStack_1c2b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x274];
  fStack_1c140 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x283];
  fStack_1be58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x292];
  fStack_1bce4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a1];
  fStack_1bb70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b0];
  fStack_1b714 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2bf];
  fStack_1b5a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ce];
  fStack_1b2b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2dd];
  fStack_1ae5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ec];
  fStack_1ace8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fb];
  fStack_1ab74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30a];
  fStack_1aa00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x319];
  fStack_1a88c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x328];
  fStack_1a5a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x337];
  fStack_1a430 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x346];
  fStack_1a2bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x355];
  fStack_1a148 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x364];
  fStack_19e60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x373];
  fStack_19cec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x382];
  fStack_19b78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x391];
  fStack_19890 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a0];
  fStack_1971c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3af];
  fStack_19434 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3be];
  fStack_18fd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3cd];
  fStack_18e64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3dc];
  fStack_18cf0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3eb];
  fStack_18b7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fa];
  fStack_18894 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x409];
  fStack_18720 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x418];
  fStack_185ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x427];
  fStack_182c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x436];
  fStack_18150 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x445];
  fStack_17e68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x454];
  fStack_17a0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x463];
  fStack_17898 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x472];
  fStack_17724 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x481];
  fStack_1743c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x490];
  fStack_172c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49f];
  fStack_16fe0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ae];
  fStack_16b84 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4bd];
  fStack_16a10 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cc];
  fStack_16728 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4db];
  fStack_162cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ea];
  fStack_1f418 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe0];
  fStack_1f2a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xef];
  fStack_1f130 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfe];
  fStack_1efbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10d];
  fStack_1ecd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11c];
  fStack_1eb60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[299];
  fStack_1e9ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13a];
  fStack_1e878 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x149];
  fStack_1e590 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x158];
  fStack_1e41c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x167];
  fStack_1e2a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x176];
  fStack_1dfc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x185];
  fStack_1de4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x194];
  fStack_1db64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a3];
  fStack_1d87c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b2];
  fStack_1d708 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c1];
  fStack_1d594 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d0];
  fStack_1d420 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1df];
  fStack_1d2ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ee];
  fStack_1d138 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fd];
  fStack_1ce50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20c];
  fStack_1ccdc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21b];
  fStack_1cb68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22a];
  fStack_1c9f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x239];
  fStack_1c880 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x248];
  fStack_1c598 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[599];
  fStack_1c424 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x266];
  fStack_1c2b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x275];
  fStack_1c13c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x284];
  fStack_1be54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x293];
  fStack_1bce0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a2];
  fStack_1bb6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b1];
  fStack_1b710 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c0];
  fStack_1b59c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cf];
  fStack_1b2b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2de];
  fStack_1ae58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ed];
  fStack_1ace4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fc];
  fStack_1ab70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30b];
  fStack_1a9fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31a];
  fStack_1a888 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x329];
  fStack_1a5a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x338];
  fStack_1a42c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x347];
  fStack_1a2b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x356];
  fStack_1a144 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x365];
  fStack_19e5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x374];
  fStack_19ce8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[899];
  fStack_19b74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x392];
  fStack_1988c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a1];
  fStack_19718 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b0];
  fStack_19430 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bf];
  fStack_18fd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ce];
  fStack_18e60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3dd];
  fStack_18cec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ec];
  fStack_18b78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fb];
  fStack_18890 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40a];
  fStack_1871c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x419];
  fStack_185a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x428];
  fStack_182c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x437];
  fStack_1814c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x446];
  fStack_17e64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x455];
  fStack_17a08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x464];
  fStack_17894 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x473];
  fStack_17720 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x482];
  fStack_17438 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x491];
  fStack_172c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a0];
  fStack_16fdc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4af];
  fStack_16b80 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4be];
  fStack_16a0c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cd];
  fStack_16724 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4dc];
  fStack_162c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4eb];
  fStack_1d878 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0];
  fStack_1c2ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe1];
  fStack_1c138 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf0];
  fStack_1bfc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xff];
  fStack_1be50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10e];
  fStack_1bcdc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11d];
  fStack_1bb68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[300];
  fStack_1b880 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13b];
  fStack_1b70c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14a];
  fStack_1b598 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x159];
  fStack_1b424 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x168];
  fStack_1b2b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x177];
  fStack_1b13c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x186];
  fStack_1afc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x195];
  fStack_1ae54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a4];
  fStack_1ace0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b3];
  fStack_1ab6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c2];
  fStack_1a9f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d1];
  fStack_1a884 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e0];
  fStack_1a710 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ef];
  fStack_1a59c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fe];
  fStack_1a428 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20d];
  fStack_1a2b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21c];
  fStack_1a140 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22b];
  fStack_19fcc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23a];
  fStack_19e58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x249];
  fStack_19ce4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[600];
  fStack_19b70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x267];
  fStack_199fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x276];
  fStack_19888 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x285];
  fStack_19714 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x294];
  fStack_195a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a3];
  fStack_1942c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b2];
  fStack_192b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c1];
  fStack_19144 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d0];
  fStack_18fd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2df];
  fStack_18e5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ee];
  fStack_18ce8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fd];
  fStack_18b74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30c];
  fStack_18a00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31b];
  fStack_1888c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32a];
  fStack_18718 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x339];
  fStack_185a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x348];
  fStack_18430 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x357];
  fStack_182bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x366];
  fStack_18148 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x375];
  fStack_17fd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[900];
  fStack_17e60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x393];
  fStack_17cec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a2];
  fStack_17b78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b1];
  fStack_17a04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c0];
  fStack_17890 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3cf];
  fStack_1771c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3de];
  fStack_175a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ed];
  fStack_17434 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fc];
  fStack_172c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40b];
  fStack_1714c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41a];
  fStack_16fd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x429];
  fStack_16e64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x438];
  fStack_16cf0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x447];
  fStack_16b7c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x456];
  fStack_16a08 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x465];
  fStack_16894 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x474];
  fStack_16720 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x483];
  fStack_165ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x492];
  fStack_16438 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a1];
  fStack_162c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b0];
  fStack_16150 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4bf];
  fStack_15fdc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ce];
  fStack_15e68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4dd];
  fStack_1d700 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10];
  fStack_1c2a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe2];
  fStack_1c134 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf1];
  fStack_1bfc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x100];
  fStack_1be4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10f];
  fStack_1bcd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11e];
  fStack_1bb64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x12d];
  fStack_1b87c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13c];
  fStack_1b708 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14b];
  fStack_1b594 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15a];
  fStack_1b420 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x169];
  fStack_1b2ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x178];
  fStack_1b138 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x187];
  fStack_1afc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x196];
  fStack_1ae50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a5];
  fStack_1acdc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b4];
  fStack_1ab68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c3];
  fStack_1a9f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d2];
  fStack_1a880 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e1];
  fStack_1a70c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f0];
  fStack_1a598 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ff];
  fStack_1a424 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20e];
  fStack_1a2b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21d];
  fStack_1a13c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22c];
  fStack_19fc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23b];
  fStack_19e54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24a];
  fStack_19ce0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x259];
  fStack_19b6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x268];
  fStack_199f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x277];
  fStack_19884 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x286];
  fStack_19710 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x295];
  fStack_1959c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a4];
  fStack_19428 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b3];
  fStack_192b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c2];
  fStack_19140 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d1];
  fStack_18fcc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e0];
  fStack_18e58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ef];
  fStack_18ce4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fe];
  fStack_18b70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30d];
  fStack_189fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31c];
  fStack_18888 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32b];
  fStack_18714 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33a];
  fStack_185a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x349];
  fStack_1842c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x358];
  fStack_182b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x367];
  fStack_18144 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x376];
  fStack_17fd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x385];
  fStack_17e5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x394];
  fStack_17ce8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a3];
  fStack_17b74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b2];
  fStack_17a00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c1];
  fStack_1788c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d0];
  fStack_17718 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3df];
  fStack_175a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ee];
  fStack_17430 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fd];
  fStack_172bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40c];
  fStack_17148 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41b];
  fStack_16fd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42a];
  fStack_16e60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x439];
  fStack_16cec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x448];
  fStack_16b78 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x457];
  fStack_16a04 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x466];
  fStack_16890 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x475];
  fStack_1671c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x484];
  fStack_165a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x493];
  fStack_16434 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a2];
  fStack_162c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b1];
  fStack_1614c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c0];
  fStack_15fd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cf];
  fStack_15e64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4de];
  fStack_1d588 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20];
  fStack_1c2a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe3];
  fStack_1c130 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf2];
  fStack_1bfbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x101];
  fStack_1be48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x110];
  fStack_1bcd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11f];
  fStack_1bb60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x12e];
  fStack_1b878 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13d];
  fStack_1b704 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14c];
  fStack_1b590 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15b];
  fStack_1b41c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16a];
  fStack_1b2a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x179];
  fStack_1b134 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x188];
  fStack_1afc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x197];
  fStack_1ae4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a6];
  fStack_1acd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b5];
  fStack_1ab64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c4];
  fStack_1a9f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d3];
  fStack_1a87c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e2];
  fStack_1a708 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f1];
  fStack_1a594 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x200];
  fStack_1a420 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20f];
  fStack_1a2ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21e];
  fStack_1a138 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22d];
  fStack_19fc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23c];
  fStack_19e50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24b];
  fStack_19cdc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25a];
  fStack_19b68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x269];
  fStack_199f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x278];
  fStack_19880 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x287];
  fStack_1970c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x296];
  fStack_19598 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a5];
  fStack_19424 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b4];
  fStack_192b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c3];
  fStack_1913c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d2];
  fStack_18fc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e1];
  fStack_18e54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f0];
  fStack_18ce0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ff];
  fStack_18b6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30e];
  fStack_189f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31d];
  fStack_18884 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32c];
  fStack_18710 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33b];
  fStack_1859c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34a];
  fStack_18428 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x359];
  fStack_182b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x368];
  fStack_18140 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x377];
  fStack_17fcc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x386];
  fStack_17e58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x395];
  fStack_17ce4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a4];
  fStack_17b70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b3];
  fStack_179fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c2];
  fStack_17888 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d1];
  fStack_17714 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e0];
  fStack_175a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ef];
  fStack_1742c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fe];
  fStack_172b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40d];
  fStack_17144 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41c];
  fStack_16fd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42b];
  fStack_16e5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43a];
  fStack_16ce8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x449];
  fStack_16b74 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x458];
  fStack_16a00 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x467];
  fStack_1688c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x476];
  fStack_16718 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x485];
  fStack_165a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x494];
  fStack_16430 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a3];
  fStack_162bc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b2];
  fStack_16148 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c1];
  fStack_15fd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d0];
  fStack_15e60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4df];
  fStack_1d410 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30];
  fStack_1c2a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe4];
  fStack_1c12c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf3];
  fStack_1bfb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x102];
  fStack_1be44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x111];
  fStack_1bcd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x120];
  fStack_1bb5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x12f];
  fStack_1b874 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13e];
  fStack_1b700 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14d];
  fStack_1b58c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15c];
  fStack_1b418 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16b];
  fStack_1b2a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17a];
  fStack_1b130 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x189];
  fStack_1afbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x198];
  fStack_1ae48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a7];
  fStack_1acd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b6];
  fStack_1ab60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c5];
  fStack_1a9ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d4];
  fStack_1a878 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e3];
  fStack_1a704 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f2];
  fStack_1a590 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x201];
  fStack_1a41c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x210];
  fStack_1a2a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21f];
  fStack_1a134 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22e];
  fStack_19fc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23d];
  fStack_19e4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24c];
  fStack_19cd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25b];
  fStack_19b64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26a];
  fStack_199f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x279];
  fStack_1987c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x288];
  fStack_19708 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x297];
  fStack_19594 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a6];
  fStack_19420 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b5];
  fStack_192ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c4];
  fStack_19138 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d3];
  fStack_18fc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e2];
  fStack_18e50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f1];
  fStack_18cdc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x300];
  fStack_18b68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30f];
  fStack_189f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31e];
  fStack_18880 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32d];
  fStack_1870c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33c];
  fStack_18598 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34b];
  fStack_18424 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35a];
  fStack_182b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x369];
  fStack_1813c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x378];
  fStack_17fc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x387];
  fStack_17e54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x396];
  fStack_17ce0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a5];
  fStack_17b6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b4];
  fStack_179f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c3];
  fStack_17884 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d2];
  fStack_17710 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e1];
  fStack_1759c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f0];
  fStack_17428 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ff];
  fStack_172b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40e];
  fStack_17140 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41d];
  fStack_16fcc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42c];
  fStack_16e58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43b];
  fStack_16ce4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44a];
  fStack_16b70 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x459];
  fStack_169fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x468];
  fStack_16888 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x477];
  fStack_16714 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x486];
  fStack_165a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x495];
  fStack_1642c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a4];
  fStack_162b8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b3];
  fStack_16144 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c2];
  fStack_15fd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d1];
  fStack_15e5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e0];
  fStack_1d298 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40];
  fStack_1c29c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe5];
  fStack_1c128 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf4];
  fStack_1bfb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x103];
  fStack_1be40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x112];
  fStack_1bccc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x121];
  fStack_1bb58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x130];
  fStack_1b870 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13f];
  fStack_1b6fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14e];
  fStack_1b588 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15d];
  fStack_1b414 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16c];
  fStack_1b2a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17b];
  fStack_1b12c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18a];
  fStack_1afb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x199];
  fStack_1ae44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a8];
  fStack_1acd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b7];
  fStack_1ab5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c6];
  fStack_1a9e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d5];
  fStack_1a874 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e4];
  fStack_1a700 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[499];
  fStack_1a58c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x202];
  fStack_1a418 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x211];
  fStack_1a2a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x220];
  fStack_1a130 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22f];
  fStack_19fbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23e];
  fStack_19e48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24d];
  fStack_19cd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25c];
  fStack_19b60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26b];
  fStack_199ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27a];
  fStack_19878 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x289];
  fStack_19704 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x298];
  fStack_19590 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a7];
  fStack_1941c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b6];
  fStack_192a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c5];
  fStack_19134 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d4];
  fStack_18fc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e3];
  fStack_18e4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f2];
  fStack_18cd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x301];
  fStack_18b64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x310];
  fStack_189f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[799];
  fStack_1887c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32e];
  fStack_18708 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33d];
  fStack_18594 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34c];
  fStack_18420 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35b];
  fStack_182ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36a];
  fStack_18138 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x379];
  fStack_17fc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x388];
  fStack_17e50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x397];
  fStack_17cdc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a6];
  fStack_17b68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b5];
  fStack_179f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c4];
  fStack_17880 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d3];
  fStack_1770c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e2];
  fStack_17598 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f1];
  fStack_17424 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x400];
  fStack_172b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40f];
  fStack_1713c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41e];
  fStack_16fc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42d];
  fStack_16e54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43c];
  fStack_16ce0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[1099];
  fStack_16b6c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45a];
  fStack_169f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x469];
  fStack_16884 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x478];
  fStack_16710 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x487];
  fStack_1659c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x496];
  fStack_16428 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a5];
  fStack_162b4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b4];
  fStack_16140 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c3];
  fStack_15fcc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d2];
  fStack_15e58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e1];
  fStack_1d120 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x50];
  fStack_1c298 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe6];
  fStack_1c124 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf5];
  fStack_1bfb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x104];
  fStack_1be3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x113];
  fStack_1bcc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x122];
  fStack_1bb54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x131];
  fStack_1b86c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x140];
  fStack_1b6f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x14f];
  fStack_1b584 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15e];
  fStack_1b410 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16d];
  fStack_1b29c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17c];
  fStack_1b128 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18b];
  fStack_1afb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19a];
  fStack_1ae40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a9];
  fStack_1accc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b8];
  fStack_1ab58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c7];
  fStack_1a9e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d6];
  fStack_1a870 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e5];
  fStack_1a6fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[500];
  fStack_1a588 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x203];
  fStack_1a414 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x212];
  fStack_1a2a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x221];
  fStack_1a12c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x230];
  fStack_19fb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x23f];
  fStack_19e44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24e];
  fStack_19cd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25d];
  fStack_19b5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26c];
  fStack_199e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27b];
  fStack_19874 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28a];
  fStack_19700 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x299];
  fStack_1958c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a8];
  fStack_19418 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b7];
  fStack_192a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c6];
  fStack_19130 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d5];
  fStack_18fbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e4];
  fStack_18e48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f3];
  fStack_18cd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x302];
  fStack_18b60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x311];
  fStack_189ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[800];
  fStack_18878 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x32f];
  fStack_18704 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33e];
  fStack_18590 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34d];
  fStack_1841c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35c];
  fStack_182a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36b];
  fStack_18134 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37a];
  fStack_17fc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x389];
  fStack_17e4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x398];
  fStack_17cd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a7];
  fStack_17b64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b6];
  fStack_179f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c5];
  fStack_1787c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d4];
  fStack_17708 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e3];
  fStack_17594 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f2];
  fStack_17420 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x401];
  fStack_172ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x410];
  fStack_17138 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x41f];
  fStack_16fc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42e];
  fStack_16e50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43d];
  fStack_16cdc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44c];
  fStack_16b68 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45b];
  fStack_169f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46a];
  fStack_16880 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x479];
  fStack_1670c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x488];
  fStack_16598 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x497];
  fStack_16424 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a6];
  fStack_162b0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b5];
  fStack_1613c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c4];
  fStack_15fc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d3];
  fStack_15e54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e2];
  fStack_1cfa8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x60];
  fStack_1c294 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe7];
  fStack_1c120 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf6];
  fStack_1bfac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x105];
  fStack_1be38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x114];
  fStack_1bcc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x123];
  fStack_1bb50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x132];
  fStack_1b868 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x141];
  fStack_1b6f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x150];
  fStack_1b580 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x15f];
  fStack_1b40c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16e];
  fStack_1b298 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17d];
  fStack_1b124 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18c];
  fStack_1afb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19b];
  fStack_1ae3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1aa];
  fStack_1acc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b9];
  fStack_1ab54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c8];
  fStack_1a9e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d7];
  fStack_1a86c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e6];
  fStack_1a6f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f5];
  fStack_1a584 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x204];
  fStack_1a410 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x213];
  fStack_1a29c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x222];
  fStack_1a128 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x231];
  fStack_19fb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x240];
  fStack_19e40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x24f];
  fStack_19ccc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25e];
  fStack_19b58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26d];
  fStack_199e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27c];
  fStack_19870 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28b];
  fStack_196fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29a];
  fStack_19588 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a9];
  fStack_19414 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b8];
  fStack_192a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c7];
  fStack_1912c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d6];
  fStack_18fb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e5];
  fStack_18e44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f4];
  fStack_18cd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x303];
  fStack_18b5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x312];
  fStack_189e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x321];
  fStack_18874 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x330];
  fStack_18700 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x33f];
  fStack_1858c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34e];
  fStack_18418 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35d];
  fStack_182a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36c];
  fStack_18130 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37b];
  fStack_17fbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38a];
  fStack_17e48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x399];
  fStack_17cd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a8];
  fStack_17b60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b7];
  fStack_179ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c6];
  fStack_17878 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d5];
  fStack_17704 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e4];
  fStack_17590 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f3];
  fStack_1741c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x402];
  fStack_172a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x411];
  fStack_17134 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x420];
  fStack_16fc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x42f];
  fStack_16e4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43e];
  fStack_16cd8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44d];
  fStack_16b64 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45c];
  fStack_169f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46b];
  fStack_1687c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47a];
  fStack_16708 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x489];
  fStack_16594 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x498];
  fStack_16420 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a7];
  fStack_162ac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b6];
  fStack_16138 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c5];
  fStack_15fc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d4];
  fStack_15e50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e3];
  fStack_1ce30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x70];
  fStack_1c290 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe8];
  fStack_1c11c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf7];
  fStack_1bfa8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x106];
  fStack_1be34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x115];
  fStack_1bcc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x124];
  fStack_1bb4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x133];
  fStack_1b864 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x142];
  fStack_1b6f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x151];
  fStack_1b57c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x160];
  fStack_1b408 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x16f];
  fStack_1b294 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17e];
  fStack_1b120 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18d];
  fStack_1afac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19c];
  fStack_1ae38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ab];
  fStack_1acc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ba];
  fStack_1ab50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c9];
  fStack_1a9dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d8];
  fStack_1a868 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e7];
  fStack_1a6f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f6];
  fStack_1a580 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x205];
  fStack_1a40c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x214];
  fStack_1a298 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x223];
  fStack_1a124 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x232];
  fStack_19fb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x241];
  fStack_19e3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x250];
  fStack_19cc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x25f];
  fStack_19b54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26e];
  fStack_199e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27d];
  fStack_1986c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28c];
  fStack_196f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29b];
  fStack_19584 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2aa];
  fStack_19410 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b9];
  fStack_1929c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c8];
  fStack_19128 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d7];
  fStack_18fb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e6];
  fStack_18e40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f5];
  fStack_18ccc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x304];
  fStack_18b58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x313];
  fStack_189e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x322];
  fStack_18870 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x331];
  fStack_186fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x340];
  fStack_18588 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x34f];
  fStack_18414 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35e];
  fStack_182a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36d];
  fStack_1812c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37c];
  fStack_17fb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38b];
  fStack_17e44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39a];
  fStack_17cd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a9];
  fStack_17b5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b8];
  fStack_179e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c7];
  fStack_17874 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d6];
  fStack_17700 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e5];
  fStack_1758c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f4];
  fStack_17418 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x403];
  fStack_172a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x412];
  fStack_17130 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x421];
  fStack_16fbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x430];
  fStack_16e48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x43f];
  fStack_16cd4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44e];
  fStack_16b60 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45d];
  fStack_169ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46c];
  fStack_16878 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47b];
  fStack_16704 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48a];
  fStack_16590 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x499];
  fStack_1641c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a8];
  fStack_162a8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b7];
  fStack_16134 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c6];
  fStack_15fc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d5];
  fStack_15e4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e4];
  fStack_1ccb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x80];
  fStack_1c28c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe9];
  fStack_1c118 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf8];
  fStack_1bfa4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x107];
  fStack_1be30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x116];
  fStack_1bcbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x125];
  fStack_1bb48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x134];
  fStack_1b860 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x143];
  fStack_1b6ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x152];
  fStack_1b578 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x161];
  fStack_1b404 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x170];
  fStack_1b290 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x17f];
  fStack_1b11c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x18e];
  fStack_1afa8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19d];
  fStack_1ae34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ac];
  fStack_1acc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bb];
  fStack_1ab4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ca];
  fStack_1a9d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d9];
  fStack_1a864 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e8];
  fStack_1a6f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f7];
  fStack_1a57c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x206];
  fStack_1a408 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x215];
  fStack_1a294 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x224];
  fStack_1a120 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x233];
  fStack_19fac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x242];
  fStack_19e38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x251];
  fStack_19cc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x260];
  fStack_19b50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x26f];
  fStack_199dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27e];
  fStack_19868 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28d];
  fStack_196f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29c];
  fStack_19580 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ab];
  fStack_1940c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ba];
  fStack_19298 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c9];
  fStack_19124 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d8];
  fStack_18fb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e7];
  fStack_18e3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f6];
  fStack_18cc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x305];
  fStack_18b54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x314];
  fStack_189e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x323];
  fStack_1886c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x332];
  fStack_186f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x341];
  fStack_18584 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x350];
  fStack_18410 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x35f];
  fStack_1829c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36e];
  fStack_18128 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37d];
  fStack_17fb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38c];
  fStack_17e40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39b];
  fStack_17ccc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3aa];
  fStack_17b58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b9];
  fStack_179e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c8];
  fStack_17870 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d7];
  fStack_176fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e6];
  fStack_17588 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f5];
  fStack_17414 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x404];
  fStack_172a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x413];
  fStack_1712c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x422];
  fStack_16fb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x431];
  fStack_16e44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x440];
  fStack_16cd0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x44f];
  fStack_16b5c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45e];
  fStack_169e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46d];
  fStack_16874 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47c];
  fStack_16700 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48b];
  fStack_1658c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49a];
  fStack_16418 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a9];
  fStack_162a4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b8];
  fStack_16130 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c7];
  fStack_15fbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d6];
  fStack_15e48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e5];
  fStack_1cb40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x90];
  fStack_1c288 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xea];
  fStack_1c114 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xf9];
  fStack_1bfa0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x108];
  fStack_1be2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x117];
  fStack_1bcb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x126];
  fStack_1bb44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x135];
  fStack_1b85c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x144];
  fStack_1b6e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x153];
  fStack_1b574 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x162];
  fStack_1b400 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x171];
  fStack_1b28c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x180];
  fStack_1b118 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[399];
  fStack_1afa4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19e];
  fStack_1ae30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ad];
  fStack_1acbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bc];
  fStack_1ab48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cb];
  fStack_1a9d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1da];
  fStack_1a860 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1e9];
  fStack_1a6ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f8];
  fStack_1a578 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x207];
  fStack_1a404 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x216];
  fStack_1a290 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x225];
  fStack_1a11c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x234];
  fStack_19fa8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x243];
  fStack_19e34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x252];
  fStack_19cc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x261];
  fStack_19b4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x270];
  fStack_199d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x27f];
  fStack_19864 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28e];
  fStack_196f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29d];
  fStack_1957c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ac];
  fStack_19408 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[699];
  fStack_19294 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ca];
  fStack_19120 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2d9];
  fStack_18fac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e8];
  fStack_18e38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f7];
  fStack_18cc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x306];
  fStack_18b50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x315];
  fStack_189dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x324];
  fStack_18868 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x333];
  fStack_186f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x342];
  fStack_18580 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x351];
  fStack_1840c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x360];
  fStack_18298 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x36f];
  fStack_18124 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37e];
  fStack_17fb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38d];
  fStack_17e3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39c];
  fStack_17cc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ab];
  fStack_17b54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ba];
  fStack_179e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3c9];
  fStack_1786c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d8];
  fStack_176f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[999];
  fStack_17584 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f6];
  fStack_17410 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x405];
  fStack_1729c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x414];
  fStack_17128 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x423];
  fStack_16fb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x432];
  fStack_16e40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x441];
  fStack_16ccc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x450];
  fStack_16b58 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x45f];
  fStack_169e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46e];
  fStack_16870 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47d];
  fStack_166fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48c];
  fStack_16588 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49b];
  fStack_16414 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4aa];
  fStack_162a0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4b9];
  fStack_1612c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c8];
  fStack_15fb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d7];
  fStack_15e44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e6];
  fStack_1c9c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xa0];
  fStack_1c284 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xeb];
  fStack_1c110 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfa];
  fStack_1bf9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x109];
  fStack_1be28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x118];
  fStack_1bcb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x127];
  fStack_1bb40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x136];
  fStack_1b858 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x145];
  fStack_1b6e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x154];
  fStack_1b570 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x163];
  fStack_1b3fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x172];
  fStack_1b288 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x181];
  fStack_1b114 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[400];
  fStack_1afa0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x19f];
  fStack_1ae2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ae];
  fStack_1acb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bd];
  fStack_1ab44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cc];
  fStack_1a9d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1db];
  fStack_1a85c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ea];
  fStack_1a6e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1f9];
  fStack_1a574 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x208];
  fStack_1a400 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x217];
  fStack_1a28c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x226];
  fStack_1a118 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x235];
  fStack_19fa4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x244];
  fStack_19e30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x253];
  fStack_19cbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x262];
  fStack_19b48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x271];
  fStack_199d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x280];
  fStack_19860 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x28f];
  fStack_196ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29e];
  fStack_19578 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ad];
  fStack_19404 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[700];
  fStack_19290 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cb];
  fStack_1911c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2da];
  fStack_18fa8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2e9];
  fStack_18e34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f8];
  fStack_18cc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x307];
  fStack_18b4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x316];
  fStack_189d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x325];
  fStack_18864 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x334];
  fStack_186f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x343];
  fStack_1857c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x352];
  fStack_18408 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x361];
  fStack_18294 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x370];
  fStack_18120 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x37f];
  fStack_17fac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38e];
  fStack_17e38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39d];
  fStack_17cc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ac];
  fStack_17b50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bb];
  fStack_179dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ca];
  fStack_17868 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3d9];
  fStack_176f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[1000];
  fStack_17580 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f7];
  fStack_1740c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x406];
  fStack_17298 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x415];
  fStack_17124 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x424];
  fStack_16fb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x433];
  fStack_16e3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x442];
  fStack_16cc8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x451];
  fStack_16b54 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x460];
  fStack_169e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x46f];
  fStack_1686c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47e];
  fStack_166f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48d];
  fStack_16584 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49c];
  fStack_16410 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ab];
  fStack_1629c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ba];
  fStack_16128 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4c9];
  fStack_15fb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d8];
  fStack_15e40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e7];
  fStack_1c850 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xb0];
  fStack_1c280 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xec];
  fStack_1c10c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfb];
  fStack_1bf98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10a];
  fStack_1be24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x119];
  fStack_1bcb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x128];
  fStack_1bb3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x137];
  fStack_1b854 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x146];
  fStack_1b6e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x155];
  fStack_1b56c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x164];
  fStack_1b3f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x173];
  fStack_1b284 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x182];
  fStack_1b110 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x191];
  fStack_1af9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a0];
  fStack_1ae28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1af];
  fStack_1acb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1be];
  fStack_1ab40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cd];
  fStack_1a9cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1dc];
  fStack_1a858 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1eb];
  fStack_1a6e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fa];
  fStack_1a570 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x209];
  fStack_1a3fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x218];
  fStack_1a288 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x227];
  fStack_1a114 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x236];
  fStack_19fa0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x245];
  fStack_19e2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x254];
  fStack_19cb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x263];
  fStack_19b44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x272];
  fStack_199d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x281];
  fStack_1985c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x290];
  fStack_196e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x29f];
  fStack_19574 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ae];
  fStack_19400 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2bd];
  fStack_1928c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cc];
  fStack_19118 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2db];
  fStack_18fa4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ea];
  fStack_18e30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2f9];
  fStack_18cbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x308];
  fStack_18b48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x317];
  fStack_189d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x326];
  fStack_18860 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x335];
  fStack_186ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x344];
  fStack_18578 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x353];
  fStack_18404 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x362];
  fStack_18290 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x371];
  fStack_1811c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x380];
  fStack_17fa8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x38f];
  fStack_17e34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39e];
  fStack_17cc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ad];
  fStack_17b4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bc];
  fStack_179d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3cb];
  fStack_17864 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3da];
  fStack_176f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3e9];
  fStack_1757c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f8];
  fStack_17408 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x407];
  fStack_17294 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x416];
  fStack_17120 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x425];
  fStack_16fac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x434];
  fStack_16e38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x443];
  fStack_16cc4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x452];
  fStack_16b50 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x461];
  fStack_169dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x470];
  fStack_16868 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x47f];
  fStack_166f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48e];
  fStack_16580 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49d];
  fStack_1640c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ac];
  fStack_16298 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4bb];
  fStack_16124 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ca];
  fStack_15fb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4d9];
  fStack_15e3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e8];
  fStack_1c6d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xc0];
  fStack_1c27c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xed];
  fStack_1c108 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfc];
  fStack_1bf94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10b];
  fStack_1be20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11a];
  fStack_1bcac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x129];
  fStack_1bb38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x138];
  fStack_1b850 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x147];
  fStack_1b6dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x156];
  fStack_1b568 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x165];
  fStack_1b3f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x174];
  fStack_1b280 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x183];
  fStack_1b10c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x192];
  fStack_1af98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a1];
  fStack_1ae24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b0];
  fStack_1acb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1bf];
  fStack_1ab3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ce];
  fStack_1a9c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1dd];
  fStack_1a854 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ec];
  fStack_1a6e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fb];
  fStack_1a56c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20a];
  fStack_1a3f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x219];
  fStack_1a284 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x228];
  fStack_1a110 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x237];
  fStack_19f9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x246];
  fStack_19e28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x255];
  fStack_19cb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x264];
  fStack_19b40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x273];
  fStack_199cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x282];
  fStack_19858 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x291];
  fStack_196e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a0];
  fStack_19570 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2af];
  fStack_193fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2be];
  fStack_19288 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cd];
  fStack_19114 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2dc];
  fStack_18fa0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2eb];
  fStack_18e2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fa];
  fStack_18cb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x309];
  fStack_18b44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x318];
  fStack_189d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x327];
  fStack_1885c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x336];
  fStack_186e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x345];
  fStack_18574 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x354];
  fStack_18400 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x363];
  fStack_1828c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x372];
  fStack_18118 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x381];
  fStack_17fa4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x390];
  fStack_17e30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x39f];
  fStack_17cbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ae];
  fStack_17b48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bd];
  fStack_179d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3cc];
  fStack_17860 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3db];
  fStack_176ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ea];
  fStack_17578 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3f9];
  fStack_17404 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x408];
  fStack_17290 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x417];
  fStack_1711c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x426];
  fStack_16fa8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x435];
  fStack_16e34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x444];
  fStack_16cc0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x453];
  fStack_16b4c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x462];
  fStack_169d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x471];
  fStack_16864 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x480];
  fStack_166f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x48f];
  fStack_1657c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49e];
  fStack_16408 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ad];
  fStack_16294 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4bc];
  fStack_16120 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cb];
  fStack_15fac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4da];
  fStack_15e38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4e9];
  fStack_1c560 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xd0];
  fStack_1c278 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xee];
  fStack_1c104 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfd];
  fStack_1bf90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10c];
  fStack_1be1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11b];
  fStack_1bca8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x12a];
  fStack_1bb34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x139];
  fStack_1b84c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x148];
  fStack_1b6d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x157];
  fStack_1b564 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x166];
  fStack_1b3f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x175];
  fStack_1b27c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x184];
  fStack_1b108 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x193];
  fStack_1af94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a2];
  fStack_1ae20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b1];
  fStack_1acac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c0];
  fStack_1ab38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1cf];
  fStack_1a9c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1de];
  fStack_1a850 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ed];
  fStack_1a6dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fc];
  fStack_1a568 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20b];
  fStack_1a3f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21a];
  fStack_1a280 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x229];
  fStack_1a10c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x238];
  fStack_19f98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x247];
  fStack_19e24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x256];
  fStack_19cb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x265];
  fStack_19b3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x274];
  fStack_199c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x283];
  fStack_19854 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x292];
  fStack_196e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a1];
  fStack_1956c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b0];
  fStack_193f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2bf];
  fStack_19284 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ce];
  fStack_19110 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2dd];
  fStack_18f9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ec];
  fStack_18e28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fb];
  fStack_18cb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30a];
  fStack_18b40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x319];
  fStack_189cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x328];
  fStack_18858 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x337];
  fStack_186e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x346];
  fStack_18570 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x355];
  fStack_183fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x364];
  fStack_18288 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x373];
  fStack_18114 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x382];
  fStack_17fa0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x391];
  fStack_17e2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a0];
  fStack_17cb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3af];
  fStack_17b44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3be];
  fStack_179d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3cd];
  fStack_1785c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3dc];
  fStack_176e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3eb];
  fStack_17574 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fa];
  fStack_17400 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x409];
  fStack_1728c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x418];
  fStack_17118 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x427];
  fStack_16fa4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x436];
  fStack_16e30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x445];
  fStack_16cbc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x454];
  fStack_16b48 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x463];
  fStack_169d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x472];
  fStack_16860 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x481];
  fStack_166ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x490];
  fStack_16578 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x49f];
  fStack_16404 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ae];
  fStack_16290 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4bd];
  fStack_1611c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cc];
  fStack_15fa8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4db];
  fStack_15e34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4ea];
  fStack_1c3e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xe0];
  fStack_1c274 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xef];
  fStack_1c100 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0xfe];
  fStack_1bf8c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x10d];
  fStack_1be18 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x11c];
  fStack_1bca4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[299];
  fStack_1bb30 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x13a];
  fStack_1b848 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x149];
  fStack_1b6d4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x158];
  fStack_1b560 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x167];
  fStack_1b3ec = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x176];
  fStack_1b278 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x185];
  fStack_1b104 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x194];
  fStack_1af90 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1a3];
  fStack_1ae1c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1b2];
  fStack_1aca8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1c1];
  fStack_1ab34 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1d0];
  fStack_1a9c0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1df];
  fStack_1a84c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1ee];
  fStack_1a6d8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x1fd];
  fStack_1a564 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x20c];
  fStack_1a3f0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x21b];
  fStack_1a27c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x22a];
  fStack_1a108 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x239];
  fStack_19f94 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x248];
  fStack_19e20 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[599];
  fStack_19cac = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x266];
  fStack_19b38 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x275];
  fStack_199c4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x284];
  fStack_19850 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x293];
  fStack_196dc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2a2];
  fStack_19568 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2b1];
  fStack_193f4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2c0];
  fStack_19280 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2cf];
  fStack_1910c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2de];
  fStack_18f98 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2ed];
  fStack_18e24 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x2fc];
  fStack_18cb0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x30b];
  fStack_18b3c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x31a];
  fStack_189c8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x329];
  fStack_18854 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x338];
  fStack_186e0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x347];
  fStack_1856c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x356];
  fStack_183f8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x365];
  fStack_18284 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x374];
  fStack_18110 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[899];
  fStack_17f9c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x392];
  fStack_17e28 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3a1];
  fStack_17cb4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3b0];
  fStack_17b40 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3bf];
  fStack_179cc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ce];
  fStack_17858 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3dd];
  fStack_176e4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3ec];
  fStack_17570 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x3fb];
  fStack_173fc = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x40a];
  fStack_17288 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x419];
  fStack_17114 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x428];
  fStack_16fa0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x437];
  fStack_16e2c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x446];
  fStack_16cb8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x455];
  fStack_16b44 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x464];
  fStack_169d0 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x473];
  fStack_1685c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x482];
  fStack_166e8 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x491];
  fStack_16574 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4a0];
  fStack_16400 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4af];
  fStack_1628c = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4be];
  fStack_16118 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4cd];
  fStack_15fa4 = MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.
                 m_storage.m_data.array[0x4dc];
  afStack_15e30[0] =
       MStack_25718.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
       .array[0x4eb];
  afStack_14400[0] = 0.0;
  afStack_14400[1] = 0.0;
  afStack_14400[2] = 0.0;
  afStack_14400[3] = 0.0;
  afStack_14400[4] = 1.30321e-43;
  afStack_14400[5] = 0.0;
  local_38 = 0;
  local_34 = 0;
  local_33 = '\0';
  auStack_14418._0_8_ = &PStack_24250;
  auStack_14418._16_8_ = &PStack_24250;
  Eigen::PartialPivLU<Eigen::Matrix<float,93,93,0,93,93>>::
  compute<Eigen::Block<Eigen::Matrix<float,93,157,0,93,157>,93,93,false>>
            ((PartialPivLU<Eigen::Matrix<float,93,93,0,93,93>> *)local_8a44,
             (EigenBase<Eigen::Block<Eigen::Matrix<float,_93,_157,_0,_93,_157>,_93,_93,_false>_> *)
             auStack_14418);
  BStack_24280.
  super_BlockImpl<Eigen::Matrix<float,_93,_157,_0,_93,_157>,_93,_64,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_93,_157,_0,_93,_157>,_93,_64,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_93,_157,_0,_93,_157>,_93,_64,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_93,_157,_0,_93,_157>,_93,_64,_false>,_0>.m_data =
       afStack_1bb2c;
  BStack_24280.
  super_BlockImpl<Eigen::Matrix<float,_93,_157,_0,_93,_157>,_93,_64,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_93,_157,_0,_93,_157>,_93,_64,_false,_true>.m_startRow.
  m_value = 0;
  BStack_24280.
  super_BlockImpl<Eigen::Matrix<float,_93,_157,_0,_93,_157>,_93,_64,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_93,_157,_0,_93,_157>,_93,_64,_false,_true>.m_startCol.
  m_value = 0x5d;
  BStack_24280.
  super_BlockImpl<Eigen::Matrix<float,_93,_157,_0,_93,_157>,_93,_64,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_93,_157,_0,_93,_157>,_93,_64,_false,_true>.
  m_outerStride = 0x5d;
  BStack_24280.
  super_BlockImpl<Eigen::Matrix<float,_93,_157,_0,_93,_157>,_93,_64,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_93,_157,_0,_93,_157>,_93,_64,_false,_true>.m_xpr =
       (XprTypeNested)&PStack_24250;
  if (local_33 != '\0') {
    Eigen::PartialPivLU<Eigen::Matrix<float,93,93,0,93,93>>::
    _solve_impl<Eigen::Block<Eigen::Matrix<float,93,157,0,93,157>,93,64,false>,Eigen::Matrix<float,93,64,0,93,64>>
              ((PartialPivLU<Eigen::Matrix<float,93,93,0,93,93>> *)local_8a44,&BStack_24280,
               (Matrix<float,_93,_64,_0,_93,_64> *)auStack_14418);
    pfVar12 = pfStack_24288;
    memset(pfStack_24288,0,0x4000);
    lVar16 = 0x90;
    pfVar13 = pfVar12;
    do {
      *pfVar13 = *pfVar13 - *(float *)(auStack_14418 + lVar16);
      lVar16 = lVar16 + 0x174;
      pfVar13 = pfVar13 + 0x40;
    } while (lVar16 != 0x5d90);
    pfVar13 = pfVar12 + 1;
    lVar16 = 0x108;
    do {
      *pfVar13 = *pfVar13 - *(float *)(auStack_14418 + lVar16);
      lVar16 = lVar16 + 0x174;
      pfVar13 = pfVar13 + 0x40;
    } while (lVar16 != 0x5e08);
    pfVar13 = pfVar12 + 2;
    lVar16 = 0x10c;
    do {
      *pfVar13 = *pfVar13 - *(float *)(auStack_14418 + lVar16);
      lVar16 = lVar16 + 0x174;
      pfVar13 = pfVar13 + 0x40;
    } while (lVar16 != 0x5e0c);
    pfVar13 = pfVar12 + 3;
    lVar16 = 0x110;
    do {
      *pfVar13 = *pfVar13 - *(float *)(auStack_14418 + lVar16);
      lVar16 = lVar16 + 0x174;
      pfVar13 = pfVar13 + 0x40;
    } while (lVar16 != 0x5e10);
    pfVar13 = pfVar12 + 4;
    lVar16 = 0x114;
    do {
      *pfVar13 = *pfVar13 - *(float *)(auStack_14418 + lVar16);
      lVar16 = lVar16 + 0x174;
      pfVar13 = pfVar13 + 0x40;
    } while (lVar16 != 0x5e14);
    pfVar13 = pfVar12 + 5;
    lVar16 = 0x118;
    do {
      *pfVar13 = *pfVar13 - *(float *)(auStack_14418 + lVar16);
      lVar16 = lVar16 + 0x174;
      pfVar13 = pfVar13 + 0x40;
    } while (lVar16 != 0x5e18);
    pfVar13 = pfVar12 + 6;
    lVar16 = 0x11c;
    do {
      *pfVar13 = *pfVar13 - *(float *)(auStack_14418 + lVar16);
      lVar16 = lVar16 + 0x174;
      pfVar13 = pfVar13 + 0x40;
    } while (lVar16 != 0x5e1c);
    pfVar12[7] = 1.0;
    pfVar13 = pfVar12 + 8;
    lVar16 = 0x13c;
    do {
      *pfVar13 = *pfVar13 - *(float *)(auStack_14418 + lVar16);
      lVar16 = lVar16 + 0x174;
      pfVar13 = pfVar13 + 0x40;
    } while (lVar16 != 0x5e3c);
    pfVar13 = pfVar12 + 9;
    lVar16 = 0x140;
    do {
      *pfVar13 = *pfVar13 - *(float *)(auStack_14418 + lVar16);
      lVar16 = lVar16 + 0x174;
      pfVar13 = pfVar13 + 0x40;
    } while (lVar16 != 0x5e40);
    pfVar13 = pfVar12 + 10;
    lVar16 = 0x144;
    do {
      *pfVar13 = *pfVar13 - *(float *)(auStack_14418 + lVar16);
      lVar16 = lVar16 + 0x174;
      pfVar13 = pfVar13 + 0x40;
    } while (lVar16 != 0x5e44);
    pfVar13 = pfVar12 + 0xb;
    lVar16 = 0x148;
    do {
      *pfVar13 = *pfVar13 - *(float *)(auStack_14418 + lVar16);
      lVar16 = lVar16 + 0x174;
      pfVar13 = pfVar13 + 0x40;
    } while (lVar16 != 0x5e48);
    pfVar13 = pfVar12 + 0xc;
    lVar16 = 0x14c;
    do {
      *pfVar13 = *pfVar13 - *(float *)(auStack_14418 + lVar16);
      lVar16 = lVar16 + 0x174;
      pfVar13 = pfVar13 + 0x40;
    } while (lVar16 != 0x5e4c);
    pfVar13 = pfVar12 + 0xd;
    lVar16 = 0x150;
    do {
      *pfVar13 = *pfVar13 - *(float *)(auStack_14418 + lVar16);
      lVar16 = lVar16 + 0x174;
      pfVar13 = pfVar13 + 0x40;
    } while (lVar16 != 0x5e50);
    pfVar13 = pfVar12 + 0xe;
    lVar16 = 0x154;
    do {
      *pfVar13 = *pfVar13 - *(float *)(auStack_14418 + lVar16);
      lVar16 = lVar16 + 0x174;
      pfVar13 = pfVar13 + 0x40;
    } while (lVar16 != 0x5e54);
    pfVar13 = pfVar12 + 0xf;
    lVar16 = 0x158;
    do {
      *pfVar13 = *pfVar13 - *(float *)(auStack_14418 + lVar16);
      lVar16 = lVar16 + 0x174;
      pfVar13 = pfVar13 + 0x40;
    } while (lVar16 != 0x5e58);
    pfVar13 = pfVar12 + 0x10;
    lVar16 = 0x15c;
    do {
      *pfVar13 = *pfVar13 - *(float *)(auStack_14418 + lVar16);
      lVar16 = lVar16 + 0x174;
      pfVar13 = pfVar13 + 0x40;
    } while (lVar16 != 0x5e5c);
    pfVar13 = pfVar12 + 0x11;
    lVar16 = 0x160;
    do {
      *pfVar13 = *pfVar13 - *(float *)(auStack_14418 + lVar16);
      lVar16 = lVar16 + 0x174;
      pfVar13 = pfVar13 + 0x40;
    } while (lVar16 != 0x5e60);
    pfVar13 = pfVar12 + 0x12;
    lVar16 = 0x164;
    do {
      *pfVar13 = *pfVar13 - *(float *)(auStack_14418 + lVar16);
      lVar16 = lVar16 + 0x174;
      pfVar13 = pfVar13 + 0x40;
    } while (lVar16 != 0x5e64);
    pfVar13 = pfVar12 + 0x13;
    lVar16 = 0x168;
    do {
      *pfVar13 = *pfVar13 - *(float *)(auStack_14418 + lVar16);
      lVar16 = lVar16 + 0x174;
      pfVar13 = pfVar13 + 0x40;
    } while (lVar16 != 0x5e68);
    pfVar13 = pfVar12 + 0x14;
    lVar16 = 0x16c;
    do {
      *pfVar13 = *pfVar13 - *(float *)(auStack_14418 + lVar16);
      lVar16 = lVar16 + 0x174;
      pfVar13 = pfVar13 + 0x40;
    } while (lVar16 != 0x5e6c);
    pfVar13 = pfVar12 + 0x15;
    lVar16 = 0x170;
    do {
      *pfVar13 = *pfVar13 - *(float *)(auStack_14418 + lVar16);
      lVar16 = lVar16 + 0x174;
      pfVar13 = pfVar13 + 0x40;
    } while (lVar16 != 0x5e70);
    pfVar12[0x56] = 1.0;
    pfVar12[0x97] = 1.0;
    pfVar12[0xd8] = 1.0;
    pfVar12[0x119] = 1.0;
    pfVar12[0x15a] = 1.0;
    pfVar12[0x19b] = 1.0;
    pfVar12[0x1dc] = 1.0;
    pfVar12[0x39d] = 1.0;
    pfVar12[0x3de] = 1.0;
    pfVar12[0x41f] = 1.0;
    pfVar12[0x460] = 1.0;
    pfVar12[0x4a1] = 1.0;
    pfVar12[0x4e2] = 1.0;
    pfVar12[0x523] = 1.0;
    pfVar12[0x564] = 1.0;
    pfVar12[0x5a5] = 1.0;
    pfVar12[0x5e6] = 1.0;
    pfVar12[0x627] = 1.0;
    pfVar12[0x668] = 1.0;
    pfVar12[0x6a9] = 1.0;
    pfVar12[0x6ea] = 1.0;
    pfVar12[0x72b] = 1.0;
    pfVar12[0x8ac] = 1.0;
    pfVar12[0x8ed] = 1.0;
    pfVar12[0x92e] = 1.0;
    pfVar12[0x96f] = 1.0;
    pfVar12[0x9b0] = 1.0;
    pfVar12[0x9f1] = 1.0;
    pfVar12[0xa32] = 1.0;
    pfVar12[0xa73] = 1.0;
    pfVar12[0xab4] = 1.0;
    pfVar12[0xaf5] = 1.0;
    pfVar12[0xc36] = 1.0;
    pfVar12[0xc77] = 1.0;
    pfVar12[0xcb8] = 1.0;
    pfVar12[0xcf9] = 1.0;
    pfVar12[0xd3a] = 1.0;
    pfVar12[0xd7b] = 1.0;
    pfVar12[0xe7c] = 1.0;
    pfVar12[0xebd] = 1.0;
    pfVar12[0xefe] = 1.0;
    pfVar12[0xfbf] = 1.0;
    lVar16 = 0x870;
    do {
      pvVar3 = *(void **)((long)&avStack_15018[-1].super__Vector_base<float,_std::allocator<float>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar16);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,*(long *)((long)avStack_15018 + lVar16 + -8) - (long)pvVar3);
      }
      lVar16 = lVar16 + -0x18;
    } while (lVar16 != 0);
    return;
  }
  __assert_fail("derived().m_isInitialized && \"Solver is not initialized.\"",
                "/usr/include/eigen3/Eigen/src/Core/SolverBase.h",0x96,
                "void Eigen::SolverBase<Eigen::PartialPivLU<Eigen::Matrix<float, 93, 93>>>::_check_solve_assertion(const Rhs &) const [Derived = Eigen::PartialPivLU<Eigen::Matrix<float, 93, 93>>, Transpose_ = false, Rhs = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float, 93, 157>, 93, 64>>]"
               );
}

Assistant:

void setupAction(
    const std::vector<Eigen::Matrix<floatPrec,6,1>,Eigen::aligned_allocator< Eigen::Matrix<floatPrec,6,1> > > & L1,
    const std::vector<Eigen::Matrix<floatPrec,6,1>,Eigen::aligned_allocator< Eigen::Matrix<floatPrec,6,1> > > & L2,
    Eigen::Matrix<floatPrec,64,64> & Action )
{
  std::vector<floatPrec> m[DECA_EQS][5][3];
  for( int primI = 0; primI < DECA_EQS; primI++ )
  {
    for( int secI = 0; secI < 6; secI++ )
    {
      if( primI != secI )
      {
        const Eigen::Matrix<floatPrec,6,1> & l01 = L1[primI];
        const Eigen::Matrix<floatPrec,6,1> & l02 = L2[primI];
        const Eigen::Matrix<floatPrec,6,1> & l11 = L1[secI];
        const Eigen::Matrix<floatPrec,6,1> & l12 = L2[secI];
        
        int r = secI;
        if(secI > primI)
          r--;
        
        fillRow1<floatPrec>( l01, l02, l11, l12, m[primI][r][0], m[primI][r][1], m[primI][r][2] );
      }
    }
  }

  Eigen::Matrix<floatPrec,EQS,84> M1p = Eigen::Matrix<floatPrec,EQS,84>::Zero();
  
  int decaIndex = 0;
  int row0 = 0;
  int row1 = 1;
  int row2 = 2;
  
  for( int row = 0; row < EQS; row++ )
  {
    fillRow2<floatPrec>( M1p, row, m[decaIndex][row0], m[decaIndex][row1], m[decaIndex][row2] );
    
    row2++;
    if( row2 > 4 )
    {
      row1++;
      row2 = row1 + 1;
      if( row1 > 3 )
      {
        row0++;
        row1 = row0 + 1;
        row2 = row1 + 1;
        
        if( row0 > 2)
        {
          decaIndex++;
          row0 = 0;
          row1 = 1;
          row2 = 2;
        }
      }
    }
  }
  
  //this is currently hardcoded for 15 equations!
  //Eigen::Matrix<floatPrec,15,15> M1_part1 = M1.block<15,15>(0,0);
  //Eigen::Matrix<floatPrec,15,84> M1_part2 = M1_part1.inverse() * M1;
  //M1 = M1_part2;
  
  Eigen::Matrix<floatPrec,EQS,15> B = M1p.template block<EQS,15>(0,0);
  Eigen::Matrix<floatPrec,15,EQS> Bt = B.transpose();
  Eigen::Matrix<floatPrec,15,15> BtB = Bt * B;
  Eigen::Matrix<floatPrec,15,84> M1 = BtB.inverse() * Bt * M1p;
  
  Eigen::Matrix<floatPrec,93,157> M2 = Eigen::Matrix<floatPrec,93,157>::Zero();
M2(0,23) = M1(14,14); M2(0,24) = M1(14,15); M2(0,25) = M1(14,16); M2(0,26) = M1(14,17); M2(0,27) = M1(14,18); M2(0,28) = M1(14,19); M2(0,29) = M1(14,20); M2(0,30) = M1(14,21); M2(0,31) = M1(14,22); M2(0,32) = M1(14,23); M2(0,33) = M1(14,24); M2(0,34) = M1(14,25); M2(0,35) = M1(14,26); M2(0,36) = M1(14,27); M2(0,52) = M1(14,28); M2(0,53) = M1(14,29); M2(0,54) = M1(14,30); M2(0,55) = M1(14,31); M2(0,56) = M1(14,32); M2(0,57) = M1(14,33); M2(0,58) = M1(14,34); M2(0,59) = M1(14,35); M2(0,60) = M1(14,36); M2(0,61) = M1(14,37); M2(0,62) = M1(14,38); M2(0,63) = M1(14,39); M2(0,64) = M1(14,40); M2(0,65) = M1(14,41); M2(0,66) = M1(14,42); M2(0,67) = M1(14,43); M2(0,68) = M1(14,44); M2(0,69) = M1(14,45); M2(0,70) = M1(14,46); M2(0,71) = M1(14,47); M2(0,85) = M1(14,49); M2(0,86) = M1(14,50); M2(0,87) = M1(14,51); M2(0,88) = M1(14,52); M2(0,89) = M1(14,53); M2(0,90) = M1(14,54); M2(0,91) = M1(14,55); M2(0,92) = M1(14,56); M2(0,93) = M1(14,48); M2(0,94) = M1(14,57); M2(0,95) = M1(14,58); M2(0,96) = M1(14,59); M2(0,97) = M1(14,60); M2(0,98) = M1(14,61); M2(0,99) = M1(14,62); M2(0,100) = M1(14,63); M2(0,112) = M1(14,64); M2(0,113) = M1(14,65); M2(0,114) = M1(14,66); M2(0,115) = M1(14,67); M2(0,116) = M1(14,68); M2(0,117) = M1(14,69); M2(0,118) = M1(14,70); M2(0,119) = M1(14,71); M2(0,120) = M1(14,72); M2(0,121) = M1(14,73); M2(0,131) = M1(14,74); M2(0,132) = M1(14,75); M2(0,133) = M1(14,76); M2(0,134) = M1(14,77); M2(0,135) = M1(14,78); M2(0,136) = M1(14,79); M2(0,144) = M1(14,80); M2(0,145) = M1(14,81); M2(0,146) = M1(14,82); M2(0,152) = M1(14,83); 
M2(1,18) = M1(14,14); M2(1,19) = M1(14,15); M2(1,20) = M1(14,16); M2(1,21) = M1(14,17); M2(1,23) = M1(14,18); M2(1,24) = M1(14,19); M2(1,25) = M1(14,20); M2(1,26) = M1(14,21); M2(1,28) = M1(14,22); M2(1,29) = M1(14,23); M2(1,30) = M1(14,24); M2(1,32) = M1(14,25); M2(1,33) = M1(14,26); M2(1,35) = M1(14,27); M2(1,46) = M1(14,28); M2(1,47) = M1(14,29); M2(1,48) = M1(14,30); M2(1,49) = M1(14,31); M2(1,50) = M1(14,32); M2(1,51) = M1(14,33); M2(1,53) = M1(14,34); M2(1,54) = M1(14,35); M2(1,55) = M1(14,36); M2(1,56) = M1(14,37); M2(1,57) = M1(14,38); M2(1,59) = M1(14,39); M2(1,60) = M1(14,40); M2(1,61) = M1(14,41); M2(1,62) = M1(14,42); M2(1,64) = M1(14,43); M2(1,65) = M1(14,44); M2(1,66) = M1(14,45); M2(1,68) = M1(14,46); M2(1,69) = M1(14,47); M2(1,71) = M1(14,48); M2(1,80) = M1(14,49); M2(1,81) = M1(14,50); M2(1,82) = M1(14,51); M2(1,83) = M1(14,52); M2(1,84) = M1(14,53); M2(1,86) = M1(14,54); M2(1,87) = M1(14,55); M2(1,88) = M1(14,56); M2(1,89) = M1(14,57); M2(1,91) = M1(14,58); M2(1,92) = M1(14,59); M2(1,94) = M1(14,60); M2(1,96) = M1(14,61); M2(1,97) = M1(14,62); M2(1,99) = M1(14,63); M2(1,108) = M1(14,64); M2(1,109) = M1(14,65); M2(1,110) = M1(14,66); M2(1,111) = M1(14,67); M2(1,113) = M1(14,68); M2(1,114) = M1(14,69); M2(1,115) = M1(14,70); M2(1,117) = M1(14,71); M2(1,118) = M1(14,72); M2(1,120) = M1(14,73); M2(1,128) = M1(14,74); M2(1,129) = M1(14,75); M2(1,130) = M1(14,76); M2(1,132) = M1(14,77); M2(1,133) = M1(14,78); M2(1,135) = M1(14,79); M2(1,142) = M1(14,80); M2(1,143) = M1(14,81); M2(1,145) = M1(14,82); M2(1,151) = M1(14,83); 
M2(2,6) = M1(8,8); M2(2,13) = M1(8,15); M2(2,14) = M1(8,16); M2(2,15) = M1(8,17); M2(2,18) = M1(8,18); M2(2,19) = M1(8,19); M2(2,20) = M1(8,20); M2(2,21) = M1(8,21); M2(2,24) = M1(8,22); M2(2,25) = M1(8,23); M2(2,26) = M1(8,24); M2(2,29) = M1(8,25); M2(2,30) = M1(8,26); M2(2,33) = M1(8,27); M2(2,39) = M1(8,28); M2(2,40) = M1(8,29); M2(2,41) = M1(8,30); M2(2,42) = M1(8,31); M2(2,43) = M1(8,32); M2(2,44) = M1(8,33); M2(2,47) = M1(8,34); M2(2,48) = M1(8,35); M2(2,49) = M1(8,36); M2(2,50) = M1(8,37); M2(2,51) = M1(8,38); M2(2,54) = M1(8,39); M2(2,55) = M1(8,40); M2(2,56) = M1(8,41); M2(2,57) = M1(8,42); M2(2,60) = M1(8,43); M2(2,61) = M1(8,44); M2(2,62) = M1(8,45); M2(2,65) = M1(8,46); M2(2,66) = M1(8,47); M2(2,69) = M1(8,48); M2(2,74) = M1(8,49); M2(2,75) = M1(8,50); M2(2,76) = M1(8,51); M2(2,77) = M1(8,52); M2(2,78) = M1(8,53); M2(2,81) = M1(8,54); M2(2,82) = M1(8,55); M2(2,83) = M1(8,56); M2(2,84) = M1(8,57); M2(2,87) = M1(8,58); M2(2,88) = M1(8,59); M2(2,89) = M1(8,60); M2(2,92) = M1(8,61); M2(2,94) = M1(8,62); M2(2,97) = M1(8,63); M2(2,103) = M1(8,64); M2(2,104) = M1(8,65); M2(2,105) = M1(8,66); M2(2,106) = M1(8,67); M2(2,109) = M1(8,68); M2(2,110) = M1(8,69); M2(2,111) = M1(8,70); M2(2,114) = M1(8,71); M2(2,115) = M1(8,72); M2(2,118) = M1(8,73); M2(2,124) = M1(8,74); M2(2,125) = M1(8,75); M2(2,126) = M1(8,76); M2(2,129) = M1(8,77); M2(2,130) = M1(8,78); M2(2,133) = M1(8,79); M2(2,139) = M1(8,80); M2(2,140) = M1(8,81); M2(2,143) = M1(8,82); M2(2,149) = M1(8,83); 
M2(3,7) = M1(9,9); M2(3,13) = M1(9,15); M2(3,14) = M1(9,16); M2(3,15) = M1(9,17); M2(3,18) = M1(9,18); M2(3,19) = M1(9,19); M2(3,20) = M1(9,20); M2(3,21) = M1(9,21); M2(3,24) = M1(9,22); M2(3,25) = M1(9,23); M2(3,26) = M1(9,24); M2(3,29) = M1(9,25); M2(3,30) = M1(9,26); M2(3,33) = M1(9,27); M2(3,39) = M1(9,28); M2(3,40) = M1(9,29); M2(3,41) = M1(9,30); M2(3,42) = M1(9,31); M2(3,43) = M1(9,32); M2(3,44) = M1(9,33); M2(3,47) = M1(9,34); M2(3,48) = M1(9,35); M2(3,49) = M1(9,36); M2(3,50) = M1(9,37); M2(3,51) = M1(9,38); M2(3,54) = M1(9,39); M2(3,55) = M1(9,40); M2(3,56) = M1(9,41); M2(3,57) = M1(9,42); M2(3,60) = M1(9,43); M2(3,61) = M1(9,44); M2(3,62) = M1(9,45); M2(3,65) = M1(9,46); M2(3,66) = M1(9,47); M2(3,69) = M1(9,48); M2(3,74) = M1(9,49); M2(3,75) = M1(9,50); M2(3,76) = M1(9,51); M2(3,77) = M1(9,52); M2(3,78) = M1(9,53); M2(3,81) = M1(9,54); M2(3,82) = M1(9,55); M2(3,83) = M1(9,56); M2(3,84) = M1(9,57); M2(3,87) = M1(9,58); M2(3,88) = M1(9,59); M2(3,89) = M1(9,60); M2(3,92) = M1(9,61); M2(3,94) = M1(9,62); M2(3,97) = M1(9,63); M2(3,103) = M1(9,64); M2(3,104) = M1(9,65); M2(3,105) = M1(9,66); M2(3,106) = M1(9,67); M2(3,109) = M1(9,68); M2(3,110) = M1(9,69); M2(3,111) = M1(9,70); M2(3,114) = M1(9,71); M2(3,115) = M1(9,72); M2(3,118) = M1(9,73); M2(3,124) = M1(9,74); M2(3,125) = M1(9,75); M2(3,126) = M1(9,76); M2(3,129) = M1(9,77); M2(3,130) = M1(9,78); M2(3,133) = M1(9,79); M2(3,139) = M1(9,80); M2(3,140) = M1(9,81); M2(3,143) = M1(9,82); M2(3,149) = M1(9,83); 
M2(4,8) = M1(10,10); M2(4,13) = M1(10,15); M2(4,14) = M1(10,16); M2(4,15) = M1(10,17); M2(4,18) = M1(10,18); M2(4,19) = M1(10,19); M2(4,20) = M1(10,20); M2(4,21) = M1(10,21); M2(4,24) = M1(10,22); M2(4,25) = M1(10,23); M2(4,26) = M1(10,24); M2(4,29) = M1(10,25); M2(4,30) = M1(10,26); M2(4,33) = M1(10,27); M2(4,39) = M1(10,28); M2(4,40) = M1(10,29); M2(4,41) = M1(10,30); M2(4,42) = M1(10,31); M2(4,43) = M1(10,32); M2(4,44) = M1(10,33); M2(4,47) = M1(10,34); M2(4,48) = M1(10,35); M2(4,49) = M1(10,36); M2(4,50) = M1(10,37); M2(4,51) = M1(10,38); M2(4,54) = M1(10,39); M2(4,55) = M1(10,40); M2(4,56) = M1(10,41); M2(4,57) = M1(10,42); M2(4,60) = M1(10,43); M2(4,61) = M1(10,44); M2(4,62) = M1(10,45); M2(4,65) = M1(10,46); M2(4,66) = M1(10,47); M2(4,69) = M1(10,48); M2(4,74) = M1(10,49); M2(4,75) = M1(10,50); M2(4,76) = M1(10,51); M2(4,77) = M1(10,52); M2(4,78) = M1(10,53); M2(4,81) = M1(10,54); M2(4,82) = M1(10,55); M2(4,83) = M1(10,56); M2(4,84) = M1(10,57); M2(4,87) = M1(10,58); M2(4,88) = M1(10,59); M2(4,89) = M1(10,60); M2(4,92) = M1(10,61); M2(4,94) = M1(10,62); M2(4,97) = M1(10,63); M2(4,103) = M1(10,64); M2(4,104) = M1(10,65); M2(4,105) = M1(10,66); M2(4,106) = M1(10,67); M2(4,109) = M1(10,68); M2(4,110) = M1(10,69); M2(4,111) = M1(10,70); M2(4,114) = M1(10,71); M2(4,115) = M1(10,72); M2(4,118) = M1(10,73); M2(4,124) = M1(10,74); M2(4,125) = M1(10,75); M2(4,126) = M1(10,76); M2(4,129) = M1(10,77); M2(4,130) = M1(10,78); M2(4,133) = M1(10,79); M2(4,139) = M1(10,80); M2(4,140) = M1(10,81); M2(4,143) = M1(10,82); M2(4,149) = M1(10,83); 
M2(5,9) = M1(11,11); M2(5,13) = M1(11,15); M2(5,14) = M1(11,16); M2(5,15) = M1(11,17); M2(5,18) = M1(11,18); M2(5,19) = M1(11,19); M2(5,20) = M1(11,20); M2(5,21) = M1(11,21); M2(5,24) = M1(11,22); M2(5,25) = M1(11,23); M2(5,26) = M1(11,24); M2(5,29) = M1(11,25); M2(5,30) = M1(11,26); M2(5,33) = M1(11,27); M2(5,39) = M1(11,28); M2(5,40) = M1(11,29); M2(5,41) = M1(11,30); M2(5,42) = M1(11,31); M2(5,43) = M1(11,32); M2(5,44) = M1(11,33); M2(5,47) = M1(11,34); M2(5,48) = M1(11,35); M2(5,49) = M1(11,36); M2(5,50) = M1(11,37); M2(5,51) = M1(11,38); M2(5,54) = M1(11,39); M2(5,55) = M1(11,40); M2(5,56) = M1(11,41); M2(5,57) = M1(11,42); M2(5,60) = M1(11,43); M2(5,61) = M1(11,44); M2(5,62) = M1(11,45); M2(5,65) = M1(11,46); M2(5,66) = M1(11,47); M2(5,69) = M1(11,48); M2(5,74) = M1(11,49); M2(5,75) = M1(11,50); M2(5,76) = M1(11,51); M2(5,77) = M1(11,52); M2(5,78) = M1(11,53); M2(5,81) = M1(11,54); M2(5,82) = M1(11,55); M2(5,83) = M1(11,56); M2(5,84) = M1(11,57); M2(5,87) = M1(11,58); M2(5,88) = M1(11,59); M2(5,89) = M1(11,60); M2(5,92) = M1(11,61); M2(5,94) = M1(11,62); M2(5,97) = M1(11,63); M2(5,103) = M1(11,64); M2(5,104) = M1(11,65); M2(5,105) = M1(11,66); M2(5,106) = M1(11,67); M2(5,109) = M1(11,68); M2(5,110) = M1(11,69); M2(5,111) = M1(11,70); M2(5,114) = M1(11,71); M2(5,115) = M1(11,72); M2(5,118) = M1(11,73); M2(5,124) = M1(11,74); M2(5,125) = M1(11,75); M2(5,126) = M1(11,76); M2(5,129) = M1(11,77); M2(5,130) = M1(11,78); M2(5,133) = M1(11,79); M2(5,139) = M1(11,80); M2(5,140) = M1(11,81); M2(5,143) = M1(11,82); M2(5,149) = M1(11,83); 
M2(6,11) = M1(13,13); M2(6,13) = M1(13,15); M2(6,14) = M1(13,16); M2(6,15) = M1(13,17); M2(6,18) = M1(13,18); M2(6,19) = M1(13,19); M2(6,20) = M1(13,20); M2(6,21) = M1(13,21); M2(6,24) = M1(13,22); M2(6,25) = M1(13,23); M2(6,26) = M1(13,24); M2(6,29) = M1(13,25); M2(6,30) = M1(13,26); M2(6,33) = M1(13,27); M2(6,39) = M1(13,28); M2(6,40) = M1(13,29); M2(6,41) = M1(13,30); M2(6,42) = M1(13,31); M2(6,43) = M1(13,32); M2(6,44) = M1(13,33); M2(6,47) = M1(13,34); M2(6,48) = M1(13,35); M2(6,49) = M1(13,36); M2(6,50) = M1(13,37); M2(6,51) = M1(13,38); M2(6,54) = M1(13,39); M2(6,55) = M1(13,40); M2(6,56) = M1(13,41); M2(6,57) = M1(13,42); M2(6,60) = M1(13,43); M2(6,61) = M1(13,44); M2(6,62) = M1(13,45); M2(6,65) = M1(13,46); M2(6,66) = M1(13,47); M2(6,69) = M1(13,48); M2(6,74) = M1(13,49); M2(6,75) = M1(13,50); M2(6,76) = M1(13,51); M2(6,77) = M1(13,52); M2(6,78) = M1(13,53); M2(6,81) = M1(13,54); M2(6,82) = M1(13,55); M2(6,83) = M1(13,56); M2(6,84) = M1(13,57); M2(6,87) = M1(13,58); M2(6,88) = M1(13,59); M2(6,89) = M1(13,60); M2(6,92) = M1(13,61); M2(6,94) = M1(13,62); M2(6,97) = M1(13,63); M2(6,103) = M1(13,64); M2(6,104) = M1(13,65); M2(6,105) = M1(13,66); M2(6,106) = M1(13,67); M2(6,109) = M1(13,68); M2(6,110) = M1(13,69); M2(6,111) = M1(13,70); M2(6,114) = M1(13,71); M2(6,115) = M1(13,72); M2(6,118) = M1(13,73); M2(6,124) = M1(13,74); M2(6,125) = M1(13,75); M2(6,126) = M1(13,76); M2(6,129) = M1(13,77); M2(6,130) = M1(13,78); M2(6,133) = M1(13,79); M2(6,139) = M1(13,80); M2(6,140) = M1(13,81); M2(6,143) = M1(13,82); M2(6,149) = M1(13,83); 
M2(7,12) = M1(14,14); M2(7,13) = M1(14,15); M2(7,14) = M1(14,16); M2(7,15) = M1(14,17); M2(7,18) = M1(14,18); M2(7,19) = M1(14,19); M2(7,20) = M1(14,20); M2(7,21) = M1(14,21); M2(7,24) = M1(14,22); M2(7,25) = M1(14,23); M2(7,26) = M1(14,24); M2(7,29) = M1(14,25); M2(7,30) = M1(14,26); M2(7,33) = M1(14,27); M2(7,39) = M1(14,28); M2(7,40) = M1(14,29); M2(7,41) = M1(14,30); M2(7,42) = M1(14,31); M2(7,43) = M1(14,32); M2(7,44) = M1(14,33); M2(7,47) = M1(14,34); M2(7,48) = M1(14,35); M2(7,49) = M1(14,36); M2(7,50) = M1(14,37); M2(7,51) = M1(14,38); M2(7,54) = M1(14,39); M2(7,55) = M1(14,40); M2(7,56) = M1(14,41); M2(7,57) = M1(14,42); M2(7,60) = M1(14,43); M2(7,61) = M1(14,44); M2(7,62) = M1(14,45); M2(7,65) = M1(14,46); M2(7,66) = M1(14,47); M2(7,69) = M1(14,48); M2(7,74) = M1(14,49); M2(7,75) = M1(14,50); M2(7,76) = M1(14,51); M2(7,77) = M1(14,52); M2(7,78) = M1(14,53); M2(7,81) = M1(14,54); M2(7,82) = M1(14,55); M2(7,83) = M1(14,56); M2(7,84) = M1(14,57); M2(7,87) = M1(14,58); M2(7,88) = M1(14,59); M2(7,89) = M1(14,60); M2(7,92) = M1(14,61); M2(7,94) = M1(14,62); M2(7,97) = M1(14,63); M2(7,103) = M1(14,64); M2(7,104) = M1(14,65); M2(7,105) = M1(14,66); M2(7,106) = M1(14,67); M2(7,109) = M1(14,68); M2(7,110) = M1(14,69); M2(7,111) = M1(14,70); M2(7,114) = M1(14,71); M2(7,115) = M1(14,72); M2(7,118) = M1(14,73); M2(7,124) = M1(14,74); M2(7,125) = M1(14,75); M2(7,126) = M1(14,76); M2(7,129) = M1(14,77); M2(7,130) = M1(14,78); M2(7,133) = M1(14,79); M2(7,139) = M1(14,80); M2(7,140) = M1(14,81); M2(7,143) = M1(14,82); M2(7,149) = M1(14,83); 
M2(8,10) = M1(8,8); M2(8,18) = M1(8,15); M2(8,19) = M1(8,16); M2(8,20) = M1(8,17); M2(8,22) = M1(8,18); M2(8,23) = M1(8,19); M2(8,24) = M1(8,20); M2(8,25) = M1(8,21); M2(8,27) = M1(8,22); M2(8,28) = M1(8,23); M2(8,29) = M1(8,24); M2(8,31) = M1(8,25); M2(8,32) = M1(8,26); M2(8,34) = M1(8,27); M2(8,45) = M1(8,28); M2(8,46) = M1(8,29); M2(8,47) = M1(8,30); M2(8,48) = M1(8,31); M2(8,49) = M1(8,32); M2(8,50) = M1(8,33); M2(8,52) = M1(8,34); M2(8,53) = M1(8,35); M2(8,54) = M1(8,36); M2(8,55) = M1(8,37); M2(8,56) = M1(8,38); M2(8,58) = M1(8,39); M2(8,59) = M1(8,40); M2(8,60) = M1(8,41); M2(8,61) = M1(8,42); M2(8,63) = M1(8,43); M2(8,64) = M1(8,44); M2(8,65) = M1(8,45); M2(8,67) = M1(8,46); M2(8,68) = M1(8,47); M2(8,70) = M1(8,48); M2(8,79) = M1(8,49); M2(8,80) = M1(8,50); M2(8,81) = M1(8,51); M2(8,82) = M1(8,52); M2(8,83) = M1(8,53); M2(8,85) = M1(8,54); M2(8,86) = M1(8,55); M2(8,87) = M1(8,56); M2(8,88) = M1(8,57); M2(8,90) = M1(8,58); M2(8,91) = M1(8,59); M2(8,92) = M1(8,60); M2(8,95) = M1(8,61); M2(8,96) = M1(8,62); M2(8,98) = M1(8,63); M2(8,107) = M1(8,64); M2(8,108) = M1(8,65); M2(8,109) = M1(8,66); M2(8,110) = M1(8,67); M2(8,112) = M1(8,68); M2(8,113) = M1(8,69); M2(8,114) = M1(8,70); M2(8,116) = M1(8,71); M2(8,117) = M1(8,72); M2(8,119) = M1(8,73); M2(8,127) = M1(8,74); M2(8,128) = M1(8,75); M2(8,129) = M1(8,76); M2(8,131) = M1(8,77); M2(8,132) = M1(8,78); M2(8,134) = M1(8,79); M2(8,141) = M1(8,80); M2(8,142) = M1(8,81); M2(8,144) = M1(8,82); M2(8,150) = M1(8,83); 
M2(9,11) = M1(9,9); M2(9,18) = M1(9,15); M2(9,19) = M1(9,16); M2(9,20) = M1(9,17); M2(9,22) = M1(9,18); M2(9,23) = M1(9,19); M2(9,24) = M1(9,20); M2(9,25) = M1(9,21); M2(9,27) = M1(9,22); M2(9,28) = M1(9,23); M2(9,29) = M1(9,24); M2(9,31) = M1(9,25); M2(9,32) = M1(9,26); M2(9,34) = M1(9,27); M2(9,45) = M1(9,28); M2(9,46) = M1(9,29); M2(9,47) = M1(9,30); M2(9,48) = M1(9,31); M2(9,49) = M1(9,32); M2(9,50) = M1(9,33); M2(9,52) = M1(9,34); M2(9,53) = M1(9,35); M2(9,54) = M1(9,36); M2(9,55) = M1(9,37); M2(9,56) = M1(9,38); M2(9,58) = M1(9,39); M2(9,59) = M1(9,40); M2(9,60) = M1(9,41); M2(9,61) = M1(9,42); M2(9,63) = M1(9,43); M2(9,64) = M1(9,44); M2(9,65) = M1(9,45); M2(9,67) = M1(9,46); M2(9,68) = M1(9,47); M2(9,70) = M1(9,48); M2(9,79) = M1(9,49); M2(9,80) = M1(9,50); M2(9,81) = M1(9,51); M2(9,82) = M1(9,52); M2(9,83) = M1(9,53); M2(9,85) = M1(9,54); M2(9,86) = M1(9,55); M2(9,87) = M1(9,56); M2(9,88) = M1(9,57); M2(9,90) = M1(9,58); M2(9,91) = M1(9,59); M2(9,92) = M1(9,60); M2(9,95) = M1(9,61); M2(9,96) = M1(9,62); M2(9,98) = M1(9,63); M2(9,107) = M1(9,64); M2(9,108) = M1(9,65); M2(9,109) = M1(9,66); M2(9,110) = M1(9,67); M2(9,112) = M1(9,68); M2(9,113) = M1(9,69); M2(9,114) = M1(9,70); M2(9,116) = M1(9,71); M2(9,117) = M1(9,72); M2(9,119) = M1(9,73); M2(9,127) = M1(9,74); M2(9,128) = M1(9,75); M2(9,129) = M1(9,76); M2(9,131) = M1(9,77); M2(9,132) = M1(9,78); M2(9,134) = M1(9,79); M2(9,141) = M1(9,80); M2(9,142) = M1(9,81); M2(9,144) = M1(9,82); M2(9,150) = M1(9,83); 
M2(10,12) = M1(10,10); M2(10,18) = M1(10,15); M2(10,19) = M1(10,16); M2(10,20) = M1(10,17); M2(10,22) = M1(10,18); M2(10,23) = M1(10,19); M2(10,24) = M1(10,20); M2(10,25) = M1(10,21); M2(10,27) = M1(10,22); M2(10,28) = M1(10,23); M2(10,29) = M1(10,24); M2(10,31) = M1(10,25); M2(10,32) = M1(10,26); M2(10,34) = M1(10,27); M2(10,45) = M1(10,28); M2(10,46) = M1(10,29); M2(10,47) = M1(10,30); M2(10,48) = M1(10,31); M2(10,49) = M1(10,32); M2(10,50) = M1(10,33); M2(10,52) = M1(10,34); M2(10,53) = M1(10,35); M2(10,54) = M1(10,36); M2(10,55) = M1(10,37); M2(10,56) = M1(10,38); M2(10,58) = M1(10,39); M2(10,59) = M1(10,40); M2(10,60) = M1(10,41); M2(10,61) = M1(10,42); M2(10,63) = M1(10,43); M2(10,64) = M1(10,44); M2(10,65) = M1(10,45); M2(10,67) = M1(10,46); M2(10,68) = M1(10,47); M2(10,70) = M1(10,48); M2(10,79) = M1(10,49); M2(10,80) = M1(10,50); M2(10,81) = M1(10,51); M2(10,82) = M1(10,52); M2(10,83) = M1(10,53); M2(10,85) = M1(10,54); M2(10,86) = M1(10,55); M2(10,87) = M1(10,56); M2(10,88) = M1(10,57); M2(10,90) = M1(10,58); M2(10,91) = M1(10,59); M2(10,92) = M1(10,60); M2(10,95) = M1(10,61); M2(10,96) = M1(10,62); M2(10,98) = M1(10,63); M2(10,107) = M1(10,64); M2(10,108) = M1(10,65); M2(10,109) = M1(10,66); M2(10,110) = M1(10,67); M2(10,112) = M1(10,68); M2(10,113) = M1(10,69); M2(10,114) = M1(10,70); M2(10,116) = M1(10,71); M2(10,117) = M1(10,72); M2(10,119) = M1(10,73); M2(10,127) = M1(10,74); M2(10,128) = M1(10,75); M2(10,129) = M1(10,76); M2(10,131) = M1(10,77); M2(10,132) = M1(10,78); M2(10,134) = M1(10,79); M2(10,141) = M1(10,80); M2(10,142) = M1(10,81); M2(10,144) = M1(10,82); M2(10,150) = M1(10,83); 
M2(11,13) = M1(11,11); M2(11,18) = M1(11,15); M2(11,19) = M1(11,16); M2(11,20) = M1(11,17); M2(11,22) = M1(11,18); M2(11,23) = M1(11,19); M2(11,24) = M1(11,20); M2(11,25) = M1(11,21); M2(11,27) = M1(11,22); M2(11,28) = M1(11,23); M2(11,29) = M1(11,24); M2(11,31) = M1(11,25); M2(11,32) = M1(11,26); M2(11,34) = M1(11,27); M2(11,45) = M1(11,28); M2(11,46) = M1(11,29); M2(11,47) = M1(11,30); M2(11,48) = M1(11,31); M2(11,49) = M1(11,32); M2(11,50) = M1(11,33); M2(11,52) = M1(11,34); M2(11,53) = M1(11,35); M2(11,54) = M1(11,36); M2(11,55) = M1(11,37); M2(11,56) = M1(11,38); M2(11,58) = M1(11,39); M2(11,59) = M1(11,40); M2(11,60) = M1(11,41); M2(11,61) = M1(11,42); M2(11,63) = M1(11,43); M2(11,64) = M1(11,44); M2(11,65) = M1(11,45); M2(11,67) = M1(11,46); M2(11,68) = M1(11,47); M2(11,70) = M1(11,48); M2(11,79) = M1(11,49); M2(11,80) = M1(11,50); M2(11,81) = M1(11,51); M2(11,82) = M1(11,52); M2(11,83) = M1(11,53); M2(11,85) = M1(11,54); M2(11,86) = M1(11,55); M2(11,87) = M1(11,56); M2(11,88) = M1(11,57); M2(11,90) = M1(11,58); M2(11,91) = M1(11,59); M2(11,92) = M1(11,60); M2(11,95) = M1(11,61); M2(11,96) = M1(11,62); M2(11,98) = M1(11,63); M2(11,107) = M1(11,64); M2(11,108) = M1(11,65); M2(11,109) = M1(11,66); M2(11,110) = M1(11,67); M2(11,112) = M1(11,68); M2(11,113) = M1(11,69); M2(11,114) = M1(11,70); M2(11,116) = M1(11,71); M2(11,117) = M1(11,72); M2(11,119) = M1(11,73); M2(11,127) = M1(11,74); M2(11,128) = M1(11,75); M2(11,129) = M1(11,76); M2(11,131) = M1(11,77); M2(11,132) = M1(11,78); M2(11,134) = M1(11,79); M2(11,141) = M1(11,80); M2(11,142) = M1(11,81); M2(11,144) = M1(11,82); M2(11,150) = M1(11,83); 
M2(12,14) = M1(12,12); M2(12,18) = M1(12,15); M2(12,19) = M1(12,16); M2(12,20) = M1(12,17); M2(12,22) = M1(12,18); M2(12,23) = M1(12,19); M2(12,24) = M1(12,20); M2(12,25) = M1(12,21); M2(12,27) = M1(12,22); M2(12,28) = M1(12,23); M2(12,29) = M1(12,24); M2(12,31) = M1(12,25); M2(12,32) = M1(12,26); M2(12,34) = M1(12,27); M2(12,45) = M1(12,28); M2(12,46) = M1(12,29); M2(12,47) = M1(12,30); M2(12,48) = M1(12,31); M2(12,49) = M1(12,32); M2(12,50) = M1(12,33); M2(12,52) = M1(12,34); M2(12,53) = M1(12,35); M2(12,54) = M1(12,36); M2(12,55) = M1(12,37); M2(12,56) = M1(12,38); M2(12,58) = M1(12,39); M2(12,59) = M1(12,40); M2(12,60) = M1(12,41); M2(12,61) = M1(12,42); M2(12,63) = M1(12,43); M2(12,64) = M1(12,44); M2(12,65) = M1(12,45); M2(12,67) = M1(12,46); M2(12,68) = M1(12,47); M2(12,70) = M1(12,48); M2(12,79) = M1(12,49); M2(12,80) = M1(12,50); M2(12,81) = M1(12,51); M2(12,82) = M1(12,52); M2(12,83) = M1(12,53); M2(12,85) = M1(12,54); M2(12,86) = M1(12,55); M2(12,87) = M1(12,56); M2(12,88) = M1(12,57); M2(12,90) = M1(12,58); M2(12,91) = M1(12,59); M2(12,92) = M1(12,60); M2(12,95) = M1(12,61); M2(12,96) = M1(12,62); M2(12,98) = M1(12,63); M2(12,107) = M1(12,64); M2(12,108) = M1(12,65); M2(12,109) = M1(12,66); M2(12,110) = M1(12,67); M2(12,112) = M1(12,68); M2(12,113) = M1(12,69); M2(12,114) = M1(12,70); M2(12,116) = M1(12,71); M2(12,117) = M1(12,72); M2(12,119) = M1(12,73); M2(12,127) = M1(12,74); M2(12,128) = M1(12,75); M2(12,129) = M1(12,76); M2(12,131) = M1(12,77); M2(12,132) = M1(12,78); M2(12,134) = M1(12,79); M2(12,141) = M1(12,80); M2(12,142) = M1(12,81); M2(12,144) = M1(12,82); M2(12,150) = M1(12,83); 
M2(13,16) = M1(13,13); M2(13,18) = M1(13,15); M2(13,19) = M1(13,16); M2(13,20) = M1(13,17); M2(13,22) = M1(13,18); M2(13,23) = M1(13,19); M2(13,24) = M1(13,20); M2(13,25) = M1(13,21); M2(13,27) = M1(13,22); M2(13,28) = M1(13,23); M2(13,29) = M1(13,24); M2(13,31) = M1(13,25); M2(13,32) = M1(13,26); M2(13,34) = M1(13,27); M2(13,45) = M1(13,28); M2(13,46) = M1(13,29); M2(13,47) = M1(13,30); M2(13,48) = M1(13,31); M2(13,49) = M1(13,32); M2(13,50) = M1(13,33); M2(13,52) = M1(13,34); M2(13,53) = M1(13,35); M2(13,54) = M1(13,36); M2(13,55) = M1(13,37); M2(13,56) = M1(13,38); M2(13,58) = M1(13,39); M2(13,59) = M1(13,40); M2(13,60) = M1(13,41); M2(13,61) = M1(13,42); M2(13,63) = M1(13,43); M2(13,64) = M1(13,44); M2(13,65) = M1(13,45); M2(13,67) = M1(13,46); M2(13,68) = M1(13,47); M2(13,70) = M1(13,48); M2(13,79) = M1(13,49); M2(13,80) = M1(13,50); M2(13,81) = M1(13,51); M2(13,82) = M1(13,52); M2(13,83) = M1(13,53); M2(13,85) = M1(13,54); M2(13,86) = M1(13,55); M2(13,87) = M1(13,56); M2(13,88) = M1(13,57); M2(13,90) = M1(13,58); M2(13,91) = M1(13,59); M2(13,92) = M1(13,60); M2(13,95) = M1(13,61); M2(13,96) = M1(13,62); M2(13,98) = M1(13,63); M2(13,107) = M1(13,64); M2(13,108) = M1(13,65); M2(13,109) = M1(13,66); M2(13,110) = M1(13,67); M2(13,112) = M1(13,68); M2(13,113) = M1(13,69); M2(13,114) = M1(13,70); M2(13,116) = M1(13,71); M2(13,117) = M1(13,72); M2(13,119) = M1(13,73); M2(13,127) = M1(13,74); M2(13,128) = M1(13,75); M2(13,129) = M1(13,76); M2(13,131) = M1(13,77); M2(13,132) = M1(13,78); M2(13,134) = M1(13,79); M2(13,141) = M1(13,80); M2(13,142) = M1(13,81); M2(13,144) = M1(13,82); M2(13,150) = M1(13,83); 
M2(14,17) = M1(14,14); M2(14,18) = M1(14,15); M2(14,19) = M1(14,16); M2(14,20) = M1(14,17); M2(14,22) = M1(14,18); M2(14,23) = M1(14,19); M2(14,24) = M1(14,20); M2(14,25) = M1(14,21); M2(14,27) = M1(14,22); M2(14,28) = M1(14,23); M2(14,29) = M1(14,24); M2(14,31) = M1(14,25); M2(14,32) = M1(14,26); M2(14,34) = M1(14,27); M2(14,45) = M1(14,28); M2(14,46) = M1(14,29); M2(14,47) = M1(14,30); M2(14,48) = M1(14,31); M2(14,49) = M1(14,32); M2(14,50) = M1(14,33); M2(14,52) = M1(14,34); M2(14,53) = M1(14,35); M2(14,54) = M1(14,36); M2(14,55) = M1(14,37); M2(14,56) = M1(14,38); M2(14,58) = M1(14,39); M2(14,59) = M1(14,40); M2(14,60) = M1(14,41); M2(14,61) = M1(14,42); M2(14,63) = M1(14,43); M2(14,64) = M1(14,44); M2(14,65) = M1(14,45); M2(14,67) = M1(14,46); M2(14,68) = M1(14,47); M2(14,70) = M1(14,48); M2(14,79) = M1(14,49); M2(14,80) = M1(14,50); M2(14,81) = M1(14,51); M2(14,82) = M1(14,52); M2(14,83) = M1(14,53); M2(14,85) = M1(14,54); M2(14,86) = M1(14,55); M2(14,87) = M1(14,56); M2(14,88) = M1(14,57); M2(14,90) = M1(14,58); M2(14,91) = M1(14,59); M2(14,92) = M1(14,60); M2(14,95) = M1(14,61); M2(14,96) = M1(14,62); M2(14,98) = M1(14,63); M2(14,107) = M1(14,64); M2(14,108) = M1(14,65); M2(14,109) = M1(14,66); M2(14,110) = M1(14,67); M2(14,112) = M1(14,68); M2(14,113) = M1(14,69); M2(14,114) = M1(14,70); M2(14,116) = M1(14,71); M2(14,117) = M1(14,72); M2(14,119) = M1(14,73); M2(14,127) = M1(14,74); M2(14,128) = M1(14,75); M2(14,129) = M1(14,76); M2(14,131) = M1(14,77); M2(14,132) = M1(14,78); M2(14,134) = M1(14,79); M2(14,141) = M1(14,80); M2(14,142) = M1(14,81); M2(14,144) = M1(14,82); M2(14,150) = M1(14,83); 
M2(15,0) = M1(2,2); M2(15,12) = M1(2,15); M2(15,13) = M1(2,16); M2(15,14) = M1(2,17); M2(15,17) = M1(2,18); M2(15,18) = M1(2,19); M2(15,19) = M1(2,20); M2(15,20) = M1(2,21); M2(15,23) = M1(2,22); M2(15,24) = M1(2,23); M2(15,25) = M1(2,24); M2(15,28) = M1(2,25); M2(15,29) = M1(2,26); M2(15,32) = M1(2,27); M2(15,38) = M1(2,28); M2(15,39) = M1(2,29); M2(15,40) = M1(2,30); M2(15,41) = M1(2,31); M2(15,42) = M1(2,32); M2(15,43) = M1(2,33); M2(15,46) = M1(2,34); M2(15,47) = M1(2,35); M2(15,48) = M1(2,36); M2(15,49) = M1(2,37); M2(15,50) = M1(2,38); M2(15,53) = M1(2,39); M2(15,54) = M1(2,40); M2(15,55) = M1(2,41); M2(15,56) = M1(2,42); M2(15,59) = M1(2,43); M2(15,60) = M1(2,44); M2(15,61) = M1(2,45); M2(15,64) = M1(2,46); M2(15,65) = M1(2,47); M2(15,68) = M1(2,48); M2(15,73) = M1(2,49); M2(15,74) = M1(2,50); M2(15,75) = M1(2,51); M2(15,76) = M1(2,52); M2(15,77) = M1(2,53); M2(15,80) = M1(2,54); M2(15,81) = M1(2,55); M2(15,82) = M1(2,56); M2(15,83) = M1(2,57); M2(15,86) = M1(2,58); M2(15,87) = M1(2,59); M2(15,88) = M1(2,60); M2(15,91) = M1(2,61); M2(15,92) = M1(2,62); M2(15,96) = M1(2,63); M2(15,102) = M1(2,64); M2(15,103) = M1(2,65); M2(15,104) = M1(2,66); M2(15,105) = M1(2,67); M2(15,108) = M1(2,68); M2(15,109) = M1(2,69); M2(15,110) = M1(2,70); M2(15,113) = M1(2,71); M2(15,114) = M1(2,72); M2(15,117) = M1(2,73); M2(15,123) = M1(2,74); M2(15,124) = M1(2,75); M2(15,125) = M1(2,76); M2(15,128) = M1(2,77); M2(15,129) = M1(2,78); M2(15,132) = M1(2,79); M2(15,138) = M1(2,80); M2(15,139) = M1(2,81); M2(15,142) = M1(2,82); M2(15,148) = M1(2,83); 
M2(16,1) = M1(3,3); M2(16,12) = M1(3,15); M2(16,13) = M1(3,16); M2(16,14) = M1(3,17); M2(16,17) = M1(3,18); M2(16,18) = M1(3,19); M2(16,19) = M1(3,20); M2(16,20) = M1(3,21); M2(16,23) = M1(3,22); M2(16,24) = M1(3,23); M2(16,25) = M1(3,24); M2(16,28) = M1(3,25); M2(16,29) = M1(3,26); M2(16,32) = M1(3,27); M2(16,38) = M1(3,28); M2(16,39) = M1(3,29); M2(16,40) = M1(3,30); M2(16,41) = M1(3,31); M2(16,42) = M1(3,32); M2(16,43) = M1(3,33); M2(16,46) = M1(3,34); M2(16,47) = M1(3,35); M2(16,48) = M1(3,36); M2(16,49) = M1(3,37); M2(16,50) = M1(3,38); M2(16,53) = M1(3,39); M2(16,54) = M1(3,40); M2(16,55) = M1(3,41); M2(16,56) = M1(3,42); M2(16,59) = M1(3,43); M2(16,60) = M1(3,44); M2(16,61) = M1(3,45); M2(16,64) = M1(3,46); M2(16,65) = M1(3,47); M2(16,68) = M1(3,48); M2(16,73) = M1(3,49); M2(16,74) = M1(3,50); M2(16,75) = M1(3,51); M2(16,76) = M1(3,52); M2(16,77) = M1(3,53); M2(16,80) = M1(3,54); M2(16,81) = M1(3,55); M2(16,82) = M1(3,56); M2(16,83) = M1(3,57); M2(16,86) = M1(3,58); M2(16,87) = M1(3,59); M2(16,88) = M1(3,60); M2(16,91) = M1(3,61); M2(16,92) = M1(3,62); M2(16,96) = M1(3,63); M2(16,102) = M1(3,64); M2(16,103) = M1(3,65); M2(16,104) = M1(3,66); M2(16,105) = M1(3,67); M2(16,108) = M1(3,68); M2(16,109) = M1(3,69); M2(16,110) = M1(3,70); M2(16,113) = M1(3,71); M2(16,114) = M1(3,72); M2(16,117) = M1(3,73); M2(16,123) = M1(3,74); M2(16,124) = M1(3,75); M2(16,125) = M1(3,76); M2(16,128) = M1(3,77); M2(16,129) = M1(3,78); M2(16,132) = M1(3,79); M2(16,138) = M1(3,80); M2(16,139) = M1(3,81); M2(16,142) = M1(3,82); M2(16,148) = M1(3,83); 
M2(17,2) = M1(4,4); M2(17,12) = M1(4,15); M2(17,13) = M1(4,16); M2(17,14) = M1(4,17); M2(17,17) = M1(4,18); M2(17,18) = M1(4,19); M2(17,19) = M1(4,20); M2(17,20) = M1(4,21); M2(17,23) = M1(4,22); M2(17,24) = M1(4,23); M2(17,25) = M1(4,24); M2(17,28) = M1(4,25); M2(17,29) = M1(4,26); M2(17,32) = M1(4,27); M2(17,38) = M1(4,28); M2(17,39) = M1(4,29); M2(17,40) = M1(4,30); M2(17,41) = M1(4,31); M2(17,42) = M1(4,32); M2(17,43) = M1(4,33); M2(17,46) = M1(4,34); M2(17,47) = M1(4,35); M2(17,48) = M1(4,36); M2(17,49) = M1(4,37); M2(17,50) = M1(4,38); M2(17,53) = M1(4,39); M2(17,54) = M1(4,40); M2(17,55) = M1(4,41); M2(17,56) = M1(4,42); M2(17,59) = M1(4,43); M2(17,60) = M1(4,44); M2(17,61) = M1(4,45); M2(17,64) = M1(4,46); M2(17,65) = M1(4,47); M2(17,68) = M1(4,48); M2(17,73) = M1(4,49); M2(17,74) = M1(4,50); M2(17,75) = M1(4,51); M2(17,76) = M1(4,52); M2(17,77) = M1(4,53); M2(17,80) = M1(4,54); M2(17,81) = M1(4,55); M2(17,82) = M1(4,56); M2(17,83) = M1(4,57); M2(17,86) = M1(4,58); M2(17,87) = M1(4,59); M2(17,88) = M1(4,60); M2(17,91) = M1(4,61); M2(17,92) = M1(4,62); M2(17,96) = M1(4,63); M2(17,102) = M1(4,64); M2(17,103) = M1(4,65); M2(17,104) = M1(4,66); M2(17,105) = M1(4,67); M2(17,108) = M1(4,68); M2(17,109) = M1(4,69); M2(17,110) = M1(4,70); M2(17,113) = M1(4,71); M2(17,114) = M1(4,72); M2(17,117) = M1(4,73); M2(17,123) = M1(4,74); M2(17,124) = M1(4,75); M2(17,125) = M1(4,76); M2(17,128) = M1(4,77); M2(17,129) = M1(4,78); M2(17,132) = M1(4,79); M2(17,138) = M1(4,80); M2(17,139) = M1(4,81); M2(17,142) = M1(4,82); M2(17,148) = M1(4,83); 
M2(18,3) = M1(5,5); M2(18,12) = M1(5,15); M2(18,13) = M1(5,16); M2(18,14) = M1(5,17); M2(18,17) = M1(5,18); M2(18,18) = M1(5,19); M2(18,19) = M1(5,20); M2(18,20) = M1(5,21); M2(18,23) = M1(5,22); M2(18,24) = M1(5,23); M2(18,25) = M1(5,24); M2(18,28) = M1(5,25); M2(18,29) = M1(5,26); M2(18,32) = M1(5,27); M2(18,38) = M1(5,28); M2(18,39) = M1(5,29); M2(18,40) = M1(5,30); M2(18,41) = M1(5,31); M2(18,42) = M1(5,32); M2(18,43) = M1(5,33); M2(18,46) = M1(5,34); M2(18,47) = M1(5,35); M2(18,48) = M1(5,36); M2(18,49) = M1(5,37); M2(18,50) = M1(5,38); M2(18,53) = M1(5,39); M2(18,54) = M1(5,40); M2(18,55) = M1(5,41); M2(18,56) = M1(5,42); M2(18,59) = M1(5,43); M2(18,60) = M1(5,44); M2(18,61) = M1(5,45); M2(18,64) = M1(5,46); M2(18,65) = M1(5,47); M2(18,68) = M1(5,48); M2(18,73) = M1(5,49); M2(18,74) = M1(5,50); M2(18,75) = M1(5,51); M2(18,76) = M1(5,52); M2(18,77) = M1(5,53); M2(18,80) = M1(5,54); M2(18,81) = M1(5,55); M2(18,82) = M1(5,56); M2(18,83) = M1(5,57); M2(18,86) = M1(5,58); M2(18,87) = M1(5,59); M2(18,88) = M1(5,60); M2(18,91) = M1(5,61); M2(18,92) = M1(5,62); M2(18,96) = M1(5,63); M2(18,102) = M1(5,64); M2(18,103) = M1(5,65); M2(18,104) = M1(5,66); M2(18,105) = M1(5,67); M2(18,108) = M1(5,68); M2(18,109) = M1(5,69); M2(18,110) = M1(5,70); M2(18,113) = M1(5,71); M2(18,114) = M1(5,72); M2(18,117) = M1(5,73); M2(18,123) = M1(5,74); M2(18,124) = M1(5,75); M2(18,125) = M1(5,76); M2(18,128) = M1(5,77); M2(18,129) = M1(5,78); M2(18,132) = M1(5,79); M2(18,138) = M1(5,80); M2(18,139) = M1(5,81); M2(18,142) = M1(5,82); M2(18,148) = M1(5,83); 
M2(19,4) = M1(7,7); M2(19,12) = M1(7,15); M2(19,13) = M1(7,16); M2(19,14) = M1(7,17); M2(19,17) = M1(7,18); M2(19,18) = M1(7,19); M2(19,19) = M1(7,20); M2(19,20) = M1(7,21); M2(19,23) = M1(7,22); M2(19,24) = M1(7,23); M2(19,25) = M1(7,24); M2(19,28) = M1(7,25); M2(19,29) = M1(7,26); M2(19,32) = M1(7,27); M2(19,38) = M1(7,28); M2(19,39) = M1(7,29); M2(19,40) = M1(7,30); M2(19,41) = M1(7,31); M2(19,42) = M1(7,32); M2(19,43) = M1(7,33); M2(19,46) = M1(7,34); M2(19,47) = M1(7,35); M2(19,48) = M1(7,36); M2(19,49) = M1(7,37); M2(19,50) = M1(7,38); M2(19,53) = M1(7,39); M2(19,54) = M1(7,40); M2(19,55) = M1(7,41); M2(19,56) = M1(7,42); M2(19,59) = M1(7,43); M2(19,60) = M1(7,44); M2(19,61) = M1(7,45); M2(19,64) = M1(7,46); M2(19,65) = M1(7,47); M2(19,68) = M1(7,48); M2(19,73) = M1(7,49); M2(19,74) = M1(7,50); M2(19,75) = M1(7,51); M2(19,76) = M1(7,52); M2(19,77) = M1(7,53); M2(19,80) = M1(7,54); M2(19,81) = M1(7,55); M2(19,82) = M1(7,56); M2(19,83) = M1(7,57); M2(19,86) = M1(7,58); M2(19,87) = M1(7,59); M2(19,88) = M1(7,60); M2(19,91) = M1(7,61); M2(19,92) = M1(7,62); M2(19,96) = M1(7,63); M2(19,102) = M1(7,64); M2(19,103) = M1(7,65); M2(19,104) = M1(7,66); M2(19,105) = M1(7,67); M2(19,108) = M1(7,68); M2(19,109) = M1(7,69); M2(19,110) = M1(7,70); M2(19,113) = M1(7,71); M2(19,114) = M1(7,72); M2(19,117) = M1(7,73); M2(19,123) = M1(7,74); M2(19,124) = M1(7,75); M2(19,125) = M1(7,76); M2(19,128) = M1(7,77); M2(19,129) = M1(7,78); M2(19,132) = M1(7,79); M2(19,138) = M1(7,80); M2(19,139) = M1(7,81); M2(19,142) = M1(7,82); M2(19,148) = M1(7,83); 
M2(20,5) = M1(8,8); M2(20,12) = M1(8,15); M2(20,13) = M1(8,16); M2(20,14) = M1(8,17); M2(20,17) = M1(8,18); M2(20,18) = M1(8,19); M2(20,19) = M1(8,20); M2(20,20) = M1(8,21); M2(20,23) = M1(8,22); M2(20,24) = M1(8,23); M2(20,25) = M1(8,24); M2(20,28) = M1(8,25); M2(20,29) = M1(8,26); M2(20,32) = M1(8,27); M2(20,38) = M1(8,28); M2(20,39) = M1(8,29); M2(20,40) = M1(8,30); M2(20,41) = M1(8,31); M2(20,42) = M1(8,32); M2(20,43) = M1(8,33); M2(20,46) = M1(8,34); M2(20,47) = M1(8,35); M2(20,48) = M1(8,36); M2(20,49) = M1(8,37); M2(20,50) = M1(8,38); M2(20,53) = M1(8,39); M2(20,54) = M1(8,40); M2(20,55) = M1(8,41); M2(20,56) = M1(8,42); M2(20,59) = M1(8,43); M2(20,60) = M1(8,44); M2(20,61) = M1(8,45); M2(20,64) = M1(8,46); M2(20,65) = M1(8,47); M2(20,68) = M1(8,48); M2(20,73) = M1(8,49); M2(20,74) = M1(8,50); M2(20,75) = M1(8,51); M2(20,76) = M1(8,52); M2(20,77) = M1(8,53); M2(20,80) = M1(8,54); M2(20,81) = M1(8,55); M2(20,82) = M1(8,56); M2(20,83) = M1(8,57); M2(20,86) = M1(8,58); M2(20,87) = M1(8,59); M2(20,88) = M1(8,60); M2(20,91) = M1(8,61); M2(20,92) = M1(8,62); M2(20,96) = M1(8,63); M2(20,102) = M1(8,64); M2(20,103) = M1(8,65); M2(20,104) = M1(8,66); M2(20,105) = M1(8,67); M2(20,108) = M1(8,68); M2(20,109) = M1(8,69); M2(20,110) = M1(8,70); M2(20,113) = M1(8,71); M2(20,114) = M1(8,72); M2(20,117) = M1(8,73); M2(20,123) = M1(8,74); M2(20,124) = M1(8,75); M2(20,125) = M1(8,76); M2(20,128) = M1(8,77); M2(20,129) = M1(8,78); M2(20,132) = M1(8,79); M2(20,138) = M1(8,80); M2(20,139) = M1(8,81); M2(20,142) = M1(8,82); M2(20,148) = M1(8,83); 
M2(21,6) = M1(9,9); M2(21,12) = M1(9,15); M2(21,13) = M1(9,16); M2(21,14) = M1(9,17); M2(21,17) = M1(9,18); M2(21,18) = M1(9,19); M2(21,19) = M1(9,20); M2(21,20) = M1(9,21); M2(21,23) = M1(9,22); M2(21,24) = M1(9,23); M2(21,25) = M1(9,24); M2(21,28) = M1(9,25); M2(21,29) = M1(9,26); M2(21,32) = M1(9,27); M2(21,38) = M1(9,28); M2(21,39) = M1(9,29); M2(21,40) = M1(9,30); M2(21,41) = M1(9,31); M2(21,42) = M1(9,32); M2(21,43) = M1(9,33); M2(21,46) = M1(9,34); M2(21,47) = M1(9,35); M2(21,48) = M1(9,36); M2(21,49) = M1(9,37); M2(21,50) = M1(9,38); M2(21,53) = M1(9,39); M2(21,54) = M1(9,40); M2(21,55) = M1(9,41); M2(21,56) = M1(9,42); M2(21,59) = M1(9,43); M2(21,60) = M1(9,44); M2(21,61) = M1(9,45); M2(21,64) = M1(9,46); M2(21,65) = M1(9,47); M2(21,68) = M1(9,48); M2(21,73) = M1(9,49); M2(21,74) = M1(9,50); M2(21,75) = M1(9,51); M2(21,76) = M1(9,52); M2(21,77) = M1(9,53); M2(21,80) = M1(9,54); M2(21,81) = M1(9,55); M2(21,82) = M1(9,56); M2(21,83) = M1(9,57); M2(21,86) = M1(9,58); M2(21,87) = M1(9,59); M2(21,88) = M1(9,60); M2(21,91) = M1(9,61); M2(21,92) = M1(9,62); M2(21,96) = M1(9,63); M2(21,102) = M1(9,64); M2(21,103) = M1(9,65); M2(21,104) = M1(9,66); M2(21,105) = M1(9,67); M2(21,108) = M1(9,68); M2(21,109) = M1(9,69); M2(21,110) = M1(9,70); M2(21,113) = M1(9,71); M2(21,114) = M1(9,72); M2(21,117) = M1(9,73); M2(21,123) = M1(9,74); M2(21,124) = M1(9,75); M2(21,125) = M1(9,76); M2(21,128) = M1(9,77); M2(21,129) = M1(9,78); M2(21,132) = M1(9,79); M2(21,138) = M1(9,80); M2(21,139) = M1(9,81); M2(21,142) = M1(9,82); M2(21,148) = M1(9,83); 
M2(22,7) = M1(10,10); M2(22,12) = M1(10,15); M2(22,13) = M1(10,16); M2(22,14) = M1(10,17); M2(22,17) = M1(10,18); M2(22,18) = M1(10,19); M2(22,19) = M1(10,20); M2(22,20) = M1(10,21); M2(22,23) = M1(10,22); M2(22,24) = M1(10,23); M2(22,25) = M1(10,24); M2(22,28) = M1(10,25); M2(22,29) = M1(10,26); M2(22,32) = M1(10,27); M2(22,38) = M1(10,28); M2(22,39) = M1(10,29); M2(22,40) = M1(10,30); M2(22,41) = M1(10,31); M2(22,42) = M1(10,32); M2(22,43) = M1(10,33); M2(22,46) = M1(10,34); M2(22,47) = M1(10,35); M2(22,48) = M1(10,36); M2(22,49) = M1(10,37); M2(22,50) = M1(10,38); M2(22,53) = M1(10,39); M2(22,54) = M1(10,40); M2(22,55) = M1(10,41); M2(22,56) = M1(10,42); M2(22,59) = M1(10,43); M2(22,60) = M1(10,44); M2(22,61) = M1(10,45); M2(22,64) = M1(10,46); M2(22,65) = M1(10,47); M2(22,68) = M1(10,48); M2(22,73) = M1(10,49); M2(22,74) = M1(10,50); M2(22,75) = M1(10,51); M2(22,76) = M1(10,52); M2(22,77) = M1(10,53); M2(22,80) = M1(10,54); M2(22,81) = M1(10,55); M2(22,82) = M1(10,56); M2(22,83) = M1(10,57); M2(22,86) = M1(10,58); M2(22,87) = M1(10,59); M2(22,88) = M1(10,60); M2(22,91) = M1(10,61); M2(22,92) = M1(10,62); M2(22,96) = M1(10,63); M2(22,102) = M1(10,64); M2(22,103) = M1(10,65); M2(22,104) = M1(10,66); M2(22,105) = M1(10,67); M2(22,108) = M1(10,68); M2(22,109) = M1(10,69); M2(22,110) = M1(10,70); M2(22,113) = M1(10,71); M2(22,114) = M1(10,72); M2(22,117) = M1(10,73); M2(22,123) = M1(10,74); M2(22,124) = M1(10,75); M2(22,125) = M1(10,76); M2(22,128) = M1(10,77); M2(22,129) = M1(10,78); M2(22,132) = M1(10,79); M2(22,138) = M1(10,80); M2(22,139) = M1(10,81); M2(22,142) = M1(10,82); M2(22,148) = M1(10,83); 
M2(23,8) = M1(11,11); M2(23,12) = M1(11,15); M2(23,13) = M1(11,16); M2(23,14) = M1(11,17); M2(23,17) = M1(11,18); M2(23,18) = M1(11,19); M2(23,19) = M1(11,20); M2(23,20) = M1(11,21); M2(23,23) = M1(11,22); M2(23,24) = M1(11,23); M2(23,25) = M1(11,24); M2(23,28) = M1(11,25); M2(23,29) = M1(11,26); M2(23,32) = M1(11,27); M2(23,38) = M1(11,28); M2(23,39) = M1(11,29); M2(23,40) = M1(11,30); M2(23,41) = M1(11,31); M2(23,42) = M1(11,32); M2(23,43) = M1(11,33); M2(23,46) = M1(11,34); M2(23,47) = M1(11,35); M2(23,48) = M1(11,36); M2(23,49) = M1(11,37); M2(23,50) = M1(11,38); M2(23,53) = M1(11,39); M2(23,54) = M1(11,40); M2(23,55) = M1(11,41); M2(23,56) = M1(11,42); M2(23,59) = M1(11,43); M2(23,60) = M1(11,44); M2(23,61) = M1(11,45); M2(23,64) = M1(11,46); M2(23,65) = M1(11,47); M2(23,68) = M1(11,48); M2(23,73) = M1(11,49); M2(23,74) = M1(11,50); M2(23,75) = M1(11,51); M2(23,76) = M1(11,52); M2(23,77) = M1(11,53); M2(23,80) = M1(11,54); M2(23,81) = M1(11,55); M2(23,82) = M1(11,56); M2(23,83) = M1(11,57); M2(23,86) = M1(11,58); M2(23,87) = M1(11,59); M2(23,88) = M1(11,60); M2(23,91) = M1(11,61); M2(23,92) = M1(11,62); M2(23,96) = M1(11,63); M2(23,102) = M1(11,64); M2(23,103) = M1(11,65); M2(23,104) = M1(11,66); M2(23,105) = M1(11,67); M2(23,108) = M1(11,68); M2(23,109) = M1(11,69); M2(23,110) = M1(11,70); M2(23,113) = M1(11,71); M2(23,114) = M1(11,72); M2(23,117) = M1(11,73); M2(23,123) = M1(11,74); M2(23,124) = M1(11,75); M2(23,125) = M1(11,76); M2(23,128) = M1(11,77); M2(23,129) = M1(11,78); M2(23,132) = M1(11,79); M2(23,138) = M1(11,80); M2(23,139) = M1(11,81); M2(23,142) = M1(11,82); M2(23,148) = M1(11,83); 
M2(24,9) = M1(12,12); M2(24,12) = M1(12,15); M2(24,13) = M1(12,16); M2(24,14) = M1(12,17); M2(24,17) = M1(12,18); M2(24,18) = M1(12,19); M2(24,19) = M1(12,20); M2(24,20) = M1(12,21); M2(24,23) = M1(12,22); M2(24,24) = M1(12,23); M2(24,25) = M1(12,24); M2(24,28) = M1(12,25); M2(24,29) = M1(12,26); M2(24,32) = M1(12,27); M2(24,38) = M1(12,28); M2(24,39) = M1(12,29); M2(24,40) = M1(12,30); M2(24,41) = M1(12,31); M2(24,42) = M1(12,32); M2(24,43) = M1(12,33); M2(24,46) = M1(12,34); M2(24,47) = M1(12,35); M2(24,48) = M1(12,36); M2(24,49) = M1(12,37); M2(24,50) = M1(12,38); M2(24,53) = M1(12,39); M2(24,54) = M1(12,40); M2(24,55) = M1(12,41); M2(24,56) = M1(12,42); M2(24,59) = M1(12,43); M2(24,60) = M1(12,44); M2(24,61) = M1(12,45); M2(24,64) = M1(12,46); M2(24,65) = M1(12,47); M2(24,68) = M1(12,48); M2(24,73) = M1(12,49); M2(24,74) = M1(12,50); M2(24,75) = M1(12,51); M2(24,76) = M1(12,52); M2(24,77) = M1(12,53); M2(24,80) = M1(12,54); M2(24,81) = M1(12,55); M2(24,82) = M1(12,56); M2(24,83) = M1(12,57); M2(24,86) = M1(12,58); M2(24,87) = M1(12,59); M2(24,88) = M1(12,60); M2(24,91) = M1(12,61); M2(24,92) = M1(12,62); M2(24,96) = M1(12,63); M2(24,102) = M1(12,64); M2(24,103) = M1(12,65); M2(24,104) = M1(12,66); M2(24,105) = M1(12,67); M2(24,108) = M1(12,68); M2(24,109) = M1(12,69); M2(24,110) = M1(12,70); M2(24,113) = M1(12,71); M2(24,114) = M1(12,72); M2(24,117) = M1(12,73); M2(24,123) = M1(12,74); M2(24,124) = M1(12,75); M2(24,125) = M1(12,76); M2(24,128) = M1(12,77); M2(24,129) = M1(12,78); M2(24,132) = M1(12,79); M2(24,138) = M1(12,80); M2(24,139) = M1(12,81); M2(24,142) = M1(12,82); M2(24,148) = M1(12,83); 
M2(25,10) = M1(13,13); M2(25,12) = M1(13,15); M2(25,13) = M1(13,16); M2(25,14) = M1(13,17); M2(25,17) = M1(13,18); M2(25,18) = M1(13,19); M2(25,19) = M1(13,20); M2(25,20) = M1(13,21); M2(25,23) = M1(13,22); M2(25,24) = M1(13,23); M2(25,25) = M1(13,24); M2(25,28) = M1(13,25); M2(25,29) = M1(13,26); M2(25,32) = M1(13,27); M2(25,38) = M1(13,28); M2(25,39) = M1(13,29); M2(25,40) = M1(13,30); M2(25,41) = M1(13,31); M2(25,42) = M1(13,32); M2(25,43) = M1(13,33); M2(25,46) = M1(13,34); M2(25,47) = M1(13,35); M2(25,48) = M1(13,36); M2(25,49) = M1(13,37); M2(25,50) = M1(13,38); M2(25,53) = M1(13,39); M2(25,54) = M1(13,40); M2(25,55) = M1(13,41); M2(25,56) = M1(13,42); M2(25,59) = M1(13,43); M2(25,60) = M1(13,44); M2(25,61) = M1(13,45); M2(25,64) = M1(13,46); M2(25,65) = M1(13,47); M2(25,68) = M1(13,48); M2(25,73) = M1(13,49); M2(25,74) = M1(13,50); M2(25,75) = M1(13,51); M2(25,76) = M1(13,52); M2(25,77) = M1(13,53); M2(25,80) = M1(13,54); M2(25,81) = M1(13,55); M2(25,82) = M1(13,56); M2(25,83) = M1(13,57); M2(25,86) = M1(13,58); M2(25,87) = M1(13,59); M2(25,88) = M1(13,60); M2(25,91) = M1(13,61); M2(25,92) = M1(13,62); M2(25,96) = M1(13,63); M2(25,102) = M1(13,64); M2(25,103) = M1(13,65); M2(25,104) = M1(13,66); M2(25,105) = M1(13,67); M2(25,108) = M1(13,68); M2(25,109) = M1(13,69); M2(25,110) = M1(13,70); M2(25,113) = M1(13,71); M2(25,114) = M1(13,72); M2(25,117) = M1(13,73); M2(25,123) = M1(13,74); M2(25,124) = M1(13,75); M2(25,125) = M1(13,76); M2(25,128) = M1(13,77); M2(25,129) = M1(13,78); M2(25,132) = M1(13,79); M2(25,138) = M1(13,80); M2(25,139) = M1(13,81); M2(25,142) = M1(13,82); M2(25,148) = M1(13,83); 
M2(26,11) = M1(14,14); M2(26,12) = M1(14,15); M2(26,13) = M1(14,16); M2(26,14) = M1(14,17); M2(26,17) = M1(14,18); M2(26,18) = M1(14,19); M2(26,19) = M1(14,20); M2(26,20) = M1(14,21); M2(26,23) = M1(14,22); M2(26,24) = M1(14,23); M2(26,25) = M1(14,24); M2(26,28) = M1(14,25); M2(26,29) = M1(14,26); M2(26,32) = M1(14,27); M2(26,38) = M1(14,28); M2(26,39) = M1(14,29); M2(26,40) = M1(14,30); M2(26,41) = M1(14,31); M2(26,42) = M1(14,32); M2(26,43) = M1(14,33); M2(26,46) = M1(14,34); M2(26,47) = M1(14,35); M2(26,48) = M1(14,36); M2(26,49) = M1(14,37); M2(26,50) = M1(14,38); M2(26,53) = M1(14,39); M2(26,54) = M1(14,40); M2(26,55) = M1(14,41); M2(26,56) = M1(14,42); M2(26,59) = M1(14,43); M2(26,60) = M1(14,44); M2(26,61) = M1(14,45); M2(26,64) = M1(14,46); M2(26,65) = M1(14,47); M2(26,68) = M1(14,48); M2(26,73) = M1(14,49); M2(26,74) = M1(14,50); M2(26,75) = M1(14,51); M2(26,76) = M1(14,52); M2(26,77) = M1(14,53); M2(26,80) = M1(14,54); M2(26,81) = M1(14,55); M2(26,82) = M1(14,56); M2(26,83) = M1(14,57); M2(26,86) = M1(14,58); M2(26,87) = M1(14,59); M2(26,88) = M1(14,60); M2(26,91) = M1(14,61); M2(26,92) = M1(14,62); M2(26,96) = M1(14,63); M2(26,102) = M1(14,64); M2(26,103) = M1(14,65); M2(26,104) = M1(14,66); M2(26,105) = M1(14,67); M2(26,108) = M1(14,68); M2(26,109) = M1(14,69); M2(26,110) = M1(14,70); M2(26,113) = M1(14,71); M2(26,114) = M1(14,72); M2(26,117) = M1(14,73); M2(26,123) = M1(14,74); M2(26,124) = M1(14,75); M2(26,125) = M1(14,76); M2(26,128) = M1(14,77); M2(26,129) = M1(14,78); M2(26,132) = M1(14,79); M2(26,138) = M1(14,80); M2(26,139) = M1(14,81); M2(26,142) = M1(14,82); M2(26,148) = M1(14,83); 
M2(27,0) = M1(3,3); M2(27,11) = M1(3,15); M2(27,12) = M1(3,16); M2(27,13) = M1(3,17); M2(27,16) = M1(3,18); M2(27,17) = M1(3,19); M2(27,18) = M1(3,20); M2(27,19) = M1(3,21); M2(27,22) = M1(3,22); M2(27,23) = M1(3,23); M2(27,24) = M1(3,24); M2(27,27) = M1(3,25); M2(27,28) = M1(3,26); M2(27,31) = M1(3,27); M2(27,37) = M1(3,28); M2(27,38) = M1(3,29); M2(27,39) = M1(3,30); M2(27,40) = M1(3,31); M2(27,41) = M1(3,32); M2(27,42) = M1(3,33); M2(27,45) = M1(3,34); M2(27,46) = M1(3,35); M2(27,47) = M1(3,36); M2(27,48) = M1(3,37); M2(27,49) = M1(3,38); M2(27,52) = M1(3,39); M2(27,53) = M1(3,40); M2(27,54) = M1(3,41); M2(27,55) = M1(3,42); M2(27,58) = M1(3,43); M2(27,59) = M1(3,44); M2(27,60) = M1(3,45); M2(27,63) = M1(3,46); M2(27,64) = M1(3,47); M2(27,67) = M1(3,48); M2(27,72) = M1(3,49); M2(27,73) = M1(3,50); M2(27,74) = M1(3,51); M2(27,75) = M1(3,52); M2(27,76) = M1(3,53); M2(27,79) = M1(3,54); M2(27,80) = M1(3,55); M2(27,81) = M1(3,56); M2(27,82) = M1(3,57); M2(27,85) = M1(3,58); M2(27,86) = M1(3,59); M2(27,87) = M1(3,60); M2(27,90) = M1(3,61); M2(27,91) = M1(3,62); M2(27,95) = M1(3,63); M2(27,101) = M1(3,64); M2(27,102) = M1(3,65); M2(27,103) = M1(3,66); M2(27,104) = M1(3,67); M2(27,107) = M1(3,68); M2(27,108) = M1(3,69); M2(27,109) = M1(3,70); M2(27,112) = M1(3,71); M2(27,113) = M1(3,72); M2(27,116) = M1(3,73); M2(27,122) = M1(3,74); M2(27,123) = M1(3,75); M2(27,124) = M1(3,76); M2(27,127) = M1(3,77); M2(27,128) = M1(3,78); M2(27,131) = M1(3,79); M2(27,137) = M1(3,80); M2(27,138) = M1(3,81); M2(27,141) = M1(3,82); M2(27,147) = M1(3,83); 
M2(28,1) = M1(4,4); M2(28,11) = M1(4,15); M2(28,12) = M1(4,16); M2(28,13) = M1(4,17); M2(28,16) = M1(4,18); M2(28,17) = M1(4,19); M2(28,18) = M1(4,20); M2(28,19) = M1(4,21); M2(28,22) = M1(4,22); M2(28,23) = M1(4,23); M2(28,24) = M1(4,24); M2(28,27) = M1(4,25); M2(28,28) = M1(4,26); M2(28,31) = M1(4,27); M2(28,37) = M1(4,28); M2(28,38) = M1(4,29); M2(28,39) = M1(4,30); M2(28,40) = M1(4,31); M2(28,41) = M1(4,32); M2(28,42) = M1(4,33); M2(28,45) = M1(4,34); M2(28,46) = M1(4,35); M2(28,47) = M1(4,36); M2(28,48) = M1(4,37); M2(28,49) = M1(4,38); M2(28,52) = M1(4,39); M2(28,53) = M1(4,40); M2(28,54) = M1(4,41); M2(28,55) = M1(4,42); M2(28,58) = M1(4,43); M2(28,59) = M1(4,44); M2(28,60) = M1(4,45); M2(28,63) = M1(4,46); M2(28,64) = M1(4,47); M2(28,67) = M1(4,48); M2(28,72) = M1(4,49); M2(28,73) = M1(4,50); M2(28,74) = M1(4,51); M2(28,75) = M1(4,52); M2(28,76) = M1(4,53); M2(28,79) = M1(4,54); M2(28,80) = M1(4,55); M2(28,81) = M1(4,56); M2(28,82) = M1(4,57); M2(28,85) = M1(4,58); M2(28,86) = M1(4,59); M2(28,87) = M1(4,60); M2(28,90) = M1(4,61); M2(28,91) = M1(4,62); M2(28,95) = M1(4,63); M2(28,101) = M1(4,64); M2(28,102) = M1(4,65); M2(28,103) = M1(4,66); M2(28,104) = M1(4,67); M2(28,107) = M1(4,68); M2(28,108) = M1(4,69); M2(28,109) = M1(4,70); M2(28,112) = M1(4,71); M2(28,113) = M1(4,72); M2(28,116) = M1(4,73); M2(28,122) = M1(4,74); M2(28,123) = M1(4,75); M2(28,124) = M1(4,76); M2(28,127) = M1(4,77); M2(28,128) = M1(4,78); M2(28,131) = M1(4,79); M2(28,137) = M1(4,80); M2(28,138) = M1(4,81); M2(28,141) = M1(4,82); M2(28,147) = M1(4,83); 
M2(29,2) = M1(5,5); M2(29,11) = M1(5,15); M2(29,12) = M1(5,16); M2(29,13) = M1(5,17); M2(29,16) = M1(5,18); M2(29,17) = M1(5,19); M2(29,18) = M1(5,20); M2(29,19) = M1(5,21); M2(29,22) = M1(5,22); M2(29,23) = M1(5,23); M2(29,24) = M1(5,24); M2(29,27) = M1(5,25); M2(29,28) = M1(5,26); M2(29,31) = M1(5,27); M2(29,37) = M1(5,28); M2(29,38) = M1(5,29); M2(29,39) = M1(5,30); M2(29,40) = M1(5,31); M2(29,41) = M1(5,32); M2(29,42) = M1(5,33); M2(29,45) = M1(5,34); M2(29,46) = M1(5,35); M2(29,47) = M1(5,36); M2(29,48) = M1(5,37); M2(29,49) = M1(5,38); M2(29,52) = M1(5,39); M2(29,53) = M1(5,40); M2(29,54) = M1(5,41); M2(29,55) = M1(5,42); M2(29,58) = M1(5,43); M2(29,59) = M1(5,44); M2(29,60) = M1(5,45); M2(29,63) = M1(5,46); M2(29,64) = M1(5,47); M2(29,67) = M1(5,48); M2(29,72) = M1(5,49); M2(29,73) = M1(5,50); M2(29,74) = M1(5,51); M2(29,75) = M1(5,52); M2(29,76) = M1(5,53); M2(29,79) = M1(5,54); M2(29,80) = M1(5,55); M2(29,81) = M1(5,56); M2(29,82) = M1(5,57); M2(29,85) = M1(5,58); M2(29,86) = M1(5,59); M2(29,87) = M1(5,60); M2(29,90) = M1(5,61); M2(29,91) = M1(5,62); M2(29,95) = M1(5,63); M2(29,101) = M1(5,64); M2(29,102) = M1(5,65); M2(29,103) = M1(5,66); M2(29,104) = M1(5,67); M2(29,107) = M1(5,68); M2(29,108) = M1(5,69); M2(29,109) = M1(5,70); M2(29,112) = M1(5,71); M2(29,113) = M1(5,72); M2(29,116) = M1(5,73); M2(29,122) = M1(5,74); M2(29,123) = M1(5,75); M2(29,124) = M1(5,76); M2(29,127) = M1(5,77); M2(29,128) = M1(5,78); M2(29,131) = M1(5,79); M2(29,137) = M1(5,80); M2(29,138) = M1(5,81); M2(29,141) = M1(5,82); M2(29,147) = M1(5,83); 
M2(30,3) = M1(6,6); M2(30,11) = M1(6,15); M2(30,12) = M1(6,16); M2(30,13) = M1(6,17); M2(30,16) = M1(6,18); M2(30,17) = M1(6,19); M2(30,18) = M1(6,20); M2(30,19) = M1(6,21); M2(30,22) = M1(6,22); M2(30,23) = M1(6,23); M2(30,24) = M1(6,24); M2(30,27) = M1(6,25); M2(30,28) = M1(6,26); M2(30,31) = M1(6,27); M2(30,37) = M1(6,28); M2(30,38) = M1(6,29); M2(30,39) = M1(6,30); M2(30,40) = M1(6,31); M2(30,41) = M1(6,32); M2(30,42) = M1(6,33); M2(30,45) = M1(6,34); M2(30,46) = M1(6,35); M2(30,47) = M1(6,36); M2(30,48) = M1(6,37); M2(30,49) = M1(6,38); M2(30,52) = M1(6,39); M2(30,53) = M1(6,40); M2(30,54) = M1(6,41); M2(30,55) = M1(6,42); M2(30,58) = M1(6,43); M2(30,59) = M1(6,44); M2(30,60) = M1(6,45); M2(30,63) = M1(6,46); M2(30,64) = M1(6,47); M2(30,67) = M1(6,48); M2(30,72) = M1(6,49); M2(30,73) = M1(6,50); M2(30,74) = M1(6,51); M2(30,75) = M1(6,52); M2(30,76) = M1(6,53); M2(30,79) = M1(6,54); M2(30,80) = M1(6,55); M2(30,81) = M1(6,56); M2(30,82) = M1(6,57); M2(30,85) = M1(6,58); M2(30,86) = M1(6,59); M2(30,87) = M1(6,60); M2(30,90) = M1(6,61); M2(30,91) = M1(6,62); M2(30,95) = M1(6,63); M2(30,101) = M1(6,64); M2(30,102) = M1(6,65); M2(30,103) = M1(6,66); M2(30,104) = M1(6,67); M2(30,107) = M1(6,68); M2(30,108) = M1(6,69); M2(30,109) = M1(6,70); M2(30,112) = M1(6,71); M2(30,113) = M1(6,72); M2(30,116) = M1(6,73); M2(30,122) = M1(6,74); M2(30,123) = M1(6,75); M2(30,124) = M1(6,76); M2(30,127) = M1(6,77); M2(30,128) = M1(6,78); M2(30,131) = M1(6,79); M2(30,137) = M1(6,80); M2(30,138) = M1(6,81); M2(30,141) = M1(6,82); M2(30,147) = M1(6,83); 
M2(31,4) = M1(8,8); M2(31,11) = M1(8,15); M2(31,12) = M1(8,16); M2(31,13) = M1(8,17); M2(31,16) = M1(8,18); M2(31,17) = M1(8,19); M2(31,18) = M1(8,20); M2(31,19) = M1(8,21); M2(31,22) = M1(8,22); M2(31,23) = M1(8,23); M2(31,24) = M1(8,24); M2(31,27) = M1(8,25); M2(31,28) = M1(8,26); M2(31,31) = M1(8,27); M2(31,37) = M1(8,28); M2(31,38) = M1(8,29); M2(31,39) = M1(8,30); M2(31,40) = M1(8,31); M2(31,41) = M1(8,32); M2(31,42) = M1(8,33); M2(31,45) = M1(8,34); M2(31,46) = M1(8,35); M2(31,47) = M1(8,36); M2(31,48) = M1(8,37); M2(31,49) = M1(8,38); M2(31,52) = M1(8,39); M2(31,53) = M1(8,40); M2(31,54) = M1(8,41); M2(31,55) = M1(8,42); M2(31,58) = M1(8,43); M2(31,59) = M1(8,44); M2(31,60) = M1(8,45); M2(31,63) = M1(8,46); M2(31,64) = M1(8,47); M2(31,67) = M1(8,48); M2(31,72) = M1(8,49); M2(31,73) = M1(8,50); M2(31,74) = M1(8,51); M2(31,75) = M1(8,52); M2(31,76) = M1(8,53); M2(31,79) = M1(8,54); M2(31,80) = M1(8,55); M2(31,81) = M1(8,56); M2(31,82) = M1(8,57); M2(31,85) = M1(8,58); M2(31,86) = M1(8,59); M2(31,87) = M1(8,60); M2(31,90) = M1(8,61); M2(31,91) = M1(8,62); M2(31,95) = M1(8,63); M2(31,101) = M1(8,64); M2(31,102) = M1(8,65); M2(31,103) = M1(8,66); M2(31,104) = M1(8,67); M2(31,107) = M1(8,68); M2(31,108) = M1(8,69); M2(31,109) = M1(8,70); M2(31,112) = M1(8,71); M2(31,113) = M1(8,72); M2(31,116) = M1(8,73); M2(31,122) = M1(8,74); M2(31,123) = M1(8,75); M2(31,124) = M1(8,76); M2(31,127) = M1(8,77); M2(31,128) = M1(8,78); M2(31,131) = M1(8,79); M2(31,137) = M1(8,80); M2(31,138) = M1(8,81); M2(31,141) = M1(8,82); M2(31,147) = M1(8,83); 
M2(32,5) = M1(9,9); M2(32,11) = M1(9,15); M2(32,12) = M1(9,16); M2(32,13) = M1(9,17); M2(32,16) = M1(9,18); M2(32,17) = M1(9,19); M2(32,18) = M1(9,20); M2(32,19) = M1(9,21); M2(32,22) = M1(9,22); M2(32,23) = M1(9,23); M2(32,24) = M1(9,24); M2(32,27) = M1(9,25); M2(32,28) = M1(9,26); M2(32,31) = M1(9,27); M2(32,37) = M1(9,28); M2(32,38) = M1(9,29); M2(32,39) = M1(9,30); M2(32,40) = M1(9,31); M2(32,41) = M1(9,32); M2(32,42) = M1(9,33); M2(32,45) = M1(9,34); M2(32,46) = M1(9,35); M2(32,47) = M1(9,36); M2(32,48) = M1(9,37); M2(32,49) = M1(9,38); M2(32,52) = M1(9,39); M2(32,53) = M1(9,40); M2(32,54) = M1(9,41); M2(32,55) = M1(9,42); M2(32,58) = M1(9,43); M2(32,59) = M1(9,44); M2(32,60) = M1(9,45); M2(32,63) = M1(9,46); M2(32,64) = M1(9,47); M2(32,67) = M1(9,48); M2(32,72) = M1(9,49); M2(32,73) = M1(9,50); M2(32,74) = M1(9,51); M2(32,75) = M1(9,52); M2(32,76) = M1(9,53); M2(32,79) = M1(9,54); M2(32,80) = M1(9,55); M2(32,81) = M1(9,56); M2(32,82) = M1(9,57); M2(32,85) = M1(9,58); M2(32,86) = M1(9,59); M2(32,87) = M1(9,60); M2(32,90) = M1(9,61); M2(32,91) = M1(9,62); M2(32,95) = M1(9,63); M2(32,101) = M1(9,64); M2(32,102) = M1(9,65); M2(32,103) = M1(9,66); M2(32,104) = M1(9,67); M2(32,107) = M1(9,68); M2(32,108) = M1(9,69); M2(32,109) = M1(9,70); M2(32,112) = M1(9,71); M2(32,113) = M1(9,72); M2(32,116) = M1(9,73); M2(32,122) = M1(9,74); M2(32,123) = M1(9,75); M2(32,124) = M1(9,76); M2(32,127) = M1(9,77); M2(32,128) = M1(9,78); M2(32,131) = M1(9,79); M2(32,137) = M1(9,80); M2(32,138) = M1(9,81); M2(32,141) = M1(9,82); M2(32,147) = M1(9,83); 
M2(33,6) = M1(10,10); M2(33,11) = M1(10,15); M2(33,12) = M1(10,16); M2(33,13) = M1(10,17); M2(33,16) = M1(10,18); M2(33,17) = M1(10,19); M2(33,18) = M1(10,20); M2(33,19) = M1(10,21); M2(33,22) = M1(10,22); M2(33,23) = M1(10,23); M2(33,24) = M1(10,24); M2(33,27) = M1(10,25); M2(33,28) = M1(10,26); M2(33,31) = M1(10,27); M2(33,37) = M1(10,28); M2(33,38) = M1(10,29); M2(33,39) = M1(10,30); M2(33,40) = M1(10,31); M2(33,41) = M1(10,32); M2(33,42) = M1(10,33); M2(33,45) = M1(10,34); M2(33,46) = M1(10,35); M2(33,47) = M1(10,36); M2(33,48) = M1(10,37); M2(33,49) = M1(10,38); M2(33,52) = M1(10,39); M2(33,53) = M1(10,40); M2(33,54) = M1(10,41); M2(33,55) = M1(10,42); M2(33,58) = M1(10,43); M2(33,59) = M1(10,44); M2(33,60) = M1(10,45); M2(33,63) = M1(10,46); M2(33,64) = M1(10,47); M2(33,67) = M1(10,48); M2(33,72) = M1(10,49); M2(33,73) = M1(10,50); M2(33,74) = M1(10,51); M2(33,75) = M1(10,52); M2(33,76) = M1(10,53); M2(33,79) = M1(10,54); M2(33,80) = M1(10,55); M2(33,81) = M1(10,56); M2(33,82) = M1(10,57); M2(33,85) = M1(10,58); M2(33,86) = M1(10,59); M2(33,87) = M1(10,60); M2(33,90) = M1(10,61); M2(33,91) = M1(10,62); M2(33,95) = M1(10,63); M2(33,101) = M1(10,64); M2(33,102) = M1(10,65); M2(33,103) = M1(10,66); M2(33,104) = M1(10,67); M2(33,107) = M1(10,68); M2(33,108) = M1(10,69); M2(33,109) = M1(10,70); M2(33,112) = M1(10,71); M2(33,113) = M1(10,72); M2(33,116) = M1(10,73); M2(33,122) = M1(10,74); M2(33,123) = M1(10,75); M2(33,124) = M1(10,76); M2(33,127) = M1(10,77); M2(33,128) = M1(10,78); M2(33,131) = M1(10,79); M2(33,137) = M1(10,80); M2(33,138) = M1(10,81); M2(33,141) = M1(10,82); M2(33,147) = M1(10,83); 
M2(34,7) = M1(11,11); M2(34,11) = M1(11,15); M2(34,12) = M1(11,16); M2(34,13) = M1(11,17); M2(34,16) = M1(11,18); M2(34,17) = M1(11,19); M2(34,18) = M1(11,20); M2(34,19) = M1(11,21); M2(34,22) = M1(11,22); M2(34,23) = M1(11,23); M2(34,24) = M1(11,24); M2(34,27) = M1(11,25); M2(34,28) = M1(11,26); M2(34,31) = M1(11,27); M2(34,37) = M1(11,28); M2(34,38) = M1(11,29); M2(34,39) = M1(11,30); M2(34,40) = M1(11,31); M2(34,41) = M1(11,32); M2(34,42) = M1(11,33); M2(34,45) = M1(11,34); M2(34,46) = M1(11,35); M2(34,47) = M1(11,36); M2(34,48) = M1(11,37); M2(34,49) = M1(11,38); M2(34,52) = M1(11,39); M2(34,53) = M1(11,40); M2(34,54) = M1(11,41); M2(34,55) = M1(11,42); M2(34,58) = M1(11,43); M2(34,59) = M1(11,44); M2(34,60) = M1(11,45); M2(34,63) = M1(11,46); M2(34,64) = M1(11,47); M2(34,67) = M1(11,48); M2(34,72) = M1(11,49); M2(34,73) = M1(11,50); M2(34,74) = M1(11,51); M2(34,75) = M1(11,52); M2(34,76) = M1(11,53); M2(34,79) = M1(11,54); M2(34,80) = M1(11,55); M2(34,81) = M1(11,56); M2(34,82) = M1(11,57); M2(34,85) = M1(11,58); M2(34,86) = M1(11,59); M2(34,87) = M1(11,60); M2(34,90) = M1(11,61); M2(34,91) = M1(11,62); M2(34,95) = M1(11,63); M2(34,101) = M1(11,64); M2(34,102) = M1(11,65); M2(34,103) = M1(11,66); M2(34,104) = M1(11,67); M2(34,107) = M1(11,68); M2(34,108) = M1(11,69); M2(34,109) = M1(11,70); M2(34,112) = M1(11,71); M2(34,113) = M1(11,72); M2(34,116) = M1(11,73); M2(34,122) = M1(11,74); M2(34,123) = M1(11,75); M2(34,124) = M1(11,76); M2(34,127) = M1(11,77); M2(34,128) = M1(11,78); M2(34,131) = M1(11,79); M2(34,137) = M1(11,80); M2(34,138) = M1(11,81); M2(34,141) = M1(11,82); M2(34,147) = M1(11,83); 
M2(35,8) = M1(12,12); M2(35,11) = M1(12,15); M2(35,12) = M1(12,16); M2(35,13) = M1(12,17); M2(35,16) = M1(12,18); M2(35,17) = M1(12,19); M2(35,18) = M1(12,20); M2(35,19) = M1(12,21); M2(35,22) = M1(12,22); M2(35,23) = M1(12,23); M2(35,24) = M1(12,24); M2(35,27) = M1(12,25); M2(35,28) = M1(12,26); M2(35,31) = M1(12,27); M2(35,37) = M1(12,28); M2(35,38) = M1(12,29); M2(35,39) = M1(12,30); M2(35,40) = M1(12,31); M2(35,41) = M1(12,32); M2(35,42) = M1(12,33); M2(35,45) = M1(12,34); M2(35,46) = M1(12,35); M2(35,47) = M1(12,36); M2(35,48) = M1(12,37); M2(35,49) = M1(12,38); M2(35,52) = M1(12,39); M2(35,53) = M1(12,40); M2(35,54) = M1(12,41); M2(35,55) = M1(12,42); M2(35,58) = M1(12,43); M2(35,59) = M1(12,44); M2(35,60) = M1(12,45); M2(35,63) = M1(12,46); M2(35,64) = M1(12,47); M2(35,67) = M1(12,48); M2(35,72) = M1(12,49); M2(35,73) = M1(12,50); M2(35,74) = M1(12,51); M2(35,75) = M1(12,52); M2(35,76) = M1(12,53); M2(35,79) = M1(12,54); M2(35,80) = M1(12,55); M2(35,81) = M1(12,56); M2(35,82) = M1(12,57); M2(35,85) = M1(12,58); M2(35,86) = M1(12,59); M2(35,87) = M1(12,60); M2(35,90) = M1(12,61); M2(35,91) = M1(12,62); M2(35,95) = M1(12,63); M2(35,101) = M1(12,64); M2(35,102) = M1(12,65); M2(35,103) = M1(12,66); M2(35,104) = M1(12,67); M2(35,107) = M1(12,68); M2(35,108) = M1(12,69); M2(35,109) = M1(12,70); M2(35,112) = M1(12,71); M2(35,113) = M1(12,72); M2(35,116) = M1(12,73); M2(35,122) = M1(12,74); M2(35,123) = M1(12,75); M2(35,124) = M1(12,76); M2(35,127) = M1(12,77); M2(35,128) = M1(12,78); M2(35,131) = M1(12,79); M2(35,137) = M1(12,80); M2(35,138) = M1(12,81); M2(35,141) = M1(12,82); M2(35,147) = M1(12,83); 
M2(36,10) = M1(14,14); M2(36,11) = M1(14,15); M2(36,12) = M1(14,16); M2(36,13) = M1(14,17); M2(36,16) = M1(14,18); M2(36,17) = M1(14,19); M2(36,18) = M1(14,20); M2(36,19) = M1(14,21); M2(36,22) = M1(14,22); M2(36,23) = M1(14,23); M2(36,24) = M1(14,24); M2(36,27) = M1(14,25); M2(36,28) = M1(14,26); M2(36,31) = M1(14,27); M2(36,37) = M1(14,28); M2(36,38) = M1(14,29); M2(36,39) = M1(14,30); M2(36,40) = M1(14,31); M2(36,41) = M1(14,32); M2(36,42) = M1(14,33); M2(36,45) = M1(14,34); M2(36,46) = M1(14,35); M2(36,47) = M1(14,36); M2(36,48) = M1(14,37); M2(36,49) = M1(14,38); M2(36,52) = M1(14,39); M2(36,53) = M1(14,40); M2(36,54) = M1(14,41); M2(36,55) = M1(14,42); M2(36,58) = M1(14,43); M2(36,59) = M1(14,44); M2(36,60) = M1(14,45); M2(36,63) = M1(14,46); M2(36,64) = M1(14,47); M2(36,67) = M1(14,48); M2(36,72) = M1(14,49); M2(36,73) = M1(14,50); M2(36,74) = M1(14,51); M2(36,75) = M1(14,52); M2(36,76) = M1(14,53); M2(36,79) = M1(14,54); M2(36,80) = M1(14,55); M2(36,81) = M1(14,56); M2(36,82) = M1(14,57); M2(36,85) = M1(14,58); M2(36,86) = M1(14,59); M2(36,87) = M1(14,60); M2(36,90) = M1(14,61); M2(36,91) = M1(14,62); M2(36,95) = M1(14,63); M2(36,101) = M1(14,64); M2(36,102) = M1(14,65); M2(36,103) = M1(14,66); M2(36,104) = M1(14,67); M2(36,107) = M1(14,68); M2(36,108) = M1(14,69); M2(36,109) = M1(14,70); M2(36,112) = M1(14,71); M2(36,113) = M1(14,72); M2(36,116) = M1(14,73); M2(36,122) = M1(14,74); M2(36,123) = M1(14,75); M2(36,124) = M1(14,76); M2(36,127) = M1(14,77); M2(36,128) = M1(14,78); M2(36,131) = M1(14,79); M2(36,137) = M1(14,80); M2(36,138) = M1(14,81); M2(36,141) = M1(14,82); M2(36,147) = M1(14,83); 
M2(37,48) = M1(3,3); M2(37,60) = M1(3,15); M2(37,61) = M1(3,16); M2(37,62) = M1(3,17); M2(37,63) = M1(3,18); M2(37,64) = M1(3,19); M2(37,65) = M1(3,20); M2(37,66) = M1(3,21); M2(37,67) = M1(3,22); M2(37,68) = M1(3,23); M2(37,69) = M1(3,24); M2(37,70) = M1(3,25); M2(37,71) = M1(3,26); M2(37,79) = M1(3,28); M2(37,80) = M1(3,29); M2(37,81) = M1(3,30); M2(37,82) = M1(3,31); M2(37,83) = M1(3,32); M2(37,84) = M1(3,33); M2(37,85) = M1(3,34); M2(37,86) = M1(3,35); M2(37,87) = M1(3,36); M2(37,88) = M1(3,37); M2(37,89) = M1(3,38); M2(37,90) = M1(3,39); M2(37,91) = M1(3,40); M2(37,92) = M1(3,41); M2(37,93) = M1(3,27); M2(37,94) = M1(3,42); M2(37,95) = M1(3,43); M2(37,96) = M1(3,44); M2(37,97) = M1(3,45); M2(37,98) = M1(3,46); M2(37,99) = M1(3,47); M2(37,100) = M1(3,48); M2(37,107) = M1(3,49); M2(37,108) = M1(3,50); M2(37,109) = M1(3,51); M2(37,110) = M1(3,52); M2(37,111) = M1(3,53); M2(37,112) = M1(3,54); M2(37,113) = M1(3,55); M2(37,114) = M1(3,56); M2(37,115) = M1(3,57); M2(37,116) = M1(3,58); M2(37,117) = M1(3,59); M2(37,118) = M1(3,60); M2(37,119) = M1(3,61); M2(37,120) = M1(3,62); M2(37,121) = M1(3,63); M2(37,127) = M1(3,64); M2(37,128) = M1(3,65); M2(37,129) = M1(3,66); M2(37,130) = M1(3,67); M2(37,131) = M1(3,68); M2(37,132) = M1(3,69); M2(37,133) = M1(3,70); M2(37,134) = M1(3,71); M2(37,135) = M1(3,72); M2(37,136) = M1(3,73); M2(37,141) = M1(3,74); M2(37,142) = M1(3,75); M2(37,143) = M1(3,76); M2(37,144) = M1(3,77); M2(37,145) = M1(3,78); M2(37,146) = M1(3,79); M2(37,150) = M1(3,80); M2(37,151) = M1(3,81); M2(37,152) = M1(3,82); M2(37,155) = M1(3,83); 
M2(38,49) = M1(4,4); M2(38,60) = M1(4,15); M2(38,61) = M1(4,16); M2(38,62) = M1(4,17); M2(38,63) = M1(4,18); M2(38,64) = M1(4,19); M2(38,65) = M1(4,20); M2(38,66) = M1(4,21); M2(38,67) = M1(4,22); M2(38,68) = M1(4,23); M2(38,69) = M1(4,24); M2(38,70) = M1(4,25); M2(38,71) = M1(4,26); M2(38,79) = M1(4,28); M2(38,80) = M1(4,29); M2(38,81) = M1(4,30); M2(38,82) = M1(4,31); M2(38,83) = M1(4,32); M2(38,84) = M1(4,33); M2(38,85) = M1(4,34); M2(38,86) = M1(4,35); M2(38,87) = M1(4,36); M2(38,88) = M1(4,37); M2(38,89) = M1(4,38); M2(38,90) = M1(4,39); M2(38,91) = M1(4,40); M2(38,92) = M1(4,41); M2(38,93) = M1(4,27); M2(38,94) = M1(4,42); M2(38,95) = M1(4,43); M2(38,96) = M1(4,44); M2(38,97) = M1(4,45); M2(38,98) = M1(4,46); M2(38,99) = M1(4,47); M2(38,100) = M1(4,48); M2(38,107) = M1(4,49); M2(38,108) = M1(4,50); M2(38,109) = M1(4,51); M2(38,110) = M1(4,52); M2(38,111) = M1(4,53); M2(38,112) = M1(4,54); M2(38,113) = M1(4,55); M2(38,114) = M1(4,56); M2(38,115) = M1(4,57); M2(38,116) = M1(4,58); M2(38,117) = M1(4,59); M2(38,118) = M1(4,60); M2(38,119) = M1(4,61); M2(38,120) = M1(4,62); M2(38,121) = M1(4,63); M2(38,127) = M1(4,64); M2(38,128) = M1(4,65); M2(38,129) = M1(4,66); M2(38,130) = M1(4,67); M2(38,131) = M1(4,68); M2(38,132) = M1(4,69); M2(38,133) = M1(4,70); M2(38,134) = M1(4,71); M2(38,135) = M1(4,72); M2(38,136) = M1(4,73); M2(38,141) = M1(4,74); M2(38,142) = M1(4,75); M2(38,143) = M1(4,76); M2(38,144) = M1(4,77); M2(38,145) = M1(4,78); M2(38,146) = M1(4,79); M2(38,150) = M1(4,80); M2(38,151) = M1(4,81); M2(38,152) = M1(4,82); M2(38,155) = M1(4,83); 
M2(39,50) = M1(5,5); M2(39,60) = M1(5,15); M2(39,61) = M1(5,16); M2(39,62) = M1(5,17); M2(39,63) = M1(5,18); M2(39,64) = M1(5,19); M2(39,65) = M1(5,20); M2(39,66) = M1(5,21); M2(39,67) = M1(5,22); M2(39,68) = M1(5,23); M2(39,69) = M1(5,24); M2(39,70) = M1(5,25); M2(39,71) = M1(5,26); M2(39,79) = M1(5,28); M2(39,80) = M1(5,29); M2(39,81) = M1(5,30); M2(39,82) = M1(5,31); M2(39,83) = M1(5,32); M2(39,84) = M1(5,33); M2(39,85) = M1(5,34); M2(39,86) = M1(5,35); M2(39,87) = M1(5,36); M2(39,88) = M1(5,37); M2(39,89) = M1(5,38); M2(39,90) = M1(5,39); M2(39,91) = M1(5,40); M2(39,92) = M1(5,41); M2(39,93) = M1(5,27); M2(39,94) = M1(5,42); M2(39,95) = M1(5,43); M2(39,96) = M1(5,44); M2(39,97) = M1(5,45); M2(39,98) = M1(5,46); M2(39,99) = M1(5,47); M2(39,100) = M1(5,48); M2(39,107) = M1(5,49); M2(39,108) = M1(5,50); M2(39,109) = M1(5,51); M2(39,110) = M1(5,52); M2(39,111) = M1(5,53); M2(39,112) = M1(5,54); M2(39,113) = M1(5,55); M2(39,114) = M1(5,56); M2(39,115) = M1(5,57); M2(39,116) = M1(5,58); M2(39,117) = M1(5,59); M2(39,118) = M1(5,60); M2(39,119) = M1(5,61); M2(39,120) = M1(5,62); M2(39,121) = M1(5,63); M2(39,127) = M1(5,64); M2(39,128) = M1(5,65); M2(39,129) = M1(5,66); M2(39,130) = M1(5,67); M2(39,131) = M1(5,68); M2(39,132) = M1(5,69); M2(39,133) = M1(5,70); M2(39,134) = M1(5,71); M2(39,135) = M1(5,72); M2(39,136) = M1(5,73); M2(39,141) = M1(5,74); M2(39,142) = M1(5,75); M2(39,143) = M1(5,76); M2(39,144) = M1(5,77); M2(39,145) = M1(5,78); M2(39,146) = M1(5,79); M2(39,150) = M1(5,80); M2(39,151) = M1(5,81); M2(39,152) = M1(5,82); M2(39,155) = M1(5,83); 
M2(40,51) = M1(6,6); M2(40,60) = M1(6,15); M2(40,61) = M1(6,16); M2(40,62) = M1(6,17); M2(40,63) = M1(6,18); M2(40,64) = M1(6,19); M2(40,65) = M1(6,20); M2(40,66) = M1(6,21); M2(40,67) = M1(6,22); M2(40,68) = M1(6,23); M2(40,69) = M1(6,24); M2(40,70) = M1(6,25); M2(40,71) = M1(6,26); M2(40,79) = M1(6,28); M2(40,80) = M1(6,29); M2(40,81) = M1(6,30); M2(40,82) = M1(6,31); M2(40,83) = M1(6,32); M2(40,84) = M1(6,33); M2(40,85) = M1(6,34); M2(40,86) = M1(6,35); M2(40,87) = M1(6,36); M2(40,88) = M1(6,37); M2(40,89) = M1(6,38); M2(40,90) = M1(6,39); M2(40,91) = M1(6,40); M2(40,92) = M1(6,41); M2(40,93) = M1(6,27); M2(40,94) = M1(6,42); M2(40,95) = M1(6,43); M2(40,96) = M1(6,44); M2(40,97) = M1(6,45); M2(40,98) = M1(6,46); M2(40,99) = M1(6,47); M2(40,100) = M1(6,48); M2(40,107) = M1(6,49); M2(40,108) = M1(6,50); M2(40,109) = M1(6,51); M2(40,110) = M1(6,52); M2(40,111) = M1(6,53); M2(40,112) = M1(6,54); M2(40,113) = M1(6,55); M2(40,114) = M1(6,56); M2(40,115) = M1(6,57); M2(40,116) = M1(6,58); M2(40,117) = M1(6,59); M2(40,118) = M1(6,60); M2(40,119) = M1(6,61); M2(40,120) = M1(6,62); M2(40,121) = M1(6,63); M2(40,127) = M1(6,64); M2(40,128) = M1(6,65); M2(40,129) = M1(6,66); M2(40,130) = M1(6,67); M2(40,131) = M1(6,68); M2(40,132) = M1(6,69); M2(40,133) = M1(6,70); M2(40,134) = M1(6,71); M2(40,135) = M1(6,72); M2(40,136) = M1(6,73); M2(40,141) = M1(6,74); M2(40,142) = M1(6,75); M2(40,143) = M1(6,76); M2(40,144) = M1(6,77); M2(40,145) = M1(6,78); M2(40,146) = M1(6,79); M2(40,150) = M1(6,80); M2(40,151) = M1(6,81); M2(40,152) = M1(6,82); M2(40,155) = M1(6,83); 
M2(41,52) = M1(7,7); M2(41,60) = M1(7,15); M2(41,61) = M1(7,16); M2(41,62) = M1(7,17); M2(41,63) = M1(7,18); M2(41,64) = M1(7,19); M2(41,65) = M1(7,20); M2(41,66) = M1(7,21); M2(41,67) = M1(7,22); M2(41,68) = M1(7,23); M2(41,69) = M1(7,24); M2(41,70) = M1(7,25); M2(41,71) = M1(7,26); M2(41,79) = M1(7,28); M2(41,80) = M1(7,29); M2(41,81) = M1(7,30); M2(41,82) = M1(7,31); M2(41,83) = M1(7,32); M2(41,84) = M1(7,33); M2(41,85) = M1(7,34); M2(41,86) = M1(7,35); M2(41,87) = M1(7,36); M2(41,88) = M1(7,37); M2(41,89) = M1(7,38); M2(41,90) = M1(7,39); M2(41,91) = M1(7,40); M2(41,92) = M1(7,41); M2(41,93) = M1(7,27); M2(41,94) = M1(7,42); M2(41,95) = M1(7,43); M2(41,96) = M1(7,44); M2(41,97) = M1(7,45); M2(41,98) = M1(7,46); M2(41,99) = M1(7,47); M2(41,100) = M1(7,48); M2(41,107) = M1(7,49); M2(41,108) = M1(7,50); M2(41,109) = M1(7,51); M2(41,110) = M1(7,52); M2(41,111) = M1(7,53); M2(41,112) = M1(7,54); M2(41,113) = M1(7,55); M2(41,114) = M1(7,56); M2(41,115) = M1(7,57); M2(41,116) = M1(7,58); M2(41,117) = M1(7,59); M2(41,118) = M1(7,60); M2(41,119) = M1(7,61); M2(41,120) = M1(7,62); M2(41,121) = M1(7,63); M2(41,127) = M1(7,64); M2(41,128) = M1(7,65); M2(41,129) = M1(7,66); M2(41,130) = M1(7,67); M2(41,131) = M1(7,68); M2(41,132) = M1(7,69); M2(41,133) = M1(7,70); M2(41,134) = M1(7,71); M2(41,135) = M1(7,72); M2(41,136) = M1(7,73); M2(41,141) = M1(7,74); M2(41,142) = M1(7,75); M2(41,143) = M1(7,76); M2(41,144) = M1(7,77); M2(41,145) = M1(7,78); M2(41,146) = M1(7,79); M2(41,150) = M1(7,80); M2(41,151) = M1(7,81); M2(41,152) = M1(7,82); M2(41,155) = M1(7,83); 
M2(42,53) = M1(8,8); M2(42,60) = M1(8,15); M2(42,61) = M1(8,16); M2(42,62) = M1(8,17); M2(42,63) = M1(8,18); M2(42,64) = M1(8,19); M2(42,65) = M1(8,20); M2(42,66) = M1(8,21); M2(42,67) = M1(8,22); M2(42,68) = M1(8,23); M2(42,69) = M1(8,24); M2(42,70) = M1(8,25); M2(42,71) = M1(8,26); M2(42,79) = M1(8,28); M2(42,80) = M1(8,29); M2(42,81) = M1(8,30); M2(42,82) = M1(8,31); M2(42,83) = M1(8,32); M2(42,84) = M1(8,33); M2(42,85) = M1(8,34); M2(42,86) = M1(8,35); M2(42,87) = M1(8,36); M2(42,88) = M1(8,37); M2(42,89) = M1(8,38); M2(42,90) = M1(8,39); M2(42,91) = M1(8,40); M2(42,92) = M1(8,41); M2(42,93) = M1(8,27); M2(42,94) = M1(8,42); M2(42,95) = M1(8,43); M2(42,96) = M1(8,44); M2(42,97) = M1(8,45); M2(42,98) = M1(8,46); M2(42,99) = M1(8,47); M2(42,100) = M1(8,48); M2(42,107) = M1(8,49); M2(42,108) = M1(8,50); M2(42,109) = M1(8,51); M2(42,110) = M1(8,52); M2(42,111) = M1(8,53); M2(42,112) = M1(8,54); M2(42,113) = M1(8,55); M2(42,114) = M1(8,56); M2(42,115) = M1(8,57); M2(42,116) = M1(8,58); M2(42,117) = M1(8,59); M2(42,118) = M1(8,60); M2(42,119) = M1(8,61); M2(42,120) = M1(8,62); M2(42,121) = M1(8,63); M2(42,127) = M1(8,64); M2(42,128) = M1(8,65); M2(42,129) = M1(8,66); M2(42,130) = M1(8,67); M2(42,131) = M1(8,68); M2(42,132) = M1(8,69); M2(42,133) = M1(8,70); M2(42,134) = M1(8,71); M2(42,135) = M1(8,72); M2(42,136) = M1(8,73); M2(42,141) = M1(8,74); M2(42,142) = M1(8,75); M2(42,143) = M1(8,76); M2(42,144) = M1(8,77); M2(42,145) = M1(8,78); M2(42,146) = M1(8,79); M2(42,150) = M1(8,80); M2(42,151) = M1(8,81); M2(42,152) = M1(8,82); M2(42,155) = M1(8,83); 
M2(43,54) = M1(9,9); M2(43,60) = M1(9,15); M2(43,61) = M1(9,16); M2(43,62) = M1(9,17); M2(43,63) = M1(9,18); M2(43,64) = M1(9,19); M2(43,65) = M1(9,20); M2(43,66) = M1(9,21); M2(43,67) = M1(9,22); M2(43,68) = M1(9,23); M2(43,69) = M1(9,24); M2(43,70) = M1(9,25); M2(43,71) = M1(9,26); M2(43,79) = M1(9,28); M2(43,80) = M1(9,29); M2(43,81) = M1(9,30); M2(43,82) = M1(9,31); M2(43,83) = M1(9,32); M2(43,84) = M1(9,33); M2(43,85) = M1(9,34); M2(43,86) = M1(9,35); M2(43,87) = M1(9,36); M2(43,88) = M1(9,37); M2(43,89) = M1(9,38); M2(43,90) = M1(9,39); M2(43,91) = M1(9,40); M2(43,92) = M1(9,41); M2(43,93) = M1(9,27); M2(43,94) = M1(9,42); M2(43,95) = M1(9,43); M2(43,96) = M1(9,44); M2(43,97) = M1(9,45); M2(43,98) = M1(9,46); M2(43,99) = M1(9,47); M2(43,100) = M1(9,48); M2(43,107) = M1(9,49); M2(43,108) = M1(9,50); M2(43,109) = M1(9,51); M2(43,110) = M1(9,52); M2(43,111) = M1(9,53); M2(43,112) = M1(9,54); M2(43,113) = M1(9,55); M2(43,114) = M1(9,56); M2(43,115) = M1(9,57); M2(43,116) = M1(9,58); M2(43,117) = M1(9,59); M2(43,118) = M1(9,60); M2(43,119) = M1(9,61); M2(43,120) = M1(9,62); M2(43,121) = M1(9,63); M2(43,127) = M1(9,64); M2(43,128) = M1(9,65); M2(43,129) = M1(9,66); M2(43,130) = M1(9,67); M2(43,131) = M1(9,68); M2(43,132) = M1(9,69); M2(43,133) = M1(9,70); M2(43,134) = M1(9,71); M2(43,135) = M1(9,72); M2(43,136) = M1(9,73); M2(43,141) = M1(9,74); M2(43,142) = M1(9,75); M2(43,143) = M1(9,76); M2(43,144) = M1(9,77); M2(43,145) = M1(9,78); M2(43,146) = M1(9,79); M2(43,150) = M1(9,80); M2(43,151) = M1(9,81); M2(43,152) = M1(9,82); M2(43,155) = M1(9,83); 
M2(44,55) = M1(10,10); M2(44,60) = M1(10,15); M2(44,61) = M1(10,16); M2(44,62) = M1(10,17); M2(44,63) = M1(10,18); M2(44,64) = M1(10,19); M2(44,65) = M1(10,20); M2(44,66) = M1(10,21); M2(44,67) = M1(10,22); M2(44,68) = M1(10,23); M2(44,69) = M1(10,24); M2(44,70) = M1(10,25); M2(44,71) = M1(10,26); M2(44,79) = M1(10,28); M2(44,80) = M1(10,29); M2(44,81) = M1(10,30); M2(44,82) = M1(10,31); M2(44,83) = M1(10,32); M2(44,84) = M1(10,33); M2(44,85) = M1(10,34); M2(44,86) = M1(10,35); M2(44,87) = M1(10,36); M2(44,88) = M1(10,37); M2(44,89) = M1(10,38); M2(44,90) = M1(10,39); M2(44,91) = M1(10,40); M2(44,92) = M1(10,41); M2(44,93) = M1(10,27); M2(44,94) = M1(10,42); M2(44,95) = M1(10,43); M2(44,96) = M1(10,44); M2(44,97) = M1(10,45); M2(44,98) = M1(10,46); M2(44,99) = M1(10,47); M2(44,100) = M1(10,48); M2(44,107) = M1(10,49); M2(44,108) = M1(10,50); M2(44,109) = M1(10,51); M2(44,110) = M1(10,52); M2(44,111) = M1(10,53); M2(44,112) = M1(10,54); M2(44,113) = M1(10,55); M2(44,114) = M1(10,56); M2(44,115) = M1(10,57); M2(44,116) = M1(10,58); M2(44,117) = M1(10,59); M2(44,118) = M1(10,60); M2(44,119) = M1(10,61); M2(44,120) = M1(10,62); M2(44,121) = M1(10,63); M2(44,127) = M1(10,64); M2(44,128) = M1(10,65); M2(44,129) = M1(10,66); M2(44,130) = M1(10,67); M2(44,131) = M1(10,68); M2(44,132) = M1(10,69); M2(44,133) = M1(10,70); M2(44,134) = M1(10,71); M2(44,135) = M1(10,72); M2(44,136) = M1(10,73); M2(44,141) = M1(10,74); M2(44,142) = M1(10,75); M2(44,143) = M1(10,76); M2(44,144) = M1(10,77); M2(44,145) = M1(10,78); M2(44,146) = M1(10,79); M2(44,150) = M1(10,80); M2(44,151) = M1(10,81); M2(44,152) = M1(10,82); M2(44,155) = M1(10,83); 
M2(45,56) = M1(11,11); M2(45,60) = M1(11,15); M2(45,61) = M1(11,16); M2(45,62) = M1(11,17); M2(45,63) = M1(11,18); M2(45,64) = M1(11,19); M2(45,65) = M1(11,20); M2(45,66) = M1(11,21); M2(45,67) = M1(11,22); M2(45,68) = M1(11,23); M2(45,69) = M1(11,24); M2(45,70) = M1(11,25); M2(45,71) = M1(11,26); M2(45,79) = M1(11,28); M2(45,80) = M1(11,29); M2(45,81) = M1(11,30); M2(45,82) = M1(11,31); M2(45,83) = M1(11,32); M2(45,84) = M1(11,33); M2(45,85) = M1(11,34); M2(45,86) = M1(11,35); M2(45,87) = M1(11,36); M2(45,88) = M1(11,37); M2(45,89) = M1(11,38); M2(45,90) = M1(11,39); M2(45,91) = M1(11,40); M2(45,92) = M1(11,41); M2(45,93) = M1(11,27); M2(45,94) = M1(11,42); M2(45,95) = M1(11,43); M2(45,96) = M1(11,44); M2(45,97) = M1(11,45); M2(45,98) = M1(11,46); M2(45,99) = M1(11,47); M2(45,100) = M1(11,48); M2(45,107) = M1(11,49); M2(45,108) = M1(11,50); M2(45,109) = M1(11,51); M2(45,110) = M1(11,52); M2(45,111) = M1(11,53); M2(45,112) = M1(11,54); M2(45,113) = M1(11,55); M2(45,114) = M1(11,56); M2(45,115) = M1(11,57); M2(45,116) = M1(11,58); M2(45,117) = M1(11,59); M2(45,118) = M1(11,60); M2(45,119) = M1(11,61); M2(45,120) = M1(11,62); M2(45,121) = M1(11,63); M2(45,127) = M1(11,64); M2(45,128) = M1(11,65); M2(45,129) = M1(11,66); M2(45,130) = M1(11,67); M2(45,131) = M1(11,68); M2(45,132) = M1(11,69); M2(45,133) = M1(11,70); M2(45,134) = M1(11,71); M2(45,135) = M1(11,72); M2(45,136) = M1(11,73); M2(45,141) = M1(11,74); M2(45,142) = M1(11,75); M2(45,143) = M1(11,76); M2(45,144) = M1(11,77); M2(45,145) = M1(11,78); M2(45,146) = M1(11,79); M2(45,150) = M1(11,80); M2(45,151) = M1(11,81); M2(45,152) = M1(11,82); M2(45,155) = M1(11,83); 
M2(46,57) = M1(12,12); M2(46,60) = M1(12,15); M2(46,61) = M1(12,16); M2(46,62) = M1(12,17); M2(46,63) = M1(12,18); M2(46,64) = M1(12,19); M2(46,65) = M1(12,20); M2(46,66) = M1(12,21); M2(46,67) = M1(12,22); M2(46,68) = M1(12,23); M2(46,69) = M1(12,24); M2(46,70) = M1(12,25); M2(46,71) = M1(12,26); M2(46,79) = M1(12,28); M2(46,80) = M1(12,29); M2(46,81) = M1(12,30); M2(46,82) = M1(12,31); M2(46,83) = M1(12,32); M2(46,84) = M1(12,33); M2(46,85) = M1(12,34); M2(46,86) = M1(12,35); M2(46,87) = M1(12,36); M2(46,88) = M1(12,37); M2(46,89) = M1(12,38); M2(46,90) = M1(12,39); M2(46,91) = M1(12,40); M2(46,92) = M1(12,41); M2(46,93) = M1(12,27); M2(46,94) = M1(12,42); M2(46,95) = M1(12,43); M2(46,96) = M1(12,44); M2(46,97) = M1(12,45); M2(46,98) = M1(12,46); M2(46,99) = M1(12,47); M2(46,100) = M1(12,48); M2(46,107) = M1(12,49); M2(46,108) = M1(12,50); M2(46,109) = M1(12,51); M2(46,110) = M1(12,52); M2(46,111) = M1(12,53); M2(46,112) = M1(12,54); M2(46,113) = M1(12,55); M2(46,114) = M1(12,56); M2(46,115) = M1(12,57); M2(46,116) = M1(12,58); M2(46,117) = M1(12,59); M2(46,118) = M1(12,60); M2(46,119) = M1(12,61); M2(46,120) = M1(12,62); M2(46,121) = M1(12,63); M2(46,127) = M1(12,64); M2(46,128) = M1(12,65); M2(46,129) = M1(12,66); M2(46,130) = M1(12,67); M2(46,131) = M1(12,68); M2(46,132) = M1(12,69); M2(46,133) = M1(12,70); M2(46,134) = M1(12,71); M2(46,135) = M1(12,72); M2(46,136) = M1(12,73); M2(46,141) = M1(12,74); M2(46,142) = M1(12,75); M2(46,143) = M1(12,76); M2(46,144) = M1(12,77); M2(46,145) = M1(12,78); M2(46,146) = M1(12,79); M2(46,150) = M1(12,80); M2(46,151) = M1(12,81); M2(46,152) = M1(12,82); M2(46,155) = M1(12,83); 
M2(47,58) = M1(13,13); M2(47,60) = M1(13,15); M2(47,61) = M1(13,16); M2(47,62) = M1(13,17); M2(47,63) = M1(13,18); M2(47,64) = M1(13,19); M2(47,65) = M1(13,20); M2(47,66) = M1(13,21); M2(47,67) = M1(13,22); M2(47,68) = M1(13,23); M2(47,69) = M1(13,24); M2(47,70) = M1(13,25); M2(47,71) = M1(13,26); M2(47,79) = M1(13,28); M2(47,80) = M1(13,29); M2(47,81) = M1(13,30); M2(47,82) = M1(13,31); M2(47,83) = M1(13,32); M2(47,84) = M1(13,33); M2(47,85) = M1(13,34); M2(47,86) = M1(13,35); M2(47,87) = M1(13,36); M2(47,88) = M1(13,37); M2(47,89) = M1(13,38); M2(47,90) = M1(13,39); M2(47,91) = M1(13,40); M2(47,92) = M1(13,41); M2(47,93) = M1(13,27); M2(47,94) = M1(13,42); M2(47,95) = M1(13,43); M2(47,96) = M1(13,44); M2(47,97) = M1(13,45); M2(47,98) = M1(13,46); M2(47,99) = M1(13,47); M2(47,100) = M1(13,48); M2(47,107) = M1(13,49); M2(47,108) = M1(13,50); M2(47,109) = M1(13,51); M2(47,110) = M1(13,52); M2(47,111) = M1(13,53); M2(47,112) = M1(13,54); M2(47,113) = M1(13,55); M2(47,114) = M1(13,56); M2(47,115) = M1(13,57); M2(47,116) = M1(13,58); M2(47,117) = M1(13,59); M2(47,118) = M1(13,60); M2(47,119) = M1(13,61); M2(47,120) = M1(13,62); M2(47,121) = M1(13,63); M2(47,127) = M1(13,64); M2(47,128) = M1(13,65); M2(47,129) = M1(13,66); M2(47,130) = M1(13,67); M2(47,131) = M1(13,68); M2(47,132) = M1(13,69); M2(47,133) = M1(13,70); M2(47,134) = M1(13,71); M2(47,135) = M1(13,72); M2(47,136) = M1(13,73); M2(47,141) = M1(13,74); M2(47,142) = M1(13,75); M2(47,143) = M1(13,76); M2(47,144) = M1(13,77); M2(47,145) = M1(13,78); M2(47,146) = M1(13,79); M2(47,150) = M1(13,80); M2(47,151) = M1(13,81); M2(47,152) = M1(13,82); M2(47,155) = M1(13,83); 
M2(48,59) = M1(14,14); M2(48,60) = M1(14,15); M2(48,61) = M1(14,16); M2(48,62) = M1(14,17); M2(48,63) = M1(14,18); M2(48,64) = M1(14,19); M2(48,65) = M1(14,20); M2(48,66) = M1(14,21); M2(48,67) = M1(14,22); M2(48,68) = M1(14,23); M2(48,69) = M1(14,24); M2(48,70) = M1(14,25); M2(48,71) = M1(14,26); M2(48,79) = M1(14,28); M2(48,80) = M1(14,29); M2(48,81) = M1(14,30); M2(48,82) = M1(14,31); M2(48,83) = M1(14,32); M2(48,84) = M1(14,33); M2(48,85) = M1(14,34); M2(48,86) = M1(14,35); M2(48,87) = M1(14,36); M2(48,88) = M1(14,37); M2(48,89) = M1(14,38); M2(48,90) = M1(14,39); M2(48,91) = M1(14,40); M2(48,92) = M1(14,41); M2(48,93) = M1(14,27); M2(48,94) = M1(14,42); M2(48,95) = M1(14,43); M2(48,96) = M1(14,44); M2(48,97) = M1(14,45); M2(48,98) = M1(14,46); M2(48,99) = M1(14,47); M2(48,100) = M1(14,48); M2(48,107) = M1(14,49); M2(48,108) = M1(14,50); M2(48,109) = M1(14,51); M2(48,110) = M1(14,52); M2(48,111) = M1(14,53); M2(48,112) = M1(14,54); M2(48,113) = M1(14,55); M2(48,114) = M1(14,56); M2(48,115) = M1(14,57); M2(48,116) = M1(14,58); M2(48,117) = M1(14,59); M2(48,118) = M1(14,60); M2(48,119) = M1(14,61); M2(48,120) = M1(14,62); M2(48,121) = M1(14,63); M2(48,127) = M1(14,64); M2(48,128) = M1(14,65); M2(48,129) = M1(14,66); M2(48,130) = M1(14,67); M2(48,131) = M1(14,68); M2(48,132) = M1(14,69); M2(48,133) = M1(14,70); M2(48,134) = M1(14,71); M2(48,135) = M1(14,72); M2(48,136) = M1(14,73); M2(48,141) = M1(14,74); M2(48,142) = M1(14,75); M2(48,143) = M1(14,76); M2(48,144) = M1(14,77); M2(48,145) = M1(14,78); M2(48,146) = M1(14,79); M2(48,150) = M1(14,80); M2(48,151) = M1(14,81); M2(48,152) = M1(14,82); M2(48,155) = M1(14,83); 
M2(49,39) = M1(1,1); M2(49,55) = M1(1,15); M2(49,56) = M1(1,16); M2(49,57) = M1(1,17); M2(49,59) = M1(1,18); M2(49,60) = M1(1,19); M2(49,61) = M1(1,20); M2(49,62) = M1(1,21); M2(49,64) = M1(1,22); M2(49,65) = M1(1,23); M2(49,66) = M1(1,24); M2(49,68) = M1(1,25); M2(49,69) = M1(1,26); M2(49,71) = M1(1,27); M2(49,73) = M1(1,28); M2(49,74) = M1(1,29); M2(49,75) = M1(1,30); M2(49,76) = M1(1,31); M2(49,77) = M1(1,32); M2(49,78) = M1(1,33); M2(49,80) = M1(1,34); M2(49,81) = M1(1,35); M2(49,82) = M1(1,36); M2(49,83) = M1(1,37); M2(49,84) = M1(1,38); M2(49,86) = M1(1,39); M2(49,87) = M1(1,40); M2(49,88) = M1(1,41); M2(49,89) = M1(1,42); M2(49,91) = M1(1,43); M2(49,92) = M1(1,44); M2(49,94) = M1(1,45); M2(49,96) = M1(1,46); M2(49,97) = M1(1,47); M2(49,99) = M1(1,48); M2(49,102) = M1(1,49); M2(49,103) = M1(1,50); M2(49,104) = M1(1,51); M2(49,105) = M1(1,52); M2(49,106) = M1(1,53); M2(49,108) = M1(1,54); M2(49,109) = M1(1,55); M2(49,110) = M1(1,56); M2(49,111) = M1(1,57); M2(49,113) = M1(1,58); M2(49,114) = M1(1,59); M2(49,115) = M1(1,60); M2(49,117) = M1(1,61); M2(49,118) = M1(1,62); M2(49,120) = M1(1,63); M2(49,123) = M1(1,64); M2(49,124) = M1(1,65); M2(49,125) = M1(1,66); M2(49,126) = M1(1,67); M2(49,128) = M1(1,68); M2(49,129) = M1(1,69); M2(49,130) = M1(1,70); M2(49,132) = M1(1,71); M2(49,133) = M1(1,72); M2(49,135) = M1(1,73); M2(49,138) = M1(1,74); M2(49,139) = M1(1,75); M2(49,140) = M1(1,76); M2(49,142) = M1(1,77); M2(49,143) = M1(1,78); M2(49,145) = M1(1,79); M2(49,148) = M1(1,80); M2(49,149) = M1(1,81); M2(49,151) = M1(1,82); M2(49,154) = M1(1,83); 
M2(50,40) = M1(2,2); M2(50,55) = M1(2,15); M2(50,56) = M1(2,16); M2(50,57) = M1(2,17); M2(50,59) = M1(2,18); M2(50,60) = M1(2,19); M2(50,61) = M1(2,20); M2(50,62) = M1(2,21); M2(50,64) = M1(2,22); M2(50,65) = M1(2,23); M2(50,66) = M1(2,24); M2(50,68) = M1(2,25); M2(50,69) = M1(2,26); M2(50,71) = M1(2,27); M2(50,73) = M1(2,28); M2(50,74) = M1(2,29); M2(50,75) = M1(2,30); M2(50,76) = M1(2,31); M2(50,77) = M1(2,32); M2(50,78) = M1(2,33); M2(50,80) = M1(2,34); M2(50,81) = M1(2,35); M2(50,82) = M1(2,36); M2(50,83) = M1(2,37); M2(50,84) = M1(2,38); M2(50,86) = M1(2,39); M2(50,87) = M1(2,40); M2(50,88) = M1(2,41); M2(50,89) = M1(2,42); M2(50,91) = M1(2,43); M2(50,92) = M1(2,44); M2(50,94) = M1(2,45); M2(50,96) = M1(2,46); M2(50,97) = M1(2,47); M2(50,99) = M1(2,48); M2(50,102) = M1(2,49); M2(50,103) = M1(2,50); M2(50,104) = M1(2,51); M2(50,105) = M1(2,52); M2(50,106) = M1(2,53); M2(50,108) = M1(2,54); M2(50,109) = M1(2,55); M2(50,110) = M1(2,56); M2(50,111) = M1(2,57); M2(50,113) = M1(2,58); M2(50,114) = M1(2,59); M2(50,115) = M1(2,60); M2(50,117) = M1(2,61); M2(50,118) = M1(2,62); M2(50,120) = M1(2,63); M2(50,123) = M1(2,64); M2(50,124) = M1(2,65); M2(50,125) = M1(2,66); M2(50,126) = M1(2,67); M2(50,128) = M1(2,68); M2(50,129) = M1(2,69); M2(50,130) = M1(2,70); M2(50,132) = M1(2,71); M2(50,133) = M1(2,72); M2(50,135) = M1(2,73); M2(50,138) = M1(2,74); M2(50,139) = M1(2,75); M2(50,140) = M1(2,76); M2(50,142) = M1(2,77); M2(50,143) = M1(2,78); M2(50,145) = M1(2,79); M2(50,148) = M1(2,80); M2(50,149) = M1(2,81); M2(50,151) = M1(2,82); M2(50,154) = M1(2,83); 
M2(51,41) = M1(3,3); M2(51,55) = M1(3,15); M2(51,56) = M1(3,16); M2(51,57) = M1(3,17); M2(51,59) = M1(3,18); M2(51,60) = M1(3,19); M2(51,61) = M1(3,20); M2(51,62) = M1(3,21); M2(51,64) = M1(3,22); M2(51,65) = M1(3,23); M2(51,66) = M1(3,24); M2(51,68) = M1(3,25); M2(51,69) = M1(3,26); M2(51,71) = M1(3,27); M2(51,73) = M1(3,28); M2(51,74) = M1(3,29); M2(51,75) = M1(3,30); M2(51,76) = M1(3,31); M2(51,77) = M1(3,32); M2(51,78) = M1(3,33); M2(51,80) = M1(3,34); M2(51,81) = M1(3,35); M2(51,82) = M1(3,36); M2(51,83) = M1(3,37); M2(51,84) = M1(3,38); M2(51,86) = M1(3,39); M2(51,87) = M1(3,40); M2(51,88) = M1(3,41); M2(51,89) = M1(3,42); M2(51,91) = M1(3,43); M2(51,92) = M1(3,44); M2(51,94) = M1(3,45); M2(51,96) = M1(3,46); M2(51,97) = M1(3,47); M2(51,99) = M1(3,48); M2(51,102) = M1(3,49); M2(51,103) = M1(3,50); M2(51,104) = M1(3,51); M2(51,105) = M1(3,52); M2(51,106) = M1(3,53); M2(51,108) = M1(3,54); M2(51,109) = M1(3,55); M2(51,110) = M1(3,56); M2(51,111) = M1(3,57); M2(51,113) = M1(3,58); M2(51,114) = M1(3,59); M2(51,115) = M1(3,60); M2(51,117) = M1(3,61); M2(51,118) = M1(3,62); M2(51,120) = M1(3,63); M2(51,123) = M1(3,64); M2(51,124) = M1(3,65); M2(51,125) = M1(3,66); M2(51,126) = M1(3,67); M2(51,128) = M1(3,68); M2(51,129) = M1(3,69); M2(51,130) = M1(3,70); M2(51,132) = M1(3,71); M2(51,133) = M1(3,72); M2(51,135) = M1(3,73); M2(51,138) = M1(3,74); M2(51,139) = M1(3,75); M2(51,140) = M1(3,76); M2(51,142) = M1(3,77); M2(51,143) = M1(3,78); M2(51,145) = M1(3,79); M2(51,148) = M1(3,80); M2(51,149) = M1(3,81); M2(51,151) = M1(3,82); M2(51,154) = M1(3,83); 
M2(52,42) = M1(4,4); M2(52,55) = M1(4,15); M2(52,56) = M1(4,16); M2(52,57) = M1(4,17); M2(52,59) = M1(4,18); M2(52,60) = M1(4,19); M2(52,61) = M1(4,20); M2(52,62) = M1(4,21); M2(52,64) = M1(4,22); M2(52,65) = M1(4,23); M2(52,66) = M1(4,24); M2(52,68) = M1(4,25); M2(52,69) = M1(4,26); M2(52,71) = M1(4,27); M2(52,73) = M1(4,28); M2(52,74) = M1(4,29); M2(52,75) = M1(4,30); M2(52,76) = M1(4,31); M2(52,77) = M1(4,32); M2(52,78) = M1(4,33); M2(52,80) = M1(4,34); M2(52,81) = M1(4,35); M2(52,82) = M1(4,36); M2(52,83) = M1(4,37); M2(52,84) = M1(4,38); M2(52,86) = M1(4,39); M2(52,87) = M1(4,40); M2(52,88) = M1(4,41); M2(52,89) = M1(4,42); M2(52,91) = M1(4,43); M2(52,92) = M1(4,44); M2(52,94) = M1(4,45); M2(52,96) = M1(4,46); M2(52,97) = M1(4,47); M2(52,99) = M1(4,48); M2(52,102) = M1(4,49); M2(52,103) = M1(4,50); M2(52,104) = M1(4,51); M2(52,105) = M1(4,52); M2(52,106) = M1(4,53); M2(52,108) = M1(4,54); M2(52,109) = M1(4,55); M2(52,110) = M1(4,56); M2(52,111) = M1(4,57); M2(52,113) = M1(4,58); M2(52,114) = M1(4,59); M2(52,115) = M1(4,60); M2(52,117) = M1(4,61); M2(52,118) = M1(4,62); M2(52,120) = M1(4,63); M2(52,123) = M1(4,64); M2(52,124) = M1(4,65); M2(52,125) = M1(4,66); M2(52,126) = M1(4,67); M2(52,128) = M1(4,68); M2(52,129) = M1(4,69); M2(52,130) = M1(4,70); M2(52,132) = M1(4,71); M2(52,133) = M1(4,72); M2(52,135) = M1(4,73); M2(52,138) = M1(4,74); M2(52,139) = M1(4,75); M2(52,140) = M1(4,76); M2(52,142) = M1(4,77); M2(52,143) = M1(4,78); M2(52,145) = M1(4,79); M2(52,148) = M1(4,80); M2(52,149) = M1(4,81); M2(52,151) = M1(4,82); M2(52,154) = M1(4,83); 
M2(53,43) = M1(5,5); M2(53,55) = M1(5,15); M2(53,56) = M1(5,16); M2(53,57) = M1(5,17); M2(53,59) = M1(5,18); M2(53,60) = M1(5,19); M2(53,61) = M1(5,20); M2(53,62) = M1(5,21); M2(53,64) = M1(5,22); M2(53,65) = M1(5,23); M2(53,66) = M1(5,24); M2(53,68) = M1(5,25); M2(53,69) = M1(5,26); M2(53,71) = M1(5,27); M2(53,73) = M1(5,28); M2(53,74) = M1(5,29); M2(53,75) = M1(5,30); M2(53,76) = M1(5,31); M2(53,77) = M1(5,32); M2(53,78) = M1(5,33); M2(53,80) = M1(5,34); M2(53,81) = M1(5,35); M2(53,82) = M1(5,36); M2(53,83) = M1(5,37); M2(53,84) = M1(5,38); M2(53,86) = M1(5,39); M2(53,87) = M1(5,40); M2(53,88) = M1(5,41); M2(53,89) = M1(5,42); M2(53,91) = M1(5,43); M2(53,92) = M1(5,44); M2(53,94) = M1(5,45); M2(53,96) = M1(5,46); M2(53,97) = M1(5,47); M2(53,99) = M1(5,48); M2(53,102) = M1(5,49); M2(53,103) = M1(5,50); M2(53,104) = M1(5,51); M2(53,105) = M1(5,52); M2(53,106) = M1(5,53); M2(53,108) = M1(5,54); M2(53,109) = M1(5,55); M2(53,110) = M1(5,56); M2(53,111) = M1(5,57); M2(53,113) = M1(5,58); M2(53,114) = M1(5,59); M2(53,115) = M1(5,60); M2(53,117) = M1(5,61); M2(53,118) = M1(5,62); M2(53,120) = M1(5,63); M2(53,123) = M1(5,64); M2(53,124) = M1(5,65); M2(53,125) = M1(5,66); M2(53,126) = M1(5,67); M2(53,128) = M1(5,68); M2(53,129) = M1(5,69); M2(53,130) = M1(5,70); M2(53,132) = M1(5,71); M2(53,133) = M1(5,72); M2(53,135) = M1(5,73); M2(53,138) = M1(5,74); M2(53,139) = M1(5,75); M2(53,140) = M1(5,76); M2(53,142) = M1(5,77); M2(53,143) = M1(5,78); M2(53,145) = M1(5,79); M2(53,148) = M1(5,80); M2(53,149) = M1(5,81); M2(53,151) = M1(5,82); M2(53,154) = M1(5,83); 
M2(54,44) = M1(6,6); M2(54,55) = M1(6,15); M2(54,56) = M1(6,16); M2(54,57) = M1(6,17); M2(54,59) = M1(6,18); M2(54,60) = M1(6,19); M2(54,61) = M1(6,20); M2(54,62) = M1(6,21); M2(54,64) = M1(6,22); M2(54,65) = M1(6,23); M2(54,66) = M1(6,24); M2(54,68) = M1(6,25); M2(54,69) = M1(6,26); M2(54,71) = M1(6,27); M2(54,73) = M1(6,28); M2(54,74) = M1(6,29); M2(54,75) = M1(6,30); M2(54,76) = M1(6,31); M2(54,77) = M1(6,32); M2(54,78) = M1(6,33); M2(54,80) = M1(6,34); M2(54,81) = M1(6,35); M2(54,82) = M1(6,36); M2(54,83) = M1(6,37); M2(54,84) = M1(6,38); M2(54,86) = M1(6,39); M2(54,87) = M1(6,40); M2(54,88) = M1(6,41); M2(54,89) = M1(6,42); M2(54,91) = M1(6,43); M2(54,92) = M1(6,44); M2(54,94) = M1(6,45); M2(54,96) = M1(6,46); M2(54,97) = M1(6,47); M2(54,99) = M1(6,48); M2(54,102) = M1(6,49); M2(54,103) = M1(6,50); M2(54,104) = M1(6,51); M2(54,105) = M1(6,52); M2(54,106) = M1(6,53); M2(54,108) = M1(6,54); M2(54,109) = M1(6,55); M2(54,110) = M1(6,56); M2(54,111) = M1(6,57); M2(54,113) = M1(6,58); M2(54,114) = M1(6,59); M2(54,115) = M1(6,60); M2(54,117) = M1(6,61); M2(54,118) = M1(6,62); M2(54,120) = M1(6,63); M2(54,123) = M1(6,64); M2(54,124) = M1(6,65); M2(54,125) = M1(6,66); M2(54,126) = M1(6,67); M2(54,128) = M1(6,68); M2(54,129) = M1(6,69); M2(54,130) = M1(6,70); M2(54,132) = M1(6,71); M2(54,133) = M1(6,72); M2(54,135) = M1(6,73); M2(54,138) = M1(6,74); M2(54,139) = M1(6,75); M2(54,140) = M1(6,76); M2(54,142) = M1(6,77); M2(54,143) = M1(6,78); M2(54,145) = M1(6,79); M2(54,148) = M1(6,80); M2(54,149) = M1(6,81); M2(54,151) = M1(6,82); M2(54,154) = M1(6,83); 
M2(55,46) = M1(7,7); M2(55,55) = M1(7,15); M2(55,56) = M1(7,16); M2(55,57) = M1(7,17); M2(55,59) = M1(7,18); M2(55,60) = M1(7,19); M2(55,61) = M1(7,20); M2(55,62) = M1(7,21); M2(55,64) = M1(7,22); M2(55,65) = M1(7,23); M2(55,66) = M1(7,24); M2(55,68) = M1(7,25); M2(55,69) = M1(7,26); M2(55,71) = M1(7,27); M2(55,73) = M1(7,28); M2(55,74) = M1(7,29); M2(55,75) = M1(7,30); M2(55,76) = M1(7,31); M2(55,77) = M1(7,32); M2(55,78) = M1(7,33); M2(55,80) = M1(7,34); M2(55,81) = M1(7,35); M2(55,82) = M1(7,36); M2(55,83) = M1(7,37); M2(55,84) = M1(7,38); M2(55,86) = M1(7,39); M2(55,87) = M1(7,40); M2(55,88) = M1(7,41); M2(55,89) = M1(7,42); M2(55,91) = M1(7,43); M2(55,92) = M1(7,44); M2(55,94) = M1(7,45); M2(55,96) = M1(7,46); M2(55,97) = M1(7,47); M2(55,99) = M1(7,48); M2(55,102) = M1(7,49); M2(55,103) = M1(7,50); M2(55,104) = M1(7,51); M2(55,105) = M1(7,52); M2(55,106) = M1(7,53); M2(55,108) = M1(7,54); M2(55,109) = M1(7,55); M2(55,110) = M1(7,56); M2(55,111) = M1(7,57); M2(55,113) = M1(7,58); M2(55,114) = M1(7,59); M2(55,115) = M1(7,60); M2(55,117) = M1(7,61); M2(55,118) = M1(7,62); M2(55,120) = M1(7,63); M2(55,123) = M1(7,64); M2(55,124) = M1(7,65); M2(55,125) = M1(7,66); M2(55,126) = M1(7,67); M2(55,128) = M1(7,68); M2(55,129) = M1(7,69); M2(55,130) = M1(7,70); M2(55,132) = M1(7,71); M2(55,133) = M1(7,72); M2(55,135) = M1(7,73); M2(55,138) = M1(7,74); M2(55,139) = M1(7,75); M2(55,140) = M1(7,76); M2(55,142) = M1(7,77); M2(55,143) = M1(7,78); M2(55,145) = M1(7,79); M2(55,148) = M1(7,80); M2(55,149) = M1(7,81); M2(55,151) = M1(7,82); M2(55,154) = M1(7,83); 
M2(56,47) = M1(8,8); M2(56,55) = M1(8,15); M2(56,56) = M1(8,16); M2(56,57) = M1(8,17); M2(56,59) = M1(8,18); M2(56,60) = M1(8,19); M2(56,61) = M1(8,20); M2(56,62) = M1(8,21); M2(56,64) = M1(8,22); M2(56,65) = M1(8,23); M2(56,66) = M1(8,24); M2(56,68) = M1(8,25); M2(56,69) = M1(8,26); M2(56,71) = M1(8,27); M2(56,73) = M1(8,28); M2(56,74) = M1(8,29); M2(56,75) = M1(8,30); M2(56,76) = M1(8,31); M2(56,77) = M1(8,32); M2(56,78) = M1(8,33); M2(56,80) = M1(8,34); M2(56,81) = M1(8,35); M2(56,82) = M1(8,36); M2(56,83) = M1(8,37); M2(56,84) = M1(8,38); M2(56,86) = M1(8,39); M2(56,87) = M1(8,40); M2(56,88) = M1(8,41); M2(56,89) = M1(8,42); M2(56,91) = M1(8,43); M2(56,92) = M1(8,44); M2(56,94) = M1(8,45); M2(56,96) = M1(8,46); M2(56,97) = M1(8,47); M2(56,99) = M1(8,48); M2(56,102) = M1(8,49); M2(56,103) = M1(8,50); M2(56,104) = M1(8,51); M2(56,105) = M1(8,52); M2(56,106) = M1(8,53); M2(56,108) = M1(8,54); M2(56,109) = M1(8,55); M2(56,110) = M1(8,56); M2(56,111) = M1(8,57); M2(56,113) = M1(8,58); M2(56,114) = M1(8,59); M2(56,115) = M1(8,60); M2(56,117) = M1(8,61); M2(56,118) = M1(8,62); M2(56,120) = M1(8,63); M2(56,123) = M1(8,64); M2(56,124) = M1(8,65); M2(56,125) = M1(8,66); M2(56,126) = M1(8,67); M2(56,128) = M1(8,68); M2(56,129) = M1(8,69); M2(56,130) = M1(8,70); M2(56,132) = M1(8,71); M2(56,133) = M1(8,72); M2(56,135) = M1(8,73); M2(56,138) = M1(8,74); M2(56,139) = M1(8,75); M2(56,140) = M1(8,76); M2(56,142) = M1(8,77); M2(56,143) = M1(8,78); M2(56,145) = M1(8,79); M2(56,148) = M1(8,80); M2(56,149) = M1(8,81); M2(56,151) = M1(8,82); M2(56,154) = M1(8,83); 
M2(57,48) = M1(9,9); M2(57,55) = M1(9,15); M2(57,56) = M1(9,16); M2(57,57) = M1(9,17); M2(57,59) = M1(9,18); M2(57,60) = M1(9,19); M2(57,61) = M1(9,20); M2(57,62) = M1(9,21); M2(57,64) = M1(9,22); M2(57,65) = M1(9,23); M2(57,66) = M1(9,24); M2(57,68) = M1(9,25); M2(57,69) = M1(9,26); M2(57,71) = M1(9,27); M2(57,73) = M1(9,28); M2(57,74) = M1(9,29); M2(57,75) = M1(9,30); M2(57,76) = M1(9,31); M2(57,77) = M1(9,32); M2(57,78) = M1(9,33); M2(57,80) = M1(9,34); M2(57,81) = M1(9,35); M2(57,82) = M1(9,36); M2(57,83) = M1(9,37); M2(57,84) = M1(9,38); M2(57,86) = M1(9,39); M2(57,87) = M1(9,40); M2(57,88) = M1(9,41); M2(57,89) = M1(9,42); M2(57,91) = M1(9,43); M2(57,92) = M1(9,44); M2(57,94) = M1(9,45); M2(57,96) = M1(9,46); M2(57,97) = M1(9,47); M2(57,99) = M1(9,48); M2(57,102) = M1(9,49); M2(57,103) = M1(9,50); M2(57,104) = M1(9,51); M2(57,105) = M1(9,52); M2(57,106) = M1(9,53); M2(57,108) = M1(9,54); M2(57,109) = M1(9,55); M2(57,110) = M1(9,56); M2(57,111) = M1(9,57); M2(57,113) = M1(9,58); M2(57,114) = M1(9,59); M2(57,115) = M1(9,60); M2(57,117) = M1(9,61); M2(57,118) = M1(9,62); M2(57,120) = M1(9,63); M2(57,123) = M1(9,64); M2(57,124) = M1(9,65); M2(57,125) = M1(9,66); M2(57,126) = M1(9,67); M2(57,128) = M1(9,68); M2(57,129) = M1(9,69); M2(57,130) = M1(9,70); M2(57,132) = M1(9,71); M2(57,133) = M1(9,72); M2(57,135) = M1(9,73); M2(57,138) = M1(9,74); M2(57,139) = M1(9,75); M2(57,140) = M1(9,76); M2(57,142) = M1(9,77); M2(57,143) = M1(9,78); M2(57,145) = M1(9,79); M2(57,148) = M1(9,80); M2(57,149) = M1(9,81); M2(57,151) = M1(9,82); M2(57,154) = M1(9,83); 
M2(58,49) = M1(10,10); M2(58,55) = M1(10,15); M2(58,56) = M1(10,16); M2(58,57) = M1(10,17); M2(58,59) = M1(10,18); M2(58,60) = M1(10,19); M2(58,61) = M1(10,20); M2(58,62) = M1(10,21); M2(58,64) = M1(10,22); M2(58,65) = M1(10,23); M2(58,66) = M1(10,24); M2(58,68) = M1(10,25); M2(58,69) = M1(10,26); M2(58,71) = M1(10,27); M2(58,73) = M1(10,28); M2(58,74) = M1(10,29); M2(58,75) = M1(10,30); M2(58,76) = M1(10,31); M2(58,77) = M1(10,32); M2(58,78) = M1(10,33); M2(58,80) = M1(10,34); M2(58,81) = M1(10,35); M2(58,82) = M1(10,36); M2(58,83) = M1(10,37); M2(58,84) = M1(10,38); M2(58,86) = M1(10,39); M2(58,87) = M1(10,40); M2(58,88) = M1(10,41); M2(58,89) = M1(10,42); M2(58,91) = M1(10,43); M2(58,92) = M1(10,44); M2(58,94) = M1(10,45); M2(58,96) = M1(10,46); M2(58,97) = M1(10,47); M2(58,99) = M1(10,48); M2(58,102) = M1(10,49); M2(58,103) = M1(10,50); M2(58,104) = M1(10,51); M2(58,105) = M1(10,52); M2(58,106) = M1(10,53); M2(58,108) = M1(10,54); M2(58,109) = M1(10,55); M2(58,110) = M1(10,56); M2(58,111) = M1(10,57); M2(58,113) = M1(10,58); M2(58,114) = M1(10,59); M2(58,115) = M1(10,60); M2(58,117) = M1(10,61); M2(58,118) = M1(10,62); M2(58,120) = M1(10,63); M2(58,123) = M1(10,64); M2(58,124) = M1(10,65); M2(58,125) = M1(10,66); M2(58,126) = M1(10,67); M2(58,128) = M1(10,68); M2(58,129) = M1(10,69); M2(58,130) = M1(10,70); M2(58,132) = M1(10,71); M2(58,133) = M1(10,72); M2(58,135) = M1(10,73); M2(58,138) = M1(10,74); M2(58,139) = M1(10,75); M2(58,140) = M1(10,76); M2(58,142) = M1(10,77); M2(58,143) = M1(10,78); M2(58,145) = M1(10,79); M2(58,148) = M1(10,80); M2(58,149) = M1(10,81); M2(58,151) = M1(10,82); M2(58,154) = M1(10,83); 
M2(59,50) = M1(11,11); M2(59,55) = M1(11,15); M2(59,56) = M1(11,16); M2(59,57) = M1(11,17); M2(59,59) = M1(11,18); M2(59,60) = M1(11,19); M2(59,61) = M1(11,20); M2(59,62) = M1(11,21); M2(59,64) = M1(11,22); M2(59,65) = M1(11,23); M2(59,66) = M1(11,24); M2(59,68) = M1(11,25); M2(59,69) = M1(11,26); M2(59,71) = M1(11,27); M2(59,73) = M1(11,28); M2(59,74) = M1(11,29); M2(59,75) = M1(11,30); M2(59,76) = M1(11,31); M2(59,77) = M1(11,32); M2(59,78) = M1(11,33); M2(59,80) = M1(11,34); M2(59,81) = M1(11,35); M2(59,82) = M1(11,36); M2(59,83) = M1(11,37); M2(59,84) = M1(11,38); M2(59,86) = M1(11,39); M2(59,87) = M1(11,40); M2(59,88) = M1(11,41); M2(59,89) = M1(11,42); M2(59,91) = M1(11,43); M2(59,92) = M1(11,44); M2(59,94) = M1(11,45); M2(59,96) = M1(11,46); M2(59,97) = M1(11,47); M2(59,99) = M1(11,48); M2(59,102) = M1(11,49); M2(59,103) = M1(11,50); M2(59,104) = M1(11,51); M2(59,105) = M1(11,52); M2(59,106) = M1(11,53); M2(59,108) = M1(11,54); M2(59,109) = M1(11,55); M2(59,110) = M1(11,56); M2(59,111) = M1(11,57); M2(59,113) = M1(11,58); M2(59,114) = M1(11,59); M2(59,115) = M1(11,60); M2(59,117) = M1(11,61); M2(59,118) = M1(11,62); M2(59,120) = M1(11,63); M2(59,123) = M1(11,64); M2(59,124) = M1(11,65); M2(59,125) = M1(11,66); M2(59,126) = M1(11,67); M2(59,128) = M1(11,68); M2(59,129) = M1(11,69); M2(59,130) = M1(11,70); M2(59,132) = M1(11,71); M2(59,133) = M1(11,72); M2(59,135) = M1(11,73); M2(59,138) = M1(11,74); M2(59,139) = M1(11,75); M2(59,140) = M1(11,76); M2(59,142) = M1(11,77); M2(59,143) = M1(11,78); M2(59,145) = M1(11,79); M2(59,148) = M1(11,80); M2(59,149) = M1(11,81); M2(59,151) = M1(11,82); M2(59,154) = M1(11,83); 
M2(60,51) = M1(12,12); M2(60,55) = M1(12,15); M2(60,56) = M1(12,16); M2(60,57) = M1(12,17); M2(60,59) = M1(12,18); M2(60,60) = M1(12,19); M2(60,61) = M1(12,20); M2(60,62) = M1(12,21); M2(60,64) = M1(12,22); M2(60,65) = M1(12,23); M2(60,66) = M1(12,24); M2(60,68) = M1(12,25); M2(60,69) = M1(12,26); M2(60,71) = M1(12,27); M2(60,73) = M1(12,28); M2(60,74) = M1(12,29); M2(60,75) = M1(12,30); M2(60,76) = M1(12,31); M2(60,77) = M1(12,32); M2(60,78) = M1(12,33); M2(60,80) = M1(12,34); M2(60,81) = M1(12,35); M2(60,82) = M1(12,36); M2(60,83) = M1(12,37); M2(60,84) = M1(12,38); M2(60,86) = M1(12,39); M2(60,87) = M1(12,40); M2(60,88) = M1(12,41); M2(60,89) = M1(12,42); M2(60,91) = M1(12,43); M2(60,92) = M1(12,44); M2(60,94) = M1(12,45); M2(60,96) = M1(12,46); M2(60,97) = M1(12,47); M2(60,99) = M1(12,48); M2(60,102) = M1(12,49); M2(60,103) = M1(12,50); M2(60,104) = M1(12,51); M2(60,105) = M1(12,52); M2(60,106) = M1(12,53); M2(60,108) = M1(12,54); M2(60,109) = M1(12,55); M2(60,110) = M1(12,56); M2(60,111) = M1(12,57); M2(60,113) = M1(12,58); M2(60,114) = M1(12,59); M2(60,115) = M1(12,60); M2(60,117) = M1(12,61); M2(60,118) = M1(12,62); M2(60,120) = M1(12,63); M2(60,123) = M1(12,64); M2(60,124) = M1(12,65); M2(60,125) = M1(12,66); M2(60,126) = M1(12,67); M2(60,128) = M1(12,68); M2(60,129) = M1(12,69); M2(60,130) = M1(12,70); M2(60,132) = M1(12,71); M2(60,133) = M1(12,72); M2(60,135) = M1(12,73); M2(60,138) = M1(12,74); M2(60,139) = M1(12,75); M2(60,140) = M1(12,76); M2(60,142) = M1(12,77); M2(60,143) = M1(12,78); M2(60,145) = M1(12,79); M2(60,148) = M1(12,80); M2(60,149) = M1(12,81); M2(60,151) = M1(12,82); M2(60,154) = M1(12,83); 
M2(61,53) = M1(13,13); M2(61,55) = M1(13,15); M2(61,56) = M1(13,16); M2(61,57) = M1(13,17); M2(61,59) = M1(13,18); M2(61,60) = M1(13,19); M2(61,61) = M1(13,20); M2(61,62) = M1(13,21); M2(61,64) = M1(13,22); M2(61,65) = M1(13,23); M2(61,66) = M1(13,24); M2(61,68) = M1(13,25); M2(61,69) = M1(13,26); M2(61,71) = M1(13,27); M2(61,73) = M1(13,28); M2(61,74) = M1(13,29); M2(61,75) = M1(13,30); M2(61,76) = M1(13,31); M2(61,77) = M1(13,32); M2(61,78) = M1(13,33); M2(61,80) = M1(13,34); M2(61,81) = M1(13,35); M2(61,82) = M1(13,36); M2(61,83) = M1(13,37); M2(61,84) = M1(13,38); M2(61,86) = M1(13,39); M2(61,87) = M1(13,40); M2(61,88) = M1(13,41); M2(61,89) = M1(13,42); M2(61,91) = M1(13,43); M2(61,92) = M1(13,44); M2(61,94) = M1(13,45); M2(61,96) = M1(13,46); M2(61,97) = M1(13,47); M2(61,99) = M1(13,48); M2(61,102) = M1(13,49); M2(61,103) = M1(13,50); M2(61,104) = M1(13,51); M2(61,105) = M1(13,52); M2(61,106) = M1(13,53); M2(61,108) = M1(13,54); M2(61,109) = M1(13,55); M2(61,110) = M1(13,56); M2(61,111) = M1(13,57); M2(61,113) = M1(13,58); M2(61,114) = M1(13,59); M2(61,115) = M1(13,60); M2(61,117) = M1(13,61); M2(61,118) = M1(13,62); M2(61,120) = M1(13,63); M2(61,123) = M1(13,64); M2(61,124) = M1(13,65); M2(61,125) = M1(13,66); M2(61,126) = M1(13,67); M2(61,128) = M1(13,68); M2(61,129) = M1(13,69); M2(61,130) = M1(13,70); M2(61,132) = M1(13,71); M2(61,133) = M1(13,72); M2(61,135) = M1(13,73); M2(61,138) = M1(13,74); M2(61,139) = M1(13,75); M2(61,140) = M1(13,76); M2(61,142) = M1(13,77); M2(61,143) = M1(13,78); M2(61,145) = M1(13,79); M2(61,148) = M1(13,80); M2(61,149) = M1(13,81); M2(61,151) = M1(13,82); M2(61,154) = M1(13,83); 
M2(62,54) = M1(14,14); M2(62,55) = M1(14,15); M2(62,56) = M1(14,16); M2(62,57) = M1(14,17); M2(62,59) = M1(14,18); M2(62,60) = M1(14,19); M2(62,61) = M1(14,20); M2(62,62) = M1(14,21); M2(62,64) = M1(14,22); M2(62,65) = M1(14,23); M2(62,66) = M1(14,24); M2(62,68) = M1(14,25); M2(62,69) = M1(14,26); M2(62,71) = M1(14,27); M2(62,73) = M1(14,28); M2(62,74) = M1(14,29); M2(62,75) = M1(14,30); M2(62,76) = M1(14,31); M2(62,77) = M1(14,32); M2(62,78) = M1(14,33); M2(62,80) = M1(14,34); M2(62,81) = M1(14,35); M2(62,82) = M1(14,36); M2(62,83) = M1(14,37); M2(62,84) = M1(14,38); M2(62,86) = M1(14,39); M2(62,87) = M1(14,40); M2(62,88) = M1(14,41); M2(62,89) = M1(14,42); M2(62,91) = M1(14,43); M2(62,92) = M1(14,44); M2(62,94) = M1(14,45); M2(62,96) = M1(14,46); M2(62,97) = M1(14,47); M2(62,99) = M1(14,48); M2(62,102) = M1(14,49); M2(62,103) = M1(14,50); M2(62,104) = M1(14,51); M2(62,105) = M1(14,52); M2(62,106) = M1(14,53); M2(62,108) = M1(14,54); M2(62,109) = M1(14,55); M2(62,110) = M1(14,56); M2(62,111) = M1(14,57); M2(62,113) = M1(14,58); M2(62,114) = M1(14,59); M2(62,115) = M1(14,60); M2(62,117) = M1(14,61); M2(62,118) = M1(14,62); M2(62,120) = M1(14,63); M2(62,123) = M1(14,64); M2(62,124) = M1(14,65); M2(62,125) = M1(14,66); M2(62,126) = M1(14,67); M2(62,128) = M1(14,68); M2(62,129) = M1(14,69); M2(62,130) = M1(14,70); M2(62,132) = M1(14,71); M2(62,133) = M1(14,72); M2(62,135) = M1(14,73); M2(62,138) = M1(14,74); M2(62,139) = M1(14,75); M2(62,140) = M1(14,76); M2(62,142) = M1(14,77); M2(62,143) = M1(14,78); M2(62,145) = M1(14,79); M2(62,148) = M1(14,80); M2(62,149) = M1(14,81); M2(62,151) = M1(14,82); M2(62,154) = M1(14,83); 
M2(63,37) = M1(0,0); M2(63,54) = M1(0,15); M2(63,55) = M1(0,16); M2(63,56) = M1(0,17); M2(63,58) = M1(0,18); M2(63,59) = M1(0,19); M2(63,60) = M1(0,20); M2(63,61) = M1(0,21); M2(63,63) = M1(0,22); M2(63,64) = M1(0,23); M2(63,65) = M1(0,24); M2(63,67) = M1(0,25); M2(63,68) = M1(0,26); M2(63,70) = M1(0,27); M2(63,72) = M1(0,28); M2(63,73) = M1(0,29); M2(63,74) = M1(0,30); M2(63,75) = M1(0,31); M2(63,76) = M1(0,32); M2(63,77) = M1(0,33); M2(63,79) = M1(0,34); M2(63,80) = M1(0,35); M2(63,81) = M1(0,36); M2(63,82) = M1(0,37); M2(63,83) = M1(0,38); M2(63,85) = M1(0,39); M2(63,86) = M1(0,40); M2(63,87) = M1(0,41); M2(63,88) = M1(0,42); M2(63,90) = M1(0,43); M2(63,91) = M1(0,44); M2(63,92) = M1(0,45); M2(63,95) = M1(0,46); M2(63,96) = M1(0,47); M2(63,98) = M1(0,48); M2(63,101) = M1(0,49); M2(63,102) = M1(0,50); M2(63,103) = M1(0,51); M2(63,104) = M1(0,52); M2(63,105) = M1(0,53); M2(63,107) = M1(0,54); M2(63,108) = M1(0,55); M2(63,109) = M1(0,56); M2(63,110) = M1(0,57); M2(63,112) = M1(0,58); M2(63,113) = M1(0,59); M2(63,114) = M1(0,60); M2(63,116) = M1(0,61); M2(63,117) = M1(0,62); M2(63,119) = M1(0,63); M2(63,122) = M1(0,64); M2(63,123) = M1(0,65); M2(63,124) = M1(0,66); M2(63,125) = M1(0,67); M2(63,127) = M1(0,68); M2(63,128) = M1(0,69); M2(63,129) = M1(0,70); M2(63,131) = M1(0,71); M2(63,132) = M1(0,72); M2(63,134) = M1(0,73); M2(63,137) = M1(0,74); M2(63,138) = M1(0,75); M2(63,139) = M1(0,76); M2(63,141) = M1(0,77); M2(63,142) = M1(0,78); M2(63,144) = M1(0,79); M2(63,147) = M1(0,80); M2(63,148) = M1(0,81); M2(63,150) = M1(0,82); M2(63,153) = M1(0,83); 
M2(64,38) = M1(1,1); M2(64,54) = M1(1,15); M2(64,55) = M1(1,16); M2(64,56) = M1(1,17); M2(64,58) = M1(1,18); M2(64,59) = M1(1,19); M2(64,60) = M1(1,20); M2(64,61) = M1(1,21); M2(64,63) = M1(1,22); M2(64,64) = M1(1,23); M2(64,65) = M1(1,24); M2(64,67) = M1(1,25); M2(64,68) = M1(1,26); M2(64,70) = M1(1,27); M2(64,72) = M1(1,28); M2(64,73) = M1(1,29); M2(64,74) = M1(1,30); M2(64,75) = M1(1,31); M2(64,76) = M1(1,32); M2(64,77) = M1(1,33); M2(64,79) = M1(1,34); M2(64,80) = M1(1,35); M2(64,81) = M1(1,36); M2(64,82) = M1(1,37); M2(64,83) = M1(1,38); M2(64,85) = M1(1,39); M2(64,86) = M1(1,40); M2(64,87) = M1(1,41); M2(64,88) = M1(1,42); M2(64,90) = M1(1,43); M2(64,91) = M1(1,44); M2(64,92) = M1(1,45); M2(64,95) = M1(1,46); M2(64,96) = M1(1,47); M2(64,98) = M1(1,48); M2(64,101) = M1(1,49); M2(64,102) = M1(1,50); M2(64,103) = M1(1,51); M2(64,104) = M1(1,52); M2(64,105) = M1(1,53); M2(64,107) = M1(1,54); M2(64,108) = M1(1,55); M2(64,109) = M1(1,56); M2(64,110) = M1(1,57); M2(64,112) = M1(1,58); M2(64,113) = M1(1,59); M2(64,114) = M1(1,60); M2(64,116) = M1(1,61); M2(64,117) = M1(1,62); M2(64,119) = M1(1,63); M2(64,122) = M1(1,64); M2(64,123) = M1(1,65); M2(64,124) = M1(1,66); M2(64,125) = M1(1,67); M2(64,127) = M1(1,68); M2(64,128) = M1(1,69); M2(64,129) = M1(1,70); M2(64,131) = M1(1,71); M2(64,132) = M1(1,72); M2(64,134) = M1(1,73); M2(64,137) = M1(1,74); M2(64,138) = M1(1,75); M2(64,139) = M1(1,76); M2(64,141) = M1(1,77); M2(64,142) = M1(1,78); M2(64,144) = M1(1,79); M2(64,147) = M1(1,80); M2(64,148) = M1(1,81); M2(64,150) = M1(1,82); M2(64,153) = M1(1,83); 
M2(65,39) = M1(2,2); M2(65,54) = M1(2,15); M2(65,55) = M1(2,16); M2(65,56) = M1(2,17); M2(65,58) = M1(2,18); M2(65,59) = M1(2,19); M2(65,60) = M1(2,20); M2(65,61) = M1(2,21); M2(65,63) = M1(2,22); M2(65,64) = M1(2,23); M2(65,65) = M1(2,24); M2(65,67) = M1(2,25); M2(65,68) = M1(2,26); M2(65,70) = M1(2,27); M2(65,72) = M1(2,28); M2(65,73) = M1(2,29); M2(65,74) = M1(2,30); M2(65,75) = M1(2,31); M2(65,76) = M1(2,32); M2(65,77) = M1(2,33); M2(65,79) = M1(2,34); M2(65,80) = M1(2,35); M2(65,81) = M1(2,36); M2(65,82) = M1(2,37); M2(65,83) = M1(2,38); M2(65,85) = M1(2,39); M2(65,86) = M1(2,40); M2(65,87) = M1(2,41); M2(65,88) = M1(2,42); M2(65,90) = M1(2,43); M2(65,91) = M1(2,44); M2(65,92) = M1(2,45); M2(65,95) = M1(2,46); M2(65,96) = M1(2,47); M2(65,98) = M1(2,48); M2(65,101) = M1(2,49); M2(65,102) = M1(2,50); M2(65,103) = M1(2,51); M2(65,104) = M1(2,52); M2(65,105) = M1(2,53); M2(65,107) = M1(2,54); M2(65,108) = M1(2,55); M2(65,109) = M1(2,56); M2(65,110) = M1(2,57); M2(65,112) = M1(2,58); M2(65,113) = M1(2,59); M2(65,114) = M1(2,60); M2(65,116) = M1(2,61); M2(65,117) = M1(2,62); M2(65,119) = M1(2,63); M2(65,122) = M1(2,64); M2(65,123) = M1(2,65); M2(65,124) = M1(2,66); M2(65,125) = M1(2,67); M2(65,127) = M1(2,68); M2(65,128) = M1(2,69); M2(65,129) = M1(2,70); M2(65,131) = M1(2,71); M2(65,132) = M1(2,72); M2(65,134) = M1(2,73); M2(65,137) = M1(2,74); M2(65,138) = M1(2,75); M2(65,139) = M1(2,76); M2(65,141) = M1(2,77); M2(65,142) = M1(2,78); M2(65,144) = M1(2,79); M2(65,147) = M1(2,80); M2(65,148) = M1(2,81); M2(65,150) = M1(2,82); M2(65,153) = M1(2,83); 
M2(66,40) = M1(3,3); M2(66,54) = M1(3,15); M2(66,55) = M1(3,16); M2(66,56) = M1(3,17); M2(66,58) = M1(3,18); M2(66,59) = M1(3,19); M2(66,60) = M1(3,20); M2(66,61) = M1(3,21); M2(66,63) = M1(3,22); M2(66,64) = M1(3,23); M2(66,65) = M1(3,24); M2(66,67) = M1(3,25); M2(66,68) = M1(3,26); M2(66,70) = M1(3,27); M2(66,72) = M1(3,28); M2(66,73) = M1(3,29); M2(66,74) = M1(3,30); M2(66,75) = M1(3,31); M2(66,76) = M1(3,32); M2(66,77) = M1(3,33); M2(66,79) = M1(3,34); M2(66,80) = M1(3,35); M2(66,81) = M1(3,36); M2(66,82) = M1(3,37); M2(66,83) = M1(3,38); M2(66,85) = M1(3,39); M2(66,86) = M1(3,40); M2(66,87) = M1(3,41); M2(66,88) = M1(3,42); M2(66,90) = M1(3,43); M2(66,91) = M1(3,44); M2(66,92) = M1(3,45); M2(66,95) = M1(3,46); M2(66,96) = M1(3,47); M2(66,98) = M1(3,48); M2(66,101) = M1(3,49); M2(66,102) = M1(3,50); M2(66,103) = M1(3,51); M2(66,104) = M1(3,52); M2(66,105) = M1(3,53); M2(66,107) = M1(3,54); M2(66,108) = M1(3,55); M2(66,109) = M1(3,56); M2(66,110) = M1(3,57); M2(66,112) = M1(3,58); M2(66,113) = M1(3,59); M2(66,114) = M1(3,60); M2(66,116) = M1(3,61); M2(66,117) = M1(3,62); M2(66,119) = M1(3,63); M2(66,122) = M1(3,64); M2(66,123) = M1(3,65); M2(66,124) = M1(3,66); M2(66,125) = M1(3,67); M2(66,127) = M1(3,68); M2(66,128) = M1(3,69); M2(66,129) = M1(3,70); M2(66,131) = M1(3,71); M2(66,132) = M1(3,72); M2(66,134) = M1(3,73); M2(66,137) = M1(3,74); M2(66,138) = M1(3,75); M2(66,139) = M1(3,76); M2(66,141) = M1(3,77); M2(66,142) = M1(3,78); M2(66,144) = M1(3,79); M2(66,147) = M1(3,80); M2(66,148) = M1(3,81); M2(66,150) = M1(3,82); M2(66,153) = M1(3,83); 
M2(67,41) = M1(4,4); M2(67,54) = M1(4,15); M2(67,55) = M1(4,16); M2(67,56) = M1(4,17); M2(67,58) = M1(4,18); M2(67,59) = M1(4,19); M2(67,60) = M1(4,20); M2(67,61) = M1(4,21); M2(67,63) = M1(4,22); M2(67,64) = M1(4,23); M2(67,65) = M1(4,24); M2(67,67) = M1(4,25); M2(67,68) = M1(4,26); M2(67,70) = M1(4,27); M2(67,72) = M1(4,28); M2(67,73) = M1(4,29); M2(67,74) = M1(4,30); M2(67,75) = M1(4,31); M2(67,76) = M1(4,32); M2(67,77) = M1(4,33); M2(67,79) = M1(4,34); M2(67,80) = M1(4,35); M2(67,81) = M1(4,36); M2(67,82) = M1(4,37); M2(67,83) = M1(4,38); M2(67,85) = M1(4,39); M2(67,86) = M1(4,40); M2(67,87) = M1(4,41); M2(67,88) = M1(4,42); M2(67,90) = M1(4,43); M2(67,91) = M1(4,44); M2(67,92) = M1(4,45); M2(67,95) = M1(4,46); M2(67,96) = M1(4,47); M2(67,98) = M1(4,48); M2(67,101) = M1(4,49); M2(67,102) = M1(4,50); M2(67,103) = M1(4,51); M2(67,104) = M1(4,52); M2(67,105) = M1(4,53); M2(67,107) = M1(4,54); M2(67,108) = M1(4,55); M2(67,109) = M1(4,56); M2(67,110) = M1(4,57); M2(67,112) = M1(4,58); M2(67,113) = M1(4,59); M2(67,114) = M1(4,60); M2(67,116) = M1(4,61); M2(67,117) = M1(4,62); M2(67,119) = M1(4,63); M2(67,122) = M1(4,64); M2(67,123) = M1(4,65); M2(67,124) = M1(4,66); M2(67,125) = M1(4,67); M2(67,127) = M1(4,68); M2(67,128) = M1(4,69); M2(67,129) = M1(4,70); M2(67,131) = M1(4,71); M2(67,132) = M1(4,72); M2(67,134) = M1(4,73); M2(67,137) = M1(4,74); M2(67,138) = M1(4,75); M2(67,139) = M1(4,76); M2(67,141) = M1(4,77); M2(67,142) = M1(4,78); M2(67,144) = M1(4,79); M2(67,147) = M1(4,80); M2(67,148) = M1(4,81); M2(67,150) = M1(4,82); M2(67,153) = M1(4,83); 
M2(68,42) = M1(5,5); M2(68,54) = M1(5,15); M2(68,55) = M1(5,16); M2(68,56) = M1(5,17); M2(68,58) = M1(5,18); M2(68,59) = M1(5,19); M2(68,60) = M1(5,20); M2(68,61) = M1(5,21); M2(68,63) = M1(5,22); M2(68,64) = M1(5,23); M2(68,65) = M1(5,24); M2(68,67) = M1(5,25); M2(68,68) = M1(5,26); M2(68,70) = M1(5,27); M2(68,72) = M1(5,28); M2(68,73) = M1(5,29); M2(68,74) = M1(5,30); M2(68,75) = M1(5,31); M2(68,76) = M1(5,32); M2(68,77) = M1(5,33); M2(68,79) = M1(5,34); M2(68,80) = M1(5,35); M2(68,81) = M1(5,36); M2(68,82) = M1(5,37); M2(68,83) = M1(5,38); M2(68,85) = M1(5,39); M2(68,86) = M1(5,40); M2(68,87) = M1(5,41); M2(68,88) = M1(5,42); M2(68,90) = M1(5,43); M2(68,91) = M1(5,44); M2(68,92) = M1(5,45); M2(68,95) = M1(5,46); M2(68,96) = M1(5,47); M2(68,98) = M1(5,48); M2(68,101) = M1(5,49); M2(68,102) = M1(5,50); M2(68,103) = M1(5,51); M2(68,104) = M1(5,52); M2(68,105) = M1(5,53); M2(68,107) = M1(5,54); M2(68,108) = M1(5,55); M2(68,109) = M1(5,56); M2(68,110) = M1(5,57); M2(68,112) = M1(5,58); M2(68,113) = M1(5,59); M2(68,114) = M1(5,60); M2(68,116) = M1(5,61); M2(68,117) = M1(5,62); M2(68,119) = M1(5,63); M2(68,122) = M1(5,64); M2(68,123) = M1(5,65); M2(68,124) = M1(5,66); M2(68,125) = M1(5,67); M2(68,127) = M1(5,68); M2(68,128) = M1(5,69); M2(68,129) = M1(5,70); M2(68,131) = M1(5,71); M2(68,132) = M1(5,72); M2(68,134) = M1(5,73); M2(68,137) = M1(5,74); M2(68,138) = M1(5,75); M2(68,139) = M1(5,76); M2(68,141) = M1(5,77); M2(68,142) = M1(5,78); M2(68,144) = M1(5,79); M2(68,147) = M1(5,80); M2(68,148) = M1(5,81); M2(68,150) = M1(5,82); M2(68,153) = M1(5,83); 
M2(69,43) = M1(6,6); M2(69,54) = M1(6,15); M2(69,55) = M1(6,16); M2(69,56) = M1(6,17); M2(69,58) = M1(6,18); M2(69,59) = M1(6,19); M2(69,60) = M1(6,20); M2(69,61) = M1(6,21); M2(69,63) = M1(6,22); M2(69,64) = M1(6,23); M2(69,65) = M1(6,24); M2(69,67) = M1(6,25); M2(69,68) = M1(6,26); M2(69,70) = M1(6,27); M2(69,72) = M1(6,28); M2(69,73) = M1(6,29); M2(69,74) = M1(6,30); M2(69,75) = M1(6,31); M2(69,76) = M1(6,32); M2(69,77) = M1(6,33); M2(69,79) = M1(6,34); M2(69,80) = M1(6,35); M2(69,81) = M1(6,36); M2(69,82) = M1(6,37); M2(69,83) = M1(6,38); M2(69,85) = M1(6,39); M2(69,86) = M1(6,40); M2(69,87) = M1(6,41); M2(69,88) = M1(6,42); M2(69,90) = M1(6,43); M2(69,91) = M1(6,44); M2(69,92) = M1(6,45); M2(69,95) = M1(6,46); M2(69,96) = M1(6,47); M2(69,98) = M1(6,48); M2(69,101) = M1(6,49); M2(69,102) = M1(6,50); M2(69,103) = M1(6,51); M2(69,104) = M1(6,52); M2(69,105) = M1(6,53); M2(69,107) = M1(6,54); M2(69,108) = M1(6,55); M2(69,109) = M1(6,56); M2(69,110) = M1(6,57); M2(69,112) = M1(6,58); M2(69,113) = M1(6,59); M2(69,114) = M1(6,60); M2(69,116) = M1(6,61); M2(69,117) = M1(6,62); M2(69,119) = M1(6,63); M2(69,122) = M1(6,64); M2(69,123) = M1(6,65); M2(69,124) = M1(6,66); M2(69,125) = M1(6,67); M2(69,127) = M1(6,68); M2(69,128) = M1(6,69); M2(69,129) = M1(6,70); M2(69,131) = M1(6,71); M2(69,132) = M1(6,72); M2(69,134) = M1(6,73); M2(69,137) = M1(6,74); M2(69,138) = M1(6,75); M2(69,139) = M1(6,76); M2(69,141) = M1(6,77); M2(69,142) = M1(6,78); M2(69,144) = M1(6,79); M2(69,147) = M1(6,80); M2(69,148) = M1(6,81); M2(69,150) = M1(6,82); M2(69,153) = M1(6,83); 
M2(70,45) = M1(7,7); M2(70,54) = M1(7,15); M2(70,55) = M1(7,16); M2(70,56) = M1(7,17); M2(70,58) = M1(7,18); M2(70,59) = M1(7,19); M2(70,60) = M1(7,20); M2(70,61) = M1(7,21); M2(70,63) = M1(7,22); M2(70,64) = M1(7,23); M2(70,65) = M1(7,24); M2(70,67) = M1(7,25); M2(70,68) = M1(7,26); M2(70,70) = M1(7,27); M2(70,72) = M1(7,28); M2(70,73) = M1(7,29); M2(70,74) = M1(7,30); M2(70,75) = M1(7,31); M2(70,76) = M1(7,32); M2(70,77) = M1(7,33); M2(70,79) = M1(7,34); M2(70,80) = M1(7,35); M2(70,81) = M1(7,36); M2(70,82) = M1(7,37); M2(70,83) = M1(7,38); M2(70,85) = M1(7,39); M2(70,86) = M1(7,40); M2(70,87) = M1(7,41); M2(70,88) = M1(7,42); M2(70,90) = M1(7,43); M2(70,91) = M1(7,44); M2(70,92) = M1(7,45); M2(70,95) = M1(7,46); M2(70,96) = M1(7,47); M2(70,98) = M1(7,48); M2(70,101) = M1(7,49); M2(70,102) = M1(7,50); M2(70,103) = M1(7,51); M2(70,104) = M1(7,52); M2(70,105) = M1(7,53); M2(70,107) = M1(7,54); M2(70,108) = M1(7,55); M2(70,109) = M1(7,56); M2(70,110) = M1(7,57); M2(70,112) = M1(7,58); M2(70,113) = M1(7,59); M2(70,114) = M1(7,60); M2(70,116) = M1(7,61); M2(70,117) = M1(7,62); M2(70,119) = M1(7,63); M2(70,122) = M1(7,64); M2(70,123) = M1(7,65); M2(70,124) = M1(7,66); M2(70,125) = M1(7,67); M2(70,127) = M1(7,68); M2(70,128) = M1(7,69); M2(70,129) = M1(7,70); M2(70,131) = M1(7,71); M2(70,132) = M1(7,72); M2(70,134) = M1(7,73); M2(70,137) = M1(7,74); M2(70,138) = M1(7,75); M2(70,139) = M1(7,76); M2(70,141) = M1(7,77); M2(70,142) = M1(7,78); M2(70,144) = M1(7,79); M2(70,147) = M1(7,80); M2(70,148) = M1(7,81); M2(70,150) = M1(7,82); M2(70,153) = M1(7,83); 
M2(71,46) = M1(8,8); M2(71,54) = M1(8,15); M2(71,55) = M1(8,16); M2(71,56) = M1(8,17); M2(71,58) = M1(8,18); M2(71,59) = M1(8,19); M2(71,60) = M1(8,20); M2(71,61) = M1(8,21); M2(71,63) = M1(8,22); M2(71,64) = M1(8,23); M2(71,65) = M1(8,24); M2(71,67) = M1(8,25); M2(71,68) = M1(8,26); M2(71,70) = M1(8,27); M2(71,72) = M1(8,28); M2(71,73) = M1(8,29); M2(71,74) = M1(8,30); M2(71,75) = M1(8,31); M2(71,76) = M1(8,32); M2(71,77) = M1(8,33); M2(71,79) = M1(8,34); M2(71,80) = M1(8,35); M2(71,81) = M1(8,36); M2(71,82) = M1(8,37); M2(71,83) = M1(8,38); M2(71,85) = M1(8,39); M2(71,86) = M1(8,40); M2(71,87) = M1(8,41); M2(71,88) = M1(8,42); M2(71,90) = M1(8,43); M2(71,91) = M1(8,44); M2(71,92) = M1(8,45); M2(71,95) = M1(8,46); M2(71,96) = M1(8,47); M2(71,98) = M1(8,48); M2(71,101) = M1(8,49); M2(71,102) = M1(8,50); M2(71,103) = M1(8,51); M2(71,104) = M1(8,52); M2(71,105) = M1(8,53); M2(71,107) = M1(8,54); M2(71,108) = M1(8,55); M2(71,109) = M1(8,56); M2(71,110) = M1(8,57); M2(71,112) = M1(8,58); M2(71,113) = M1(8,59); M2(71,114) = M1(8,60); M2(71,116) = M1(8,61); M2(71,117) = M1(8,62); M2(71,119) = M1(8,63); M2(71,122) = M1(8,64); M2(71,123) = M1(8,65); M2(71,124) = M1(8,66); M2(71,125) = M1(8,67); M2(71,127) = M1(8,68); M2(71,128) = M1(8,69); M2(71,129) = M1(8,70); M2(71,131) = M1(8,71); M2(71,132) = M1(8,72); M2(71,134) = M1(8,73); M2(71,137) = M1(8,74); M2(71,138) = M1(8,75); M2(71,139) = M1(8,76); M2(71,141) = M1(8,77); M2(71,142) = M1(8,78); M2(71,144) = M1(8,79); M2(71,147) = M1(8,80); M2(71,148) = M1(8,81); M2(71,150) = M1(8,82); M2(71,153) = M1(8,83); 
M2(72,47) = M1(9,9); M2(72,54) = M1(9,15); M2(72,55) = M1(9,16); M2(72,56) = M1(9,17); M2(72,58) = M1(9,18); M2(72,59) = M1(9,19); M2(72,60) = M1(9,20); M2(72,61) = M1(9,21); M2(72,63) = M1(9,22); M2(72,64) = M1(9,23); M2(72,65) = M1(9,24); M2(72,67) = M1(9,25); M2(72,68) = M1(9,26); M2(72,70) = M1(9,27); M2(72,72) = M1(9,28); M2(72,73) = M1(9,29); M2(72,74) = M1(9,30); M2(72,75) = M1(9,31); M2(72,76) = M1(9,32); M2(72,77) = M1(9,33); M2(72,79) = M1(9,34); M2(72,80) = M1(9,35); M2(72,81) = M1(9,36); M2(72,82) = M1(9,37); M2(72,83) = M1(9,38); M2(72,85) = M1(9,39); M2(72,86) = M1(9,40); M2(72,87) = M1(9,41); M2(72,88) = M1(9,42); M2(72,90) = M1(9,43); M2(72,91) = M1(9,44); M2(72,92) = M1(9,45); M2(72,95) = M1(9,46); M2(72,96) = M1(9,47); M2(72,98) = M1(9,48); M2(72,101) = M1(9,49); M2(72,102) = M1(9,50); M2(72,103) = M1(9,51); M2(72,104) = M1(9,52); M2(72,105) = M1(9,53); M2(72,107) = M1(9,54); M2(72,108) = M1(9,55); M2(72,109) = M1(9,56); M2(72,110) = M1(9,57); M2(72,112) = M1(9,58); M2(72,113) = M1(9,59); M2(72,114) = M1(9,60); M2(72,116) = M1(9,61); M2(72,117) = M1(9,62); M2(72,119) = M1(9,63); M2(72,122) = M1(9,64); M2(72,123) = M1(9,65); M2(72,124) = M1(9,66); M2(72,125) = M1(9,67); M2(72,127) = M1(9,68); M2(72,128) = M1(9,69); M2(72,129) = M1(9,70); M2(72,131) = M1(9,71); M2(72,132) = M1(9,72); M2(72,134) = M1(9,73); M2(72,137) = M1(9,74); M2(72,138) = M1(9,75); M2(72,139) = M1(9,76); M2(72,141) = M1(9,77); M2(72,142) = M1(9,78); M2(72,144) = M1(9,79); M2(72,147) = M1(9,80); M2(72,148) = M1(9,81); M2(72,150) = M1(9,82); M2(72,153) = M1(9,83); 
M2(73,48) = M1(10,10); M2(73,54) = M1(10,15); M2(73,55) = M1(10,16); M2(73,56) = M1(10,17); M2(73,58) = M1(10,18); M2(73,59) = M1(10,19); M2(73,60) = M1(10,20); M2(73,61) = M1(10,21); M2(73,63) = M1(10,22); M2(73,64) = M1(10,23); M2(73,65) = M1(10,24); M2(73,67) = M1(10,25); M2(73,68) = M1(10,26); M2(73,70) = M1(10,27); M2(73,72) = M1(10,28); M2(73,73) = M1(10,29); M2(73,74) = M1(10,30); M2(73,75) = M1(10,31); M2(73,76) = M1(10,32); M2(73,77) = M1(10,33); M2(73,79) = M1(10,34); M2(73,80) = M1(10,35); M2(73,81) = M1(10,36); M2(73,82) = M1(10,37); M2(73,83) = M1(10,38); M2(73,85) = M1(10,39); M2(73,86) = M1(10,40); M2(73,87) = M1(10,41); M2(73,88) = M1(10,42); M2(73,90) = M1(10,43); M2(73,91) = M1(10,44); M2(73,92) = M1(10,45); M2(73,95) = M1(10,46); M2(73,96) = M1(10,47); M2(73,98) = M1(10,48); M2(73,101) = M1(10,49); M2(73,102) = M1(10,50); M2(73,103) = M1(10,51); M2(73,104) = M1(10,52); M2(73,105) = M1(10,53); M2(73,107) = M1(10,54); M2(73,108) = M1(10,55); M2(73,109) = M1(10,56); M2(73,110) = M1(10,57); M2(73,112) = M1(10,58); M2(73,113) = M1(10,59); M2(73,114) = M1(10,60); M2(73,116) = M1(10,61); M2(73,117) = M1(10,62); M2(73,119) = M1(10,63); M2(73,122) = M1(10,64); M2(73,123) = M1(10,65); M2(73,124) = M1(10,66); M2(73,125) = M1(10,67); M2(73,127) = M1(10,68); M2(73,128) = M1(10,69); M2(73,129) = M1(10,70); M2(73,131) = M1(10,71); M2(73,132) = M1(10,72); M2(73,134) = M1(10,73); M2(73,137) = M1(10,74); M2(73,138) = M1(10,75); M2(73,139) = M1(10,76); M2(73,141) = M1(10,77); M2(73,142) = M1(10,78); M2(73,144) = M1(10,79); M2(73,147) = M1(10,80); M2(73,148) = M1(10,81); M2(73,150) = M1(10,82); M2(73,153) = M1(10,83); 
M2(74,49) = M1(11,11); M2(74,54) = M1(11,15); M2(74,55) = M1(11,16); M2(74,56) = M1(11,17); M2(74,58) = M1(11,18); M2(74,59) = M1(11,19); M2(74,60) = M1(11,20); M2(74,61) = M1(11,21); M2(74,63) = M1(11,22); M2(74,64) = M1(11,23); M2(74,65) = M1(11,24); M2(74,67) = M1(11,25); M2(74,68) = M1(11,26); M2(74,70) = M1(11,27); M2(74,72) = M1(11,28); M2(74,73) = M1(11,29); M2(74,74) = M1(11,30); M2(74,75) = M1(11,31); M2(74,76) = M1(11,32); M2(74,77) = M1(11,33); M2(74,79) = M1(11,34); M2(74,80) = M1(11,35); M2(74,81) = M1(11,36); M2(74,82) = M1(11,37); M2(74,83) = M1(11,38); M2(74,85) = M1(11,39); M2(74,86) = M1(11,40); M2(74,87) = M1(11,41); M2(74,88) = M1(11,42); M2(74,90) = M1(11,43); M2(74,91) = M1(11,44); M2(74,92) = M1(11,45); M2(74,95) = M1(11,46); M2(74,96) = M1(11,47); M2(74,98) = M1(11,48); M2(74,101) = M1(11,49); M2(74,102) = M1(11,50); M2(74,103) = M1(11,51); M2(74,104) = M1(11,52); M2(74,105) = M1(11,53); M2(74,107) = M1(11,54); M2(74,108) = M1(11,55); M2(74,109) = M1(11,56); M2(74,110) = M1(11,57); M2(74,112) = M1(11,58); M2(74,113) = M1(11,59); M2(74,114) = M1(11,60); M2(74,116) = M1(11,61); M2(74,117) = M1(11,62); M2(74,119) = M1(11,63); M2(74,122) = M1(11,64); M2(74,123) = M1(11,65); M2(74,124) = M1(11,66); M2(74,125) = M1(11,67); M2(74,127) = M1(11,68); M2(74,128) = M1(11,69); M2(74,129) = M1(11,70); M2(74,131) = M1(11,71); M2(74,132) = M1(11,72); M2(74,134) = M1(11,73); M2(74,137) = M1(11,74); M2(74,138) = M1(11,75); M2(74,139) = M1(11,76); M2(74,141) = M1(11,77); M2(74,142) = M1(11,78); M2(74,144) = M1(11,79); M2(74,147) = M1(11,80); M2(74,148) = M1(11,81); M2(74,150) = M1(11,82); M2(74,153) = M1(11,83); 
M2(75,50) = M1(12,12); M2(75,54) = M1(12,15); M2(75,55) = M1(12,16); M2(75,56) = M1(12,17); M2(75,58) = M1(12,18); M2(75,59) = M1(12,19); M2(75,60) = M1(12,20); M2(75,61) = M1(12,21); M2(75,63) = M1(12,22); M2(75,64) = M1(12,23); M2(75,65) = M1(12,24); M2(75,67) = M1(12,25); M2(75,68) = M1(12,26); M2(75,70) = M1(12,27); M2(75,72) = M1(12,28); M2(75,73) = M1(12,29); M2(75,74) = M1(12,30); M2(75,75) = M1(12,31); M2(75,76) = M1(12,32); M2(75,77) = M1(12,33); M2(75,79) = M1(12,34); M2(75,80) = M1(12,35); M2(75,81) = M1(12,36); M2(75,82) = M1(12,37); M2(75,83) = M1(12,38); M2(75,85) = M1(12,39); M2(75,86) = M1(12,40); M2(75,87) = M1(12,41); M2(75,88) = M1(12,42); M2(75,90) = M1(12,43); M2(75,91) = M1(12,44); M2(75,92) = M1(12,45); M2(75,95) = M1(12,46); M2(75,96) = M1(12,47); M2(75,98) = M1(12,48); M2(75,101) = M1(12,49); M2(75,102) = M1(12,50); M2(75,103) = M1(12,51); M2(75,104) = M1(12,52); M2(75,105) = M1(12,53); M2(75,107) = M1(12,54); M2(75,108) = M1(12,55); M2(75,109) = M1(12,56); M2(75,110) = M1(12,57); M2(75,112) = M1(12,58); M2(75,113) = M1(12,59); M2(75,114) = M1(12,60); M2(75,116) = M1(12,61); M2(75,117) = M1(12,62); M2(75,119) = M1(12,63); M2(75,122) = M1(12,64); M2(75,123) = M1(12,65); M2(75,124) = M1(12,66); M2(75,125) = M1(12,67); M2(75,127) = M1(12,68); M2(75,128) = M1(12,69); M2(75,129) = M1(12,70); M2(75,131) = M1(12,71); M2(75,132) = M1(12,72); M2(75,134) = M1(12,73); M2(75,137) = M1(12,74); M2(75,138) = M1(12,75); M2(75,139) = M1(12,76); M2(75,141) = M1(12,77); M2(75,142) = M1(12,78); M2(75,144) = M1(12,79); M2(75,147) = M1(12,80); M2(75,148) = M1(12,81); M2(75,150) = M1(12,82); M2(75,153) = M1(12,83); 
M2(76,52) = M1(13,13); M2(76,54) = M1(13,15); M2(76,55) = M1(13,16); M2(76,56) = M1(13,17); M2(76,58) = M1(13,18); M2(76,59) = M1(13,19); M2(76,60) = M1(13,20); M2(76,61) = M1(13,21); M2(76,63) = M1(13,22); M2(76,64) = M1(13,23); M2(76,65) = M1(13,24); M2(76,67) = M1(13,25); M2(76,68) = M1(13,26); M2(76,70) = M1(13,27); M2(76,72) = M1(13,28); M2(76,73) = M1(13,29); M2(76,74) = M1(13,30); M2(76,75) = M1(13,31); M2(76,76) = M1(13,32); M2(76,77) = M1(13,33); M2(76,79) = M1(13,34); M2(76,80) = M1(13,35); M2(76,81) = M1(13,36); M2(76,82) = M1(13,37); M2(76,83) = M1(13,38); M2(76,85) = M1(13,39); M2(76,86) = M1(13,40); M2(76,87) = M1(13,41); M2(76,88) = M1(13,42); M2(76,90) = M1(13,43); M2(76,91) = M1(13,44); M2(76,92) = M1(13,45); M2(76,95) = M1(13,46); M2(76,96) = M1(13,47); M2(76,98) = M1(13,48); M2(76,101) = M1(13,49); M2(76,102) = M1(13,50); M2(76,103) = M1(13,51); M2(76,104) = M1(13,52); M2(76,105) = M1(13,53); M2(76,107) = M1(13,54); M2(76,108) = M1(13,55); M2(76,109) = M1(13,56); M2(76,110) = M1(13,57); M2(76,112) = M1(13,58); M2(76,113) = M1(13,59); M2(76,114) = M1(13,60); M2(76,116) = M1(13,61); M2(76,117) = M1(13,62); M2(76,119) = M1(13,63); M2(76,122) = M1(13,64); M2(76,123) = M1(13,65); M2(76,124) = M1(13,66); M2(76,125) = M1(13,67); M2(76,127) = M1(13,68); M2(76,128) = M1(13,69); M2(76,129) = M1(13,70); M2(76,131) = M1(13,71); M2(76,132) = M1(13,72); M2(76,134) = M1(13,73); M2(76,137) = M1(13,74); M2(76,138) = M1(13,75); M2(76,139) = M1(13,76); M2(76,141) = M1(13,77); M2(76,142) = M1(13,78); M2(76,144) = M1(13,79); M2(76,147) = M1(13,80); M2(76,148) = M1(13,81); M2(76,150) = M1(13,82); M2(76,153) = M1(13,83); 
M2(77,53) = M1(14,14); M2(77,54) = M1(14,15); M2(77,55) = M1(14,16); M2(77,56) = M1(14,17); M2(77,58) = M1(14,18); M2(77,59) = M1(14,19); M2(77,60) = M1(14,20); M2(77,61) = M1(14,21); M2(77,63) = M1(14,22); M2(77,64) = M1(14,23); M2(77,65) = M1(14,24); M2(77,67) = M1(14,25); M2(77,68) = M1(14,26); M2(77,70) = M1(14,27); M2(77,72) = M1(14,28); M2(77,73) = M1(14,29); M2(77,74) = M1(14,30); M2(77,75) = M1(14,31); M2(77,76) = M1(14,32); M2(77,77) = M1(14,33); M2(77,79) = M1(14,34); M2(77,80) = M1(14,35); M2(77,81) = M1(14,36); M2(77,82) = M1(14,37); M2(77,83) = M1(14,38); M2(77,85) = M1(14,39); M2(77,86) = M1(14,40); M2(77,87) = M1(14,41); M2(77,88) = M1(14,42); M2(77,90) = M1(14,43); M2(77,91) = M1(14,44); M2(77,92) = M1(14,45); M2(77,95) = M1(14,46); M2(77,96) = M1(14,47); M2(77,98) = M1(14,48); M2(77,101) = M1(14,49); M2(77,102) = M1(14,50); M2(77,103) = M1(14,51); M2(77,104) = M1(14,52); M2(77,105) = M1(14,53); M2(77,107) = M1(14,54); M2(77,108) = M1(14,55); M2(77,109) = M1(14,56); M2(77,110) = M1(14,57); M2(77,112) = M1(14,58); M2(77,113) = M1(14,59); M2(77,114) = M1(14,60); M2(77,116) = M1(14,61); M2(77,117) = M1(14,62); M2(77,119) = M1(14,63); M2(77,122) = M1(14,64); M2(77,123) = M1(14,65); M2(77,124) = M1(14,66); M2(77,125) = M1(14,67); M2(77,127) = M1(14,68); M2(77,128) = M1(14,69); M2(77,129) = M1(14,70); M2(77,131) = M1(14,71); M2(77,132) = M1(14,72); M2(77,134) = M1(14,73); M2(77,137) = M1(14,74); M2(77,138) = M1(14,75); M2(77,139) = M1(14,76); M2(77,141) = M1(14,77); M2(77,142) = M1(14,78); M2(77,144) = M1(14,79); M2(77,147) = M1(14,80); M2(77,148) = M1(14,81); M2(77,150) = M1(14,82); M2(77,153) = M1(14,83); 
M2(78,72) = M1(0,0); M2(78,87) = M1(0,15); M2(78,88) = M1(0,16); M2(78,89) = M1(0,17); M2(78,90) = M1(0,18); M2(78,91) = M1(0,19); M2(78,92) = M1(0,20); M2(78,94) = M1(0,21); M2(78,95) = M1(0,22); M2(78,96) = M1(0,23); M2(78,97) = M1(0,24); M2(78,98) = M1(0,25); M2(78,99) = M1(0,26); M2(78,100) = M1(0,27); M2(78,101) = M1(0,28); M2(78,102) = M1(0,29); M2(78,103) = M1(0,30); M2(78,104) = M1(0,31); M2(78,105) = M1(0,32); M2(78,106) = M1(0,33); M2(78,107) = M1(0,34); M2(78,108) = M1(0,35); M2(78,109) = M1(0,36); M2(78,110) = M1(0,37); M2(78,111) = M1(0,38); M2(78,112) = M1(0,39); M2(78,113) = M1(0,40); M2(78,114) = M1(0,41); M2(78,115) = M1(0,42); M2(78,116) = M1(0,43); M2(78,117) = M1(0,44); M2(78,118) = M1(0,45); M2(78,119) = M1(0,46); M2(78,120) = M1(0,47); M2(78,121) = M1(0,48); M2(78,122) = M1(0,49); M2(78,123) = M1(0,50); M2(78,124) = M1(0,51); M2(78,125) = M1(0,52); M2(78,126) = M1(0,53); M2(78,127) = M1(0,54); M2(78,128) = M1(0,55); M2(78,129) = M1(0,56); M2(78,130) = M1(0,57); M2(78,131) = M1(0,58); M2(78,132) = M1(0,59); M2(78,133) = M1(0,60); M2(78,134) = M1(0,61); M2(78,135) = M1(0,62); M2(78,136) = M1(0,63); M2(78,137) = M1(0,64); M2(78,138) = M1(0,65); M2(78,139) = M1(0,66); M2(78,140) = M1(0,67); M2(78,141) = M1(0,68); M2(78,142) = M1(0,69); M2(78,143) = M1(0,70); M2(78,144) = M1(0,71); M2(78,145) = M1(0,72); M2(78,146) = M1(0,73); M2(78,147) = M1(0,74); M2(78,148) = M1(0,75); M2(78,149) = M1(0,76); M2(78,150) = M1(0,77); M2(78,151) = M1(0,78); M2(78,152) = M1(0,79); M2(78,153) = M1(0,80); M2(78,154) = M1(0,81); M2(78,155) = M1(0,82); M2(78,156) = M1(0,83); 
M2(79,73) = M1(1,1); M2(79,87) = M1(1,15); M2(79,88) = M1(1,16); M2(79,89) = M1(1,17); M2(79,90) = M1(1,18); M2(79,91) = M1(1,19); M2(79,92) = M1(1,20); M2(79,94) = M1(1,21); M2(79,95) = M1(1,22); M2(79,96) = M1(1,23); M2(79,97) = M1(1,24); M2(79,98) = M1(1,25); M2(79,99) = M1(1,26); M2(79,100) = M1(1,27); M2(79,101) = M1(1,28); M2(79,102) = M1(1,29); M2(79,103) = M1(1,30); M2(79,104) = M1(1,31); M2(79,105) = M1(1,32); M2(79,106) = M1(1,33); M2(79,107) = M1(1,34); M2(79,108) = M1(1,35); M2(79,109) = M1(1,36); M2(79,110) = M1(1,37); M2(79,111) = M1(1,38); M2(79,112) = M1(1,39); M2(79,113) = M1(1,40); M2(79,114) = M1(1,41); M2(79,115) = M1(1,42); M2(79,116) = M1(1,43); M2(79,117) = M1(1,44); M2(79,118) = M1(1,45); M2(79,119) = M1(1,46); M2(79,120) = M1(1,47); M2(79,121) = M1(1,48); M2(79,122) = M1(1,49); M2(79,123) = M1(1,50); M2(79,124) = M1(1,51); M2(79,125) = M1(1,52); M2(79,126) = M1(1,53); M2(79,127) = M1(1,54); M2(79,128) = M1(1,55); M2(79,129) = M1(1,56); M2(79,130) = M1(1,57); M2(79,131) = M1(1,58); M2(79,132) = M1(1,59); M2(79,133) = M1(1,60); M2(79,134) = M1(1,61); M2(79,135) = M1(1,62); M2(79,136) = M1(1,63); M2(79,137) = M1(1,64); M2(79,138) = M1(1,65); M2(79,139) = M1(1,66); M2(79,140) = M1(1,67); M2(79,141) = M1(1,68); M2(79,142) = M1(1,69); M2(79,143) = M1(1,70); M2(79,144) = M1(1,71); M2(79,145) = M1(1,72); M2(79,146) = M1(1,73); M2(79,147) = M1(1,74); M2(79,148) = M1(1,75); M2(79,149) = M1(1,76); M2(79,150) = M1(1,77); M2(79,151) = M1(1,78); M2(79,152) = M1(1,79); M2(79,153) = M1(1,80); M2(79,154) = M1(1,81); M2(79,155) = M1(1,82); M2(79,156) = M1(1,83); 
M2(80,74) = M1(2,2); M2(80,87) = M1(2,15); M2(80,88) = M1(2,16); M2(80,89) = M1(2,17); M2(80,90) = M1(2,18); M2(80,91) = M1(2,19); M2(80,92) = M1(2,20); M2(80,94) = M1(2,21); M2(80,95) = M1(2,22); M2(80,96) = M1(2,23); M2(80,97) = M1(2,24); M2(80,98) = M1(2,25); M2(80,99) = M1(2,26); M2(80,100) = M1(2,27); M2(80,101) = M1(2,28); M2(80,102) = M1(2,29); M2(80,103) = M1(2,30); M2(80,104) = M1(2,31); M2(80,105) = M1(2,32); M2(80,106) = M1(2,33); M2(80,107) = M1(2,34); M2(80,108) = M1(2,35); M2(80,109) = M1(2,36); M2(80,110) = M1(2,37); M2(80,111) = M1(2,38); M2(80,112) = M1(2,39); M2(80,113) = M1(2,40); M2(80,114) = M1(2,41); M2(80,115) = M1(2,42); M2(80,116) = M1(2,43); M2(80,117) = M1(2,44); M2(80,118) = M1(2,45); M2(80,119) = M1(2,46); M2(80,120) = M1(2,47); M2(80,121) = M1(2,48); M2(80,122) = M1(2,49); M2(80,123) = M1(2,50); M2(80,124) = M1(2,51); M2(80,125) = M1(2,52); M2(80,126) = M1(2,53); M2(80,127) = M1(2,54); M2(80,128) = M1(2,55); M2(80,129) = M1(2,56); M2(80,130) = M1(2,57); M2(80,131) = M1(2,58); M2(80,132) = M1(2,59); M2(80,133) = M1(2,60); M2(80,134) = M1(2,61); M2(80,135) = M1(2,62); M2(80,136) = M1(2,63); M2(80,137) = M1(2,64); M2(80,138) = M1(2,65); M2(80,139) = M1(2,66); M2(80,140) = M1(2,67); M2(80,141) = M1(2,68); M2(80,142) = M1(2,69); M2(80,143) = M1(2,70); M2(80,144) = M1(2,71); M2(80,145) = M1(2,72); M2(80,146) = M1(2,73); M2(80,147) = M1(2,74); M2(80,148) = M1(2,75); M2(80,149) = M1(2,76); M2(80,150) = M1(2,77); M2(80,151) = M1(2,78); M2(80,152) = M1(2,79); M2(80,153) = M1(2,80); M2(80,154) = M1(2,81); M2(80,155) = M1(2,82); M2(80,156) = M1(2,83); 
M2(81,75) = M1(3,3); M2(81,87) = M1(3,15); M2(81,88) = M1(3,16); M2(81,89) = M1(3,17); M2(81,90) = M1(3,18); M2(81,91) = M1(3,19); M2(81,92) = M1(3,20); M2(81,94) = M1(3,21); M2(81,95) = M1(3,22); M2(81,96) = M1(3,23); M2(81,97) = M1(3,24); M2(81,98) = M1(3,25); M2(81,99) = M1(3,26); M2(81,100) = M1(3,27); M2(81,101) = M1(3,28); M2(81,102) = M1(3,29); M2(81,103) = M1(3,30); M2(81,104) = M1(3,31); M2(81,105) = M1(3,32); M2(81,106) = M1(3,33); M2(81,107) = M1(3,34); M2(81,108) = M1(3,35); M2(81,109) = M1(3,36); M2(81,110) = M1(3,37); M2(81,111) = M1(3,38); M2(81,112) = M1(3,39); M2(81,113) = M1(3,40); M2(81,114) = M1(3,41); M2(81,115) = M1(3,42); M2(81,116) = M1(3,43); M2(81,117) = M1(3,44); M2(81,118) = M1(3,45); M2(81,119) = M1(3,46); M2(81,120) = M1(3,47); M2(81,121) = M1(3,48); M2(81,122) = M1(3,49); M2(81,123) = M1(3,50); M2(81,124) = M1(3,51); M2(81,125) = M1(3,52); M2(81,126) = M1(3,53); M2(81,127) = M1(3,54); M2(81,128) = M1(3,55); M2(81,129) = M1(3,56); M2(81,130) = M1(3,57); M2(81,131) = M1(3,58); M2(81,132) = M1(3,59); M2(81,133) = M1(3,60); M2(81,134) = M1(3,61); M2(81,135) = M1(3,62); M2(81,136) = M1(3,63); M2(81,137) = M1(3,64); M2(81,138) = M1(3,65); M2(81,139) = M1(3,66); M2(81,140) = M1(3,67); M2(81,141) = M1(3,68); M2(81,142) = M1(3,69); M2(81,143) = M1(3,70); M2(81,144) = M1(3,71); M2(81,145) = M1(3,72); M2(81,146) = M1(3,73); M2(81,147) = M1(3,74); M2(81,148) = M1(3,75); M2(81,149) = M1(3,76); M2(81,150) = M1(3,77); M2(81,151) = M1(3,78); M2(81,152) = M1(3,79); M2(81,153) = M1(3,80); M2(81,154) = M1(3,81); M2(81,155) = M1(3,82); M2(81,156) = M1(3,83); 
M2(82,76) = M1(4,4); M2(82,87) = M1(4,15); M2(82,88) = M1(4,16); M2(82,89) = M1(4,17); M2(82,90) = M1(4,18); M2(82,91) = M1(4,19); M2(82,92) = M1(4,20); M2(82,94) = M1(4,21); M2(82,95) = M1(4,22); M2(82,96) = M1(4,23); M2(82,97) = M1(4,24); M2(82,98) = M1(4,25); M2(82,99) = M1(4,26); M2(82,100) = M1(4,27); M2(82,101) = M1(4,28); M2(82,102) = M1(4,29); M2(82,103) = M1(4,30); M2(82,104) = M1(4,31); M2(82,105) = M1(4,32); M2(82,106) = M1(4,33); M2(82,107) = M1(4,34); M2(82,108) = M1(4,35); M2(82,109) = M1(4,36); M2(82,110) = M1(4,37); M2(82,111) = M1(4,38); M2(82,112) = M1(4,39); M2(82,113) = M1(4,40); M2(82,114) = M1(4,41); M2(82,115) = M1(4,42); M2(82,116) = M1(4,43); M2(82,117) = M1(4,44); M2(82,118) = M1(4,45); M2(82,119) = M1(4,46); M2(82,120) = M1(4,47); M2(82,121) = M1(4,48); M2(82,122) = M1(4,49); M2(82,123) = M1(4,50); M2(82,124) = M1(4,51); M2(82,125) = M1(4,52); M2(82,126) = M1(4,53); M2(82,127) = M1(4,54); M2(82,128) = M1(4,55); M2(82,129) = M1(4,56); M2(82,130) = M1(4,57); M2(82,131) = M1(4,58); M2(82,132) = M1(4,59); M2(82,133) = M1(4,60); M2(82,134) = M1(4,61); M2(82,135) = M1(4,62); M2(82,136) = M1(4,63); M2(82,137) = M1(4,64); M2(82,138) = M1(4,65); M2(82,139) = M1(4,66); M2(82,140) = M1(4,67); M2(82,141) = M1(4,68); M2(82,142) = M1(4,69); M2(82,143) = M1(4,70); M2(82,144) = M1(4,71); M2(82,145) = M1(4,72); M2(82,146) = M1(4,73); M2(82,147) = M1(4,74); M2(82,148) = M1(4,75); M2(82,149) = M1(4,76); M2(82,150) = M1(4,77); M2(82,151) = M1(4,78); M2(82,152) = M1(4,79); M2(82,153) = M1(4,80); M2(82,154) = M1(4,81); M2(82,155) = M1(4,82); M2(82,156) = M1(4,83); 
M2(83,77) = M1(5,5); M2(83,87) = M1(5,15); M2(83,88) = M1(5,16); M2(83,89) = M1(5,17); M2(83,90) = M1(5,18); M2(83,91) = M1(5,19); M2(83,92) = M1(5,20); M2(83,94) = M1(5,21); M2(83,95) = M1(5,22); M2(83,96) = M1(5,23); M2(83,97) = M1(5,24); M2(83,98) = M1(5,25); M2(83,99) = M1(5,26); M2(83,100) = M1(5,27); M2(83,101) = M1(5,28); M2(83,102) = M1(5,29); M2(83,103) = M1(5,30); M2(83,104) = M1(5,31); M2(83,105) = M1(5,32); M2(83,106) = M1(5,33); M2(83,107) = M1(5,34); M2(83,108) = M1(5,35); M2(83,109) = M1(5,36); M2(83,110) = M1(5,37); M2(83,111) = M1(5,38); M2(83,112) = M1(5,39); M2(83,113) = M1(5,40); M2(83,114) = M1(5,41); M2(83,115) = M1(5,42); M2(83,116) = M1(5,43); M2(83,117) = M1(5,44); M2(83,118) = M1(5,45); M2(83,119) = M1(5,46); M2(83,120) = M1(5,47); M2(83,121) = M1(5,48); M2(83,122) = M1(5,49); M2(83,123) = M1(5,50); M2(83,124) = M1(5,51); M2(83,125) = M1(5,52); M2(83,126) = M1(5,53); M2(83,127) = M1(5,54); M2(83,128) = M1(5,55); M2(83,129) = M1(5,56); M2(83,130) = M1(5,57); M2(83,131) = M1(5,58); M2(83,132) = M1(5,59); M2(83,133) = M1(5,60); M2(83,134) = M1(5,61); M2(83,135) = M1(5,62); M2(83,136) = M1(5,63); M2(83,137) = M1(5,64); M2(83,138) = M1(5,65); M2(83,139) = M1(5,66); M2(83,140) = M1(5,67); M2(83,141) = M1(5,68); M2(83,142) = M1(5,69); M2(83,143) = M1(5,70); M2(83,144) = M1(5,71); M2(83,145) = M1(5,72); M2(83,146) = M1(5,73); M2(83,147) = M1(5,74); M2(83,148) = M1(5,75); M2(83,149) = M1(5,76); M2(83,150) = M1(5,77); M2(83,151) = M1(5,78); M2(83,152) = M1(5,79); M2(83,153) = M1(5,80); M2(83,154) = M1(5,81); M2(83,155) = M1(5,82); M2(83,156) = M1(5,83); 
M2(84,78) = M1(6,6); M2(84,87) = M1(6,15); M2(84,88) = M1(6,16); M2(84,89) = M1(6,17); M2(84,90) = M1(6,18); M2(84,91) = M1(6,19); M2(84,92) = M1(6,20); M2(84,94) = M1(6,21); M2(84,95) = M1(6,22); M2(84,96) = M1(6,23); M2(84,97) = M1(6,24); M2(84,98) = M1(6,25); M2(84,99) = M1(6,26); M2(84,100) = M1(6,27); M2(84,101) = M1(6,28); M2(84,102) = M1(6,29); M2(84,103) = M1(6,30); M2(84,104) = M1(6,31); M2(84,105) = M1(6,32); M2(84,106) = M1(6,33); M2(84,107) = M1(6,34); M2(84,108) = M1(6,35); M2(84,109) = M1(6,36); M2(84,110) = M1(6,37); M2(84,111) = M1(6,38); M2(84,112) = M1(6,39); M2(84,113) = M1(6,40); M2(84,114) = M1(6,41); M2(84,115) = M1(6,42); M2(84,116) = M1(6,43); M2(84,117) = M1(6,44); M2(84,118) = M1(6,45); M2(84,119) = M1(6,46); M2(84,120) = M1(6,47); M2(84,121) = M1(6,48); M2(84,122) = M1(6,49); M2(84,123) = M1(6,50); M2(84,124) = M1(6,51); M2(84,125) = M1(6,52); M2(84,126) = M1(6,53); M2(84,127) = M1(6,54); M2(84,128) = M1(6,55); M2(84,129) = M1(6,56); M2(84,130) = M1(6,57); M2(84,131) = M1(6,58); M2(84,132) = M1(6,59); M2(84,133) = M1(6,60); M2(84,134) = M1(6,61); M2(84,135) = M1(6,62); M2(84,136) = M1(6,63); M2(84,137) = M1(6,64); M2(84,138) = M1(6,65); M2(84,139) = M1(6,66); M2(84,140) = M1(6,67); M2(84,141) = M1(6,68); M2(84,142) = M1(6,69); M2(84,143) = M1(6,70); M2(84,144) = M1(6,71); M2(84,145) = M1(6,72); M2(84,146) = M1(6,73); M2(84,147) = M1(6,74); M2(84,148) = M1(6,75); M2(84,149) = M1(6,76); M2(84,150) = M1(6,77); M2(84,151) = M1(6,78); M2(84,152) = M1(6,79); M2(84,153) = M1(6,80); M2(84,154) = M1(6,81); M2(84,155) = M1(6,82); M2(84,156) = M1(6,83); 
M2(85,79) = M1(7,7); M2(85,87) = M1(7,15); M2(85,88) = M1(7,16); M2(85,89) = M1(7,17); M2(85,90) = M1(7,18); M2(85,91) = M1(7,19); M2(85,92) = M1(7,20); M2(85,94) = M1(7,21); M2(85,95) = M1(7,22); M2(85,96) = M1(7,23); M2(85,97) = M1(7,24); M2(85,98) = M1(7,25); M2(85,99) = M1(7,26); M2(85,100) = M1(7,27); M2(85,101) = M1(7,28); M2(85,102) = M1(7,29); M2(85,103) = M1(7,30); M2(85,104) = M1(7,31); M2(85,105) = M1(7,32); M2(85,106) = M1(7,33); M2(85,107) = M1(7,34); M2(85,108) = M1(7,35); M2(85,109) = M1(7,36); M2(85,110) = M1(7,37); M2(85,111) = M1(7,38); M2(85,112) = M1(7,39); M2(85,113) = M1(7,40); M2(85,114) = M1(7,41); M2(85,115) = M1(7,42); M2(85,116) = M1(7,43); M2(85,117) = M1(7,44); M2(85,118) = M1(7,45); M2(85,119) = M1(7,46); M2(85,120) = M1(7,47); M2(85,121) = M1(7,48); M2(85,122) = M1(7,49); M2(85,123) = M1(7,50); M2(85,124) = M1(7,51); M2(85,125) = M1(7,52); M2(85,126) = M1(7,53); M2(85,127) = M1(7,54); M2(85,128) = M1(7,55); M2(85,129) = M1(7,56); M2(85,130) = M1(7,57); M2(85,131) = M1(7,58); M2(85,132) = M1(7,59); M2(85,133) = M1(7,60); M2(85,134) = M1(7,61); M2(85,135) = M1(7,62); M2(85,136) = M1(7,63); M2(85,137) = M1(7,64); M2(85,138) = M1(7,65); M2(85,139) = M1(7,66); M2(85,140) = M1(7,67); M2(85,141) = M1(7,68); M2(85,142) = M1(7,69); M2(85,143) = M1(7,70); M2(85,144) = M1(7,71); M2(85,145) = M1(7,72); M2(85,146) = M1(7,73); M2(85,147) = M1(7,74); M2(85,148) = M1(7,75); M2(85,149) = M1(7,76); M2(85,150) = M1(7,77); M2(85,151) = M1(7,78); M2(85,152) = M1(7,79); M2(85,153) = M1(7,80); M2(85,154) = M1(7,81); M2(85,155) = M1(7,82); M2(85,156) = M1(7,83); 
M2(86,80) = M1(8,8); M2(86,87) = M1(8,15); M2(86,88) = M1(8,16); M2(86,89) = M1(8,17); M2(86,90) = M1(8,18); M2(86,91) = M1(8,19); M2(86,92) = M1(8,20); M2(86,94) = M1(8,21); M2(86,95) = M1(8,22); M2(86,96) = M1(8,23); M2(86,97) = M1(8,24); M2(86,98) = M1(8,25); M2(86,99) = M1(8,26); M2(86,100) = M1(8,27); M2(86,101) = M1(8,28); M2(86,102) = M1(8,29); M2(86,103) = M1(8,30); M2(86,104) = M1(8,31); M2(86,105) = M1(8,32); M2(86,106) = M1(8,33); M2(86,107) = M1(8,34); M2(86,108) = M1(8,35); M2(86,109) = M1(8,36); M2(86,110) = M1(8,37); M2(86,111) = M1(8,38); M2(86,112) = M1(8,39); M2(86,113) = M1(8,40); M2(86,114) = M1(8,41); M2(86,115) = M1(8,42); M2(86,116) = M1(8,43); M2(86,117) = M1(8,44); M2(86,118) = M1(8,45); M2(86,119) = M1(8,46); M2(86,120) = M1(8,47); M2(86,121) = M1(8,48); M2(86,122) = M1(8,49); M2(86,123) = M1(8,50); M2(86,124) = M1(8,51); M2(86,125) = M1(8,52); M2(86,126) = M1(8,53); M2(86,127) = M1(8,54); M2(86,128) = M1(8,55); M2(86,129) = M1(8,56); M2(86,130) = M1(8,57); M2(86,131) = M1(8,58); M2(86,132) = M1(8,59); M2(86,133) = M1(8,60); M2(86,134) = M1(8,61); M2(86,135) = M1(8,62); M2(86,136) = M1(8,63); M2(86,137) = M1(8,64); M2(86,138) = M1(8,65); M2(86,139) = M1(8,66); M2(86,140) = M1(8,67); M2(86,141) = M1(8,68); M2(86,142) = M1(8,69); M2(86,143) = M1(8,70); M2(86,144) = M1(8,71); M2(86,145) = M1(8,72); M2(86,146) = M1(8,73); M2(86,147) = M1(8,74); M2(86,148) = M1(8,75); M2(86,149) = M1(8,76); M2(86,150) = M1(8,77); M2(86,151) = M1(8,78); M2(86,152) = M1(8,79); M2(86,153) = M1(8,80); M2(86,154) = M1(8,81); M2(86,155) = M1(8,82); M2(86,156) = M1(8,83); 
M2(87,81) = M1(9,9); M2(87,87) = M1(9,15); M2(87,88) = M1(9,16); M2(87,89) = M1(9,17); M2(87,90) = M1(9,18); M2(87,91) = M1(9,19); M2(87,92) = M1(9,20); M2(87,94) = M1(9,21); M2(87,95) = M1(9,22); M2(87,96) = M1(9,23); M2(87,97) = M1(9,24); M2(87,98) = M1(9,25); M2(87,99) = M1(9,26); M2(87,100) = M1(9,27); M2(87,101) = M1(9,28); M2(87,102) = M1(9,29); M2(87,103) = M1(9,30); M2(87,104) = M1(9,31); M2(87,105) = M1(9,32); M2(87,106) = M1(9,33); M2(87,107) = M1(9,34); M2(87,108) = M1(9,35); M2(87,109) = M1(9,36); M2(87,110) = M1(9,37); M2(87,111) = M1(9,38); M2(87,112) = M1(9,39); M2(87,113) = M1(9,40); M2(87,114) = M1(9,41); M2(87,115) = M1(9,42); M2(87,116) = M1(9,43); M2(87,117) = M1(9,44); M2(87,118) = M1(9,45); M2(87,119) = M1(9,46); M2(87,120) = M1(9,47); M2(87,121) = M1(9,48); M2(87,122) = M1(9,49); M2(87,123) = M1(9,50); M2(87,124) = M1(9,51); M2(87,125) = M1(9,52); M2(87,126) = M1(9,53); M2(87,127) = M1(9,54); M2(87,128) = M1(9,55); M2(87,129) = M1(9,56); M2(87,130) = M1(9,57); M2(87,131) = M1(9,58); M2(87,132) = M1(9,59); M2(87,133) = M1(9,60); M2(87,134) = M1(9,61); M2(87,135) = M1(9,62); M2(87,136) = M1(9,63); M2(87,137) = M1(9,64); M2(87,138) = M1(9,65); M2(87,139) = M1(9,66); M2(87,140) = M1(9,67); M2(87,141) = M1(9,68); M2(87,142) = M1(9,69); M2(87,143) = M1(9,70); M2(87,144) = M1(9,71); M2(87,145) = M1(9,72); M2(87,146) = M1(9,73); M2(87,147) = M1(9,74); M2(87,148) = M1(9,75); M2(87,149) = M1(9,76); M2(87,150) = M1(9,77); M2(87,151) = M1(9,78); M2(87,152) = M1(9,79); M2(87,153) = M1(9,80); M2(87,154) = M1(9,81); M2(87,155) = M1(9,82); M2(87,156) = M1(9,83); 
M2(88,82) = M1(10,10); M2(88,87) = M1(10,15); M2(88,88) = M1(10,16); M2(88,89) = M1(10,17); M2(88,90) = M1(10,18); M2(88,91) = M1(10,19); M2(88,92) = M1(10,20); M2(88,94) = M1(10,21); M2(88,95) = M1(10,22); M2(88,96) = M1(10,23); M2(88,97) = M1(10,24); M2(88,98) = M1(10,25); M2(88,99) = M1(10,26); M2(88,100) = M1(10,27); M2(88,101) = M1(10,28); M2(88,102) = M1(10,29); M2(88,103) = M1(10,30); M2(88,104) = M1(10,31); M2(88,105) = M1(10,32); M2(88,106) = M1(10,33); M2(88,107) = M1(10,34); M2(88,108) = M1(10,35); M2(88,109) = M1(10,36); M2(88,110) = M1(10,37); M2(88,111) = M1(10,38); M2(88,112) = M1(10,39); M2(88,113) = M1(10,40); M2(88,114) = M1(10,41); M2(88,115) = M1(10,42); M2(88,116) = M1(10,43); M2(88,117) = M1(10,44); M2(88,118) = M1(10,45); M2(88,119) = M1(10,46); M2(88,120) = M1(10,47); M2(88,121) = M1(10,48); M2(88,122) = M1(10,49); M2(88,123) = M1(10,50); M2(88,124) = M1(10,51); M2(88,125) = M1(10,52); M2(88,126) = M1(10,53); M2(88,127) = M1(10,54); M2(88,128) = M1(10,55); M2(88,129) = M1(10,56); M2(88,130) = M1(10,57); M2(88,131) = M1(10,58); M2(88,132) = M1(10,59); M2(88,133) = M1(10,60); M2(88,134) = M1(10,61); M2(88,135) = M1(10,62); M2(88,136) = M1(10,63); M2(88,137) = M1(10,64); M2(88,138) = M1(10,65); M2(88,139) = M1(10,66); M2(88,140) = M1(10,67); M2(88,141) = M1(10,68); M2(88,142) = M1(10,69); M2(88,143) = M1(10,70); M2(88,144) = M1(10,71); M2(88,145) = M1(10,72); M2(88,146) = M1(10,73); M2(88,147) = M1(10,74); M2(88,148) = M1(10,75); M2(88,149) = M1(10,76); M2(88,150) = M1(10,77); M2(88,151) = M1(10,78); M2(88,152) = M1(10,79); M2(88,153) = M1(10,80); M2(88,154) = M1(10,81); M2(88,155) = M1(10,82); M2(88,156) = M1(10,83); 
M2(89,83) = M1(11,11); M2(89,87) = M1(11,15); M2(89,88) = M1(11,16); M2(89,89) = M1(11,17); M2(89,90) = M1(11,18); M2(89,91) = M1(11,19); M2(89,92) = M1(11,20); M2(89,94) = M1(11,21); M2(89,95) = M1(11,22); M2(89,96) = M1(11,23); M2(89,97) = M1(11,24); M2(89,98) = M1(11,25); M2(89,99) = M1(11,26); M2(89,100) = M1(11,27); M2(89,101) = M1(11,28); M2(89,102) = M1(11,29); M2(89,103) = M1(11,30); M2(89,104) = M1(11,31); M2(89,105) = M1(11,32); M2(89,106) = M1(11,33); M2(89,107) = M1(11,34); M2(89,108) = M1(11,35); M2(89,109) = M1(11,36); M2(89,110) = M1(11,37); M2(89,111) = M1(11,38); M2(89,112) = M1(11,39); M2(89,113) = M1(11,40); M2(89,114) = M1(11,41); M2(89,115) = M1(11,42); M2(89,116) = M1(11,43); M2(89,117) = M1(11,44); M2(89,118) = M1(11,45); M2(89,119) = M1(11,46); M2(89,120) = M1(11,47); M2(89,121) = M1(11,48); M2(89,122) = M1(11,49); M2(89,123) = M1(11,50); M2(89,124) = M1(11,51); M2(89,125) = M1(11,52); M2(89,126) = M1(11,53); M2(89,127) = M1(11,54); M2(89,128) = M1(11,55); M2(89,129) = M1(11,56); M2(89,130) = M1(11,57); M2(89,131) = M1(11,58); M2(89,132) = M1(11,59); M2(89,133) = M1(11,60); M2(89,134) = M1(11,61); M2(89,135) = M1(11,62); M2(89,136) = M1(11,63); M2(89,137) = M1(11,64); M2(89,138) = M1(11,65); M2(89,139) = M1(11,66); M2(89,140) = M1(11,67); M2(89,141) = M1(11,68); M2(89,142) = M1(11,69); M2(89,143) = M1(11,70); M2(89,144) = M1(11,71); M2(89,145) = M1(11,72); M2(89,146) = M1(11,73); M2(89,147) = M1(11,74); M2(89,148) = M1(11,75); M2(89,149) = M1(11,76); M2(89,150) = M1(11,77); M2(89,151) = M1(11,78); M2(89,152) = M1(11,79); M2(89,153) = M1(11,80); M2(89,154) = M1(11,81); M2(89,155) = M1(11,82); M2(89,156) = M1(11,83); 
M2(90,84) = M1(12,12); M2(90,87) = M1(12,15); M2(90,88) = M1(12,16); M2(90,89) = M1(12,17); M2(90,90) = M1(12,18); M2(90,91) = M1(12,19); M2(90,92) = M1(12,20); M2(90,94) = M1(12,21); M2(90,95) = M1(12,22); M2(90,96) = M1(12,23); M2(90,97) = M1(12,24); M2(90,98) = M1(12,25); M2(90,99) = M1(12,26); M2(90,100) = M1(12,27); M2(90,101) = M1(12,28); M2(90,102) = M1(12,29); M2(90,103) = M1(12,30); M2(90,104) = M1(12,31); M2(90,105) = M1(12,32); M2(90,106) = M1(12,33); M2(90,107) = M1(12,34); M2(90,108) = M1(12,35); M2(90,109) = M1(12,36); M2(90,110) = M1(12,37); M2(90,111) = M1(12,38); M2(90,112) = M1(12,39); M2(90,113) = M1(12,40); M2(90,114) = M1(12,41); M2(90,115) = M1(12,42); M2(90,116) = M1(12,43); M2(90,117) = M1(12,44); M2(90,118) = M1(12,45); M2(90,119) = M1(12,46); M2(90,120) = M1(12,47); M2(90,121) = M1(12,48); M2(90,122) = M1(12,49); M2(90,123) = M1(12,50); M2(90,124) = M1(12,51); M2(90,125) = M1(12,52); M2(90,126) = M1(12,53); M2(90,127) = M1(12,54); M2(90,128) = M1(12,55); M2(90,129) = M1(12,56); M2(90,130) = M1(12,57); M2(90,131) = M1(12,58); M2(90,132) = M1(12,59); M2(90,133) = M1(12,60); M2(90,134) = M1(12,61); M2(90,135) = M1(12,62); M2(90,136) = M1(12,63); M2(90,137) = M1(12,64); M2(90,138) = M1(12,65); M2(90,139) = M1(12,66); M2(90,140) = M1(12,67); M2(90,141) = M1(12,68); M2(90,142) = M1(12,69); M2(90,143) = M1(12,70); M2(90,144) = M1(12,71); M2(90,145) = M1(12,72); M2(90,146) = M1(12,73); M2(90,147) = M1(12,74); M2(90,148) = M1(12,75); M2(90,149) = M1(12,76); M2(90,150) = M1(12,77); M2(90,151) = M1(12,78); M2(90,152) = M1(12,79); M2(90,153) = M1(12,80); M2(90,154) = M1(12,81); M2(90,155) = M1(12,82); M2(90,156) = M1(12,83); 
M2(91,85) = M1(13,13); M2(91,87) = M1(13,15); M2(91,88) = M1(13,16); M2(91,89) = M1(13,17); M2(91,90) = M1(13,18); M2(91,91) = M1(13,19); M2(91,92) = M1(13,20); M2(91,94) = M1(13,21); M2(91,95) = M1(13,22); M2(91,96) = M1(13,23); M2(91,97) = M1(13,24); M2(91,98) = M1(13,25); M2(91,99) = M1(13,26); M2(91,100) = M1(13,27); M2(91,101) = M1(13,28); M2(91,102) = M1(13,29); M2(91,103) = M1(13,30); M2(91,104) = M1(13,31); M2(91,105) = M1(13,32); M2(91,106) = M1(13,33); M2(91,107) = M1(13,34); M2(91,108) = M1(13,35); M2(91,109) = M1(13,36); M2(91,110) = M1(13,37); M2(91,111) = M1(13,38); M2(91,112) = M1(13,39); M2(91,113) = M1(13,40); M2(91,114) = M1(13,41); M2(91,115) = M1(13,42); M2(91,116) = M1(13,43); M2(91,117) = M1(13,44); M2(91,118) = M1(13,45); M2(91,119) = M1(13,46); M2(91,120) = M1(13,47); M2(91,121) = M1(13,48); M2(91,122) = M1(13,49); M2(91,123) = M1(13,50); M2(91,124) = M1(13,51); M2(91,125) = M1(13,52); M2(91,126) = M1(13,53); M2(91,127) = M1(13,54); M2(91,128) = M1(13,55); M2(91,129) = M1(13,56); M2(91,130) = M1(13,57); M2(91,131) = M1(13,58); M2(91,132) = M1(13,59); M2(91,133) = M1(13,60); M2(91,134) = M1(13,61); M2(91,135) = M1(13,62); M2(91,136) = M1(13,63); M2(91,137) = M1(13,64); M2(91,138) = M1(13,65); M2(91,139) = M1(13,66); M2(91,140) = M1(13,67); M2(91,141) = M1(13,68); M2(91,142) = M1(13,69); M2(91,143) = M1(13,70); M2(91,144) = M1(13,71); M2(91,145) = M1(13,72); M2(91,146) = M1(13,73); M2(91,147) = M1(13,74); M2(91,148) = M1(13,75); M2(91,149) = M1(13,76); M2(91,150) = M1(13,77); M2(91,151) = M1(13,78); M2(91,152) = M1(13,79); M2(91,153) = M1(13,80); M2(91,154) = M1(13,81); M2(91,155) = M1(13,82); M2(91,156) = M1(13,83); 
M2(92,86) = M1(14,14); M2(92,87) = M1(14,15); M2(92,88) = M1(14,16); M2(92,89) = M1(14,17); M2(92,90) = M1(14,18); M2(92,91) = M1(14,19); M2(92,92) = M1(14,20); M2(92,94) = M1(14,21); M2(92,95) = M1(14,22); M2(92,96) = M1(14,23); M2(92,97) = M1(14,24); M2(92,98) = M1(14,25); M2(92,99) = M1(14,26); M2(92,100) = M1(14,27); M2(92,101) = M1(14,28); M2(92,102) = M1(14,29); M2(92,103) = M1(14,30); M2(92,104) = M1(14,31); M2(92,105) = M1(14,32); M2(92,106) = M1(14,33); M2(92,107) = M1(14,34); M2(92,108) = M1(14,35); M2(92,109) = M1(14,36); M2(92,110) = M1(14,37); M2(92,111) = M1(14,38); M2(92,112) = M1(14,39); M2(92,113) = M1(14,40); M2(92,114) = M1(14,41); M2(92,115) = M1(14,42); M2(92,116) = M1(14,43); M2(92,117) = M1(14,44); M2(92,118) = M1(14,45); M2(92,119) = M1(14,46); M2(92,120) = M1(14,47); M2(92,121) = M1(14,48); M2(92,122) = M1(14,49); M2(92,123) = M1(14,50); M2(92,124) = M1(14,51); M2(92,125) = M1(14,52); M2(92,126) = M1(14,53); M2(92,127) = M1(14,54); M2(92,128) = M1(14,55); M2(92,129) = M1(14,56); M2(92,130) = M1(14,57); M2(92,131) = M1(14,58); M2(92,132) = M1(14,59); M2(92,133) = M1(14,60); M2(92,134) = M1(14,61); M2(92,135) = M1(14,62); M2(92,136) = M1(14,63); M2(92,137) = M1(14,64); M2(92,138) = M1(14,65); M2(92,139) = M1(14,66); M2(92,140) = M1(14,67); M2(92,141) = M1(14,68); M2(92,142) = M1(14,69); M2(92,143) = M1(14,70); M2(92,144) = M1(14,71); M2(92,145) = M1(14,72); M2(92,146) = M1(14,73); M2(92,147) = M1(14,74); M2(92,148) = M1(14,75); M2(92,149) = M1(14,76); M2(92,150) = M1(14,77); M2(92,151) = M1(14,78); M2(92,152) = M1(14,79); M2(92,153) = M1(14,80); M2(92,154) = M1(14,81); M2(92,155) = M1(14,82); M2(92,156) = M1(14,83); 

Eigen::PartialPivLU< Eigen::Matrix<floatPrec,93,93> > lu(M2.template block<93,93>(0,0));
Eigen::Matrix<floatPrec,93,64> M3 = lu.solve(M2.template block<93,64>(0,93));
Action = Eigen::Matrix<floatPrec,64,64>::Zero();
Action.row(0) -= M3.template block<1,64>(36,0);
Action.row(1) -= M3.template block<1,64>(66,0);
Action.row(2) -= M3.template block<1,64>(67,0);
Action.row(3) -= M3.template block<1,64>(68,0);
Action.row(4) -= M3.template block<1,64>(69,0);
Action.row(5) -= M3.template block<1,64>(70,0);
Action.row(6) -= M3.template block<1,64>(71,0);
Action(7,0) = 1.0;
Action.row(8) -= M3.template block<1,64>(79,0);
Action.row(9) -= M3.template block<1,64>(80,0);
Action.row(10) -= M3.template block<1,64>(81,0);
Action.row(11) -= M3.template block<1,64>(82,0);
Action.row(12) -= M3.template block<1,64>(83,0);
Action.row(13) -= M3.template block<1,64>(84,0);
Action.row(14) -= M3.template block<1,64>(85,0);
Action.row(15) -= M3.template block<1,64>(86,0);
Action.row(16) -= M3.template block<1,64>(87,0);
Action.row(17) -= M3.template block<1,64>(88,0);
Action.row(18) -= M3.template block<1,64>(89,0);
Action.row(19) -= M3.template block<1,64>(90,0);
Action.row(20) -= M3.template block<1,64>(91,0);
Action.row(21) -= M3.template block<1,64>(92,0);
Action(22,1) = 1.0;
Action(23,2) = 1.0;
Action(24,3) = 1.0;
Action(25,4) = 1.0;
Action(26,5) = 1.0;
Action(27,6) = 1.0;
Action(28,7) = 1.0;
Action(29,14) = 1.0;
Action(30,15) = 1.0;
Action(31,16) = 1.0;
Action(32,17) = 1.0;
Action(33,18) = 1.0;
Action(34,19) = 1.0;
Action(35,20) = 1.0;
Action(36,21) = 1.0;
Action(37,22) = 1.0;
Action(38,23) = 1.0;
Action(39,24) = 1.0;
Action(40,25) = 1.0;
Action(41,26) = 1.0;
Action(42,27) = 1.0;
Action(43,28) = 1.0;
Action(44,34) = 1.0;
Action(45,35) = 1.0;
Action(46,36) = 1.0;
Action(47,37) = 1.0;
Action(48,38) = 1.0;
Action(49,39) = 1.0;
Action(50,40) = 1.0;
Action(51,41) = 1.0;
Action(52,42) = 1.0;
Action(53,43) = 1.0;
Action(54,48) = 1.0;
Action(55,49) = 1.0;
Action(56,50) = 1.0;
Action(57,51) = 1.0;
Action(58,52) = 1.0;
Action(59,53) = 1.0;
Action(60,57) = 1.0;
Action(61,58) = 1.0;
Action(62,59) = 1.0;
Action(63,62) = 1.0;
//columns of Action mean:
// x_3^7 x_2^3*x_3^3 x_1^2*x_3^4 x_1*x_2*x_3^4 x_2^2*x_3^4 x_1*x_3^5 x_2*x_3^5 x_3^6 x_1^5 x_1^4*x_2 x_1^3*x_2^2 x_1^2*x_2^3 x_1*x_2^4 x_2^5 x_1^4*x_3 x_1^3*x_2*x_3 x_1^2*x_2^2*x_3 x_1*x_2^3*x_3 x_2^4*x_3 x_1^3*x_3^2 x_1^2*x_2*x_3^2 x_1*x_2^2*x_3^2 x_2^3*x_3^2 x_1^2*x_3^3 x_1*x_2*x_3^3 x_2^2*x_3^3 x_1*x_3^4 x_2*x_3^4 x_3^5 x_1^4 x_1^3*x_2 x_1^2*x_2^2 x_1*x_2^3 x_2^4 x_1^3*x_3 x_1^2*x_2*x_3 x_1*x_2^2*x_3 x_2^3*x_3 x_1^2*x_3^2 x_1*x_2*x_3^2 x_2^2*x_3^2 x_1*x_3^3 x_2*x_3^3 x_3^4 x_1^3 x_1^2*x_2 x_1*x_2^2 x_2^3 x_1^2*x_3 x_1*x_2*x_3 x_2^2*x_3 x_1*x_3^2 x_2*x_3^2 x_3^3 x_1^2 x_1*x_2 x_2^2 x_1*x_3 x_2*x_3 x_3^2 x_1 x_2 x_3 1
}